

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void * generate_func_code(MIR_context_t ctx,MIR_item_t func_item,int machine_code_p)

{
  void *pvVar1;
  ulong *puVar2;
  DLIST_LINK_bb_t *pDVar3;
  undefined8 uVar4;
  undefined8 uVar8;
  undefined8 uVar10;
  undefined1 auVar5 [32];
  undefined8 uVar12;
  undefined1 auVar6 [32];
  undefined2 uVar13;
  MIR_context_t pMVar14;
  MIR_func_t pMVar15;
  MIR_item_t_conflict pMVar16;
  ssa_edge_t_conflict psVar17;
  MIR_context_t ctx_00;
  MIR_func_t func;
  long *plVar18;
  bitmap_t pVVar19;
  gen_ctx_t ctx_01;
  gen_ctx_t bm;
  FILE *pFVar20;
  in_edge_t_conflict peVar21;
  bb_t pbVar22;
  out_edge_t peVar23;
  in_edge_t peVar24;
  out_edge_t peVar25;
  edge_t_conflict e;
  MIR_reg_t *pMVar26;
  bb_insn_t pbVar27;
  uint8_t *base;
  ssa_ctx *psVar28;
  undefined1 auVar29 [16];
  uint8_t *puVar30;
  MIR_disp_t MVar31;
  MIR_disp_t MVar32;
  MIR_insn_t pMVar33;
  int64_t iVar34;
  MIR_insn_t *ppMVar35;
  MIR_insn_t pMVar36;
  MIR_insn_t pMVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  MIR_op_t op;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  anon_union_32_12_57d33f68_for_u aVar42;
  anon_union_32_12_57d33f68_for_u aVar43;
  undefined1 auVar44 [32];
  anon_union_32_12_57d33f68_for_u aVar45;
  undefined1 auVar46 [16];
  undefined4 uVar47;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined8 uVar52;
  undefined4 uVar53;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined8 uVar58;
  anon_union_32_12_57d33f68_for_u aVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  MIR_op_t op1;
  DLIST_LINK_MIR_insn_t DVar62;
  target_ctx **pptVar63;
  MIR_item_t *ppMVar64;
  bool bVar65;
  char cVar66;
  uint8_t uVar67;
  MIR_reg_t MVar69;
  uint uVar70;
  int iVar71;
  MIR_reg_t MVar72;
  uint uVar73;
  MIR_type_t MVar74;
  MIR_op_mode_t MVar75;
  uint uVar76;
  int iVar77;
  int iVar78;
  ssa_edge_t_conflict se;
  char *pcVar79;
  func_cfg_t pfVar80;
  bb_t_conflict pbVar81;
  bb_t_conflict pbVar82;
  MIR_insn_t_conflict pMVar83;
  VARR_MIR_var_t *pVVar84;
  bb_insn_t_conflict pbVar85;
  MIR_insn_t_conflict *ppMVar86;
  bb_t_conflict pbVar87;
  MIR_insn_t pMVar88;
  MIR_insn_t pMVar89;
  VARR_reg_info_t *pVVar90;
  reg_info_t *prVar91;
  bitmap_t pVVar92;
  bitmap_el_t *pbVar93;
  bb_insn_t_conflict *ppbVar94;
  mem_expr_t pmVar95;
  mem_expr_t *ppmVar96;
  bb_t_conflict *ppbVar97;
  MIR_insn_t_conflict pMVar98;
  bb_t pbVar99;
  MIR_insn_t_conflict pMVar100;
  MIR_insn_t_conflict pMVar101;
  MIR_insn_t_conflict pMVar102;
  MIR_insn_t_conflict pMVar103;
  loop_node_t plVar104;
  bb_insn_t_conflict pbVar105;
  bb_insn_t_conflict pbVar106;
  bb_t pbVar107;
  mv_t *pmVar108;
  MIR_reg_t *pMVar109;
  bitmap_t pVVar110;
  ulong uVar111;
  FILE *pFVar112;
  undefined8 *puVar113;
  bb_insn_t pbVar114;
  int *piVar115;
  uint8_t *puVar116;
  uint64_t *puVar117;
  MIR_insn_t pMVar118;
  target_ctx *extraout_RAX;
  MIR_code_reloc_t *pMVar119;
  target_ctx *extraout_RAX_00;
  gen_ctx_t pgVar120;
  VARR_void_ptr_t *pVVar121;
  void_ptr_t *ppvVar122;
  VARR_MIR_op_t *pVVar123;
  MIR_op_t *pMVar124;
  VARR_MIR_insn_t *pVVar125;
  VARR_bb_insn_t *pVVar126;
  VARR_loop_node_t *pVVar127;
  loop_node_t_conflict *pplVar128;
  VARR_mem_attr_t *pVVar129;
  mem_attr_t *pmVar130;
  VARR_target_bb_version_t *pVVar131;
  target_bb_version_t *pptVar132;
  VARR_spot_attr_t *pVVar133;
  spot_attr_t *psVar134;
  data_flow_ctx *pdVar135;
  VARR_bb_t *pVVar136;
  ssa_ctx *psVar137;
  HTAB_def_tab_el_t *pHVar138;
  VARR_HTAB_EL_def_tab_el_t *pVVar139;
  HTAB_EL_def_tab_el_t *pHVar140;
  VARR_htab_ind_t *pVVar141;
  insn_pattern_info_t *piVar142;
  VARR_ssa_edge_t *pVVar143;
  ssa_edge_t_conflict *ppsVar144;
  VARR_size_t *pVVar145;
  size_t *psVar146;
  VARR_char *pVVar147;
  gvn_ctx *pgVar148;
  VARR_expr_t *pVVar149;
  expr_t *ppeVar150;
  HTAB_expr_t *pHVar151;
  VARR_HTAB_EL_expr_t *pVVar152;
  HTAB_EL_expr_t *pHVar153;
  VARR_mem_expr_t *pVVar154;
  HTAB_mem_expr_t *pHVar155;
  VARR_HTAB_EL_mem_expr_t *pVVar156;
  HTAB_EL_mem_expr_t *pHVar157;
  VARR_insn_nop_pair_t *pVVar158;
  insn_nop_pair_t *piVar159;
  lr_ctx *plVar160;
  VARR_int *pVVar161;
  VARR_MIR_reg_t *pVVar162;
  VARR_live_range_t *pVVar163;
  live_range_t_conflict *pplVar164;
  coalesce_ctx *pcVar165;
  VARR_mv_t *pVVar166;
  ra_ctx *prVar167;
  VARR_allocno_info_t *pVVar168;
  allocno_info_t *paVar169;
  VARR_bitmap_t *pVVar170;
  VARR_lr_gap_t *pVVar171;
  lr_gap_t *plVar172;
  VARR_spill_el_t *pVVar173;
  spill_el_t *psVar174;
  HTAB_lr_gap_t *pHVar175;
  VARR_HTAB_EL_lr_gap_t *pVVar176;
  HTAB_EL_lr_gap_t *pHVar177;
  VARR_spill_cache_el_t *pVVar178;
  spill_cache_el_t *psVar179;
  combine_ctx *pcVar180;
  VARR_var_ref_t *pVVar181;
  var_ref_t *pvVar182;
  target_ctx *ptVar183;
  VARR_uint8_t *pVVar184;
  VARR_uint64_t *pVVar185;
  VARR_const_ref_t *pVVar186;
  const_ref_t *pcVar187;
  VARR_label_ref_t *pVVar188;
  label_ref_t *plVar189;
  VARR_MIR_code_reloc_t *pVVar190;
  VARR_call_ref_t *pVVar191;
  call_ref_t *pcVar192;
  byte *pbVar193;
  byte *pbVar194;
  VARR_insn_pattern_info_t *pVVar195;
  bool bVar196;
  undefined8 *puVar197;
  long *plVar198;
  MIR_item_t pMVar199;
  size_t sVar200;
  bb_insn_t pbVar201;
  void *pvVar202;
  uint uVar203;
  anon_union_32_12_57d33f68_for_u *paVar204;
  bitmap_t pVVar205;
  long lVar206;
  long lVar207;
  bitmap_t *ppVVar208;
  MIR_item_t pMVar209;
  MIR_item_t pMVar210;
  gen_ctx_t pgVar211;
  ulong uVar212;
  MIR_type_t MVar213;
  undefined8 uVar214;
  ulong uVar215;
  ulong uVar216;
  void *pvVar217;
  MIR_insn_code_t MVar218;
  undefined4 uVar219;
  size_t sVar220;
  char *pcVar221;
  loop_node_t_conflict plVar222;
  DLIST_out_edge_t *pDVar223;
  in_edge_t peVar224;
  DLIST_LINK_in_edge_t *pDVar225;
  DLIST_in_edge_t *pDVar226;
  loop_node_t_conflict insn;
  void *pvVar227;
  void *pvVar228;
  gen_ctx_t __stream;
  void *pvVar229;
  uint *puVar230;
  uint32_t uVar231;
  int iVar232;
  MIR_item_t *unaff_R12;
  size_t sVar233;
  ulong uVar234;
  anon_union_32_12_57d33f68_for_u *paVar235;
  void *pvVar236;
  ushort *puVar237;
  MIR_lref_data *pMVar238;
  int i;
  MIR_insn_code_t MVar239;
  uint uVar240;
  ulong uVar241;
  long lVar242;
  MIR_item_t pMVar243;
  MIR_item_t pMVar244;
  size_t sVar245;
  undefined1 *puVar246;
  uint64_t uVar247;
  void **ppvVar248;
  byte bVar249;
  bool bVar250;
  bool bVar251;
  bool bVar252;
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  undefined1 auVar261 [16];
  undefined1 in_ZMM1 [64];
  undefined8 in_XMM2_Qb;
  bb_insn_t_conflict bb_insn;
  MIR_op_t temp_op_1;
  int64_t c;
  MIR_reg_t early_clobbered_hard_reg1;
  int out_p;
  MIR_op_t temp_op;
  timeval tv;
  MIR_op_t *op_ref;
  undefined4 uStack_5ac;
  uint uStack_5a8;
  uint uStack_5a4;
  undefined4 uStack_580;
  MIR_op_t MStack_578;
  target_ctx **pptStack_548;
  long lStack_540;
  gen_ctx_t pgStack_538;
  MIR_context_t pMStack_530;
  pattern *ppStack_528;
  MIR_type_t MStack_51c;
  MIR_var_t aMStack_518 [2];
  gen_ctx_t pgStack_4e0;
  bb_t pbStack_4d8;
  char *pcStack_4d0;
  bb_t_conflict pbStack_4c8;
  bb_t pbStack_4c0;
  code *pcStack_4b8;
  MIR_context_t pMStack_4b0;
  MIR_context_t pMStack_4a8;
  MIR_context_t pMStack_4a0;
  MIR_context_t local_400;
  uint local_3f8;
  bb_t_conflict local_3f0;
  MIR_insn_code_t local_3d0;
  long local_3c8;
  MIR_insn_code_t local_3b8;
  MIR_insn_t_conflict local_3a0;
  undefined1 local_398 [16];
  undefined1 auStack_388 [16];
  byte local_378;
  undefined3 local_377;
  undefined1 uStack_374;
  undefined3 uStack_373;
  undefined8 uStack_370;
  MIR_item_t *local_360;
  bb_insn_t_conflict local_358;
  MIR_item_t_conflict local_350;
  MIR_context_t local_348;
  int local_33c;
  undefined1 local_338 [48];
  loop_node_t local_308;
  gen_ctx_t local_300;
  anon_union_8_10_166bea1d_for_u local_2f8;
  bitmap_t *local_2f0;
  bb_insn_t local_2e8 [6];
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined8 uStack_2b0;
  int local_288 [12];
  undefined1 local_258 [16];
  anon_union_32_12_57d33f68_for_u aStack_248;
  bb_insn_t *local_220;
  timeval local_218;
  MIR_insn_t pMStack_208;
  MIR_insn_t_conflict apMStack_200 [6];
  undefined4 uStack_1d0;
  MIR_op_t local_f8 [3];
  MIR_op_t local_68;
  undefined8 uVar7;
  undefined8 uVar9;
  undefined8 uVar11;
  undefined8 uVar48;
  undefined1 auVar262 [24];
  undefined8 uVar54;
  undefined1 auVar263 [24];
  ushort uVar68;
  
  pgVar120 = ctx->gen_ctx;
  pMStack_4a0 = (MIR_context_t)0x145100;
  local_348 = ctx;
  local_33c = machine_code_p;
  gettimeofday(&local_218,(__timezone_ptr_t)0x0);
  if ((func_item->item_type != MIR_func_item) || (func_item->data != (void *)0x0))
  goto LAB_0014f236;
  local_350 = func_item;
  if (((func_item->u).func)->machine_code == (void *)0x0) {
    local_2f8 = (anon_union_8_10_166bea1d_for_u)
                (double)CONCAT44(local_218.tv_usec._4_4_,(undefined4)local_218.tv_usec);
    pFVar112 = (FILE *)pgVar120->debug_file;
    lVar207 = CONCAT44(local_218.tv_sec._4_4_,(uint)local_218.tv_sec);
    if ((pFVar112 != (FILE *)0x0) && (-1 < pgVar120->debug_level)) {
      pMStack_4a0 = (MIR_context_t)0x1451da;
      pcVar79 = MIR_item_name(local_348,func_item);
      pMStack_4a0 = (MIR_context_t)0x1451ee;
      fprintf(pFVar112,"Code generation of function %s:\n",pcVar79);
      if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
        pMStack_4a0 = (MIR_context_t)0x145214;
        fwrite("+++++++++++++MIR before generator:\n",0x23,1,(FILE *)pgVar120->debug_file);
        pMStack_4a0 = (MIR_context_t)0x14522d;
        MIR_output_item(local_348,pgVar120->debug_file,local_350);
      }
    }
    pMVar16 = local_350;
    pgVar120->curr_func_item = local_350;
    pMStack_4a0 = (MIR_context_t)0x145249;
    _MIR_duplicate_func_insns(local_348,local_350);
    pMStack_4a0 = (MIR_context_t)0x145256;
    pfVar80 = (func_cfg_t)gen_malloc(pgVar120,0x30);
    pMVar16->data = pfVar80;
    pgVar120->curr_cfg = pfVar80;
    auVar260 = ZEXT864(0) << 0x40;
    pMVar14 = pgVar120->ctx;
    pMVar15 = (pgVar120->curr_func_item->u).func;
    (pfVar80->bbs).head = (bb_t_conflict)0x0;
    (pfVar80->bbs).tail = (bb_t_conflict)0x0;
    pfVar80->max_var = 0x21;
    pfVar80->curr_bb_insn_index = 0;
    pfVar80->root_loop_node = (loop_node_t_conflict)0x0;
    pgVar120->curr_bb_index = 0;
    pVVar84 = pMVar15->vars;
    if (pVVar84 != (VARR_MIR_var_t *)0x0) {
      auVar255._8_8_ = 0;
      auVar255._0_8_ = local_2f8;
      auVar253._8_8_ = 0;
      auVar253._0_8_ = (double)lVar207;
      in_ZMM1 = ZEXT1664(auVar253);
      unaff_R12 = &pgVar120->curr_func_item;
      lVar207 = 8;
      uVar241 = 0xffffffffffffffff;
      auVar255 = vfmadd231sd_fma(auVar255,auVar253,ZEXT816(0x412e848000000000));
      auVar260 = ZEXT1664(auVar255);
      local_2f8 = auVar255._0_8_;
      do {
        uVar241 = uVar241 + 1;
        if (pVVar84->els_num <= uVar241) goto LAB_0014532f;
        if (pVVar84->varr == (MIR_var_t *)0x0) goto LAB_0014f0bf;
        pMStack_4a0 = (MIR_context_t)0x145300;
        MVar69 = MIR_reg(pMVar14,*(char **)((long)&pVVar84->varr->type + lVar207),pMVar15);
        uVar70 = MVar69 + 0x21;
        if ((uVar70 != 0xffffffff) && (pgVar120->curr_cfg->max_var < uVar70)) {
          pgVar120->curr_cfg->max_var = uVar70;
        }
        lVar207 = lVar207 + 0x18;
        pVVar84 = pMVar15->vars;
      } while (pVVar84 != (VARR_MIR_var_t *)0x0);
    }
    pMStack_4a0 = (MIR_context_t)0x14532f;
    generate_func_code_cold_185();
LAB_0014532f:
    pMStack_4a0 = (MIR_context_t)0x145339;
    pbVar81 = create_bb(pgVar120,(MIR_insn_t)0x0);
    pMStack_4a0 = (MIR_context_t)0x145347;
    add_new_bb(pgVar120,pbVar81);
    pMStack_4a0 = (MIR_context_t)0x145351;
    pbVar82 = create_bb(pgVar120,(MIR_insn_t)0x0);
    pMStack_4a0 = (MIR_context_t)0x145364;
    add_new_bb(pgVar120,pbVar82);
    pMVar16 = pgVar120->curr_func_item;
    pMStack_4a0 = (MIR_context_t)0x145370;
    pMVar83 = MIR_new_label(pMVar14);
    pMStack_4a0 = (MIR_context_t)0x14537e;
    MIR_prepend_insn(pMVar14,pMVar16,pMVar83);
    pMStack_4a0 = (MIR_context_t)0x145388;
    local_3f0 = create_bb(pgVar120,(MIR_insn_t)0x0);
    pMStack_4a0 = (MIR_context_t)0x14539b;
    add_new_bb(pgVar120,local_3f0);
    pVVar92 = pgVar120->tied_regs;
    if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0)) {
      pMStack_4a0 = (MIR_context_t)0x14f492;
      generate_func_code_cold_183();
LAB_0014f492:
      pMStack_4a0 = (MIR_context_t)0x14f497;
      generate_func_code_cold_182();
LAB_0014f497:
      pMStack_4a0 = (MIR_context_t)0x14f49c;
      generate_func_code_cold_181();
LAB_0014f49c:
      pMStack_4a0 = (MIR_context_t)0x14f4a1;
      generate_func_code_cold_180();
LAB_0014f4a1:
      pMStack_4a0 = (MIR_context_t)0x14f4a6;
      generate_func_code_cold_76();
LAB_0014f4a6:
      pMStack_4a0 = (MIR_context_t)0x14f4ab;
      generate_func_code_cold_75();
      goto LAB_0014f4ab;
    }
    pVVar92->els_num = 0;
    pVVar92 = pgVar120->addr_regs;
    if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0)) goto LAB_0014f492;
    pVVar92->els_num = 0;
    pgVar120->addr_insn_p = 0;
    pVVar125 = pgVar120->temp_insns;
    if ((pVVar125 == (VARR_MIR_insn_t *)0x0) || (pVVar125->varr == (MIR_insn_t_conflict *)0x0))
    goto LAB_0014f497;
    pVVar125->els_num = 0;
    pVVar125 = pgVar120->temp_insns2;
    local_360 = unaff_R12;
    if ((pVVar125 == (VARR_MIR_insn_t *)0x0) || (pVVar125->varr == (MIR_insn_t_conflict *)0x0))
    goto LAB_0014f49c;
    pVVar125->els_num = 0;
    pMVar83 = (pMVar15->insns).head;
    if (pMVar83 != (MIR_insn_t_conflict)0x0) {
      pMVar118 = (MIR_insn_t)0x0;
      do {
        iVar71 = *(int *)&pMVar83->field_0x18;
        pMVar88 = (pMVar83->insn_link).next;
        if (iVar71 - 0x22U < 0xfffffffc) {
          if (iVar71 != 0xab) {
            if (0xfffffffc < iVar71 - 0xaaU) {
              local_3f0->call_p = '\x01';
            }
            goto LAB_00145650;
          }
          if (pMVar118 != (MIR_insn_t)0x0) {
            if (pMVar118 != pMVar83) {
LAB_0014f368:
              pMStack_4a0 = (MIR_context_t)0x14f387;
              __assert_fail("ret_insn == insn",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x63a,"void build_func_cfg(gen_ctx_t)");
            }
            goto LAB_00145650;
          }
          pVVar84 = pMVar15->global_vars;
          if (pVVar84 == (VARR_MIR_var_t *)0x0) goto LAB_00145650;
          pVVar123 = pgVar120->temp_ops;
          if ((pVVar123 == (VARR_MIR_op_t *)0x0) || (pVVar123->varr == (MIR_op_t *)0x0)) {
            pMStack_4a0 = (MIR_context_t)0x14f44a;
            generate_func_code_cold_6();
LAB_0014f44a:
            pMStack_4a0 = (MIR_context_t)0x14f44f;
            generate_func_code_cold_51();
LAB_0014f44f:
            pMStack_4a0 = (MIR_context_t)0x14f46e;
            __assert_fail("res",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0xbc1,"void transform_addrs(gen_ctx_t)");
          }
          lVar207 = 8;
          uVar241 = 0xffffffffffffffff;
          pVVar123->els_num = 0;
          while( true ) {
            uVar241 = uVar241 + 1;
            if (pVVar84->els_num <= uVar241) break;
            if (pVVar84->varr == (MIR_var_t *)0x0) goto LAB_0014f08e;
            pMStack_4a0 = (MIR_context_t)0x14557c;
            MVar69 = MIR_reg(pMVar14,*(char **)((long)&pVVar84->varr->type + lVar207),pMVar15);
            pVVar123 = pgVar120->temp_ops;
            pMStack_4a0 = (MIR_context_t)0x14559e;
            _MIR_new_var_op(pMVar14,MVar69 + 0x21);
            apMStack_200[1] = (MIR_insn_t_conflict)local_338._32_8_;
            apMStack_200[2] = (MIR_insn_t_conflict)local_338._40_8_;
            local_218.tv_sec._0_4_ = local_338._0_4_;
            local_218.tv_sec._4_4_ = local_338._4_4_;
            local_218.tv_usec._0_4_ = (undefined4)local_338._8_8_;
            local_218.tv_usec._4_4_ = SUB84(local_338._8_8_,4);
            pMStack_208 = (MIR_insn_t)local_338._16_8_;
            apMStack_200[0] = (MIR_insn_t_conflict)local_338._24_8_;
            pMVar124 = pVVar123->varr;
            if (pMVar124 == (MIR_op_t *)0x0) goto LAB_0014f07e;
            sVar233 = pVVar123->els_num;
            uVar234 = sVar233 + 1;
            if (pVVar123->size < uVar234) {
              sVar233 = (uVar234 >> 1) + uVar234;
              pMStack_4a0 = (MIR_context_t)0x1455fb;
              pMVar124 = (MIR_op_t *)realloc(pMVar124,sVar233 * 0x30);
              pVVar123->varr = pMVar124;
              pVVar123->size = sVar233;
              sVar233 = pVVar123->els_num;
              uVar234 = sVar233 + 1;
            }
            pVVar123->els_num = uVar234;
            lVar207 = lVar207 + 0x18;
            auVar6._4_4_ = local_218.tv_sec._4_4_;
            auVar6._0_4_ = (uint)local_218.tv_sec;
            auVar6._8_4_ = (undefined4)local_218.tv_usec;
            auVar6._12_4_ = local_218.tv_usec._4_4_;
            auVar6._16_8_ = pMStack_208;
            auVar6._24_8_ = apMStack_200[0];
            auVar260 = ZEXT3264(auVar6);
            aVar59.str.s = (char *)apMStack_200[0];
            aVar59.i = (int64_t)pMStack_208;
            aVar59._16_8_ = apMStack_200[1];
            aVar59.mem.disp = (MIR_disp_t)apMStack_200[2];
            in_ZMM1 = ZEXT3264((undefined1  [32])aVar59);
            pMVar124[sVar233].u = aVar59;
            *(undefined1 (*) [32])(pMVar124 + sVar233) = auVar6;
            pVVar84 = pMVar15->global_vars;
            if (pVVar84 == (VARR_MIR_var_t *)0x0) goto LAB_0014f086;
          }
          pVVar123 = pgVar120->temp_ops;
          if (pVVar123 == (VARR_MIR_op_t *)0x0) goto LAB_0014f53d;
          auVar260 = ZEXT1664(auVar260._0_16_);
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          pMStack_4a0 = (MIR_context_t)0x1458a8;
          pMVar88 = MIR_new_insn_arr(pMVar14,MIR_USE,pVVar123->els_num,pVVar123->varr);
          pMStack_4a0 = (MIR_context_t)0x1458c4;
          MIR_insert_insn_before(pMVar14,*local_360,pMVar83,pMVar88);
          pMVar118 = pMVar83;
        }
        else {
          pgVar120->addr_insn_p = 1;
          pVVar92 = pgVar120->addr_regs;
          uVar70 = *(int *)&pMVar83[1].insn_link.next + 0x21;
          pMStack_4a0 = (MIR_context_t)0x1454bc;
          bitmap_expand(pVVar92,(ulong)uVar70 + 1);
          if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f1c0;
          pVVar92->varr[uVar70 >> 6] = pVVar92->varr[uVar70 >> 6] | 1L << ((ulong)uVar70 & 0x3f);
LAB_00145650:
          if (pMVar83->data == (void *)0x0) {
            if (pgVar120->optimize_level == 0) {
              uVar70 = *(int *)&pMVar83->field_0x18 - 0xa7;
              if ((uVar70 < 0xe) && ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)) {
                pMStack_4a0 = (MIR_context_t)0x1456b9;
                puVar113 = (undefined8 *)gen_malloc(pgVar120,0x10);
                pMVar83->data = puVar113;
                *puVar113 = local_3f0;
                puVar113[1] = 0;
              }
              else {
                pMVar83->data = local_3f0;
              }
            }
            else {
              pMStack_4a0 = (MIR_context_t)0x145678;
              pbVar85 = create_bb_insn(pgVar120,pMVar83,local_3f0);
              pMStack_4a0 = (MIR_context_t)0x145684;
              DLIST_bb_insn_t_append(&local_3f0->bb_insns,pbVar85);
            }
          }
          if (*(int *)&pMVar83->field_0x18 == 0xa6) {
            pVVar125 = pgVar120->temp_insns;
            ppMVar86 = pVVar125->varr;
            if (ppMVar86 == (MIR_insn_t_conflict *)0x0) {
LAB_0014f227:
              pMStack_4a0 = (MIR_context_t)0x14f22c;
              generate_func_code_cold_7();
              goto LAB_0014f22c;
            }
            sVar233 = pVVar125->els_num;
            uVar241 = sVar233 + 1;
            if (pVVar125->size < uVar241) {
              sVar233 = (uVar241 >> 1) + uVar241;
              pMStack_4a0 = (MIR_context_t)0x14578f;
              ppMVar86 = (MIR_insn_t_conflict *)realloc(ppMVar86,sVar233 * 8);
              pVVar125->varr = ppMVar86;
              pVVar125->size = sVar233;
              sVar233 = pVVar125->els_num;
              uVar241 = sVar233 + 1;
            }
            pVVar125->els_num = uVar241;
            ppMVar86[sVar233] = pMVar83;
          }
          else if (*(int *)&pMVar83->field_0x18 == 0xa5) {
            if (*(char *)&pMVar83[1].insn_link.prev != '\f') {
LAB_0014f203:
              pMStack_4a0 = (MIR_context_t)0x14f222;
              __assert_fail("insn->ops[1].mode == MIR_OP_LABEL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x6f6,"void build_func_cfg(gen_ctx_t)");
            }
            pVVar125 = pgVar120->temp_insns2;
            ppMVar86 = pVVar125->varr;
            if (ppMVar86 == (MIR_insn_t_conflict *)0x0) {
              pMStack_4a0 = (MIR_context_t)0x14f227;
              generate_func_code_cold_8();
              goto LAB_0014f227;
            }
            sVar233 = pVVar125->els_num;
            pMVar98 = pMVar83[1].insn_link.next;
            uVar241 = sVar233 + 1;
            if (pVVar125->size < uVar241) {
              sVar233 = (uVar241 >> 1) + uVar241;
              pMStack_4a0 = (MIR_context_t)0x145735;
              ppMVar86 = (MIR_insn_t_conflict *)realloc(ppMVar86,sVar233 * 8);
              pVVar125->varr = ppMVar86;
              pVVar125->size = sVar233;
              sVar233 = pVVar125->els_num;
              uVar241 = sVar233 + 1;
            }
            pVVar125->els_num = uVar241;
            ppMVar86[sVar233] = pMVar98;
          }
          pMStack_4a0 = (MIR_context_t)0x1457b0;
          sVar233 = MIR_insn_nops(pMVar14,pMVar83);
          pbVar87 = local_3f0;
          if ((pMVar88 != (MIR_insn_t)0x0) &&
             ((iVar71 = (int)*(undefined8 *)&pMVar83->field_0x18, 0xffffffd0 < iVar71 - 0xa5U ||
              (((uVar70 = iVar71 - 0xa6, uVar70 < 0x13 && ((0x60071U >> (uVar70 & 0x1f) & 1) != 0))
               || (*(int *)&pMVar88->field_0x18 == 0xb4)))))) {
            if ((*(int *)&pMVar88->field_0x18 == 0xb4) &&
               (puVar113 = (undefined8 *)pMVar88->data, puVar113 != (undefined8 *)0x0)) {
              puVar197 = puVar113 + 6;
              if (pgVar120->optimize_level == 0) {
                puVar197 = puVar113;
              }
              pbVar87 = (bb_t_conflict)*puVar197;
            }
            else {
              pMStack_4a0 = (MIR_context_t)0x145827;
              pbVar87 = create_bb(pgVar120,pMVar88);
            }
            pMStack_4a0 = (MIR_context_t)0x145835;
            add_new_bb(pgVar120,pbVar87);
            uVar70 = *(int *)&pMVar83->field_0x18 - 0x76;
            if ((0x36 < uVar70) || ((0x71000000000001U >> ((ulong)uVar70 & 0x3f) & 1) == 0)) {
              pMStack_4a0 = (MIR_context_t)0x145877;
              create_edge(pgVar120,local_3f0,pbVar87,1,1);
            }
          }
          local_3f0 = pbVar87;
          if (sVar233 != 0) {
            puVar237 = (ushort *)&pMVar83->ops[0].field_0x8;
            do {
              uVar68 = *puVar237;
              if ((char)uVar68 == '\n') {
                uVar68 = uVar68 | 0xb;
                auVar255 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
                *puVar237 = uVar68;
                uVar241 = *(ulong *)(puVar237 + 0xc);
                auVar260 = ZEXT864(uVar241);
                auVar256._8_8_ = 0;
                auVar256._0_8_ = uVar241;
                uVar234 = vptestmd_avx512vl(auVar256,auVar256);
                uVar234 = uVar234 & 0xf;
                auVar29._8_4_ = 0x21;
                auVar29._0_8_ = 0x2100000021;
                auVar29._12_4_ = 0x21;
                auVar257._8_8_ = 0;
                auVar257._0_8_ = uVar241;
                auVar253 = vpaddd_avx512vl(auVar257,auVar29);
                bVar250 = (bool)((byte)uVar234 & 1);
                bVar196 = (bool)((byte)(uVar234 >> 1) & 1);
                uVar214 = CONCAT44((uint)bVar196 * auVar253._4_4_ | (uint)!bVar196 * auVar255._4_4_,
                                   (uint)bVar250 * auVar253._0_4_ | (uint)!bVar250 * auVar255._0_4_)
                ;
                bVar250 = (bool)((byte)(uVar234 >> 2) & 1);
                bVar196 = SUB81(uVar234 >> 3,0);
                in_ZMM1 = ZEXT1664(CONCAT412((uint)bVar196 * auVar253._12_4_ |
                                             (uint)!bVar196 * auVar255._12_4_,
                                             CONCAT48((uint)bVar250 * auVar253._8_4_ |
                                                      (uint)!bVar250 * auVar255._8_4_,uVar214)));
                *(undefined8 *)(puVar237 + 0xc) = uVar214;
              }
              else if ((char)uVar68 == '\x01') {
                uVar68 = uVar68 & 0xff00 | 2;
                *puVar237 = uVar68;
                *(uint *)(puVar237 + 4) =
                     -(uint)(*(int *)(puVar237 + 4) == 0) | *(int *)(puVar237 + 4) + 0x21U;
              }
              cVar66 = (char)uVar68;
              if (cVar66 == '\x02') {
                uVar70 = *(uint *)(puVar237 + 4);
                if (uVar70 == 0xffffffff) {
                  uVar70 = 0xffffffff;
                }
                else if (pgVar120->curr_cfg->max_var < uVar70) {
                  pgVar120->curr_cfg->max_var = uVar70;
                  uVar70 = *(MIR_reg_t *)(puVar237 + 4);
                }
LAB_00145a58:
                pMStack_4a0 = (MIR_context_t)0x145a5d;
                update_tied_regs(pgVar120,uVar70);
              }
              else {
                if (cVar66 == '\v') {
                  uVar70 = *(uint *)(puVar237 + 0xc);
                  MVar69 = 0xffffffff;
                  if ((uVar70 != 0xffffffff) &&
                     (MVar69 = uVar70, pgVar120->curr_cfg->max_var < uVar70)) {
                    pgVar120->curr_cfg->max_var = uVar70;
                    MVar69 = *(MIR_reg_t *)(puVar237 + 0xc);
                  }
                  pMStack_4a0 = (MIR_context_t)0x145a2b;
                  update_tied_regs(pgVar120,MVar69);
                  uVar73 = *(uint *)(puVar237 + 0xe);
                  uVar70 = 0xffffffff;
                  if ((uVar73 != 0xffffffff) &&
                     (uVar70 = uVar73, pgVar120->curr_cfg->max_var < uVar73)) {
                    pgVar120->curr_cfg->max_var = uVar73;
                    uVar70 = *(MIR_reg_t *)(puVar237 + 0xe);
                  }
                  goto LAB_00145a58;
                }
                if (cVar66 == '\f') {
                  if ((*(MIR_insn_t *)(puVar237 + 4))->data == (void *)0x0) {
                    pMStack_4a0 = (MIR_context_t)0x14597e;
                    create_bb(pgVar120,*(MIR_insn_t *)(puVar237 + 4));
                  }
                  if (*(int *)&pMVar83->field_0x18 != 0xa5) {
                    plVar198 = *(long **)(puVar237 + 4);
                    if (pgVar120->optimize_level == 0) {
                      uVar70 = (int)plVar198[3] - 0xa7;
                      if ((uVar70 < 0xe) && ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)) {
                        plVar198 = (long *)*plVar198;
                      }
                      pbVar87 = (bb_t_conflict)*plVar198;
                      uVar70 = *(int *)&pMVar83->field_0x18 - 0xa7;
                      pMVar89 = pMVar83;
                      if ((uVar70 < 0xe) && ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)) {
                        pMVar89 = (MIR_insn_t)pMVar83->data;
                      }
                    }
                    else {
                      pbVar87 = *(bb_t_conflict *)(*plVar198 + 0x30);
                      pMVar89 = (MIR_insn_t)((long)pMVar83->data + 0x30);
                    }
                    pMStack_4a0 = (MIR_context_t)0x145abb;
                    create_edge(pgVar120,(bb_t_conflict)pMVar89->data,pbVar87,0,1);
                  }
                }
              }
              puVar237 = puVar237 + 0x18;
              sVar233 = sVar233 - 1;
            } while (sVar233 != 0);
          }
        }
        pMVar83 = pMVar88;
      } while (pMVar83 != (MIR_insn_t)0x0);
    }
    for (pMVar238 = pMVar15->first_lref; pMVar238 != (MIR_lref_data *)0x0; pMVar238 = pMVar238->next
        ) {
      pVVar125 = pgVar120->temp_insns2;
      ppMVar86 = pVVar125->varr;
      if (ppMVar86 == (MIR_insn_t_conflict *)0x0) goto LAB_0014f0f7;
      sVar233 = pVVar125->els_num;
      pMVar83 = pMVar238->label;
      uVar241 = sVar233 + 1;
      if (pVVar125->size < uVar241) {
        sVar233 = (uVar241 >> 1) + uVar241;
        pMStack_4a0 = (MIR_context_t)0x145b64;
        ppMVar86 = (MIR_insn_t_conflict *)realloc(ppMVar86,sVar233 * 8);
        pVVar125->varr = ppMVar86;
        pVVar125->size = sVar233;
        sVar233 = pVVar125->els_num;
        uVar241 = sVar233 + 1;
      }
      pVVar125->els_num = uVar241;
      ppMVar86[sVar233] = pMVar83;
      pMVar83 = pMVar238->label2;
      if (pMVar83 != (MIR_insn_t_conflict)0x0) {
        pVVar125 = pgVar120->temp_insns2;
        ppMVar86 = pVVar125->varr;
        if (ppMVar86 == (MIR_insn_t_conflict *)0x0) goto LAB_0014f179;
        sVar233 = pVVar125->els_num;
        uVar241 = sVar233 + 1;
        if (pVVar125->size < uVar241) {
          sVar233 = (uVar241 >> 1) + uVar241;
          pMStack_4a0 = (MIR_context_t)0x145bbd;
          ppMVar86 = (MIR_insn_t_conflict *)realloc(ppMVar86,sVar233 * 8);
          pVVar125->varr = ppMVar86;
          pVVar125->size = sVar233;
          sVar233 = pVVar125->els_num;
          uVar241 = sVar233 + 1;
        }
        pVVar125->els_num = uVar241;
        ppMVar86[sVar233] = pMVar83;
      }
    }
    pVVar125 = pgVar120->temp_insns2;
    if (pVVar125 == (VARR_MIR_insn_t *)0x0) goto LAB_0014f568;
    pMStack_4a0 = (MIR_context_t)0x145c08;
    qsort(pVVar125->varr,pVVar125->els_num,8,label_cmp);
    pVVar125 = pgVar120->temp_insns;
    if (pVVar125 != (VARR_MIR_insn_t *)0x0) {
      uVar241 = 0;
      do {
        if (pVVar125->els_num <= uVar241) goto LAB_00145cea;
        if (pVVar125->varr == (MIR_insn_t_conflict *)0x0) goto LAB_0014f0c4;
        pMVar83 = pVVar125->varr[uVar241];
        if (*(int *)&pMVar83->field_0x18 != 0xa6) goto LAB_0014f0c9;
        if (pgVar120->optimize_level != 0) {
          pMVar83 = (MIR_insn_t_conflict)((long)pMVar83->data + 0x30);
        }
        pVVar125 = pgVar120->temp_insns2;
        if (pVVar125 == (VARR_MIR_insn_t *)0x0) {
LAB_0014aaa2:
          pMStack_4a0 = (MIR_context_t)0x14aaa7;
          generate_func_code_cold_176();
LAB_0014aaa7:
          pMStack_4a0 = (MIR_context_t)0x14aaac;
          generate_func_code_cold_175();
LAB_0014aaac:
          pMStack_4a0 = (MIR_context_t)0x14aacb;
          __assert_fail("insn2->code == MIR_LABEL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x733,"void build_func_cfg(gen_ctx_t)");
        }
        pbVar87 = (bb_t_conflict)pMVar83->data;
        pMVar83 = (MIR_insn_t_conflict)0x0;
        uVar234 = 0;
        while (uVar234 < pVVar125->els_num) {
          if (pVVar125->varr == (MIR_insn_t_conflict *)0x0) goto LAB_0014aaa7;
          pMVar98 = pVVar125->varr[uVar234];
          if (pMVar98 != pMVar83) {
            if (*(int *)&pMVar98->field_0x18 != 0xb4) goto LAB_0014aaac;
            lVar207 = 0x30;
            if (pgVar120->optimize_level == 0) {
              lVar207 = 0;
            }
            pMStack_4a0 = (MIR_context_t)0x145cbb;
            create_edge(pgVar120,pbVar87,*(bb_t_conflict *)((long)pMVar98->data + lVar207),0,1);
            pVVar125 = pgVar120->temp_insns2;
            pMVar83 = pMVar98;
          }
          uVar234 = uVar234 + 1;
          if (pVVar125 == (VARR_MIR_insn_t *)0x0) goto LAB_0014aaa2;
        }
        pVVar125 = pgVar120->temp_insns;
        uVar241 = uVar241 + 1;
      } while (pVVar125 != (VARR_MIR_insn_t *)0x0);
    }
    pMStack_4a0 = (MIR_context_t)0x145cea;
    generate_func_code_cold_178();
LAB_00145cea:
    pVVar125 = pgVar120->temp_insns2;
    if (pVVar125 != (VARR_MIR_insn_t *)0x0) {
      sVar233 = pVVar125->els_num;
      if (sVar233 != 0) {
        ppMVar86 = pVVar125->varr;
        if (ppMVar86 != (MIR_insn_t_conflict *)0x0) {
          sVar220 = 0;
          do {
            pMVar83 = ppMVar86[sVar220];
            if (*(int *)&pMVar83->field_0x18 != 0xb4) goto LAB_0014f0fc;
            uVar70 = pgVar120->optimize_level;
            lVar207 = 0x30;
            if (uVar70 == 0) {
              lVar207 = 0;
            }
            sVar220 = sVar220 + 1;
            *(undefined1 *)(*(long *)((long)pMVar83->data + lVar207) + 0x62) = 1;
          } while (sVar233 != sVar220);
          goto LAB_00145d5d;
        }
LAB_0014f5f9:
        pMStack_4a0 = (MIR_context_t)0x14f5fe;
        generate_func_code_cold_11();
LAB_0014f5fe:
        pMStack_4a0 = (MIR_context_t)0x14f603;
        generate_func_code_cold_115();
LAB_0014f603:
        pMStack_4a0 = (MIR_context_t)0x14f608;
        generate_func_code_cold_114();
LAB_0014f608:
        pMStack_4a0 = (MIR_context_t)0x14f60d;
        generate_func_code_cold_113();
LAB_0014f60d:
        pMStack_4a0 = (MIR_context_t)0x14f612;
        generate_func_code_cold_112();
LAB_0014f612:
        pMStack_4a0 = (MIR_context_t)0x14f631;
        __assert_fail("gen_ctx->optimize_level > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x2317,"void combine(gen_ctx_t, int)");
      }
      uVar70 = pgVar120->optimize_level;
LAB_00145d5d:
      if (uVar70 != 0) {
        pMStack_4a0 = (MIR_context_t)0x145d69;
        remove_unreachable_bbs(pgVar120);
      }
      pbVar87 = (pgVar120->curr_cfg->bbs).head;
      if (pbVar87 == (bb_t_conflict)0x0) {
        pgVar211 = (gen_ctx_t)0x0;
      }
      else {
        do {
          if ((pbVar87 != pbVar81) && ((pbVar87->in_edges).head == (in_edge_t_conflict)0x0)) {
            pMStack_4a0 = (MIR_context_t)0x145d9b;
            create_edge(pgVar120,pbVar81,pbVar87,0,1);
          }
          if ((pbVar87 != pbVar82) && ((pbVar87->out_edges).head == (out_edge_t)0x0)) {
            pMStack_4a0 = (MIR_context_t)0x145dbd;
            create_edge(pgVar120,pbVar87,pbVar82,0,1);
          }
          pbVar87 = (pbVar87->bb_link).next;
        } while (pbVar87 != (bb_t)0x0);
        pgVar211 = (gen_ctx_t)(pgVar120->curr_cfg->bbs).head;
      }
      pMStack_4a0 = (MIR_context_t)0x145dda;
      enumerate_bbs(pgVar211);
      pfVar80 = pgVar120->curr_cfg;
      pMStack_4a0 = (MIR_context_t)0x145deb;
      pVVar90 = (VARR_reg_info_t *)malloc(0x18);
      pfVar80->reg_info = pVVar90;
      pVVar90->els_num = 0;
      pVVar90->size = 0x80;
      pMStack_4a0 = (MIR_context_t)0x145e0a;
      prVar91 = (reg_info_t *)malloc(0x800);
      pVVar90->varr = prVar91;
      pfVar80 = pgVar120->curr_cfg;
      uVar241 = (ulong)pfVar80->max_var;
      pMStack_4a0 = (MIR_context_t)0x145e2b;
      pVVar92 = (bitmap_t)malloc(0x18);
      pVVar92->els_num = 0;
      sVar233 = 0x40;
      if (uVar241 != 0) {
        sVar233 = uVar241 + 0x3f >> 6;
      }
      pVVar92->size = sVar233;
      pMStack_4a0 = (MIR_context_t)0x145e49;
      pbVar93 = (bitmap_el_t *)malloc((ulong)(uint)((int)sVar233 << 3));
      pVVar92->varr = pbVar93;
      pfVar80->call_crossed_regs = pVVar92;
      if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
        pMStack_4a0 = (MIR_context_t)0x145e76;
        fwrite("+++++++++++++MIR after building CFG:\n",0x25,1,(FILE *)pgVar120->debug_file);
        pMStack_4a0 = (MIR_context_t)0x145e90;
        print_CFG(pgVar120,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      auVar255 = auVar260._0_16_;
      if (1 < pgVar120->optimize_level) {
        uVar70 = 0;
        if (pgVar120->addr_insn_p == 0) {
          pMStack_4a0 = (MIR_context_t)0x145eaa;
          iVar71 = clone_bbs(pgVar120);
          if (((iVar71 != 0) && ((FILE *)pgVar120->debug_file != (FILE *)0x0)) &&
             (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x145ed3;
            fwrite("+++++++++++++MIR after cloning BBs:\n",0x24,1,(FILE *)pgVar120->debug_file);
            pMStack_4a0 = (MIR_context_t)0x145eed;
            print_CFG(pgVar120,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
          }
          auVar255 = auVar260._0_16_;
          if (pgVar120->optimize_level < 2) goto LAB_0014afda;
          uVar70 = (uint)(pgVar120->addr_insn_p == 0);
        }
        pMStack_4a0 = (MIR_context_t)0x145f09;
        build_ssa(pgVar120,uVar70);
        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
          pcVar79 = " for address transformation";
          if (pgVar120->addr_insn_p == 0) {
            pcVar79 = "";
          }
          pMStack_4a0 = (MIR_context_t)0x145f44;
          fprintf((FILE *)pgVar120->debug_file,"+++++++++++++MIR after building SSA%s:\n",pcVar79);
          pMStack_4a0 = (MIR_context_t)0x145f5e;
          print_varr_insns(pgVar120,"undef init",pgVar120->ssa_ctx->undef_insns);
          pMStack_4a0 = (MIR_context_t)0x145f77;
          print_varr_insns(pgVar120,"arg init",pgVar120->ssa_ctx->arg_bb_insns);
          pMStack_4a0 = (MIR_context_t)0x145f85;
          fputc(10,(FILE *)pgVar120->debug_file);
          pMStack_4a0 = (MIR_context_t)0x145fa2;
          print_CFG(pgVar120,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
        auVar255 = auVar260._0_16_;
        if (pgVar120->optimize_level < 2) goto LAB_0014afda;
        pFVar112 = (FILE *)pgVar120->debug_file;
        if (pgVar120->addr_insn_p == 0) {
LAB_00146cb4:
          if ((pFVar112 == (FILE *)0x0) || (pgVar120->debug_level < 2)) {
            local_400 = pgVar120->ctx;
          }
          else {
            pMStack_4a0 = (MIR_context_t)0x146cd5;
            fwrite("+++++++++++++GVN:\n",0x12,1,pFVar112);
            local_400 = pgVar120->ctx;
            if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
              pMStack_4a0 = (MIR_context_t)0x146d06;
              fwrite("Calculate memory availability:\n",0x1f,1,(FILE *)pgVar120->debug_file);
            }
          }
          pVVar154 = pgVar120->gvn_ctx->mem_exprs;
          if (pVVar154 == (VARR_mem_expr_t *)0x0) {
            pMStack_4a0 = (MIR_context_t)0x14f7c6;
            generate_func_code_cold_173();
LAB_0014f7c6:
            pMStack_4a0 = (MIR_context_t)0x14f7e5;
            __assert_fail("(VARR_mem_expr_tlength (gen_ctx->gvn_ctx->mem_exprs)) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0xdba,"void calculate_memory_availability(gen_ctx_t)");
          }
          if (pVVar154->els_num != 0) goto LAB_0014f7c6;
          pbVar81 = (pgVar120->curr_cfg->bbs).head;
          if (pbVar81 != (bb_t_conflict)0x0) {
            do {
              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                pMStack_4a0 = (MIR_context_t)0x146d66;
                fprintf((FILE *)pgVar120->debug_file,"  BB%lu:\n",pbVar81->index);
              }
              pVVar92 = pbVar81->gen;
              if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0))
              goto LAB_0014f22c;
              pVVar92->els_num = 0;
              for (pbVar201 = (pbVar81->bb_insns).head; pbVar201 != (bb_insn_t_conflict)0x0;
                  pbVar201 = (pbVar201->bb_insn_link).next) {
                pMVar83 = pbVar201->insn;
                if (*(uint *)&pMVar83->field_0x18 - 0xaa < 0xfffffffd) {
                  if ((*(uint *)&pMVar83->field_0x18 < 4) &&
                     ((pMVar83->ops[0].field_0x8 == '\v' ||
                      (*(char *)&pMVar83[1].insn_link.prev == '\v')))) {
                    pVVar154 = pgVar120->gvn_ctx->mem_exprs;
                    if (pVVar154 == (VARR_mem_expr_t *)0x0) goto LAB_0014f1b6;
                    sVar233 = pVVar154->els_num;
                    uVar231 = (uint32_t)sVar233;
                    pbVar201->mem_index = uVar231;
                    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)
                       ) {
                      pMStack_4a0 = (MIR_context_t)0x146e04;
                      fprintf((FILE *)pgVar120->debug_file,"     Adding mem insn %-5llu:",sVar233);
                      pMStack_4a0 = (MIR_context_t)0x146e26;
                      MIR_output_insn(local_400,pgVar120->debug_file,pMVar83,
                                      (pgVar120->curr_func_item->u).func,1);
                    }
                    pMStack_4a0 = (MIR_context_t)0x146e33;
                    pmVar95 = (mem_expr_t)gen_malloc(pgVar120,0x18);
                    pmVar95->insn = pbVar201->insn;
                    pmVar95->temp_reg = 0xffffffff;
                    pmVar95->mem_num = uVar231;
                    pmVar95->next = (mem_expr *)0x0;
                    pVVar154 = pgVar120->gvn_ctx->mem_exprs;
                    ppmVar96 = pVVar154->varr;
                    if (ppmVar96 == (mem_expr_t *)0x0) goto LAB_0014f1bb;
                    sVar233 = pVVar154->els_num;
                    uVar241 = sVar233 + 1;
                    if (pVVar154->size < uVar241) {
                      sVar233 = (uVar241 >> 1) + uVar241;
                      pMStack_4a0 = (MIR_context_t)0x146e92;
                      ppmVar96 = (mem_expr_t *)realloc(ppmVar96,sVar233 * 8);
                      pVVar154->varr = ppmVar96;
                      pVVar154->size = sVar233;
                      sVar233 = pVVar154->els_num;
                      uVar241 = sVar233 + 1;
                    }
                    pVVar154->els_num = uVar241;
                    ppmVar96[sVar233] = pmVar95;
                    if ((pMVar83->ops[0].field_0x8 == '\v') ||
                       (*(char *)&pMVar83[1].insn_link.prev == '\v')) {
                      pMStack_4a0 = (MIR_context_t)0x146ecc;
                      update_mem_availability(pgVar120,pbVar81->gen,pbVar201);
                    }
                  }
                }
                else {
                  pVVar92 = pbVar81->gen;
                  if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0))
                  goto LAB_0014f046;
                  pVVar92->els_num = 0;
                }
              }
              if ((pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                pMStack_4a0 = (MIR_context_t)0x146f23;
                output_bitmap(pgVar120,"   Mem availabilty gen:",pbVar81->gen,0,(MIR_reg_t *)0x0);
              }
              pbVar81 = (pbVar81->bb_link).next;
            } while (pbVar81 != (bb_t)0x0);
            pbVar81 = (pgVar120->curr_cfg->bbs).head;
            if (pbVar81 != (bb_t_conflict)0x0) {
              do {
                pVVar154 = pgVar120->gvn_ctx->mem_exprs;
                if (pVVar154 == (VARR_mem_expr_t *)0x0) goto LAB_0014f4d4;
                pVVar92 = pbVar81->out;
                sVar233 = pVVar154->els_num;
                pMStack_4a0 = (MIR_context_t)0x146f74;
                bitmap_expand(pVVar92,sVar233);
                if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f4d9;
                if (sVar233 != 0) {
                  pbVar93 = pVVar92->varr;
                  uVar241 = 0;
                  do {
                    uVar234 = (ulong)((uint)uVar241 & 0x3f);
                    lVar207 = 0x40 - (ulong)((int)sVar233 + (uint)uVar241 & 0x3f);
                    if (0x40 - uVar234 <= sVar233) {
                      lVar207 = 0;
                    }
                    pbVar93[uVar241 >> 6] =
                         pbVar93[uVar241 >> 6] |
                         (0xffffffffffffffffU >> (lVar207 + uVar234 & 0x3f)) << uVar234;
                    lVar207 = 0x40 - (lVar207 + uVar234);
                    uVar241 = uVar241 + lVar207;
                    sVar233 = sVar233 - lVar207;
                  } while (sVar233 != 0);
                }
                pbVar81 = (pbVar81->bb_link).next;
              } while (pbVar81 != (bb_t)0x0);
            }
          }
          pMStack_4a0 = (MIR_context_t)0x147004;
          solve_dataflow(pgVar120,1,mem_av_con_func_0,mem_av_con_func_n,mem_av_trans_func);
          if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x147031;
            fwrite("BB mem availability in/out:\n",0x1c,1,(FILE *)pgVar120->debug_file);
            for (pbVar81 = (pgVar120->curr_cfg->bbs).head; pbVar81 != (bb_t_conflict)0x0;
                pbVar81 = (pbVar81->bb_link).next) {
              pMStack_4a0 = (MIR_context_t)0x147068;
              fprintf((FILE *)pgVar120->debug_file,"  BB%lu:\n",pbVar81->index);
              pMStack_4a0 = (MIR_context_t)0x14707d;
              output_bitmap(pgVar120,"    mem av in:",pbVar81->in,0,(MIR_reg_t *)0x0);
              pMStack_4a0 = (MIR_context_t)0x147092;
              output_bitmap(pgVar120,"    mem av out:",pbVar81->out,0,(MIR_reg_t *)0x0);
            }
          }
          pbVar81 = (pgVar120->curr_cfg->bbs).head;
          pVVar92 = pbVar81->dom_out;
          if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0)) {
            pMStack_4a0 = (MIR_context_t)0x14f760;
            generate_func_code_cold_172();
          }
          else {
            pVVar92->els_num = 0;
            pbVar99 = (pbVar81->bb_link).next;
            if (pbVar99 != (bb_t)0x0) {
              do {
                pVVar92 = pbVar99->dom_out;
                uVar241 = (ulong)pgVar120->curr_bb_index;
                pMStack_4a0 = (MIR_context_t)0x1470f8;
                bitmap_expand(pVVar92,uVar241);
                if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f394;
                if (uVar241 != 0) {
                  pbVar93 = pVVar92->varr;
                  uVar234 = 0;
                  do {
                    uVar215 = (ulong)((uint)uVar234 & 0x3f);
                    lVar207 = 0x40 - (ulong)((int)uVar241 + (uint)uVar234 & 0x3f);
                    if (0x40 - uVar215 <= uVar241) {
                      lVar207 = 0;
                    }
                    pbVar93[uVar234 >> 6] =
                         pbVar93[uVar234 >> 6] |
                         (0xffffffffffffffffU >> (lVar207 + uVar215 & 0x3f)) << uVar215;
                    lVar207 = 0x40 - (lVar207 + uVar215);
                    uVar234 = uVar234 + lVar207;
                    uVar241 = uVar241 - lVar207;
                  } while (uVar241 != 0);
                }
                pbVar99 = (pbVar99->bb_link).next;
              } while (pbVar99 != (bb_t)0x0);
            }
            pMStack_4a0 = (MIR_context_t)0x147188;
            solve_dataflow(pgVar120,1,dom_con_func_0,dom_con_func_n,dom_trans_func);
            pVVar136 = pgVar120->data_flow_ctx->worklist;
            if ((pVVar136 != (VARR_bb_t *)0x0) &&
               (ppbVar97 = pVVar136->varr, ppbVar97 != (bb_t_conflict *)0x0)) {
              pVVar136->els_num = 0;
              pbVar81 = (pgVar120->curr_cfg->bbs).head;
              if (pbVar81 == (bb_t_conflict)0x0) {
                sVar233 = 0;
              }
              else {
                do {
                  pVVar136 = pgVar120->data_flow_ctx->worklist;
                  ppbVar97 = pVVar136->varr;
                  if (ppbVar97 == (bb_t_conflict *)0x0) goto LAB_0014f399;
                  sVar233 = pVVar136->els_num;
                  uVar241 = sVar233 + 1;
                  if (pVVar136->size < uVar241) {
                    sVar233 = (uVar241 >> 1) + uVar241;
                    pMStack_4a0 = (MIR_context_t)0x1471fc;
                    ppbVar97 = (bb_t_conflict *)realloc(ppbVar97,sVar233 * 8);
                    pVVar136->varr = ppbVar97;
                    pVVar136->size = sVar233;
                    sVar233 = pVVar136->els_num;
                    uVar241 = sVar233 + 1;
                  }
                  pVVar136->els_num = uVar241;
                  ppbVar97[sVar233] = pbVar81;
                  pbVar81 = (pbVar81->bb_link).next;
                } while (pbVar81 != (bb_t)0x0);
                pVVar136 = pgVar120->data_flow_ctx->worklist;
                if (pVVar136 == (VARR_bb_t *)0x0) {
LAB_0014f80e:
                  pMStack_4a0 = (MIR_context_t)0x14f813;
                  generate_func_code_cold_32();
LAB_0014f813:
                  pMStack_4a0 = (MIR_context_t)0x14f818;
                  generate_func_code_cold_92();
LAB_0014f818:
                  pMStack_4a0 = (MIR_context_t)0x14f820;
                  generate_func_code_cold_45();
LAB_0014f820:
                  pMStack_4a0 = (MIR_context_t)0x14f825;
                  generate_func_code_cold_44();
LAB_0014f825:
                  pMStack_4a0 = (MIR_context_t)0x14f82a;
                  generate_func_code_cold_22();
LAB_0014f82a:
                  pMStack_4a0 = (MIR_context_t)0x14f82f;
                  generate_func_code_cold_81();
LAB_0014f82f:
                  pMStack_4a0 = (MIR_context_t)0x14f84e;
                  __assert_fail("use_op_ref->mode == MIR_OP_VAR || use_op_ref->mode == MIR_OP_VAR_MEM"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0xcac,"void copy_prop(gen_ctx_t)");
                }
                sVar233 = pVVar136->els_num;
                ppbVar97 = pVVar136->varr;
              }
              pMStack_4a0 = (MIR_context_t)0x14724a;
              qsort(ppbVar97,sVar233,8,post_cmp);
              pMStack_4a0 = (MIR_context_t)0x147252;
              gvn_modify(pgVar120);
              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                pMStack_4a0 = (MIR_context_t)0x147277;
                fwrite("+++++++++++++MIR after GVN:\n",0x1c,1,(FILE *)pgVar120->debug_file);
                pMStack_4a0 = (MIR_context_t)0x147294;
                print_CFG(pgVar120,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
              }
              pMStack_4a0 = (MIR_context_t)0x1472a4;
              HTAB_expr_t_clear(pgVar120->gvn_ctx->expr_tab);
              while( true ) {
                pVVar149 = pgVar120->gvn_ctx->exprs;
                if (pVVar149 == (VARR_expr_t *)0x0) break;
                sVar233 = pVVar149->els_num;
                if (sVar233 == 0) {
                  pMStack_4a0 = (MIR_context_t)0x1472e9;
                  HTAB_mem_expr_t_clear(pgVar120->gvn_ctx->mem_expr_tab);
                  goto LAB_001472e9;
                }
                if (pVVar149->varr == (expr_t *)0x0) goto LAB_0014f39e;
                pVVar149->els_num = sVar233 - 1;
                pMStack_4a0 = (MIR_context_t)0x1472de;
                free(pVVar149->varr[sVar233 - 1]);
              }
              pMStack_4a0 = (MIR_context_t)0x14f38c;
              generate_func_code_cold_170();
LAB_0014f38c:
              pMStack_4a0 = (MIR_context_t)0x14f394;
              generate_func_code_cold_67();
LAB_0014f394:
              pMStack_4a0 = (MIR_context_t)0x14f399;
              generate_func_code_cold_31();
LAB_0014f399:
              pMStack_4a0 = (MIR_context_t)0x14f39e;
              generate_func_code_cold_33();
LAB_0014f39e:
              pMStack_4a0 = (MIR_context_t)0x14f3a3;
              generate_func_code_cold_34();
LAB_0014f3a3:
              pMStack_4a0 = (MIR_context_t)0x14f3c5;
              __assert_fail("bb->in != ((void*)0) && bb->out != ((void*)0) && bb->gen != ((void*)0) && bb->kill != ((void*)0)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x13bd,"void initiate_mem_live_info(gen_ctx_t)");
            }
          }
          pMStack_4a0 = (MIR_context_t)0x14f765;
          generate_func_code_cold_171();
LAB_0014f765:
          pMStack_4a0 = (MIR_context_t)0x14f76a;
          generate_func_code_cold_54();
LAB_0014f76a:
          pMStack_4a0 = (MIR_context_t)0x14f76f;
          generate_func_code_cold_24();
        }
        else {
          if ((pFVar112 != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x145fdb;
            fwrite("+++++++++++++Transform Addr Insns and cloning BBs:\n",0x33,1,pFVar112);
            if (pgVar120->addr_insn_p == 0) goto LAB_0014f876;
          }
          auVar255 = auVar260._0_16_;
          pMVar14 = pgVar120->ctx;
          pVVar92 = pgVar120->addr_regs;
          if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0))
          goto LAB_0014f76a;
          pMVar15 = (pgVar120->curr_func_item->u).func;
          pVVar92->els_num = 0;
          pVVar126 = pgVar120->temp_bb_insns;
          if ((pVVar126 != (VARR_bb_insn_t *)0x0) && (pVVar126->varr != (bb_insn_t_conflict *)0x0))
          {
            pVVar126->els_num = 0;
            pbVar81 = (pgVar120->curr_cfg->bbs).head;
            if (pbVar81 != (bb_t_conflict)0x0) {
              do {
                pbVar201 = (pbVar81->bb_insns).head;
LAB_0014605a:
                auVar255 = auVar260._0_16_;
                if (pbVar201 != (bb_insn_t)0x0) {
                  pMVar118 = pbVar201->insn;
                  if (0xfffffffb < *(int *)&pMVar118->field_0x18 - 0x22U) {
                    pVVar126 = pgVar120->temp_bb_insns;
                    ppbVar94 = pVVar126->varr;
                    if (ppbVar94 != (bb_insn_t_conflict *)0x0) {
                      sVar233 = pVVar126->els_num;
                      uVar241 = sVar233 + 1;
                      if (pVVar126->size < uVar241) {
                        sVar233 = (uVar241 >> 1) + uVar241;
                        pMStack_4a0 = (MIR_context_t)0x1460bf;
                        ppbVar94 = (bb_insn_t_conflict *)realloc(ppbVar94,sVar233 * 8);
                        pVVar126->varr = ppbVar94;
                        pVVar126->size = sVar233;
                        sVar233 = pVVar126->els_num;
                        uVar241 = sVar233 + 1;
                      }
                      pVVar126->els_num = uVar241;
                      ppbVar94[sVar233] = pbVar201;
                      goto LAB_001460d5;
                    }
                    pMStack_4a0 = (MIR_context_t)0x14f0ed;
                    generate_func_code_cold_12();
LAB_0014f0ed:
                    pMStack_4a0 = (MIR_context_t)0x14f0f2;
                    generate_func_code_cold_72();
LAB_0014f0f2:
                    pMStack_4a0 = (MIR_context_t)0x14f0f7;
                    generate_func_code_cold_73();
                    goto LAB_0014f0f7;
                  }
                  pMStack_4a0 = (MIR_context_t)0x146075;
                  iVar71 = move_p(pMVar118);
                  if ((iVar71 == 0) || (pMVar118[1].data != (void *)0x0)) goto LAB_001460d5;
                  goto LAB_0014f141;
                }
                pbVar81 = (pbVar81->bb_link).next;
              } while (pbVar81 != (bb_t)0x0);
              pVVar126 = pgVar120->temp_bb_insns;
              if (pVVar126 == (VARR_bb_insn_t *)0x0) goto LAB_0014f825;
              if (pVVar126->els_num != 0) {
                uVar241 = 0;
                do {
                  if (pVVar126->els_num <= uVar241) goto LAB_001461ac;
                  if (pVVar126->varr == (bb_insn_t_conflict *)0x0) goto LAB_0014f502;
                  pbVar85 = pVVar126->varr[uVar241];
                  pMVar118 = pbVar85->insn;
                  if (((*(int *)&pMVar118->field_0x18 - 0x22U < 0xfffffffc) ||
                      (pMVar118->ops[0].field_0x8 != '\x02')) ||
                     (*(char *)&pMVar118[1].insn_link.prev != '\x02')) goto LAB_0014f2bb;
                  pMStack_4a0 = (MIR_context_t)0x14615e;
                  iVar71 = addr_eliminable_p(pgVar120,pbVar85,(VARR_bb_insn_t *)0x0);
                  if (iVar71 == 0) {
                    uVar70 = *(uint *)&pMVar118[1].insn_link.next;
                    pVVar92 = pgVar120->addr_regs;
                    pMStack_4a0 = (MIR_context_t)0x146178;
                    bitmap_expand(pVVar92,(ulong)uVar70 + 1);
                    if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f679;
                    pVVar92->varr[uVar70 >> 6] =
                         pVVar92->varr[uVar70 >> 6] | 1L << ((ulong)uVar70 & 0x3f);
                  }
                  pVVar126 = pgVar120->temp_bb_insns;
                  uVar241 = uVar241 + 1;
                } while (pVVar126 != (VARR_bb_insn_t *)0x0);
                pMStack_4a0 = (MIR_context_t)0x1461ac;
                generate_func_code_cold_19();
LAB_001461ac:
                auVar255 = auVar260._0_16_;
                pbVar81 = (pgVar120->curr_cfg->bbs).head;
                if (pbVar81 != (bb_t_conflict)0x0) {
                  MVar69 = 0xffffffff;
                  bVar250 = false;
                  local_3a0 = (MIR_insn_t_conflict)0x0;
                  do {
                    pbVar201 = (pbVar81->bb_insns).head;
joined_r0x001461f3:
                    pbVar85 = pbVar201;
                    auVar255 = auVar260._0_16_;
                    if (pbVar85 != (bb_insn_t_conflict)0x0) {
                      pMVar118 = pbVar85->insn;
                      pbVar201 = (pbVar85->bb_insn_link).next;
                      uVar241 = *(ulong *)&pMVar118->field_0x18;
                      iVar71 = (int)uVar241;
                      if (iVar71 == 0xba) {
                        pVVar92 = pgVar120->addr_regs;
                        if (pVVar92 != (bitmap_t)0x0) goto code_r0x0014633e;
                        goto LAB_0014f1fb;
                      }
                      if (iVar71 == 0xb9) {
                        if (uVar241 >> 0x20 != 0) {
                          bVar196 = true;
                          uVar234 = 0;
                          do {
                            paVar204 = &pMVar118->ops[uVar234].u;
                            paVar235 = &pMVar118[1].ops[uVar234 - 1].u;
                            while( true ) {
                              if ((char)(&paVar204->reg)[-2] != '\x02') goto LAB_0014eff6;
                              pVVar92 = pgVar120->addr_regs;
                              if (pVVar92 == (bitmap_t)0x0) goto LAB_0014efee;
                              uVar70 = paVar204->reg;
                              if (((ulong)uVar70 < pVVar92->els_num << 6) &&
                                 ((pVVar92->varr[uVar70 >> 6] >> ((ulong)uVar70 & 0x3f) & 1) != 0))
                              break;
                              uVar234 = uVar234 + 1;
                              paVar204 = (anon_union_32_12_57d33f68_for_u *)(&paVar204->reg + 0xc);
                              paVar235 = (anon_union_32_12_57d33f68_for_u *)(&paVar235[1].str + 1);
                              if (uVar241 >> 0x20 <= uVar234) {
                                if (bVar196) goto joined_r0x001461f3;
                                goto LAB_00146b8c;
                              }
                            }
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            pMStack_4a0 = (MIR_context_t)0x1462c0;
                            remove_ssa_edge(*(ssa_edge_t_conflict *)(&paVar204->reg + -4));
                            uVar241 = *(ulong *)&pMVar118->field_0x18;
                            uVar215 = uVar234;
                            while (uVar215 = uVar215 + 1, uVar215 < uVar241 >> 0x20) {
                              auVar260 = ZEXT3264((undefined1  [32])*paVar235);
                              paVar235[-1] = *(anon_union_32_12_57d33f68_for_u *)
                                              (&paVar235->str + 1);
                              *(anon_union_32_12_57d33f68_for_u *)(&paVar235[-2].str + 1) =
                                   *paVar235;
                              paVar235 = (anon_union_32_12_57d33f68_for_u *)(&paVar235[1].str + 1);
                              uVar241 = *(ulong *)&pMVar118->field_0x18;
                            }
                            bVar196 = false;
                            uVar215 = (uVar241 & 0xffffffff00000000) - 0x100000000;
                            uVar241 = uVar241 & 0xffffffff | uVar215;
                            *(ulong *)&pMVar118->field_0x18 = uVar241;
                          } while (uVar234 < uVar215 >> 0x20);
LAB_00146b8c:
                          if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                             (1 < pgVar120->debug_level)) {
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            pMStack_4a0 = (MIR_context_t)0x146bc4;
                            fwrite("  modifying use to ",0x13,1,(FILE *)pgVar120->debug_file);
                            pMStack_4a0 = (MIR_context_t)0x146bd5;
                            print_bb_insn(pgVar120,(bb_insn_t_conflict)pMVar118->data,1);
                          }
                        }
                      }
                      else if (iVar71 - 0x22U < 0xfffffffc) {
                        if (0 < (int)(uVar241 >> 0x20)) {
                          sVar233 = 0;
                          uVar70 = 0;
                          do {
                            paVar204 = (anon_union_32_12_57d33f68_for_u *)(pMVar118->ops + sVar233);
                            cVar66 = pMVar118->ops[sVar233].field_0x8;
                            if (cVar66 == '\v') {
                              uVar73 = paVar204[1].reg;
                              if (uVar73 != 0xffffffff) {
                                local_288[0] = 0;
                                goto LAB_0014644b;
                              }
                            }
                            else if (cVar66 == '\x02') {
                              uVar73 = ((anon_union_32_12_57d33f68_for_u *)
                                       ((long)&paVar204->mem + 0x10))->reg;
                              auVar260 = ZEXT1664(auVar260._0_16_);
                              pMStack_4a0 = (MIR_context_t)0x14642f;
                              MIR_insn_op_mode(pgVar120->ctx,pMVar118,sVar233,local_288);
LAB_0014644b:
                              if (0x21 < uVar73) {
                                pVVar92 = pgVar120->addr_regs;
                                if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f139;
                                if (((ulong)uVar73 < pVVar92->els_num << 6) &&
                                   ((pVVar92->varr[uVar73 >> 6] >> ((ulong)uVar73 & 0x3f) & 1) != 0)
                                   ) {
                                  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                                     (1 < pgVar120->debug_level)) {
                                    pMStack_4a0 = (MIR_context_t)0x1464c4;
                                    fwrite("  ",2,1,(FILE *)pgVar120->debug_file);
                                    pMStack_4a0 = (MIR_context_t)0x1464d9;
                                    print_bb_insn(pgVar120,pbVar85,1);
                                  }
                                  if (uVar73 != uVar70) {
                                    pMStack_4a0 = (MIR_context_t)0x146507;
                                    MVar69 = _MIR_new_temp_reg(pgVar120->ctx,MIR_T_I64,pMVar15);
                                    MVar69 = MVar69 + 0x21;
                                    if ((MVar69 != 0xffffffff) &&
                                       (pgVar120->curr_cfg->max_var < MVar69)) {
                                      pgVar120->curr_cfg->max_var = MVar69;
                                    }
                                    pMStack_4a0 = (MIR_context_t)0x14653d;
                                    _MIR_new_var_op(pMVar14,MVar69);
                                    pMStack_4a0 = (MIR_context_t)0x146550;
                                    _MIR_new_var_op(pMVar14,uVar73);
                                    pMStack_4a0 = (MIR_context_t)0x14659d;
                                    local_3a0 = MIR_new_insn(pMVar14,MIR_ADDR);
                                    pMStack_4a0 = (MIR_context_t)0x1465b3;
                                    gen_add_insn_before(pgVar120,pMVar118,local_3a0);
                                    uVar70 = uVar73;
                                    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                                       (1 < pgVar120->debug_level)) {
                                      pMStack_4a0 = (MIR_context_t)0x1465d8;
                                      fwrite("    adding before: ",0x13,1,
                                             (FILE *)pgVar120->debug_file);
                                      pMStack_4a0 = (MIR_context_t)0x1465f0;
                                      print_bb_insn(pgVar120,(bb_insn_t_conflict)local_3a0->data,1);
                                    }
                                  }
                                  pMStack_4a0 = (MIR_context_t)0x146614;
                                  MVar74 = MIR_reg_type(pMVar14,uVar73 - 0x21,pMVar15);
                                  if (MVar74 == MIR_T_F) {
                                    MVar218 = MIR_FMOV;
                                  }
                                  else if (MVar74 == MIR_T_D) {
                                    MVar218 = MIR_DMOV;
                                  }
                                  else {
                                    MVar218 = (uint)(MVar74 == MIR_T_LD) * 3;
                                  }
                                  pMStack_4a0 = (MIR_context_t)0x14666a;
                                  MVar72 = _MIR_new_temp_reg(pgVar120->ctx,MVar74,pMVar15);
                                  uVar76 = MVar72 + 0x21;
                                  if ((uVar76 != 0xffffffff) &&
                                     (pgVar120->curr_cfg->max_var < uVar76)) {
                                    pgVar120->curr_cfg->max_var = uVar76;
                                  }
                                  iVar71 = (int)sVar233;
                                  if (local_288[0] == 0) {
                                    pMStack_4a0 = (MIR_context_t)0x1467ca;
                                    _MIR_new_var_op(pMVar14,uVar76);
                                    pMStack_4a0 = (MIR_context_t)0x1467f9;
                                    _MIR_new_var_mem_op((MIR_op_t *)local_258,pMVar14,MVar74,0,
                                                        MVar69,0xffffffff,'\0');
                                    auVar260 = ZEXT1664(CONCAT88(uStack_2b0,
                                                                 CONCAT44(uStack_2b4,local_2b8)));
                                    pMStack_4a0 = (MIR_context_t)0x14684d;
                                    pMVar83 = MIR_new_insn(pMVar14,MVar218);
                                    pMStack_4a0 = (MIR_context_t)0x146863;
                                    gen_add_insn_before(pgVar120,pMVar118,pMVar83);
                                    if (*(undefined1 *)((long)&paVar204->str + 8) == '\v') {
                                      if (paVar204[1].reg != uVar73) goto LAB_0014f46e;
                                      paVar235 = (anon_union_32_12_57d33f68_for_u *)
                                                 ((long)paVar204 + 0x10);
                                    }
                                    else {
                                      paVar235 = paVar204;
                                      if (*(undefined1 *)((long)&paVar204->str + 8) != '\x02') {
LAB_0014f46e:
                                        pMStack_4a0 = (MIR_context_t)0x14f48d;
                                        __assert_fail(
                                                  "insn->ops[op_num].mode == MIR_OP_VAR_MEM && insn->ops[op_num].u.var_mem.base == reg"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                                  ,0xbad,"void transform_addrs(gen_ctx_t)");
                                      }
                                    }
                                    (paVar235->mem).base = uVar76;
                                    if ((ssa_edge_t_conflict)(paVar204->str).len !=
                                        (ssa_edge_t_conflict)0x0) {
                                      pMStack_4a0 = (MIR_context_t)0x14689e;
                                      remove_ssa_edge((ssa_edge_t_conflict)(paVar204->str).len);
                                    }
                                    if (!bVar250) {
                                      pMStack_4a0 = (MIR_context_t)0x1468dc;
                                      add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)local_3a0->data,0,
                                                     (bb_insn_t_conflict)pMVar83->data,1,0);
                                      pbVar105 = (bb_insn_t_conflict)pMVar83->data;
                                      iVar77 = 0;
                                      pbVar106 = pbVar85;
                                      goto LAB_001468f0;
                                    }
                                  }
                                  else {
                                    pMStack_4a0 = (MIR_context_t)0x1466c9;
                                    _MIR_new_var_mem_op((MIR_op_t *)local_398,pMVar14,MVar74,0,
                                                        MVar69,0xffffffff,'\0');
                                    pMStack_4a0 = (MIR_context_t)0x1466db;
                                    _MIR_new_var_op(pMVar14,uVar76);
                                    auVar260 = ZEXT1664(CONCAT88(local_398._8_8_,
                                                                 CONCAT44(local_398._4_4_,
                                                                          local_398._0_4_)));
                                    pMStack_4a0 = (MIR_context_t)0x14672a;
                                    pMVar83 = MIR_new_insn(pMVar14,MVar218);
                                    pMStack_4a0 = (MIR_context_t)0x146740;
                                    gen_add_insn_after(pgVar120,pMVar118,pMVar83);
                                    if (*(undefined1 *)((long)&paVar204->str + 8) != '\x02')
                                    goto LAB_0014f341;
                                    ((anon_union_32_12_57d33f68_for_u *)
                                    ((long)&paVar204->mem + 0x10))->reg = uVar76;
                                    while (paVar204->ref != (MIR_item_t)0x0) {
                                      pMStack_4a0 = (MIR_context_t)0x14675f;
                                      remove_ssa_edge((ssa_edge_t_conflict)paVar204->ref);
                                    }
                                    if (!bVar250) {
                                      pMStack_4a0 = (MIR_context_t)0x146796;
                                      add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)local_3a0->data,0,
                                                     (bb_insn_t_conflict)pMVar83->data,0,0);
                                      pbVar106 = (bb_insn_t_conflict)pMVar83->data;
                                      pbVar105 = pbVar85;
                                      iVar77 = iVar71;
                                      iVar71 = 1;
LAB_001468f0:
                                      pMStack_4a0 = (MIR_context_t)0x1468f8;
                                      add_ssa_edge_1(pgVar120,pbVar105,iVar77,pbVar106,iVar71,0);
                                    }
                                  }
                                  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                                     (1 < pgVar120->debug_level)) {
                                    pcVar79 = "after";
                                    if (local_288[0] == 0) {
                                      pcVar79 = "before";
                                    }
                                    pMStack_4a0 = (MIR_context_t)0x14692f;
                                    fprintf((FILE *)pgVar120->debug_file,"    adding %s: ",pcVar79);
                                    pMStack_4a0 = (MIR_context_t)0x146940;
                                    print_bb_insn(pgVar120,(bb_insn_t_conflict)pMVar83->data,1);
                                    pMStack_4a0 = (MIR_context_t)0x14695a;
                                    fwrite("    changing to ",0x10,1,(FILE *)pgVar120->debug_file);
                                    pMStack_4a0 = (MIR_context_t)0x14696f;
                                    print_bb_insn(pgVar120,pbVar85,1);
                                  }
                                }
                              }
                            }
                            sVar233 = sVar233 + 1;
                          } while ((long)sVar233 < (long)*(int *)&pMVar118->field_0x1c);
                        }
                      }
                      else {
                        pVVar92 = pgVar120->addr_regs;
                        if (pVVar92 == (bitmap_t)0x0) {
                          pMStack_4a0 = (MIR_context_t)0x14f368;
                          generate_func_code_cold_17();
                          goto LAB_0014f368;
                        }
                        uVar70 = *(uint *)&pMVar118[1].insn_link.next;
                        if ((pVVar92->els_num << 6 <= (ulong)uVar70) ||
                           ((pVVar92->varr[uVar70 >> 6] >> ((ulong)uVar70 & 0x3f) & 1) == 0)) {
                          auVar260 = ZEXT1664(auVar255);
                          pMStack_4a0 = (MIR_context_t)0x146a32;
                          iVar71 = addr_eliminable_p(pgVar120,pbVar85,pgVar120->temp_bb_insns);
                          auVar255 = auVar260._0_16_;
                          if (iVar71 != 0) {
                            pVVar126 = pgVar120->temp_bb_insns;
                            if (pVVar126 != (VARR_bb_insn_t *)0x0) {
                              sVar233 = pVVar126->els_num;
                              if (sVar233 != 0) {
                                do {
                                  if (pVVar126->varr == (bb_insn_t_conflict *)0x0) {
                                    pMStack_4a0 = (MIR_context_t)0x14f07e;
                                    generate_func_code_cold_15();
                                    goto LAB_0014f07e;
                                  }
                                  pVVar126->els_num = sVar233 - 1;
                                  pMVar88 = pVVar126->varr[sVar233 - 1]->insn;
                                  uVar241 = *(ulong *)&pMVar88->field_0x18;
                                  if ((uVar241 & 0xfffffffc) != 0) goto LAB_0014f05a;
                                  uVar234 = (ulong)((uint)(pMVar88->ops[0].field_0x8 != '\v') * 0x30
                                                   );
                                  switch(*(undefined1 *)((long)&pMVar88->ops[0].u + uVar234)) {
                                  case 0:
                                    uVar241 = uVar241 & 0xffffffff00000000 | 4;
                                    break;
                                  case 1:
                                    uVar241 = uVar241 | 7;
                                    break;
                                  case 2:
                                    uVar241 = uVar241 & 0xffffffff00000000 | 5;
                                    break;
                                  case 3:
                                    uVar241 = uVar241 & 0xffffffff00000000 | 8;
                                    break;
                                  case 4:
                                    uVar241 = uVar241 & 0xffffffff00000000 | 6;
                                    break;
                                  case 5:
                                    uVar241 = uVar241 & 0xffffffff00000000 | 9;
                                    break;
                                  default:
                                    goto switchD_00146aab_default;
                                  }
                                  *(ulong *)&pMVar88->field_0x18 = uVar241;
switchD_00146aab_default:
                                  puVar113 = (undefined8 *)((long)&pMVar88->ops[0].data + uVar234);
                                  if ((ssa_edge_t_conflict)*puVar113 != (ssa_edge_t_conflict)0x0) {
                                    pMStack_4a0 = (MIR_context_t)0x146af4;
                                    remove_ssa_edge((ssa_edge_t_conflict)*puVar113);
                                  }
                                  auVar255 = auVar260._0_16_;
                                  *(undefined1 *)(puVar113 + 1) = 2;
                                  *(undefined4 *)(puVar113 + 2) =
                                       *(undefined4 *)&pMVar118[1].insn_link.next;
                                  pVVar126 = pgVar120->temp_bb_insns;
                                  if (pVVar126 == (VARR_bb_insn_t *)0x0) goto LAB_0014f050;
                                  sVar233 = pVVar126->els_num;
                                } while (sVar233 != 0);
                                bVar250 = true;
                              }
                              pFVar112 = (FILE *)pgVar120->debug_file;
                              if ((pFVar112 != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                                sVar245 = 0xb;
                                pcVar79 = "  deleting ";
                                goto LAB_00146b55;
                              }
                              goto LAB_00146b6e;
                            }
                            goto LAB_0014f050;
                          }
                          goto LAB_0014f44f;
                        }
                      }
                      goto joined_r0x001461f3;
                    }
                    pbVar81 = (pbVar81->bb_link).next;
                  } while (pbVar81 != (bb_t)0x0);
                }
              }
            }
            auVar260 = ZEXT1664(auVar255);
            pMStack_4a0 = (MIR_context_t)0x146c0e;
            undo_build_ssa(pgVar120);
            pMStack_4a0 = (MIR_context_t)0x146c16;
            clone_bbs(pgVar120);
            pMStack_4a0 = (MIR_context_t)0x146c23;
            build_ssa(pgVar120,1);
            if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
              pMStack_4a0 = (MIR_context_t)0x146c48;
              fwrite("+++++++++++++MIR after Addr Insns Transformation and cloning BBs:\n",0x42,1,
                     (FILE *)pgVar120->debug_file);
              pMStack_4a0 = (MIR_context_t)0x146c62;
              print_varr_insns(pgVar120,"undef init",pgVar120->ssa_ctx->undef_insns);
              pMStack_4a0 = (MIR_context_t)0x146c7b;
              print_varr_insns(pgVar120,"arg init",pgVar120->ssa_ctx->arg_bb_insns);
              pMStack_4a0 = (MIR_context_t)0x146c89;
              fputc(10,(FILE *)pgVar120->debug_file);
              pMStack_4a0 = (MIR_context_t)0x146ca6;
              print_CFG(pgVar120,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
            }
            auVar255 = auVar260._0_16_;
            if (pgVar120->optimize_level < 2) goto LAB_0014afda;
            pFVar112 = (FILE *)pgVar120->debug_file;
            goto LAB_00146cb4;
          }
        }
        pMStack_4a0 = (MIR_context_t)0x14f774;
        generate_func_code_cold_23();
LAB_0014f774:
        pMStack_4a0 = (MIR_context_t)0x14f779;
        generate_func_code_cold_98();
LAB_0014f779:
        pMStack_4a0 = (MIR_context_t)0x14f77e;
        generate_func_code_cold_69();
LAB_0014f77e:
        pMStack_4a0 = (MIR_context_t)0x14f79d;
        __assert_fail("gen_ctx->optimize_level > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1af0,"void coalesce(gen_ctx_t)");
      }
LAB_0014afda:
      auVar260 = ZEXT1664(auVar255);
      pMStack_4a0 = (MIR_context_t)0x14afe5;
      target_machinize(pgVar120);
      if (pgVar120->curr_func_item->item_type != MIR_func_item) goto LAB_0014f572;
      pMVar14 = pgVar120->ctx;
      pMVar15 = (pgVar120->curr_func_item->u).func;
      lVar207 = 0;
      do {
        uVar70 = *(uint *)((long)target_io_dup_op_insn_codes + lVar207);
        pVVar92 = pgVar120->insn_to_consider;
        pMVar118 = (MIR_insn_t)((ulong)uVar70 + 1);
        pMStack_4a0 = (MIR_context_t)0x14b02f;
        bitmap_expand(pVVar92,(size_t)pMVar118);
        iVar71 = (int)pMVar118;
        if (pVVar92 == (bitmap_t)0x0) {
          pMStack_4a0 = (MIR_context_t)0x14f0bf;
          generate_func_code_cold_162();
LAB_0014f0bf:
          pMStack_4a0 = (MIR_context_t)0x14f0c4;
          generate_func_code_cold_184();
LAB_0014f0c4:
          pMStack_4a0 = (MIR_context_t)0x14f0c9;
          generate_func_code_cold_177();
LAB_0014f0c9:
          pMStack_4a0 = (MIR_context_t)0x14f0e8;
          __assert_fail("insn->code == MIR_JMPI",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x72d,"void build_func_cfg(gen_ctx_t)");
        }
        lVar207 = lVar207 + 4;
        pVVar92->varr[uVar70 >> 6] = pVVar92->varr[uVar70 >> 6] | 1L << ((ulong)uVar70 & 0x3f);
      } while (lVar207 != 0xac);
      auVar254 = vpternlogd_avx512f(auVar260,auVar260,auVar260,0xff);
      auVar260 = vmovdqu64_avx512f(auVar254);
      apMStack_200[5] = auVar260._52_8_;
      uStack_1d0 = auVar260._60_4_;
      auVar260 = vmovdqu64_avx512f(auVar254);
      local_218.tv_sec._0_4_ = auVar260._0_4_;
      local_218.tv_sec._4_4_ = auVar260._4_4_;
      local_218.tv_usec._0_4_ = auVar260._8_4_;
      local_218.tv_usec._4_4_ = auVar260._12_4_;
      pMStack_208 = auVar260._16_8_;
      apMStack_200[0] = auVar260._24_8_;
      apMStack_200[1] = auVar260._32_8_;
      apMStack_200[2] = auVar260._40_8_;
      apMStack_200[3] = auVar260._48_8_;
      apMStack_200[4] = auVar260._56_8_;
      pMVar88 = (pMVar15->insns).head;
      while (pMVar88 != (MIR_insn_t)0x0) {
        uVar241 = *(ulong *)&pMVar88->field_0x18;
        pMVar89 = (pMVar88->insn_link).next;
        iVar71 = (int)uVar241;
        if (((3 < iVar71 - 0x1eU) && (iVar71 != 0xb4)) && (iVar71 != 0xb9)) {
          pVVar92 = pgVar120->insn_to_consider;
          if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f38c;
          uVar234 = uVar241 & 0xffffffff;
          if ((uVar234 < pVVar92->els_num << 6) &&
             ((pVVar92->varr[uVar234 >> 6] >> (uVar241 & 0x3f) & 1) != 0)) {
            op1.data = pMVar88->ops[0].data;
            op1._8_8_ = *(undefined8 *)&pMVar88->ops[0].field_0x8;
            op1.u = pMVar88->ops[0].u;
            pMStack_4a0 = (MIR_context_t)0x14b11e;
            iVar71 = MIR_op_eq_p(pMVar14,op1,*(MIR_op_t *)(pMVar88 + 1));
            if (iVar71 == 0) {
              pMStack_4a0 = (MIR_context_t)0x14b132;
              add_inout_reloads(pgVar120,pMVar88);
            }
          }
          pMStack_4a0 = (MIR_context_t)0x14b147;
          pMVar118 = pMVar88;
          iVar71 = find_insn_pattern(pgVar120,pMVar88,(int *)0x0);
          if (iVar71 < 0) {
            uVar215 = *(ulong *)&pMVar88->field_0x18;
            if (uVar215 >> 0x20 == 0) {
              uVar111 = 0;
            }
            else {
              pMVar124 = pMVar88->ops;
              uVar111 = 0;
              do {
                if (pMVar124->field_0x8 == '\v') {
                  pVVar92 = pgVar120->insn_to_consider;
                  if (pVVar92 == (bitmap_t)0x0) {
                    pMStack_4a0 = (MIR_context_t)0x14f1fb;
                    generate_func_code_cold_64();
LAB_0014f1fb:
                    pMStack_4a0 = (MIR_context_t)0x14f203;
                    generate_func_code_cold_14();
                    goto LAB_0014f203;
                  }
                  if (((pVVar92->els_num << 6 <= uVar234) || (1 < uVar111)) ||
                     ((pVVar92->varr[uVar234 >> 6] & 1L << (uVar241 & 0x3f)) == 0)) {
                    pMStack_4a0 = (MIR_context_t)0x14b1fc;
                    pMVar118 = pMVar88;
                    MVar75 = MIR_insn_op_mode(pMVar14,pMVar88,uVar111,(int *)local_2e8);
                    if (MVar75 == MIR_OP_FLOAT) {
                      MVar74 = MIR_T_F;
                    }
                    else {
                      if (MVar75 == MIR_OP_LDOUBLE) goto LAB_0014b302;
                      if (MVar75 == MIR_OP_DOUBLE) {
                        MVar74 = MIR_T_D;
                      }
                      else {
                        MVar74 = MIR_T_I64;
                      }
                    }
                    uVar215 = (ulong)MVar74;
                    MVar69 = *(MIR_reg_t *)((long)&local_218.tv_sec + uVar215 * 4);
                    if (MVar69 == 0xffffffff) {
                      pMStack_4a0 = (MIR_context_t)0x14b24d;
                      MVar69 = _MIR_new_temp_reg(pgVar120->ctx,MVar74,
                                                 (pgVar120->curr_func_item->u).func);
                      MVar69 = MVar69 + 0x21;
                      if ((MVar69 != 0xffffffff) && (pgVar120->curr_cfg->max_var < MVar69)) {
                        pgVar120->curr_cfg->max_var = MVar69;
                      }
                      *(MIR_reg_t *)((long)&local_218.tv_sec + uVar215 * 4) = MVar69;
                    }
                    local_338._8_8_ = *(undefined8 *)&pMVar124->field_0x8;
                    local_338._16_8_ = (pMVar124->u).i;
                    local_338._24_8_ = (pMVar124->u).str.s;
                    local_338._32_8_ = *(undefined8 *)((long)&pMVar124->u + 0x10);
                    local_338._40_8_ = (pMVar124->u).mem.disp;
                    local_338._0_4_ = SUB84(pMVar124->data,0);
                    local_338._4_4_ = (undefined4)((ulong)pMVar124->data >> 0x20);
                    pMStack_4a0 = (MIR_context_t)0x14b2a5;
                    _MIR_new_var_op(pMVar14,MVar69);
                    auVar40._4_4_ = local_398._4_4_;
                    auVar40._0_4_ = local_398._0_4_;
                    auVar40._8_8_ = local_398._8_8_;
                    auVar40._16_8_ = auStack_388._0_8_;
                    auVar40._24_8_ = auStack_388._8_8_;
                    aVar42.str.s = (char *)auStack_388._8_8_;
                    aVar42.i = auStack_388._0_8_;
                    aVar42.mem.base = _local_378;
                    aVar42.mem.index = _uStack_374;
                    aVar42.mem.disp = uStack_370;
                    pMVar124->u = aVar42;
                    *(undefined1 (*) [32])pMVar124 = auVar40;
                    pMStack_4a0 = (MIR_context_t)0x14b2d8;
                    pMVar118 = pMVar88;
                    iVar71 = find_insn_pattern(pgVar120,pMVar88,(int *)0x0);
                    if (-1 < iVar71) {
                      pMStack_4a0 = (MIR_context_t)0x14b345;
                      pMVar118 = pMVar88;
                      add_reload(pgVar120,pMVar88,(MIR_op_t *)local_338,pMVar124,MVar74,
                                 (int)local_2e8[0]);
                      *(undefined4 *)((long)&local_218.tv_sec + uVar215 * 4) = 0xffffffff;
                      uVar215 = *(ulong *)&pMVar88->field_0x18;
                      break;
                    }
                    auVar44._4_4_ = local_338._4_4_;
                    auVar44._0_4_ = local_338._0_4_;
                    auVar44._8_8_ = local_338._8_8_;
                    auVar44._16_8_ = local_338._16_8_;
                    auVar44._24_8_ = local_338._24_8_;
                    aVar45.str.s = (char *)local_338._24_8_;
                    aVar45.i = local_338._16_8_;
                    aVar45._16_8_ = local_338._32_8_;
                    aVar45.mem.disp = local_338._40_8_;
                    pMVar124->u = aVar45;
                    *(undefined1 (*) [32])pMVar124 = auVar44;
                  }
                }
LAB_0014b302:
                uVar215 = *(ulong *)&pMVar88->field_0x18;
                uVar111 = uVar111 + 1;
                pMVar124 = pMVar124 + 1;
              } while (uVar111 < uVar215 >> 0x20);
            }
            if (uVar215 >> 0x20 <= uVar111) {
              pVVar92 = pgVar120->insn_to_consider;
              if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f6a7;
              if (((uVar234 < pVVar92->els_num << 6) &&
                  ((pVVar92->varr[uVar234 >> 6] >> (uVar241 & 0x3f) & 1) != 0)) &&
                 (pMVar88->ops[0].field_0x8 == '\v')) {
                pMStack_4a0 = (MIR_context_t)0x14b3be;
                add_inout_reloads(pgVar120,pMVar88);
                pMStack_4a0 = (MIR_context_t)0x14b3d3;
                pMVar118 = pMVar88;
                iVar71 = find_insn_pattern(pgVar120,pMVar88,(int *)0x0);
                if (-1 < iVar71) goto LAB_0014b099;
                uVar215 = *(ulong *)&pMVar88->field_0x18;
              }
              if (uVar215 >> 0x20 != 0) {
                pMVar124 = pMVar88->ops;
                uVar215 = 0;
                do {
                  if (pMVar124->field_0x8 == '\v') {
                    pVVar92 = pgVar120->insn_to_consider;
                    if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f334;
                    if (((pVVar92->els_num << 6 <= uVar234) || (1 < uVar215)) ||
                       ((pVVar92->varr[uVar234 >> 6] & 1L << (uVar241 & 0x3f)) == 0)) {
                      pMStack_4a0 = (MIR_context_t)0x14b479;
                      pMVar118 = pMVar88;
                      MVar75 = MIR_insn_op_mode(pMVar14,pMVar88,uVar215,(int *)local_2e8);
                      if (MVar75 == MIR_OP_FLOAT) {
                        MVar74 = MIR_T_F;
                      }
                      else {
                        if (MVar75 == MIR_OP_LDOUBLE) goto LAB_0014b539;
                        if (MVar75 == MIR_OP_DOUBLE) {
                          MVar74 = MIR_T_D;
                        }
                        else {
                          MVar74 = MIR_T_I64;
                        }
                      }
                      pMStack_4a0 = (MIR_context_t)0x14b4c0;
                      MVar69 = _MIR_new_temp_reg(pgVar120->ctx,MVar74,
                                                 (pgVar120->curr_func_item->u).func);
                      uVar70 = MVar69 + 0x21;
                      if ((uVar70 != 0xffffffff) && (pgVar120->curr_cfg->max_var < uVar70)) {
                        pgVar120->curr_cfg->max_var = uVar70;
                      }
                      pMStack_4a0 = (MIR_context_t)0x14b4f0;
                      _MIR_new_var_op(pMVar14,uVar70);
                      auVar41._4_4_ = local_398._4_4_;
                      auVar41._0_4_ = local_398._0_4_;
                      auVar41._8_8_ = local_398._8_8_;
                      auVar41._16_8_ = auStack_388._0_8_;
                      auVar41._24_8_ = auStack_388._8_8_;
                      aVar43.str.s = (char *)auStack_388._8_8_;
                      aVar43.i = auStack_388._0_8_;
                      aVar43.mem.base = _local_378;
                      aVar43.mem.index = _uStack_374;
                      aVar43.mem.disp = uStack_370;
                      pMVar124->u = aVar43;
                      *(undefined1 (*) [32])pMVar124 = auVar41;
                      pMStack_4a0 = (MIR_context_t)0x14b531;
                      pMVar118 = pMVar88;
                      add_reload(pgVar120,pMVar88,pMVar124,pMVar124,MVar74,(int)local_2e8[0]);
                    }
                  }
LAB_0014b539:
                  uVar215 = uVar215 + 1;
                  pMVar124 = pMVar124 + 1;
                } while (uVar215 < *(uint *)&pMVar88->field_0x1c);
              }
            }
          }
        }
LAB_0014b099:
        iVar71 = (int)pMVar118;
        pMVar88 = pMVar89;
      }
      if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
        pMStack_4a0 = (MIR_context_t)0x14b581;
        fwrite("+++++++++++++MIR after machinize:\n",0x22,1,(FILE *)pgVar120->debug_file);
        iVar71 = 0;
        pMStack_4a0 = (MIR_context_t)0x14b59b;
        print_CFG(pgVar120,0,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (pgVar120->optimize_level != 0) {
        pMStack_4a0 = (MIR_context_t)0x14b5b0;
        build_loop_tree(pgVar120);
        if ((pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
          pMStack_4a0 = (MIR_context_t)0x14b5c5;
          print_loop_tree(pgVar120,iVar71);
        }
        if (1 < pgVar120->optimize_level) {
          pVVar166 = pgVar120->coalesce_ctx->moves;
          if ((pVVar166 == (VARR_mv_t *)0x0) || (pmVar108 = pVVar166->varr, pmVar108 == (mv_t *)0x0)
             ) goto LAB_0014f5fe;
          pVVar166->els_num = 0;
          pbVar99 = (pgVar120->curr_cfg->bbs).head;
          if (pbVar99 == (bb_t_conflict)0x0) {
            sVar233 = 0;
          }
          else {
            do {
              for (pbVar201 = (pbVar99->bb_insns).head; pbVar201 != (bb_insn_t)0x0;
                  pbVar201 = (pbVar201->bb_insn_link).next) {
                pMStack_4a0 = (MIR_context_t)0x14b629;
                iVar71 = move_p(pbVar201->insn);
                if (iVar71 != 0) {
                  plVar222 = pbVar99->loop_node;
                  iVar71 = -2;
                  uVar70 = 0;
                  do {
                    uVar73 = uVar70;
                    plVar222 = plVar222->parent;
                    iVar71 = iVar71 + 1;
                    uVar70 = uVar73 + 1;
                  } while (plVar222 != (loop_node_t)0x0);
                  if (iVar71 < 0) goto LAB_0014f022;
                  if (iVar71 == 0) {
                    uVar241 = 1;
                  }
                  else {
                    uVar241 = 1;
                    do {
                      sVar233 = uVar241 * 5;
                      if (0x1ffffffffffffffe < uVar241) {
                        sVar233 = uVar241;
                      }
                      uVar241 = sVar233;
                      uVar73 = uVar73 - 1;
                    } while (1 < uVar73);
                  }
                  pVVar166 = pgVar120->coalesce_ctx->moves;
                  pmVar108 = pVVar166->varr;
                  if (pmVar108 == (mv_t *)0x0) goto LAB_0014f01d;
                  sVar233 = pVVar166->els_num;
                  uVar234 = sVar233 + 1;
                  if (pVVar166->size < uVar234) {
                    sVar233 = (uVar234 >> 1) + uVar234;
                    pMStack_4a0 = (MIR_context_t)0x14b6b8;
                    pmVar108 = (mv_t *)realloc(pmVar108,sVar233 * 0x10);
                    pVVar166->varr = pmVar108;
                    pVVar166->size = sVar233;
                    sVar233 = pVVar166->els_num;
                    uVar234 = sVar233 + 1;
                  }
                  pVVar166->els_num = uVar234;
                  pmVar108[sVar233].bb_insn = pbVar201;
                  pmVar108[sVar233].freq = uVar241;
                }
              }
              pbVar99 = (pbVar99->bb_link).next;
            } while (pbVar99 != (bb_t)0x0);
            pVVar166 = pgVar120->coalesce_ctx->moves;
            if (pVVar166 == (VARR_mv_t *)0x0) goto LAB_0014f779;
            sVar233 = pVVar166->els_num;
            pmVar108 = pVVar166->varr;
          }
          pMStack_4a0 = (MIR_context_t)0x14b726;
          qsort(pmVar108,sVar233,0x10,mv_freq_cmp);
          plVar160 = pgVar120->lr_ctx;
          pVVar161 = plVar160->var_to_scan_var_map;
          if ((pVVar161 == (VARR_int *)0x0) || (pVVar161->varr == (int *)0x0)) goto LAB_0014f603;
          pVVar161->els_num = 0;
          pVVar162 = plVar160->scan_var_to_var_map;
          if ((pVVar162 == (VARR_MIR_reg_t *)0x0) || (pVVar162->varr == (MIR_reg_t *)0x0))
          goto LAB_0014f608;
          pVVar162->els_num = 0;
          pVVar92 = pgVar120->temp_bitmap;
          if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0))
          goto LAB_0014f60d;
          pVVar92->els_num = 0;
          plVar160->scan_vars_num = 0;
          pVVar166 = pgVar120->coalesce_ctx->moves;
          if (pVVar166 != (VARR_mv_t *)0x0) {
            uVar241 = 0xffffffffffffffff;
            lVar207 = 0;
            do {
              uVar241 = uVar241 + 1;
              if (pVVar166->els_num <= uVar241) goto LAB_0014b7f6;
              if (pVVar166->varr == (mv_t *)0x0) goto LAB_0014f1c5;
              puVar113 = (undefined8 *)((long)&pVVar166->varr->bb_insn + lVar207);
              lVar207 = lVar207 + 0x10;
              lVar242 = *(long *)*puVar113;
              pMStack_4a0 = (MIR_context_t)0x14b7d6;
              collect_scan_var(pgVar120,*(MIR_reg_t *)(lVar242 + 0x30));
              pMStack_4a0 = (MIR_context_t)0x14b7e2;
              collect_scan_var(pgVar120,*(MIR_reg_t *)(lVar242 + 0x60));
              pVVar166 = pgVar120->coalesce_ctx->moves;
            } while (pVVar166 != (VARR_mv_t *)0x0);
          }
          pMStack_4a0 = (MIR_context_t)0x14b7f6;
          generate_func_code_cold_111();
LAB_0014b7f6:
          if (0xffffd8f0 < pgVar120->lr_ctx->scan_vars_num - 10000U) {
            pMStack_4a0 = (MIR_context_t)0x14b81b;
            calculate_func_cfg_live_info(pgVar120,0);
            pMStack_4a0 = (MIR_context_t)0x14b831;
            print_live_info(pgVar120,"Live info before coalesce",1,0);
            if (pgVar120->optimize_level == 0) goto LAB_0014f77e;
            pcVar165 = pgVar120->coalesce_ctx;
            pVVar162 = pcVar165->first_coalesced_reg;
            if ((pVVar162 == (VARR_MIR_reg_t *)0x0) || (pVVar162->varr == (MIR_reg_t *)0x0)) {
              pMStack_4a0 = (MIR_context_t)0x14f732;
              generate_func_code_cold_109();
            }
            else {
              pMVar14 = pgVar120->ctx;
              pVVar162->els_num = 0;
              pVVar162 = pcVar165->next_coalesced_reg;
              if ((pVVar162 != (VARR_MIR_reg_t *)0x0) && (pVVar162->varr != (MIR_reg_t *)0x0)) {
                MVar69 = 0;
                pVVar162->els_num = 0;
                do {
                  pcVar165 = pgVar120->coalesce_ctx;
                  pVVar162 = pcVar165->first_coalesced_reg;
                  pMVar109 = pVVar162->varr;
                  if (pMVar109 == (MIR_reg_t *)0x0) {
                    pMStack_4a0 = (MIR_context_t)0x14f25a;
                    generate_func_code_cold_107();
LAB_0014f25a:
                    pMStack_4a0 = (MIR_context_t)0x14f25f;
                    generate_func_code_cold_106();
                    goto LAB_0014f25f;
                  }
                  sVar233 = pVVar162->els_num;
                  uVar241 = sVar233 + 1;
                  if (pVVar162->size < uVar241) {
                    sVar233 = (uVar241 >> 1) + uVar241;
                    pMStack_4a0 = (MIR_context_t)0x14b8cc;
                    pMVar109 = (MIR_reg_t *)realloc(pMVar109,sVar233 * 4);
                    pVVar162->varr = pMVar109;
                    pVVar162->size = sVar233;
                    sVar233 = pVVar162->els_num;
                    pcVar165 = pgVar120->coalesce_ctx;
                    uVar241 = sVar233 + 1;
                  }
                  pVVar162->els_num = uVar241;
                  pMVar109[sVar233] = MVar69;
                  pVVar162 = pcVar165->next_coalesced_reg;
                  pMVar109 = pVVar162->varr;
                  if (pMVar109 == (MIR_reg_t *)0x0) goto LAB_0014f25a;
                  sVar233 = pVVar162->els_num;
                  uVar241 = sVar233 + 1;
                  if (pVVar162->size < uVar241) {
                    sVar233 = (uVar241 >> 1) + uVar241;
                    pMStack_4a0 = (MIR_context_t)0x14b91f;
                    pMVar109 = (MIR_reg_t *)realloc(pMVar109,sVar233 * 4);
                    pVVar162->varr = pMVar109;
                    pVVar162->size = sVar233;
                    sVar233 = pVVar162->els_num;
                    uVar241 = sVar233 + 1;
                  }
                  pVVar162->els_num = uVar241;
                  pMVar109[sVar233] = MVar69;
                  MVar69 = MVar69 + 1;
                  pfVar80 = pgVar120->curr_cfg;
                } while (MVar69 <= pfVar80->max_var);
                pVVar92 = pgVar120->coalesce_ctx->conflict_matrix;
                if ((pVVar92 != (bitmap_t)0x0) && (pVVar92->varr != (bitmap_el_t *)0x0)) {
                  pVVar92->els_num = 0;
                  pbVar99 = (pfVar80->bbs).head;
                  if (pbVar99 != (bb_t_conflict)0x0) {
LAB_0014b980:
                    pbVar201 = (pbVar99->bb_insns).head;
                    if (pbVar201 == (bb_insn_t)0x0) goto LAB_0014be8b;
                    pVVar92 = pgVar120->lr_ctx->live_vars;
                    if ((pVVar92 != (bitmap_t)0x0) && (pVVar92->varr != (bitmap_el_t *)0x0)) {
                      pMVar118 = pbVar201->insn;
                      pMVar88 = ((pbVar99->bb_insns).tail)->insn;
                      pVVar92->els_num = 0;
                      pVVar92 = pbVar99->out;
                      if ((pVVar92 != (bitmap_t)0x0) && (sVar233 = pVVar92->els_num, sVar233 != 0))
                      {
                        sVar220 = 0;
                        uVar241 = 0;
                        do {
                          while ((pVVar92->varr[sVar220] == 0 ||
                                 (uVar234 = pVVar92->varr[sVar220] >> (uVar241 & 0x3f), uVar234 == 0
                                 ))) {
                            sVar220 = sVar220 + 1;
                            uVar241 = sVar220 * 0x40;
                            if (sVar233 == sVar220) goto LAB_0014ba8c;
                          }
                          uVar215 = uVar234 & 1;
                          uVar111 = uVar241;
                          while (uVar215 == 0) {
                            uVar111 = uVar111 + 1;
                            uVar215 = uVar234 & 2;
                            uVar234 = uVar234 >> 1;
                          }
                          uVar241 = uVar111 + 1;
                          pVVar205 = pgVar120->lr_ctx->live_vars;
                          pMStack_4a0 = (MIR_context_t)0x14ba4f;
                          bitmap_expand(pVVar205,uVar241);
                          if (pVVar205 == (bitmap_t)0x0) {
                            pMStack_4a0 = (MIR_context_t)0x14f70e;
                            generate_func_code_cold_70();
LAB_0014f70e:
                            pMStack_4a0 = (MIR_context_t)0x14f72d;
                            __assert_fail("se != ((void*)0) && se->next_use == ((void*)0) && se->use == (DLIST_bb_insn_t_next (bb_insn))"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0xca9,"void copy_prop(gen_ctx_t)");
                          }
                          pVVar205->varr[uVar111 >> 6] =
                               pVVar205->varr[uVar111 >> 6] | 1L << (uVar111 & 0x3f);
                          sVar220 = uVar241 >> 6;
                          sVar233 = pVVar92->els_num;
                        } while (sVar220 < sVar233);
                      }
LAB_0014ba8c:
                      do {
                        pMStack_4a0 = (MIR_context_t)0x14ba94;
                        iVar71 = move_p(pMVar88);
                        if (iVar71 == 0) {
                          uVar70 = 0xffffffff;
                        }
                        else {
                          pMStack_4a0 = (MIR_context_t)0x14baa8;
                          uVar70 = var_to_scan_var((gen_ctx_t)pgVar120->lr_ctx,
                                                   *(MIR_reg_t *)&pMVar88[1].insn_link.next);
                        }
                        uVar73 = *(uint *)&pMVar88->field_0x1c;
                        sVar233 = 0;
                        while (sVar233 < uVar73) {
                          paVar204 = &pMVar88->ops[sVar233].u;
                          while( true ) {
                            pMStack_4a0 = (MIR_context_t)0x14bb0e;
                            MIR_insn_op_mode(pgVar120->ctx,pMVar88,sVar233,(int *)&local_218);
                            if (((uint)local_218.tv_sec != 0) &&
                               ((char)(&paVar204->reg)[-2] != '\v')) break;
                            sVar233 = sVar233 + 1;
                            paVar204 = (anon_union_32_12_57d33f68_for_u *)(&paVar204->reg + 0xc);
                            if (uVar73 == sVar233) goto LAB_0014bcad;
                          }
                          if ((char)(&paVar204->reg)[-2] != '\x02') goto LAB_0014efc0;
                          sVar233 = sVar233 + 1;
                          pMStack_4a0 = (MIR_context_t)0x14bb4c;
                          uVar76 = var_to_scan_var((gen_ctx_t)pgVar120->lr_ctx,paVar204->reg);
                          if (-1 < (int)uVar76) {
                            pVVar92 = pgVar120->lr_ctx->live_vars;
                            if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f0f2;
                            sVar220 = pVVar92->els_num;
                            if (sVar220 != 0) {
                              sVar200 = 0;
                              uVar241 = 0;
                              do {
                                while ((pVVar92->varr[sVar200] == 0 ||
                                       (uVar234 = pVVar92->varr[sVar200] >> (uVar241 & 0x3f),
                                       uVar234 == 0))) {
                                  sVar200 = sVar200 + 1;
                                  uVar241 = sVar200 * 0x40;
                                  if (sVar220 == sVar200) goto LAB_0014bc63;
                                }
                                uVar215 = uVar234 & 1;
                                while (uVar215 == 0) {
                                  uVar241 = uVar241 + 1;
                                  uVar215 = uVar234 & 2;
                                  uVar234 = uVar234 >> 1;
                                }
                                uVar240 = (uint)uVar241;
                                if ((uVar76 != uVar240) && (uVar70 != uVar240)) {
                                  uVar203 = uVar240;
                                  if ((int)uVar240 < (int)uVar76) {
                                    uVar203 = uVar76;
                                  }
                                  if ((int)uVar76 < (int)uVar240) {
                                    uVar240 = uVar76;
                                  }
                                  pVVar205 = pgVar120->coalesce_ctx->conflict_matrix;
                                  uVar234 = (ulong)(int)(uVar240 * pgVar120->lr_ctx->scan_vars_num +
                                                        uVar203);
                                  pMStack_4a0 = (MIR_context_t)0x14bc14;
                                  bitmap_expand(pVVar205,uVar234 + 1);
                                  if (pVVar205 == (bitmap_t)0x0) {
                                    pMStack_4a0 = (MIR_context_t)0x14f2df;
                                    generate_func_code_cold_71();
                                    goto LAB_0014f2df;
                                  }
                                  pVVar205->varr[uVar234 >> 6] =
                                       pVVar205->varr[uVar234 >> 6] | 1L << (uVar234 & 0x3f);
                                  sVar220 = pVVar92->els_num;
                                }
                                uVar241 = uVar241 + 1;
                                sVar200 = uVar241 >> 6;
                              } while (sVar200 < sVar220);
                            }
LAB_0014bc63:
                            pVVar92 = pgVar120->lr_ctx->live_vars;
                            if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f0ed;
                            if ((ulong)uVar76 < pVVar92->els_num << 6) {
                              bVar249 = (byte)uVar76 & 0x3f;
                              pVVar92->varr[uVar76 >> 6] =
                                   pVVar92->varr[uVar76 >> 6] &
                                   (-2L << bVar249 | 0xfffffffffffffffeU >> 0x40 - bVar249);
                            }
                          }
                        }
LAB_0014bcad:
                        uVar241 = *(ulong *)&pMVar88->field_0x18 >> 0x20;
                        if (uVar241 != 0) {
                          uVar215 = 0;
                          uVar234 = 0;
LAB_0014bccf:
                          do {
                            pMStack_4a0 = (MIR_context_t)0x14bced;
                            MIR_insn_op_mode(pgVar120->ctx,pMVar88,uVar234,(int *)&local_218);
                            if (((uint)local_218.tv_sec == 0) ||
                               (pMVar88->ops[uVar234].field_0x8 == '\v')) {
                              if (uVar215 < 2) {
                                cVar66 = pMVar88->ops[uVar234].field_0x8;
                                if (cVar66 == '\v') {
                                  do {
                                    MVar69 = *(MIR_reg_t *)
                                              ((long)&pMVar88->ops[uVar234].u +
                                              (ulong)(uVar215 != 0) * 4 + 0x10);
                                    if (MVar69 != 0xffffffff) {
                                      uVar215 = uVar215 + 1;
                                      goto LAB_0014bd5b;
                                    }
                                    bVar250 = uVar215 == 0;
                                    uVar215 = 1;
                                  } while (bVar250);
                                }
                                else if (uVar215 != 1) {
                                  uVar215 = 0;
                                  if (cVar66 != '\x02') goto LAB_0014bdcc;
                                  MVar69 = pMVar88->ops[uVar234].u.reg;
                                  uVar215 = 1;
LAB_0014bd5b:
                                  pMStack_4a0 = (MIR_context_t)0x14bd6f;
                                  uVar70 = var_to_scan_var((gen_ctx_t)pgVar120->lr_ctx,MVar69);
                                  if (-1 < (int)uVar70) {
                                    pVVar92 = pgVar120->lr_ctx->live_vars;
                                    pMStack_4a0 = (MIR_context_t)0x14bd96;
                                    bitmap_expand(pVVar92,(ulong)uVar70 + 1);
                                    if (pVVar92 == (bitmap_t)0x0) {
                                      pMStack_4a0 = (MIR_context_t)0x14efe4;
                                      generate_func_code_cold_74();
                                      goto LAB_0014efe4;
                                    }
                                    pVVar92->varr[uVar70 >> 6] =
                                         pVVar92->varr[uVar70 >> 6] | 1L << ((ulong)uVar70 & 0x3f);
                                  }
                                  if (uVar241 <= uVar234) break;
                                  goto LAB_0014bccf;
                                }
                              }
                              uVar215 = 0;
                            }
LAB_0014bdcc:
                            uVar234 = uVar234 + 1;
                          } while (uVar234 < uVar241);
                        }
                        if (pMVar88 == pMVar118) goto LAB_0014bdfb;
                        pMVar88 = (pMVar88->insn_link).prev;
                      } while( true );
                    }
                    goto LAB_0014f33c;
                  }
LAB_0014be98:
                  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level))
                  {
                    pVVar92 = pgVar120->coalesce_ctx->conflict_matrix;
                    if (pVVar92 == (bitmap_t)0x0) {
LAB_0014f85d:
                      pMStack_4a0 = (MIR_context_t)0x14f862;
                      generate_func_code_cold_78();
LAB_0014f862:
                      pMStack_4a0 = (MIR_context_t)0x14f867;
                      generate_func_code_cold_94();
LAB_0014f867:
                      pMStack_4a0 = (MIR_context_t)0x14f86c;
                      generate_func_code_cold_95();
LAB_0014f86c:
                      pMStack_4a0 = (MIR_context_t)0x14f871;
                      generate_func_code_cold_41();
LAB_0014f871:
                      pMStack_4a0 = (MIR_context_t)0x14f876;
                      generate_func_code_cold_40();
LAB_0014f876:
                      pMStack_4a0 = (MIR_context_t)0x14f895;
                      __assert_fail("gen_ctx->addr_insn_p",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0xb42,"void transform_addrs(gen_ctx_t)");
                    }
                    pMStack_4a0 = (MIR_context_t)0x14bedb;
                    fprintf((FILE *)pgVar120->debug_file,
                            "  Conflict matrix size=%lu, scan vars = %d\n",pVVar92->size << 3,
                            (ulong)(uint)pgVar120->lr_ctx->scan_vars_num);
                  }
                  pcVar165 = pgVar120->coalesce_ctx;
                  pVVar166 = pcVar165->moves;
                  if (pVVar166 != (VARR_mv_t *)0x0) {
                    uVar241 = 0;
                    iVar71 = 0;
                    do {
                      if (pVVar166->els_num <= uVar241) {
                        pVVar90 = pgVar120->curr_cfg->reg_info;
                        if (pVVar90 == (VARR_reg_info_t *)0x0) {
                          pMStack_4a0 = (MIR_context_t)0x14f7a2;
                          generate_func_code_cold_86();
LAB_0014f7a2:
                          pMStack_4a0 = (MIR_context_t)0x14f7c1;
                          __assert_fail("label_bb_insn->bb != last_label_bb_insn->bb",
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0x1a21,"void jump_opt(gen_ctx_t)");
                        }
                        uVar70 = pgVar120->curr_cfg->max_var;
                        if (uVar70 < 0x22) goto LAB_0014c3eb;
                        pVVar162 = pcVar165->first_coalesced_reg;
                        if ((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                           (pMVar109 = pVVar162->varr, pMVar109 == (MIR_reg_t *)0x0))
                        goto LAB_0014f3c5;
                        prVar91 = pVVar90->varr;
                        uVar241 = pVVar162->els_num;
                        uVar234 = 0x22;
                        goto LAB_0014c3b3;
                      }
                      if (pVVar166->varr == (mv_t *)0x0) goto LAB_0014f264;
                      pbVar85 = pVVar166->varr[uVar241].bb_insn;
                      uVar70 = *(uint *)&pbVar85->insn[1].insn_link.next;
                      uVar234 = (ulong)uVar70;
                      if (uVar234 < 0x22) goto LAB_0014f269;
                      uVar73 = pbVar85->insn->ops[0].u.reg;
                      uVar215 = (ulong)uVar73;
                      if (uVar73 < 0x22) goto LAB_0014f269;
                      pVVar162 = pcVar165->first_coalesced_reg;
                      if (((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                          (pMVar109 = pVVar162->varr, pMVar109 == (MIR_reg_t *)0x0)) ||
                         (uVar111 = pVVar162->els_num, uVar111 <= uVar234)) goto LAB_0014f165;
                      if (uVar111 <= uVar215) {
                        pMStack_4a0 = (MIR_context_t)0x14f28d;
                        generate_func_code_cold_87();
                        goto LAB_0014f28d;
                      }
                      uVar76 = pMVar109[uVar234];
                      uVar216 = (ulong)uVar76;
                      uVar240 = pMVar109[uVar215];
                      uVar212 = (ulong)uVar240;
                      if (uVar76 == uVar240) {
                        iVar71 = iVar71 + 1;
                        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                           (1 < pgVar120->debug_level)) {
                          pMStack_4a0 = (MIR_context_t)0x14bfba;
                          fprintf((FILE *)pgVar120->debug_file,
                                  "Coalescing move r%d-r%d (freq=%llud):",uVar234,uVar215);
                          pMStack_4a0 = (MIR_context_t)0x14bfca;
                          print_bb_insn(pgVar120,pbVar85,1);
                        }
                      }
                      else {
                        if (uVar111 <= uVar216) goto LAB_0014f3fd;
                        if (pMVar109[uVar216] != uVar76) goto LAB_0014f402;
                        if (uVar111 <= uVar212) {
                          pMStack_4a0 = (MIR_context_t)0x14f426;
                          generate_func_code_cold_89();
LAB_0014f426:
                          pMStack_4a0 = (MIR_context_t)0x14f445;
                          __assert_fail("var2 == (VARR_MIR_reg_tget (gen_ctx->coalesce_ctx->first_coalesced_reg, var2))"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0x1a94,
                                        "int var_conflict_p(gen_ctx_t, MIR_reg_t, MIR_reg_t)");
                        }
                        if (pMVar109[uVar212] != uVar240) goto LAB_0014f426;
                        pVVar162 = pcVar165->next_coalesced_reg;
                        if (((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                            (pVVar162->varr == (MIR_reg_t *)0x0)) || (pVVar162->els_num <= uVar216))
                        goto LAB_0014f1cf;
                        MVar69 = pVVar162->varr[uVar216];
                        pMStack_4a0 = (MIR_context_t)0x14c051;
                        iVar77 = var_to_scan_var((gen_ctx_t)pgVar120->lr_ctx,MVar69);
                        pcVar165 = pgVar120->coalesce_ctx;
                        while( true ) {
                          pVVar162 = pcVar165->next_coalesced_reg;
                          if (((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                              (pVVar162->varr == (MIR_reg_t *)0x0)) ||
                             (pVVar162->els_num <= uVar212)) {
                            pMStack_4a0 = (MIR_context_t)0x14f120;
                            generate_func_code_cold_100();
                            goto LAB_0014f120;
                          }
                          puVar230 = pVVar162->varr + uVar212;
                          pgVar211 = (gen_ctx_t)pgVar120->lr_ctx;
                          while( true ) {
                            uVar203 = *puVar230;
                            pMStack_4a0 = (MIR_context_t)0x14c09c;
                            iVar78 = var_to_scan_var(pgVar211,uVar203);
                            ppMVar64 = local_360;
                            iVar232 = iVar78;
                            if (iVar78 < iVar77) {
                              iVar232 = iVar77;
                            }
                            if (iVar77 < iVar78) {
                              iVar78 = iVar77;
                            }
                            pcVar165 = pgVar120->coalesce_ctx;
                            pVVar92 = pcVar165->conflict_matrix;
                            if (pVVar92 == (bitmap_t)0x0) goto LAB_0014efe9;
                            pgVar211 = (gen_ctx_t)pgVar120->lr_ctx;
                            uVar111 = (ulong)(iVar78 * *(int *)((long)&pgVar211->ctx + 4) + iVar232)
                            ;
                            if ((uVar111 < pVVar92->els_num << 6) &&
                               ((pVVar92->varr[uVar111 >> 6] >> (uVar111 & 0x3f) & 1) != 0))
                            goto LAB_0014c1ca;
                            if (uVar203 == uVar240) break;
                            pVVar162 = pcVar165->next_coalesced_reg;
                            if (((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                                (pVVar162->varr == (MIR_reg_t *)0x0)) ||
                               (pVVar162->els_num <= (ulong)uVar203)) goto LAB_0014efe4;
                            puVar230 = pVVar162->varr + uVar203;
                          }
                          if (MVar69 == uVar76) break;
                          pVVar162 = pcVar165->next_coalesced_reg;
                          if (((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                              (pVVar162->varr == (MIR_reg_t *)0x0)) ||
                             (pVVar162->els_num <= (ulong)MVar69)) goto LAB_0014f174;
                          MVar69 = pVVar162->varr[MVar69];
                          pMStack_4a0 = (MIR_context_t)0x14c161;
                          iVar77 = var_to_scan_var(pgVar211,MVar69);
                          pcVar165 = pgVar120->coalesce_ctx;
                        }
                        pMStack_4a0 = (MIR_context_t)0x14c19c;
                        pcVar79 = MIR_reg_hard_reg_name
                                            (pMVar14,uVar76 - 0x21,((*local_360)->u).func);
                        if (pcVar79 != (char *)0x0) {
                          pMStack_4a0 = (MIR_context_t)0x14c1b5;
                          pcVar79 = MIR_reg_hard_reg_name
                                              (pMVar14,uVar240 - 0x21,((*ppMVar64)->u).func);
                          if (pcVar79 != (char *)0x0) goto LAB_0014c1ca;
                        }
                        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                           (1 < pgVar120->debug_level)) {
                          pMStack_4a0 = (MIR_context_t)0x14c220;
                          fprintf((FILE *)pgVar120->debug_file,
                                  "Coalescing move r%d-r%d (freq=%llu):",uVar234,(ulong)uVar73);
                          pMStack_4a0 = (MIR_context_t)0x14c235;
                          print_bb_insn(pgVar120,pbVar85,1);
                        }
                        pVVar162 = pgVar120->coalesce_ctx->first_coalesced_reg;
                        if (((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                            (pMVar109 = pVVar162->varr, pMVar109 == (MIR_reg_t *)0x0)) ||
                           (pVVar162->els_num <= uVar234)) goto LAB_0014f774;
                        if (pVVar162->els_num <= uVar215) goto LAB_0014f813;
                        iVar71 = iVar71 + 1;
                        uVar76 = pMVar109[uVar234];
                        uVar111 = (ulong)uVar76;
                        uVar240 = pMVar109[uVar215];
                        if (uVar240 != uVar76) {
                          pMStack_4a0 = (MIR_context_t)0x14c298;
                          pcVar79 = MIR_reg_hard_reg_name
                                              (pgVar120->ctx,uVar240 - 0x21,
                                               (pgVar120->curr_func_item->u).func);
                          if (pcVar79 == (char *)0x0) {
                            pMStack_4a0 = (MIR_context_t)0x14c2b1;
                            pcVar79 = MIR_reg_hard_reg_name
                                                (pgVar120->ctx,uVar76 - 0x21,
                                                 (pgVar120->curr_func_item->u).func);
                            if ((pcVar79 == (char *)0x0) && (uVar240 < uVar76)) goto LAB_0014c2c2;
                          }
                          else {
LAB_0014c2c2:
                            uVar111 = (ulong)uVar240;
                            uVar215 = uVar234;
                            uVar73 = uVar70;
                          }
                          pVVar162 = pgVar120->coalesce_ctx->next_coalesced_reg;
                          if (((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                              (pMVar109 = pVVar162->varr, pMVar109 == (MIR_reg_t *)0x0)) ||
                             (uVar234 = pVVar162->els_num, uVar234 <= uVar215)) {
                            pMStack_4a0 = (MIR_context_t)0x14f7ea;
                            generate_func_code_cold_97();
LAB_0014f7ea:
                            pMStack_4a0 = (MIR_context_t)0x14f809;
                            __assert_fail("*var_op_ref1 != ((void*)0) && (*var_op_ref1)->mode == MIR_OP_VAR && *var_op_ref2 == ((void*)0)"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1601,
                                          "int var_plus_var(gen_ctx_t, ssa_edge_t, bb_t, MIR_op_t **, MIR_op_t **)"
                                         );
                          }
                          pVVar162 = pgVar120->coalesce_ctx->first_coalesced_reg;
                          if ((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
                             (pMVar26 = pVVar162->varr, pMVar26 == (MIR_reg_t *)0x0))
                          goto LAB_0014f52b;
                          uVar212 = pVVar162->els_num;
                          uVar70 = uVar73;
                          while( true ) {
                            uVar216 = (ulong)uVar70;
                            uVar70 = pMVar109[uVar215];
                            uVar215 = (ulong)uVar70;
                            if (uVar212 <= uVar215) goto LAB_0014f52b;
                            pMVar26[uVar215] = (MIR_reg_t)uVar111;
                            if (uVar70 == uVar73) break;
                            if (uVar234 <= uVar215) goto LAB_0014f530;
                          }
                          if (uVar234 <= uVar111) goto LAB_0014f862;
                          MVar69 = pMVar109[uVar111];
                          pMVar109[uVar111] = uVar73;
                          if (uVar234 <= uVar216) goto LAB_0014f867;
                          pMVar109[uVar216] = MVar69;
                        }
                      }
LAB_0014c1ca:
                      pcVar165 = pgVar120->coalesce_ctx;
                      uVar241 = uVar241 + 1;
                      pVVar166 = pcVar165->moves;
                    } while (pVVar166 != (VARR_mv_t *)0x0);
                  }
LAB_0014f25f:
                  pMStack_4a0 = (MIR_context_t)0x14f264;
                  generate_func_code_cold_104();
LAB_0014f264:
                  pMStack_4a0 = (MIR_context_t)0x14f269;
                  generate_func_code_cold_103();
LAB_0014f269:
                  pMStack_4a0 = (MIR_context_t)0x14f288;
                  __assert_fail("sreg > ST1_HARD_REG && dreg > ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x1aff,"void coalesce(gen_ctx_t)");
                }
                goto LAB_0014f737;
              }
            }
            pMStack_4a0 = (MIR_context_t)0x14f737;
            generate_func_code_cold_108();
LAB_0014f737:
            pMStack_4a0 = (MIR_context_t)0x14f73c;
            generate_func_code_cold_105();
LAB_0014f73c:
            pMStack_4a0 = (MIR_context_t)0x14f75b;
            __assert_fail("dest_var != (4294967295U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0xa95,"void make_conventional_ssa(gen_ctx_t)");
          }
        }
      }
LAB_0014c760:
      pgVar120->lr_ctx->scan_vars_num = 0;
      pMStack_4a0 = (MIR_context_t)0x14c77e;
      calculate_func_cfg_live_info(pgVar120,1);
      pcVar79 = "Live info before RA";
      pMStack_4a0 = (MIR_context_t)0x14c79b;
      print_live_info(pgVar120,"Live info before RA",(uint)(pgVar120->optimize_level != 0),1);
      pMStack_4a0 = (MIR_context_t)0x14c7a3;
      reg_alloc(pgVar120);
      if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
        pMStack_4a0 = (MIR_context_t)0x14c7c8;
        fwrite("+++++++++++++MIR after RA:\n",0x1b,1,(FILE *)pgVar120->debug_file);
        pcVar79 = &DAT_00000001;
        pMStack_4a0 = (MIR_context_t)0x14c7e2;
        print_CFG(pgVar120,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      uVar70 = pgVar120->optimize_level;
      if ((local_33c != 0 && uVar70 < 2) &&
         (pcVar79 = (char *)((((*local_360)->u).func)->insns).head,
         (loop_node_t_conflict)pcVar79 != (loop_node_t_conflict)0x0)) {
        do {
          plVar104 = ((loop_node_t_conflict)pcVar79)->entry;
          if (*(int *)&((loop_node_t_conflict)pcVar79)->parent - 0xb6U < 3) {
            pMStack_4a0 = (MIR_context_t)0x14c82d;
            remove_property_insn(pgVar120,(MIR_insn_t)pcVar79);
          }
          pcVar79 = (char *)plVar104;
        } while (plVar104 != (loop_node_t)0x0);
        uVar70 = pgVar120->optimize_level;
        pcVar79 = (char *)0x0;
      }
      if (uVar70 == 0) goto LAB_0014dbe5;
      pgVar120->lr_ctx->scan_vars_num = 0;
      pMStack_4a0 = (MIR_context_t)0x14c858;
      calculate_func_cfg_live_info(pgVar120,0);
      pMStack_4a0 = (MIR_context_t)0x14c860;
      add_bb_insn_dead_vars(pgVar120);
      pMStack_4a0 = (MIR_context_t)0x14c873;
      print_live_info(pgVar120,"Live info before combine",0,0);
      pMVar14 = pgVar120->ctx;
      local_2e8[0] = (bb_insn_t)0x0;
      if (pgVar120->optimize_level == 0) goto LAB_0014f612;
      lVar207 = 0;
      for (pbVar81 = (pgVar120->curr_cfg->bbs).head; pbVar81 != (bb_t_conflict)0x0;
          pbVar81 = (pbVar81->bb_link).next) {
        do {
          if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x14c8df;
            fprintf((FILE *)pgVar120->debug_file,"Processing bb%lu\n",pbVar81->index);
          }
          pcVar180 = pgVar120->combine_ctx;
          psVar146 = &pcVar180->curr_bb_var_ref_age;
          *psVar146 = *psVar146 + 1;
          pcVar180->last_mem_ref_insn_num = 0;
          pbVar201 = (pbVar81->bb_insns).head;
          local_398._0_4_ = SUB84(pbVar201,0);
          local_398._4_4_ = (undefined4)((ulong)pbVar201 >> 0x20);
          if (pbVar201 == (bb_insn_t)0x0) break;
          bVar250 = true;
          bVar196 = false;
          local_400 = (MIR_context_t)0x1;
          do {
            pMVar83 = pbVar201->insn;
            pbVar114 = (pbVar201->bb_insn_link).next;
            pMStack_4a0 = (MIR_context_t)0x14c951;
            sVar233 = MIR_insn_nops(pMVar14,pMVar83);
            pMVar118 = *(MIR_insn_t *)&pMVar83->field_0x18;
            if ((int)pMVar118 == 0xb4) {
              bVar252 = !bVar250;
              bVar250 = true;
              if (bVar252) {
                if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                  pMStack_4a0 = (MIR_context_t)0x14c990;
                  fwrite("  Remove label inside BB ",0x19,1,(FILE *)pgVar120->debug_file);
                  pMStack_4a0 = (MIR_context_t)0x14c9a5;
                  print_bb_insn(pgVar120,pbVar201,1);
                }
                pMStack_4a0 = (MIR_context_t)0x14c9b0;
                gen_delete_insn(pgVar120,pMVar83);
                bVar250 = false;
              }
            }
            else {
              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                pMStack_4a0 = (MIR_context_t)0x14c9e0;
                fwrite("  Processing ",0xd,1,(FILE *)pgVar120->debug_file);
                pMStack_4a0 = (MIR_context_t)0x14c9f5;
                print_bb_insn(pgVar120,pbVar201,1);
                pMVar118 = *(MIR_insn_t *)&pMVar83->field_0x18;
              }
              lVar207 = lVar207 + 1;
              if ((int)pMVar118 - 0xb6U < 3) {
                bVar250 = false;
                if (local_33c != 0) {
                  pMStack_4a0 = (MIR_context_t)0x14ca23;
                  remove_property_insn(pgVar120,pMVar83);
                  bVar250 = false;
                }
                goto LAB_0014cdf4;
              }
              pMStack_4a0 = (MIR_context_t)0x14ca3d;
              target_get_early_clobbered_hard_regs(pMVar118,&local_2b8,(MIR_reg_t *)local_258);
              if (local_2b8 != 0xffffffff) {
                pMStack_4a0 = (MIR_context_t)0x14ca64;
                setup_var_ref(pgVar120,local_2b8,pMVar83,0,(size_t)local_400,1);
              }
              if (local_258._0_4_ != 0xffffffff) {
                pMStack_4a0 = (MIR_context_t)0x14ca8b;
                setup_var_ref(pgVar120,local_258._0_4_,pMVar83,0,(size_t)local_400,1);
              }
              uVar241 = *(ulong *)&pMVar83->field_0x18;
              uVar70 = (uint)uVar241;
              if (uVar70 - 0xaa < 0xfffffffd) {
                if (uVar70 == 0xab) goto LAB_0014cc59;
                if (uVar70 == 0xb1) goto LAB_0014cc40;
                pMVar118 = pbVar201->insn;
                uVar234 = *(ulong *)&pMVar118->field_0x18;
                uVar73 = (int)uVar234 - 4;
                if ((uVar73 < 6) && (*(char *)&pMVar118[1].insn_link.prev == '\x02')) {
                  uVar76 = *(uint *)(&DAT_001b1a48 + (ulong)uVar73 * 4);
                  pMStack_4a0 = (MIR_context_t)0x14cb13;
                  iVar71 = safe_var_substitution_p
                                     (pgVar120,*(MIR_reg_t *)&pMVar118[1].insn_link.next,pbVar201);
                  if (iVar71 != 0) {
                    uVar240 = *(uint *)&pMVar118[1].insn_link.next;
                    pvVar182 = pgVar120->combine_ctx->var_refs_addr;
                    pMVar88 = pvVar182[uVar240].insn;
                    iVar71 = *(int *)&pMVar88->field_0x18;
                    uVar203 = iVar71 - 4;
                    if (uVar203 < 6) {
                      uVar203 = *(uint *)(&DAT_001b1a48 + (ulong)uVar203 * 4);
                      uVar4 = pMVar88[1].data;
                      uVar8 = pMVar88[1].insn_link.prev;
                      uVar10 = pMVar88[1].insn_link.next;
                      op.u.i = uVar10;
                      op._8_8_ = uVar8;
                      uVar12 = *(undefined8 *)&pMVar88[1].field_0x18;
                      op.u.str.s = (char *)uVar12;
                      op.data = (void *)uVar4;
                      auVar6 = *(undefined1 (*) [32])&pMVar88[1].insn_link.next;
                      pMStack_4a0 = (MIR_context_t)0x14cb95;
                      op.u._16_8_ = auVar6._16_8_;
                      op.u.mem.disp = auVar6._24_8_;
                      iVar77 = obsolete_op_p(pgVar120,op,pvVar182[uVar240].insn_num);
                      if (iVar77 == 0) {
                        pMVar89 = pMVar118 + 1;
                        pMVar33 = pMVar88 + 1;
                        if (uVar203 < uVar76) {
                          if ((uVar73 < 3) || (iVar71 - 7U < 0xfffffffd)) {
                            pMVar36 = pMVar118[1].insn_link.prev;
                            pMStack_208 = pMVar118[1].insn_link.next;
                            apMStack_200[0] = *(MIR_insn_t_conflict *)&pMVar118[1].field_0x18;
                            apMStack_200[1] = (MIR_insn_t_conflict)pMVar118[1].ops[0].data;
                            apMStack_200[2] = *(MIR_insn_t_conflict *)&pMVar118[1].ops[0].field_0x8;
                            local_218.tv_sec._0_4_ = (uint)pMVar89->data;
                            local_218.tv_sec._4_4_ = (undefined4)((ulong)pMVar89->data >> 0x20);
                            local_218.tv_usec._0_4_ = SUB84(pMVar36,0);
                            local_218.tv_usec._4_4_ = (undefined4)((ulong)pMVar36 >> 0x20);
                            pvVar217 = pMVar33->data;
                            pMVar36 = pMVar88[1].insn_link.prev;
                            pMVar37 = pMVar88[1].insn_link.next;
                            uVar214 = *(undefined8 *)&pMVar88[1].field_0x18;
                            uVar38 = *(undefined8 *)&pMVar88[1].field_0x18;
                            pvVar228 = pMVar88[1].ops[0].data;
                            uVar39 = *(undefined8 *)&pMVar88[1].ops[0].field_0x8;
                            pMVar118[1].insn_link.next = pMVar88[1].insn_link.next;
                            *(undefined8 *)&pMVar118[1].field_0x18 = uVar38;
                            pMVar118[1].ops[0].data = pvVar228;
                            *(undefined8 *)&pMVar118[1].ops[0].field_0x8 = uVar39;
                            pMVar89->data = pvVar217;
                            pMVar118[1].insn_link.prev = pMVar36;
                            pMVar118[1].insn_link.next = pMVar37;
                            *(undefined8 *)&pMVar118[1].field_0x18 = uVar214;
                            *(ulong *)&pMVar118->field_0x18 =
                                 *(ulong *)&pMVar118->field_0x18 & 0xffffffff00000000 |
                                 (ulong)*(uint *)&pMVar88->field_0x18;
                            pMStack_4a0 = (MIR_context_t)0x14d030;
                            iVar71 = find_insn_pattern(pgVar120,pMVar118,(int *)0x0);
                            uVar49 = local_218.tv_sec._4_4_;
                            uVar47 = (uint)local_218.tv_sec;
                            uVar48 = CONCAT44(uVar49,uVar47);
                            uVar50 = (undefined4)local_218.tv_usec;
                            auVar262._8_4_ = uVar50;
                            auVar262._0_8_ = uVar48;
                            uVar51 = local_218.tv_usec._4_4_;
                            auVar262._12_4_ = uVar51;
                            uVar52 = pMStack_208;
                            auVar262._16_8_ = uVar52;
                            auVar60._8_8_ = apMStack_200[0];
                            auVar60._0_8_ = pMStack_208;
                            auVar60._16_8_ = apMStack_200[1];
                            auVar60._24_8_ = apMStack_200[2];
                            pMVar89->data = (void *)uVar48;
                            (pMVar89->insn_link).prev = (MIR_insn_t)SUB168(auVar262._8_16_,0);
                            (pMVar89->insn_link).next = (MIR_insn_t)SUB168(auVar262._8_16_,8);
                            *(MIR_insn_t_conflict *)&pMVar89->field_0x18 = apMStack_200[0];
                            *(undefined1 (*) [32])&pMVar118[1].insn_link.next = auVar60;
                            uVar215 = *(ulong *)&pMVar118->field_0x18 & 0xffffffff00000000;
                            *(ulong *)&pMVar118->field_0x18 = uVar234 & 0xffffffff | uVar215;
                            if (-1 < iVar71) {
                              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                                 (1 < pgVar120->debug_level)) {
                                pMStack_4a0 = (MIR_context_t)0x14d0ac;
                                fwrite("      changing ",0xf,1,(FILE *)pgVar120->debug_file);
                                pMStack_4a0 = (MIR_context_t)0x14d0be;
                                print_bb_insn(pgVar120,pbVar201,0);
                                uVar215 = *(ulong *)&pMVar118->field_0x18 & 0xffffffff00000000;
                              }
                              pvVar217 = pMVar33->data;
                              DVar62 = pMVar33->insn_link;
                              uVar214 = *(undefined8 *)&pMVar33->field_0x18;
                              *(undefined1 (*) [32])&pMVar118[1].insn_link.next =
                                   *(undefined1 (*) [32])&pMVar88[1].insn_link.next;
                              pMVar89->data = pvVar217;
                              pMVar89->insn_link = DVar62;
                              *(undefined8 *)&pMVar89->field_0x18 = uVar214;
                              *(ulong *)&pMVar118->field_0x18 =
                                   *(uint *)&pMVar88->field_0x18 | uVar215;
                              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                                 (1 < pgVar120->debug_level)) {
                                pMStack_4a0 = (MIR_context_t)0x14d133;
                                fwrite(" to ",4,1,(FILE *)pgVar120->debug_file);
                                pMStack_4a0 = (MIR_context_t)0x14d148;
                                print_bb_insn(pgVar120,pbVar201,1);
                              }
                              pMStack_4a0 = (MIR_context_t)0x14d163;
                              iVar71 = combine_delete_insn(pgVar120,pMVar88,pbVar201);
                              goto LAB_0014d21b;
                            }
                          }
                        }
                        else {
                          pMVar36 = pMVar118[1].insn_link.prev;
                          pMStack_208 = pMVar118[1].insn_link.next;
                          apMStack_200[0] = *(MIR_insn_t_conflict *)&pMVar118[1].field_0x18;
                          apMStack_200[1] = (MIR_insn_t_conflict)pMVar118[1].ops[0].data;
                          apMStack_200[2] = *(MIR_insn_t_conflict *)&pMVar118[1].ops[0].field_0x8;
                          local_218.tv_sec._0_4_ = (uint)pMVar89->data;
                          local_218.tv_sec._4_4_ = (undefined4)((ulong)pMVar89->data >> 0x20);
                          local_218.tv_usec._0_4_ = SUB84(pMVar36,0);
                          local_218.tv_usec._4_4_ = (undefined4)((ulong)pMVar36 >> 0x20);
                          pvVar217 = pMVar33->data;
                          DVar62 = pMVar33->insn_link;
                          uVar214 = *(undefined8 *)&pMVar33->field_0x18;
                          *(undefined1 (*) [32])&pMVar118[1].insn_link.next =
                               *(undefined1 (*) [32])&pMVar88[1].insn_link.next;
                          pMVar89->data = pvVar217;
                          pMVar89->insn_link = DVar62;
                          *(undefined8 *)&pMVar89->field_0x18 = uVar214;
                          pMStack_4a0 = (MIR_context_t)0x14d1b5;
                          iVar71 = find_insn_pattern(pgVar120,pMVar118,(int *)0x0);
                          if (-1 < iVar71) {
                            if (((FILE *)pgVar120->debug_file != (FILE *)0x0) &&
                               (1 < pgVar120->debug_level)) {
                              pMStack_4a0 = (MIR_context_t)0x14d1e6;
                              fwrite("      changing to ",0x12,1,(FILE *)pgVar120->debug_file);
                              pMStack_4a0 = (MIR_context_t)0x14d1fb;
                              print_bb_insn(pgVar120,pbVar201,1);
                            }
                            pMStack_4a0 = (MIR_context_t)0x14d213;
                            iVar71 = combine_delete_insn(pgVar120,pMVar88,pbVar201);
LAB_0014d21b:
                            if (iVar71 != 0) {
                              local_2e8[0] = (bb_insn_t)((long)&local_2e8[0]->insn + 1);
                            }
                            local_398._0_4_ = SUB84(pMVar118->data,0);
                            local_398._4_4_ = (undefined4)((ulong)pMVar118->data >> 0x20);
                            pMStack_4a0 = (MIR_context_t)0x14d23e;
                            sVar233 = MIR_insn_nops(pMVar14,pMVar118);
                            bVar196 = true;
                            pMVar83 = pMVar118;
                            goto LAB_0014cc59;
                          }
                          uVar55 = local_218.tv_sec._4_4_;
                          uVar53 = (uint)local_218.tv_sec;
                          uVar54 = CONCAT44(uVar55,uVar53);
                          uVar56 = (undefined4)local_218.tv_usec;
                          auVar263._8_4_ = uVar56;
                          auVar263._0_8_ = uVar54;
                          uVar57 = local_218.tv_usec._4_4_;
                          auVar263._12_4_ = uVar57;
                          uVar58 = pMStack_208;
                          auVar263._16_8_ = uVar58;
                          auVar61._8_8_ = apMStack_200[0];
                          auVar61._0_8_ = pMStack_208;
                          auVar61._16_8_ = apMStack_200[1];
                          auVar61._24_8_ = apMStack_200[2];
                          *(undefined1 (*) [32])&pMVar118[1].insn_link.next = auVar61;
                          pMVar89->data = (void *)uVar54;
                          (pMVar89->insn_link).prev = (MIR_insn_t)SUB168(auVar263._8_16_,0);
                          (pMVar89->insn_link).next = (MIR_insn_t)SUB168(auVar263._8_16_,8);
                          *(MIR_insn_t_conflict *)&pMVar89->field_0x18 = apMStack_200[0];
                        }
                      }
                    }
                  }
                }
                pMStack_4a0 = (MIR_context_t)0x14cbd0;
                iVar71 = combine_substitute(pgVar120,(bb_insn_t_conflict *)local_398,
                                            (long *)local_2e8);
                if (iVar71 == 0) {
                  uVar234 = *(ulong *)&pMVar83->field_0x18;
                  uVar215 = uVar234;
                  switch((int)uVar234) {
                  case 0x22:
                  case 0x23:
                  case 0x24:
                  case 0x25:
                  case 0x26:
                  case 0x2c:
                  case 0x2d:
                  case 0x2e:
                  case 0x2f:
                  case 0x30:
                  case 0x3c:
                  case 0x3d:
                  case 0x3e:
                  case 0x3f:
                  case 0x40:
                  case 0x41:
                  case 0x48:
                  case 0x49:
                  case 0x4a:
                  case 0x4b:
                  case 0x4c:
                  case 0x4d:
                  case 0x4e:
                  case 0x4f:
                  case 0x50:
                  case 0x51:
                  case 0x72:
                  case 0x73:
                  case 0x74:
                  case 0x75:
                  case 0x7b:
                  case 0x7c:
                  case 0x7d:
                  case 0x7e:
                  case 0x7f:
                  case 0x80:
                  case 0x81:
                  case 0x82:
                  case 0x83:
                  case 0x84:
                    break;
                  default:
                    goto switchD_0014ce50_caseD_27;
                  case 0x52:
                    uVar215 = 0x60;
                    break;
                  case 0x53:
                    uVar215 = 0x61;
                    break;
                  case 0x54:
                    uVar215 = 0x62;
                    break;
                  case 0x55:
                    uVar215 = 99;
                    break;
                  case 0x59:
                    uVar215 = 0x67;
                    break;
                  case 0x5a:
                    uVar215 = 0x68;
                    break;
                  case 0x5b:
                    uVar215 = 0x69;
                    break;
                  case 0x5c:
                    uVar215 = 0x6a;
                    break;
                  case 0x60:
                    uVar215 = 0x52;
                    break;
                  case 0x61:
                    uVar215 = 0x53;
                    break;
                  case 0x62:
                    uVar215 = 0x54;
                    break;
                  case 99:
                    uVar215 = 0x55;
                    break;
                  case 0x67:
                    uVar215 = 0x59;
                    break;
                  case 0x68:
                    uVar215 = 0x5a;
                    break;
                  case 0x69:
                    uVar215 = 0x5b;
                    break;
                  case 0x6a:
                    uVar215 = 0x5c;
                    break;
                  case 0x85:
                    uVar215 = 0x93;
                    break;
                  case 0x86:
                    uVar215 = 0x94;
                    break;
                  case 0x87:
                    uVar215 = 0x95;
                    break;
                  case 0x88:
                    uVar215 = 0x96;
                    break;
                  case 0x8c:
                    uVar215 = 0x9a;
                    break;
                  case 0x8d:
                    uVar215 = 0x9b;
                    break;
                  case 0x8e:
                    uVar215 = 0x9c;
                    break;
                  case 0x8f:
                    uVar215 = 0x9d;
                    break;
                  case 0x93:
                    uVar215 = 0x85;
                    break;
                  case 0x94:
                    uVar215 = 0x86;
                    break;
                  case 0x95:
                    uVar215 = 0x87;
                    break;
                  case 0x96:
                    uVar215 = 0x88;
                    break;
                  case 0x9a:
                    uVar215 = 0x8c;
                    break;
                  case 0x9b:
                    uVar215 = 0x8d;
                    break;
                  case 0x9c:
                    uVar215 = 0x8e;
                    break;
                  case 0x9d:
                    uVar215 = 0x8f;
                  }
                  *(ulong *)&pMVar83->field_0x18 =
                       uVar234 & 0xffffffff00000000 | uVar215 & 0xffffffff;
                  iVar34 = ((anon_union_32_12_57d33f68_for_u *)(pMVar83 + 1))->i;
                  local_338._8_8_ = pMVar83[1].insn_link.prev;
                  ppMVar35 = &pMVar83[1].insn_link.next;
                  local_338._16_8_ = *ppMVar35;
                  local_338._24_8_ = *(undefined8 *)&pMVar83[1].field_0x18;
                  aVar59 = *(anon_union_32_12_57d33f68_for_u *)(pMVar83 + 1);
                  local_338._32_8_ = pMVar83[1].ops[0].data;
                  local_338._40_8_ = *(undefined8 *)&pMVar83[1].ops[0].field_0x8;
                  auVar6 = *(undefined1 (*) [32])ppMVar35;
                  local_338._0_4_ = (undefined4)iVar34;
                  local_338._4_4_ = (undefined4)((ulong)iVar34 >> 0x20);
                  pvVar217 = (void *)pMVar83[1].ops[0].u.i;
                  pMVar118 = (MIR_insn_t)pMVar83[1].ops[0].u.str.s;
                  pMVar88 = *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10);
                  MVar31 = pMVar83[1].ops[0].u.mem.disp;
                  MVar32 = pMVar83[1].ops[0].u.mem.disp;
                  pvVar228 = pMVar83[2].data;
                  pMVar89 = pMVar83[2].insn_link.prev;
                  pMVar83[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10);
                  *(MIR_disp_t *)&pMVar83[1].field_0x18 = MVar32;
                  pMVar83[1].ops[0].data = pvVar228;
                  *(MIR_insn_t *)&pMVar83[1].ops[0].field_0x8 = pMVar89;
                  pMVar83[1].data = pvVar217;
                  pMVar83[1].insn_link.prev = pMVar118;
                  pMVar83[1].insn_link.next = pMVar88;
                  *(MIR_disp_t *)&pMVar83[1].field_0x18 = MVar31;
                  pMVar83[1].ops[0].u = aVar59;
                  *(undefined1 (*) [32])((long)&pMVar83[1].ops[0].u + 0x10) = auVar6;
                  pMStack_4a0 = (MIR_context_t)0x14ced9;
                  iVar71 = combine_substitute(pgVar120,(bb_insn_t_conflict *)local_398,
                                              (long *)local_2e8);
                  if (iVar71 != 0) {
                    puVar113 = (undefined8 *)CONCAT44(local_398._4_4_,local_398._0_4_);
                    goto LAB_0014cee5;
                  }
                  paVar204 = (anon_union_32_12_57d33f68_for_u *)(pMVar83 + 1);
                  paVar235 = &pMVar83[1].ops[0].u;
                  *(ulong *)&pMVar83->field_0x18 =
                       *(ulong *)&pMVar83->field_0x18 & 0xffffffff00000000 | uVar241 & 0xffffffff;
                  local_338._8_8_ = pMVar83[1].insn_link.prev;
                  ppMVar35 = &pMVar83[1].insn_link.next;
                  local_338._16_8_ = *ppMVar35;
                  local_338._24_8_ = *(undefined8 *)&pMVar83[1].field_0x18;
                  aVar59 = *paVar204;
                  local_338._32_8_ = pMVar83[1].ops[0].data;
                  local_338._40_8_ = *(undefined8 *)&pMVar83[1].ops[0].field_0x8;
                  auVar6 = *(undefined1 (*) [32])ppMVar35;
                  local_338._0_4_ = (undefined4)paVar204->i;
                  local_338._4_4_ = (undefined4)((ulong)paVar204->i >> 0x20);
                  iVar34 = paVar235->i;
                  pMVar118 = (MIR_insn_t)pMVar83[1].ops[0].u.str.s;
                  pMVar88 = *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10);
                  MVar31 = pMVar83[1].ops[0].u.mem.disp;
                  MVar32 = pMVar83[1].ops[0].u.mem.disp;
                  pvVar217 = pMVar83[2].data;
                  pMVar89 = pMVar83[2].insn_link.prev;
                  pMVar83[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10);
                  *(MIR_disp_t *)&pMVar83[1].field_0x18 = MVar32;
                  pMVar83[1].ops[0].data = pvVar217;
                  *(MIR_insn_t *)&pMVar83[1].ops[0].field_0x8 = pMVar89;
                  paVar204->i = iVar34;
                  pMVar83[1].insn_link.prev = pMVar118;
                  pMVar83[1].insn_link.next = pMVar88;
                  *(MIR_disp_t *)&pMVar83[1].field_0x18 = MVar31;
                  *(undefined1 (*) [32])((long)&pMVar83[1].ops[0].u + 0x10) = auVar6;
                  *paVar235 = aVar59;
switchD_0014ce50_caseD_27:
                }
                else {
                  puVar113 = (undefined8 *)CONCAT44(local_398._4_4_,local_398._0_4_);
LAB_0014cee5:
                  pMVar83 = (MIR_insn_t_conflict)*puVar113;
                  pMStack_4a0 = (MIR_context_t)0x14cef3;
                  sVar233 = MIR_insn_nops(pMVar14,pMVar83);
                  bVar196 = true;
                }
                if ((uVar70 & 0xfffffffe) == 0xae) {
                  pgVar120->combine_ctx->last_mem_ref_insn_num = (size_t)local_400;
                }
              }
              else {
                uVar241 = 0;
                do {
                  pVVar92 = pgVar120->call_used_hard_regs[0x12];
                  if (pVVar92 == (bitmap_t)0x0) goto LAB_0014efbb;
                  if ((uVar241 < pVVar92->els_num << 6) &&
                     ((*pVVar92->varr >> (uVar241 & 0x3f) & 1) != 0)) {
                    pMStack_4a0 = (MIR_context_t)0x14cc37;
                    setup_var_ref(pgVar120,(MIR_reg_t)uVar241,pMVar83,0,(size_t)local_400,1);
                  }
                  uVar241 = uVar241 + 1;
                } while (uVar241 != 0x22);
LAB_0014cc40:
                pgVar120->combine_ctx->last_mem_ref_insn_num = (size_t)local_400;
              }
LAB_0014cc59:
              bVar249 = 0;
              bVar252 = false;
              bVar65 = true;
              do {
                bVar251 = bVar65;
                if (sVar233 != 0) {
                  sVar220 = 0;
                  pMVar109 = &pMVar83->ops[0].u.mem.index;
                  do {
                    pMStack_4a0 = (MIR_context_t)0x14ccc5;
                    MIR_insn_op_mode(pMVar14,pMVar83,sVar220,local_288);
                    if (*(char *)(pMVar109 + -7) == '\v') {
                      if ((~bVar249 & 1) == 0 && local_288[0] != 0) {
                        pgVar120->combine_ctx->last_mem_ref_insn_num = (size_t)local_400;
                      }
                      else if (bVar251) {
                        pMStack_4a0 = (MIR_context_t)0x14cd83;
                        setup_var_ref(pgVar120,pMVar109[-1],pMVar83,sVar220,(size_t)local_400,0);
                        MVar69 = *pMVar109;
                        uVar70 = 0;
                        goto LAB_0014cda7;
                      }
                    }
                    else if ((*(char *)(pMVar109 + -7) == '\x02') &&
                            (bVar252 != (local_288[0] == 0))) {
                      MVar69 = *(MIR_reg_t *)(pMVar109 + -5);
                      uVar70 = (uint)bVar249;
LAB_0014cda7:
                      pMStack_4a0 = (MIR_context_t)0x14cdac;
                      setup_var_ref(pgVar120,MVar69,pMVar83,sVar220,(size_t)local_400,uVar70);
                    }
                    sVar220 = sVar220 + 1;
                    pMVar109 = pMVar109 + 0xc;
                  } while (sVar233 != sVar220);
                }
                bVar250 = false;
                bVar252 = true;
                bVar249 = 1;
                bVar65 = false;
              } while (bVar251);
            }
LAB_0014cdf4:
            local_400 = (MIR_context_t)((long)local_400 + 1);
            local_398._0_4_ = SUB84(pbVar114,0);
            local_398._4_4_ = (undefined4)((ulong)pbVar114 >> 0x20);
            pbVar201 = pbVar114;
          } while (pbVar114 != (bb_insn_t)0x0);
        } while (bVar196);
      }
      pFVar112 = (FILE *)pgVar120->debug_file;
      if (pFVar112 != (FILE *)0x0) {
        if (0 < pgVar120->debug_level) {
          pMStack_4a0 = (MIR_context_t)0x14d428;
          fprintf(pFVar112,"%5ld deleted combine insns out of %ld (%.1f%%)\n",local_2e8[0],lVar207);
          pFVar112 = (FILE *)pgVar120->debug_file;
          if (pFVar112 == (FILE *)0x0) goto LAB_0014d467;
        }
        if (1 < pgVar120->debug_level) {
          pMStack_4a0 = (MIR_context_t)0x14d450;
          fwrite("+++++++++++++MIR after combine:\n",0x20,1,pFVar112);
          pMStack_4a0 = (MIR_context_t)0x14d467;
          print_CFG(pgVar120,0,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
      }
LAB_0014d467:
      pcVar79 = (char *)pgVar120->curr_func_item->module;
      pMStack_4a0 = (MIR_context_t)0x14d47b;
      puVar113 = (undefined8 *)
                 _MIR_get_module_global_var_hard_regs(pgVar120->ctx,(MIR_module_t_conflict)pcVar79);
      if (pgVar120->optimize_level == 0) {
        pMStack_4a0 = (MIR_context_t)0x14f650;
        __assert_fail("gen_ctx->optimize_level > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x23b8,"void dead_code_elimination(gen_ctx_t)");
      }
      if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
        pcVar79 = (char *)0x24;
        pMStack_4a0 = (MIR_context_t)0x14d4b2;
        fwrite("+++++++++++++Dead code elimination:\n",0x24,1,(FILE *)pgVar120->debug_file);
      }
      pMStack_4a0 = (MIR_context_t)0x14d4bc;
      plVar222 = (loop_node_t_conflict)malloc(0x18);
      *(void **)&plVar222->index = (void *)0x0;
      ((DLIST_LINK_MIR_insn_t *)&plVar222->bb)->prev = (MIR_insn_t)0x4;
      pMStack_4a0 = (MIR_context_t)0x14d4d8;
      plVar104 = (loop_node_t)malloc(0x20);
      plVar222->entry = plVar104;
      pbVar81 = (pgVar120->curr_cfg->bbs).head;
      if (pbVar81 == (bb_t_conflict)0x0) {
        local_3c8 = 0;
      }
      else {
        local_3c8 = 0;
        do {
          pVVar92 = pbVar81->out;
          if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f1b1;
          pvVar217 = *(void **)&plVar222->index;
          pvVar228 = (void *)pVVar92->els_num;
          if (pvVar217 < pvVar228) {
            plVar104 = plVar222->entry;
            lVar207 = (long)((ulong)pvVar228 & 0x3ffffffffffffff) - (long)pvVar217;
            if (pvVar217 <= (void *)((ulong)pvVar228 & 0x3ffffffffffffff) && lVar207 != 0) {
              do {
                if (plVar104 == (loop_node_t)0x0) {
                  pMStack_4a0 = (MIR_context_t)0x14f01d;
                  generate_func_code_cold_121();
LAB_0014f01d:
                  pMStack_4a0 = (MIR_context_t)0x14f022;
                  generate_func_code_cold_68();
LAB_0014f022:
                  pMStack_4a0 = (MIR_context_t)0x14f041;
                  __assert_fail("level >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x1748,"int bb_loop_level(bb_t)");
                }
                pvVar217 = *(void **)&plVar222->index;
                pMVar118 = (MIR_insn_t)((long)pvVar217 + 1);
                if (((DLIST_LINK_MIR_insn_t *)&plVar222->bb)->prev < pMVar118) {
                  pMVar118 = (MIR_insn_t)((long)pMVar118->ops + (((ulong)pMVar118 >> 1) - 0x20));
                  pMStack_4a0 = (MIR_context_t)0x14d559;
                  plVar104 = (loop_node_t)realloc(plVar104,(long)pMVar118 * 8);
                  plVar222->entry = plVar104;
                  ((DLIST_LINK_MIR_insn_t *)&plVar222->bb)->prev = pMVar118;
                  pvVar217 = *(void **)&plVar222->index;
                  pMVar118 = (MIR_insn_t)((long)pvVar217 + 1);
                }
                lVar207 = lVar207 + -1;
                *(MIR_insn_t *)&plVar222->index = pMVar118;
                *(void **)((long)&plVar104->index + pvVar217 * 8) = (void *)0x0;
              } while (lVar207 != 0);
            }
          }
          else {
            plVar104 = plVar222->entry;
            if (plVar104 == (loop_node_t)0x0) goto LAB_0014f231;
            *(void **)&plVar222->index = pvVar228;
          }
          pcVar79 = (char *)pVVar92->varr;
          pMStack_4a0 = (MIR_context_t)0x14d59d;
          memcpy(plVar104,pcVar79,(long)pvVar228 << 3);
          pbVar201 = (pbVar81->bb_insns).tail;
LAB_0014d5aa:
          pbVar114 = pbVar201;
          if (pbVar114 != (bb_insn_t)0x0) {
            insn = (loop_node_t_conflict)pbVar114->insn;
            pbVar201 = (pbVar114->bb_insn_link).prev;
            plVar104 = insn->parent;
            uVar241 = (ulong)plVar104 >> 0x20;
            if (uVar241 == 0) {
LAB_0014d842:
              if (0xfffffffc < (int)plVar104 - 0xaaU) {
LAB_0014d850:
                pMStack_4a0 = (MIR_context_t)0x14d862;
                bitmap_and_compl((bitmap_t)plVar222,(bitmap_t)plVar222,
                                 pgVar120->call_used_hard_regs[0x12]);
                if (puVar113 != (undefined8 *)0x0) {
                  pvVar217 = *(void **)&plVar222->index;
                  pvVar228 = (void *)*puVar113;
                  pvVar236 = pvVar228;
                  if (pvVar228 < pvVar217) {
                    pvVar236 = pvVar217;
                  }
                  pMStack_4a0 = (MIR_context_t)0x14d899;
                  bitmap_expand((bitmap_t)plVar222,(long)pvVar236 << 6);
                  plVar104 = plVar222->entry;
                  if (pvVar236 == (void *)0x0) {
                    if (plVar104 != (loop_node_t)0x0) {
                      pvVar202 = (void *)0x0;
                      goto LAB_0014d903;
                    }
                  }
                  else {
                    lVar207 = puVar113[2];
                    pvVar202 = (void *)0x0;
                    pvVar227 = (void *)0x0;
                    do {
                      pvVar229 = (void *)0x0;
                      if (pvVar227 < pvVar217) {
                        pvVar229 = *(void **)((long)&plVar104->index + pvVar227 * 8);
                      }
                      uVar241 = 0;
                      if (pvVar227 < pvVar228) {
                        uVar241 = *(ulong *)(lVar207 + (long)pvVar227 * 8);
                      }
                      pvVar1 = (void *)((long)pvVar227 + 1);
                      if ((void *)(uVar241 | (ulong)pvVar229) != (void *)0x0) {
                        pvVar202 = pvVar1;
                      }
                      *(void **)((long)&plVar104->index + pvVar227 * 8) =
                           (void *)(uVar241 | (ulong)pvVar229);
                      pvVar227 = pvVar1;
                    } while (pvVar236 != pvVar1);
                    if (pvVar202 <= *(void **)&plVar222->index) {
LAB_0014d903:
                      *(void **)&plVar222->index = pvVar202;
                      goto LAB_0014d906;
                    }
                  }
                  pMStack_4a0 = (MIR_context_t)0x14f046;
                  generate_func_code_cold_119();
LAB_0014f046:
                  pMStack_4a0 = (MIR_context_t)0x14f04b;
                  generate_func_code_cold_25();
                  goto LAB_0014f04b;
                }
              }
            }
            else {
              bVar250 = false;
              sVar233 = 0;
              bVar196 = true;
              do {
                paVar204 = (anon_union_32_12_57d33f68_for_u *)&(&insn->children)[sVar233 * 3].tail;
                while( true ) {
                  pMStack_4a0 = (MIR_context_t)0x14d628;
                  MIR_insn_op_mode(pgVar120->ctx,(MIR_insn_t_conflict)insn,sVar233,(int *)&local_218
                                  );
                  if (((uint)local_218.tv_sec != 0) && ((char)(&paVar204->reg)[-2] != '\v')) break;
                  sVar233 = sVar233 + 1;
                  paVar204 = (anon_union_32_12_57d33f68_for_u *)(&paVar204->reg + 0xc);
                  if (uVar241 <= sVar233) goto LAB_0014d6d7;
                }
                if ((char)(&paVar204->reg)[-2] != '\x02') {
LAB_0014efc0:
                  pMStack_4a0 = (MIR_context_t)0x14efdf;
                  __assert_fail("op_ref->mode == MIR_OP_VAR",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x4ff,
                                "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                               );
                }
                uVar70 = paVar204->reg;
                uVar234 = (ulong)uVar70;
                if ((uVar234 < (ulong)((long)*(void **)&plVar222->index << 6)) &&
                   (pvVar217 = *(void **)((long)&plVar222->entry->index + (ulong)(uVar70 >> 6) * 8),
                   *(void **)((long)&plVar222->entry->index + (ulong)(uVar70 >> 6) * 8) =
                        (void *)((ulong)pvVar217 & ~(1L << (uVar234 & 0x3f))),
                   ((ulong)pvVar217 >> (uVar234 & 0x3f) & 1) != 0)) {
LAB_0014d6b9:
                  bVar250 = false;
                }
                else {
                  pVVar92 = pgVar120->addr_regs;
                  if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f055;
                  bVar250 = bVar196;
                  if ((uVar234 < pVVar92->els_num << 6) &&
                     ((pVVar92->varr[uVar70 >> 6] >> (uVar234 & 0x3f) & 1) != 0)) goto LAB_0014d6b9;
                }
                sVar233 = sVar233 + 1;
                bVar196 = bVar250;
              } while (sVar233 < uVar241);
LAB_0014d6d7:
              plVar104 = insn->parent;
              if (!bVar250) goto LAB_0014d842;
              iVar71 = (int)plVar104;
              if (0xfffffffc < iVar71 - 0xaaU) goto LAB_0014d850;
              if ((5 < iVar71 - 0xabU) && (1 < iVar71 - 0xb2U)) {
                if (0xfffffff7 < iVar71 - 0x76U) {
                  pMStack_4a0 = (MIR_context_t)0x14d739;
                  iVar71 = reachable_bo_exists_p((pbVar114->bb_insn_link).next);
                  if (iVar71 != 0) goto LAB_0014d906;
                }
                if ((*(char *)&(insn->children).head != '\x02') ||
                   ((((anon_union_32_12_57d33f68_for_u *)&(insn->children).tail)->reg & 0xfffffffe)
                    != 4)) {
                  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level))
                  {
                    pMStack_4a0 = (MIR_context_t)0x14d780;
                    fprintf((FILE *)pgVar120->debug_file,"  Removing dead insn %-5lu",
                            (ulong)pbVar114->index);
                    pMStack_4a0 = (MIR_context_t)0x14d79e;
                    MIR_output_insn(pgVar120->ctx,pgVar120->debug_file,(MIR_insn_t_conflict)insn,
                                    (pgVar120->curr_func_item->u).func,1);
                  }
                  pbVar27 = (pbVar81->bb_insns).head;
                  if (pbVar27 == (pbVar81->bb_insns).tail) {
                    if (pbVar114 != pbVar27) {
LAB_0014f5ba:
                      pMStack_4a0 = (MIR_context_t)0x14f5d9;
                      __assert_fail("bb_insn == (DLIST_bb_insn_t_head (&(bb->bb_insns)))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x23d3,"void dead_code_elimination(gen_ctx_t)");
                    }
                    pMStack_4a0 = (MIR_context_t)0x14d7d2;
                    pMVar83 = MIR_new_insn_arr(pgVar120->ctx,MIR_USE,0,(MIR_op_t *)0x0);
                    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)
                       ) {
                      pMStack_4a0 = (MIR_context_t)0x14d7f6;
                      fprintf((FILE *)pgVar120->debug_file,"  Adding nop to keep bb%lu non-empty: ",
                              pbVar81->index);
                      pMStack_4a0 = (MIR_context_t)0x14d814;
                      MIR_output_insn(pgVar120->ctx,pgVar120->debug_file,pMVar83,
                                      (pgVar120->curr_func_item->u).func,1);
                    }
                    pMStack_4a0 = (MIR_context_t)0x14d822;
                    gen_add_insn_after(pgVar120,(MIR_insn_t)insn,pMVar83);
                  }
                  pMStack_4a0 = (MIR_context_t)0x14d82d;
                  gen_delete_insn(pgVar120,(MIR_insn_t)insn);
                  local_3c8 = local_3c8 + 1;
                  pcVar79 = (char *)insn;
                  goto LAB_0014d5aa;
                }
              }
            }
LAB_0014d906:
            uVar241 = (ulong)insn->parent >> 0x20;
            if (uVar241 != 0) {
              uVar234 = 0;
              sVar233 = 0;
LAB_0014d945:
              do {
                pMStack_4a0 = (MIR_context_t)0x14d959;
                MIR_insn_op_mode(pgVar120->ctx,(MIR_insn_t_conflict)insn,sVar233,(int *)&local_218);
                if (((uint)local_218.tv_sec == 0) ||
                   (*(char *)&(&insn->children)[sVar233 * 3].head == '\v')) {
                  if (uVar234 < 2) {
                    cVar66 = *(char *)&(&insn->children)[sVar233 * 3].head;
                    if (cVar66 == '\v') {
                      do {
                        uVar70 = *(uint *)((long)&(&insn->children_link)[sVar233 * 3].next +
                                          (ulong)(uVar234 != 0) * 4);
                        if (uVar70 != 0xffffffff) {
                          uVar234 = uVar234 + 1;
                          goto LAB_0014d9ca;
                        }
                        bVar250 = uVar234 == 0;
                        uVar234 = 1;
                      } while (bVar250);
                    }
                    else if (uVar234 != 1) {
                      uVar234 = 0;
                      if (cVar66 != '\x02') goto LAB_0014da6b;
                      uVar70 = ((anon_union_32_12_57d33f68_for_u *)
                               &(&insn->children)[sVar233 * 3].tail)->reg;
                      uVar234 = 1;
LAB_0014d9ca:
                      plVar104 = plVar222->entry;
                      pvVar217 = (void *)((ulong)uVar70 + 0x40 >> 6);
                      lVar207 = (long)pvVar217 - (long)*(void **)&plVar222->index;
                      if (*(void **)&plVar222->index <= pvVar217 && lVar207 != 0) {
                        do {
                          if (plVar104 == (loop_node_t)0x0) {
                            pMStack_4a0 = (MIR_context_t)0x14efbb;
                            generate_func_code_cold_120();
LAB_0014efbb:
                            pMStack_4a0 = (MIR_context_t)0x14efc0;
                            generate_func_code_cold_116();
                            goto LAB_0014efc0;
                          }
                          pvVar217 = *(void **)&plVar222->index;
                          pMVar118 = (MIR_insn_t)((long)pvVar217 + 1);
                          if (((DLIST_LINK_MIR_insn_t *)&plVar222->bb)->prev < pMVar118) {
                            pMVar118 = (MIR_insn_t)
                                       ((long)pMVar118->ops + (((ulong)pMVar118 >> 1) - 0x20));
                            pMStack_4a0 = (MIR_context_t)0x14da0d;
                            plVar104 = (loop_node_t)realloc(plVar104,(long)pMVar118 * 8);
                            plVar222->entry = plVar104;
                            ((DLIST_LINK_MIR_insn_t *)&plVar222->bb)->prev = pMVar118;
                            pvVar217 = *(void **)&plVar222->index;
                            pMVar118 = (MIR_insn_t)((long)pvVar217 + 1);
                          }
                          lVar207 = lVar207 + -1;
                          *(MIR_insn_t *)&plVar222->index = pMVar118;
                          *(void **)((long)&plVar104->index + pvVar217 * 8) = (void *)0x0;
                        } while (lVar207 != 0);
                      }
                      *(void **)((long)&plVar104->index + (ulong)(uVar70 >> 6) * 8) =
                           (void *)((ulong)*(void **)((long)&plVar104->index +
                                                     (ulong)(uVar70 >> 6) * 8) |
                                   1L << ((ulong)uVar70 & 0x3f));
                      if (uVar241 <= sVar233) break;
                      goto LAB_0014d945;
                    }
                  }
                  uVar234 = 0;
                }
LAB_0014da6b:
                sVar233 = sVar233 + 1;
              } while (sVar233 < uVar241);
            }
            pcVar79 = local_338;
            pMStack_4a0 = (MIR_context_t)0x14da9d;
            target_get_early_clobbered_hard_regs
                      ((MIR_insn_t)insn->parent,(MIR_reg_t *)pcVar79,(MIR_reg_t *)local_398);
            if (((ulong)(uint)local_338._0_4_ != 0xffffffff) &&
               ((ulong)(uint)local_338._0_4_ < (ulong)((long)*(void **)&plVar222->index << 6))) {
              bVar249 = (byte)local_338._0_4_ & 0x3f;
              pcVar79 = (char *)(-2L << bVar249 | 0xfffffffffffffffeU >> 0x40 - bVar249);
              ppvVar248 = (void **)((long)&plVar222->entry->index +
                                   (ulong)((uint)local_338._0_4_ >> 6) * 8);
              *ppvVar248 = (void *)((ulong)*ppvVar248 & (ulong)pcVar79);
            }
            if (((ulong)(uint)local_398._0_4_ != 0xffffffff) &&
               ((ulong)(uint)local_398._0_4_ < (ulong)((long)*(void **)&plVar222->index << 6))) {
              bVar249 = (byte)local_398._0_4_ & 0x3f;
              pcVar79 = (char *)(-2L << bVar249 | 0xfffffffffffffffeU >> 0x40 - bVar249);
              ppvVar248 = (void **)((long)&plVar222->entry->index +
                                   (ulong)((uint)local_398._0_4_ >> 6) * 8);
              *ppvVar248 = (void *)((ulong)*ppvVar248 & (ulong)pcVar79);
            }
            if (0xfffffffc < *(int *)&insn->parent - 0xaaU) {
              pMStack_4a0 = (MIR_context_t)0x14db34;
              pcVar79 = (char *)plVar222;
              bitmap_ior((bitmap_t)plVar222,(bitmap_t)plVar222,pbVar114->call_hard_reg_args);
            }
            goto LAB_0014d5aa;
          }
          pbVar81 = (pbVar81->bb_link).next;
        } while (pbVar81 != (bb_t)0x0);
        plVar104 = plVar222->entry;
      }
      if (plVar104 == (loop_node_t)0x0) {
        pMStack_4a0 = (MIR_context_t)0x14f6a2;
        generate_func_code_cold_123();
LAB_0014f6a2:
        pMStack_4a0 = (MIR_context_t)0x14f6a7;
        generate_func_code_cold_52();
LAB_0014f6a7:
        pMStack_4a0 = (MIR_context_t)0x14f6af;
        generate_func_code_cold_66();
LAB_0014f6af:
        pMStack_4a0 = (MIR_context_t)0x14f6b4;
        generate_func_code_cold_167();
LAB_0014f6b4:
        pMStack_4a0 = (MIR_context_t)0x14f6b9;
        generate_func_code_cold_166();
LAB_0014f6b9:
        pMStack_4a0 = (MIR_context_t)0x14f6be;
        generate_func_code_cold_53();
LAB_0014f6be:
        pMStack_4a0 = (MIR_context_t)0x14f6e0;
        __assert_fail("mem_op_ref->mode == MIR_OP_VAR_MEM && mem_op_ref->u.var_mem.index == (4294967295U)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1623,
                      "int update_addr_p(gen_ctx_t, bb_t, MIR_op_t *, MIR_op_t *, addr_info_t *)");
      }
      pMStack_4a0 = (MIR_context_t)0x14db72;
      free(plVar104);
      pMStack_4a0 = (MIR_context_t)0x14db7a;
      free(plVar222);
      if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (0 < pgVar120->debug_level)) {
        pcVar79 = "%5ld removed dead insns\n";
        pMStack_4a0 = (MIR_context_t)0x14db9f;
        fprintf((FILE *)pgVar120->debug_file,"%5ld removed dead insns\n",local_3c8);
        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
          pMStack_4a0 = (MIR_context_t)0x14dbc4;
          fwrite("+++++++++++++MIR after dead code elimination after 2nd combine:\n",0x40,1,
                 (FILE *)pgVar120->debug_file);
          pcVar79 = &DAT_00000001;
          pMStack_4a0 = (MIR_context_t)0x14dbe5;
          print_CFG(pgVar120,1,1,1,0,output_bb_live_info);
        }
      }
LAB_0014dbe5:
      if (pgVar120->curr_func_item->item_type == MIR_func_item) {
        pMVar15 = (pgVar120->curr_func_item->u).func;
        pVVar92 = pgVar120->func_used_hard_regs;
        sVar233 = pgVar120->func_stack_slots_num;
        pMVar14 = pgVar120->ctx;
        lVar207 = 0;
        uVar241 = 0;
LAB_0014dc15:
        if (uVar241 != 3 && (~(uint)uVar241 & 0xc) != 0) goto LAB_0014dc50;
        if (pVVar92 != (bitmap_t)0x0) {
          if ((uVar241 < pVVar92->els_num << 6) && ((*pVVar92->varr >> (uVar241 & 0x3f) & 1) != 0))
          {
            lVar207 = lVar207 + 8;
          }
          goto LAB_0014dc50;
        }
        pMStack_4a0 = (MIR_context_t)0x14f165;
        generate_func_code_cold_161();
LAB_0014f165:
        pMStack_4a0 = (MIR_context_t)0x14f16a;
        generate_func_code_cold_102();
LAB_0014f16a:
        pMStack_4a0 = (MIR_context_t)0x14f16f;
        generate_func_code_cold_84();
        goto LAB_0014f16f;
      }
LAB_0014f596:
      pMStack_4a0 = (MIR_context_t)0x14f5b5;
      __assert_fail("curr_func_item->item_type == MIR_func_item",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x492,"void target_make_prolog_epilog(gen_ctx_t, bitmap_t, size_t)");
    }
    goto LAB_0014f56d;
  }
  pvVar217 = ((func_item->u).func)->call_addr;
  if (pvVar217 == (void *)0x0) goto LAB_0014f4de;
  ppvVar248 = &func_item->addr;
  pMStack_4a0 = (MIR_context_t)0x145149;
  _MIR_redirect_thunk(local_348,func_item->addr,pvVar217);
  pFVar112 = (FILE *)pgVar120->debug_file;
  if ((pFVar112 != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x145176;
    pcVar79 = MIR_item_name(local_348,local_350);
    pMStack_4a0 = (MIR_context_t)0x14518a;
    fprintf(pFVar112,"+++++++++++++The code for %s has been already generated\n",pcVar79);
  }
  goto LAB_0014efa1;
LAB_001460d5:
  pbVar201 = (pbVar201->bb_insn_link).next;
  goto LAB_0014605a;
code_r0x0014633e:
  uVar70 = pMVar118->ops[0].u.reg;
  if (((ulong)uVar70 < pVVar92->els_num << 6) &&
     ((pVVar92->varr[uVar70 >> 6] >> ((ulong)uVar70 & 0x3f) & 1) != 0)) {
    pFVar112 = (FILE *)pgVar120->debug_file;
    if ((pFVar112 != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
      sVar245 = 0x32;
      pcVar79 = "  deleting phi for pseudo transformed into memory ";
LAB_00146b55:
      pMStack_4a0 = (MIR_context_t)0x146b5d;
      fwrite(pcVar79,sVar245,1,pFVar112);
      pMStack_4a0 = (MIR_context_t)0x146b6e;
      print_bb_insn(pgVar120,(bb_insn_t_conflict)pMVar118->data,1);
    }
LAB_00146b6e:
    auVar260 = ZEXT1664(auVar255);
    pMStack_4a0 = (MIR_context_t)0x146b79;
    remove_insn_ssa_edges(pMVar118);
    pMStack_4a0 = (MIR_context_t)0x146b84;
    gen_delete_insn(pgVar120,pMVar118);
  }
  goto joined_r0x001461f3;
LAB_001472e9:
  auVar255 = auVar260._0_16_;
  pVVar154 = pgVar120->gvn_ctx->mem_exprs;
  if (pVVar154 == (VARR_mem_expr_t *)0x0) goto LAB_0014f2e4;
  sVar233 = pVVar154->els_num;
  if (sVar233 != 0) {
    if (pVVar154->varr != (mem_expr_t *)0x0) goto code_r0x00147312;
    goto LAB_0014f2e9;
  }
  if (pgVar120->optimize_level < 2) goto LAB_0014afda;
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x147354;
    fwrite("+++++++++++++Copy Propagation:\n",0x1f,1,(FILE *)pgVar120->debug_file);
  }
  pgVar211 = (gen_ctx_t)(pgVar120->curr_cfg->bbs).head;
  if (pgVar211 != (gen_ctx_t)0x0) {
    pMVar14 = pgVar120->ctx;
    local_220 = local_2e8;
    pMVar15 = (pgVar120->curr_func_item->u).func;
    do {
      pbVar105 = (bb_insn_t_conflict)pgVar211->temp_bitmap;
      local_300 = pgVar211;
      pbVar85 = local_358;
joined_r0x001473ab:
      pbVar106 = pbVar105;
      if (pbVar106 != (bb_insn_t_conflict)0x0) {
        auVar255 = auVar260._0_16_;
        pMVar83 = pbVar106->insn;
        local_358 = (pbVar106->bb_insn_link).next;
        pbVar105 = local_358;
        if ((int)*(ulong *)&pMVar83->field_0x18 - 0x22U < 0xfffffffc) {
          ppVVar208 = (bitmap_t *)(*(ulong *)&pMVar83->field_0x18 >> 0x20);
          if (ppVVar208 != (bitmap_t *)0x0) {
            uVar241 = 0;
            puVar246 = (undefined1 *)0x0;
            local_2f0 = ppVVar208;
            do {
              while( true ) {
                auVar260 = ZEXT1664(auVar260._0_16_);
                pMStack_4a0 = (MIR_context_t)0x14745f;
                MIR_insn_op_mode(pgVar120->ctx,pMVar83,(size_t)puVar246,(int *)&local_218);
                auVar255 = auVar260._0_16_;
                if (((uint)local_218.tv_sec != 0) &&
                   (pMVar83->ops[(long)puVar246].field_0x8 != '\v')) goto LAB_00147676;
                if (1 < uVar241) break;
                cVar66 = pMVar83->ops[(long)puVar246].field_0x8;
                if (cVar66 == '\v') {
                  while (uVar70 = *(uint *)((long)&pMVar83->ops[(long)puVar246].u +
                                           (ulong)(uVar241 != 0) * 4 + 0x10), uVar70 == 0xffffffff)
                  {
                    bVar250 = uVar241 != 0;
                    uVar241 = 1;
                    if (bVar250) goto LAB_00147673;
                  }
                  uVar241 = uVar241 + 1;
                }
                else {
                  if (uVar241 == 1) break;
                  uVar241 = 0;
                  if (cVar66 != '\x02') goto LAB_00147676;
                  uVar70 = pMVar83->ops[(long)puVar246].u.reg;
                  uVar241 = 1;
                }
                if (0x21 < uVar70) {
                  iVar71 = 0x1e;
                  do {
                    psVar17 = (ssa_edge_t_conflict)pMVar83->ops[(int)puVar246].data;
                    pbVar85 = psVar17->def;
                    if (pbVar85->bb->index == 0) break;
                    pMVar118 = pbVar85->insn;
                    pMStack_4a0 = (MIR_context_t)0x147541;
                    iVar77 = move_p(pMVar118);
                    if (iVar77 == 0) break;
                    uVar73 = pMVar118->ops[0].u.reg;
                    uVar76 = *(uint *)&pMVar118[1].insn_link.next;
                    if (uVar73 == uVar76) break;
                    if (uVar76 < 0x22) {
                      pMStack_4a0 = (MIR_context_t)0x14aaea;
                      __assert_fail("src_reg > ST1_HARD_REG",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0xc8d,"void copy_prop(gen_ctx_t)");
                    }
                    pMStack_4a0 = (MIR_context_t)0x147589;
                    pcVar79 = MIR_reg_hard_reg_name(pMVar14,uVar73 - 0x21,pMVar15);
                    pMStack_4a0 = (MIR_context_t)0x1475ab;
                    pcVar221 = MIR_reg_hard_reg_name(pMVar14,uVar76 - 0x21,pMVar15);
                    if (pcVar79 != pcVar221) break;
                    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)
                       ) {
                      pMStack_4a0 = (MIR_context_t)0x1475e6;
                      fwrite("  Propagate from copy insn ",0x1b,1,(FILE *)pgVar120->debug_file);
                      pMStack_4a0 = (MIR_context_t)0x1475f3;
                      print_bb_insn(pgVar120,pbVar85,0);
                    }
                    uVar73 = *(uint *)&pMVar118[1].insn_link.next;
                    if (uVar73 < 0x22) {
                      pMStack_4a0 = (MIR_context_t)0x14ab09;
                      __assert_fail("reg > ST1_HARD_REG && new_reg > ST1_HARD_REG",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0xc96,"void copy_prop(gen_ctx_t)");
                    }
                    pMStack_4a0 = (MIR_context_t)0x14761c;
                    remove_ssa_edge(psVar17);
                    iVar77 = 0;
                    pMStack_4a0 = (MIR_context_t)0x14764b;
                    add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pMVar118[1].data + 8),
                                   (uint)*(ushort *)((long)pMVar118[1].data + 0x12),pbVar106,
                                   (int)puVar246,0);
                    pMStack_4a0 = (MIR_context_t)0x147663;
                    rename_op_reg(pgVar120,pMVar83->ops + (int)puVar246,uVar70,uVar73,pMVar83,iVar77
                                 );
                    iVar71 = iVar71 + -1;
                    uVar70 = uVar73;
                  } while (iVar71 != 0);
                }
                auVar255 = auVar260._0_16_;
                ppVVar208 = local_2f0;
                if (local_2f0 <= puVar246) goto LAB_00147682;
              }
LAB_00147673:
              uVar241 = 0;
LAB_00147676:
              puVar246 = puVar246 + 1;
            } while (puVar246 < ppVVar208);
          }
LAB_00147682:
          auVar260 = ZEXT1664(auVar255);
          pMStack_4a0 = (MIR_context_t)0x14768d;
          iVar71 = move_p(pMVar83);
          if (((((((iVar71 != 0) && (pMVar83->ops[0].data != (void *)0x0)) &&
                 (psVar17 = (ssa_edge_t_conflict)pMVar83[1].data,
                 psVar17 != (ssa_edge_t_conflict)0x0)) &&
                ((psVar17->def == (pbVar106->bb_insn_link).prev &&
                 (plVar198 = *(long **)((long)&psVar17->def->insn->ops[0].data +
                                       (ulong)((uint)psVar17->def_op_num * 0x30)),
                 plVar198 != (long *)0x0)))) &&
               (plVar18 = (long *)plVar198[4], plVar18 != (long *)0x0)) && (plVar18[4] == 0)) &&
             ((pbVar201 = (pbVar106->bb_insn_link).next, (bb_insn_t)*plVar198 == pbVar201 ||
              ((bb_insn_t)*plVar18 == pbVar201)))) {
            lVar207 = *(long *)plVar198[1];
            uVar241 = (ulong)((uint)*(ushort *)((long)plVar198 + 0x12) * 0x30);
            pMStack_4a0 = (MIR_context_t)0x14790e;
            remove_ssa_edge(psVar17);
            plVar198 = *(long **)(lVar207 + 0x20 + uVar241);
            if (((plVar198 == (long *)0x0) || (plVar198[4] != 0)) ||
               ((bb_insn_t)*plVar198 != (pbVar106->bb_insn_link).next)) goto LAB_0014f70e;
            MVar69 = pMVar83->ops[0].u.reg;
            lVar242 = 0x10;
            *(MIR_reg_t *)(lVar207 + uVar241 + 0x30) = MVar69;
            lVar207 = (ulong)*(uint *)((long)plVar198 + 0x14) * 0x30;
            cVar66 = *(char *)(*(long *)*plVar198 + 0x28 + lVar207);
            if (cVar66 != '\x02') {
              if (cVar66 != '\v') goto LAB_0014f82f;
              lVar242 = 0x20;
            }
            *(MIR_reg_t *)(*(long *)*plVar198 + 0x20 + lVar207 + lVar242) = MVar69;
            pvVar217 = pMVar83->ops[0].data;
            if (pvVar217 != (void *)0x0) {
              lVar207 = plVar198[1];
              uVar13 = *(undefined2 *)((long)plVar198 + 0x12);
              pvVar228 = pvVar217;
              do {
                *(long *)((long)pvVar228 + 8) = lVar207;
                *(undefined2 *)((long)pvVar228 + 0x12) = uVar13;
                pvVar228 = *(void **)((long)pvVar228 + 0x20);
              } while (pvVar228 != (void *)0x0);
            }
            plVar198[4] = (long)pvVar217;
            *(long **)((long)pvVar217 + 0x18) = plVar198;
            pMVar83[1].data = (void *)0x0;
            pMVar83->ops[0].data = (void *)0x0;
            if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
              pMStack_4a0 = (MIR_context_t)0x1479db;
              fprintf((FILE *)pgVar120->debug_file,"    Remove move %-5lu",(ulong)pbVar106->index);
              pMStack_4a0 = (MIR_context_t)0x1479e8;
              print_bb_insn(pgVar120,pbVar106,0);
            }
            pMStack_4a0 = (MIR_context_t)0x1479f3;
            gen_delete_insn(pgVar120,pMVar83);
            pbVar105 = local_358;
            pbVar85 = local_358;
            goto joined_r0x001473ab;
          }
          uVar70 = *(uint *)&pMVar83->field_0x18;
          uVar73 = uVar70 - 0x2c;
          if ((uVar73 < 9) && ((0x1e3U >> (uVar73 & 0x1f) & 1) != 0)) {
            ctx_00 = pgVar120->ctx;
            MVar218 = *(MIR_insn_code_t *)(&DAT_001b19f4 + (ulong)uVar73 * 4);
            func = (pgVar120->curr_func_item->u).func;
            pMStack_4a0 = (MIR_context_t)0x147705;
            uVar73 = power2_int_op((ssa_edge_t_conflict)pMVar83[1].ops[0].u.ref,
                                   (MIR_op_t **)&local_68);
            if ((int)uVar73 < 0) {
              if ((uVar70 & 0x3e) == 0x2c) {
                pMStack_4a0 = (MIR_context_t)0x147831;
                uVar73 = power2_int_op((ssa_edge_t_conflict)pMVar83[1].data,(MIR_op_t **)&local_68);
                if (-1 < (int)uVar73) {
                  pMVar98 = pMVar83 + 1;
                  paVar204 = &pMVar83[1].ops[0].u;
                  pvVar217 = pMVar98->data;
                  pMVar118 = pMVar83[1].insn_link.prev;
                  pMStack_208 = pMVar83[1].insn_link.next;
                  apMStack_200[0] = *(MIR_insn_t_conflict *)&pMVar83[1].field_0x18;
                  apMStack_200[1] = (MIR_insn_t_conflict)pMVar83[1].ops[0].data;
                  apMStack_200[2] = *(MIR_insn_t_conflict *)&pMVar83[1].ops[0].field_0x8;
                  local_218.tv_sec._0_4_ = (uint)pvVar217;
                  local_218.tv_sec._4_4_ = (undefined4)((ulong)pvVar217 >> 0x20);
                  local_218.tv_usec._0_4_ = SUB84(pMVar118,0);
                  local_218.tv_usec._4_4_ = (undefined4)((ulong)pMVar118 >> 0x20);
                  pvVar228 = (void *)paVar204->i;
                  pMVar88 = (MIR_insn_t)pMVar83[1].ops[0].u.str.s;
                  pMVar89 = *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10);
                  MVar31 = pMVar83[1].ops[0].u.mem.disp;
                  MVar32 = pMVar83[1].ops[0].u.mem.disp;
                  pvVar236 = pMVar83[2].data;
                  pMVar33 = pMVar83[2].insn_link.prev;
                  pMVar83[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10);
                  *(MIR_disp_t *)&pMVar83[1].field_0x18 = MVar32;
                  pMVar83[1].ops[0].data = pvVar236;
                  *(MIR_insn_t *)&pMVar83[1].ops[0].field_0x8 = pMVar33;
                  pMVar98->data = pvVar228;
                  pMVar83[1].insn_link.prev = pMVar88;
                  pMVar83[1].insn_link.next = pMVar89;
                  *(MIR_disp_t *)&pMVar83[1].field_0x18 = MVar31;
                  *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10) = pMStack_208;
                  pMVar83[1].ops[0].u.mem.disp = (MIR_disp_t)apMStack_200[0];
                  pMVar83[2].data = apMStack_200[1];
                  pMVar83[2].insn_link.prev = apMStack_200[2];
                  paVar204->i = (int64_t)pvVar217;
                  *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 8) = pMVar118;
                  *(MIR_insn_t *)((long)&pMVar83[1].ops[0].u + 0x10) = pMStack_208;
                  pMVar83[1].ops[0].u.mem.disp = (MIR_disp_t)apMStack_200[0];
                  *(undefined4 *)((long)pMVar98->data + 0x14) = 1;
                  *(undefined4 *)((long)&(paVar204->ref->item_link).prev + 4) = 2;
                  goto LAB_00147710;
                }
              }
            }
            else {
LAB_00147710:
              pMVar124 = pMVar83->ops;
              if (uVar73 == 0) {
                auVar260 = ZEXT1664(SUB3216(*(undefined1 (*) [32])pMVar124,0));
                pMStack_4a0 = (MIR_context_t)0x147a43;
                pMVar98 = MIR_new_insn(ctx_00,MIR_MOV);
                local_338._0_4_ = SUB84(pMVar98,0);
                local_338._4_4_ = (undefined4)((ulong)pMVar98 >> 0x20);
                pMVar98[1].data = (void *)0x0;
                pMStack_4a0 = (MIR_context_t)0x147a6c;
                gen_add_insn_before(pgVar120,pMVar83,pMVar98);
                pMStack_4a0 = (MIR_context_t)0x147a7c;
                redirect_def(pgVar120,pMVar83,pMVar98,0);
                lVar207 = 1;
                pMStack_4a0 = (MIR_context_t)0x147aa1;
                add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pMVar83[1].data + 8),
                               (uint)*(ushort *)((long)pMVar83[1].data + 0x12),
                               (bb_insn_t_conflict)pMVar98->data,1,0);
              }
              else if (*(int *)&pMVar83->field_0x18 - 0x31U < 2) {
                lVar207 = 0;
                do {
                  pMStack_4a0 = (MIR_context_t)0x147753;
                  MVar69 = _MIR_new_temp_reg(pgVar120->ctx,MIR_T_I64,func);
                  uVar70 = MVar69 + 0x21;
                  if ((uVar70 != 0xffffffff) && (pgVar120->curr_cfg->max_var < uVar70)) {
                    pgVar120->curr_cfg->max_var = uVar70;
                  }
                  pMStack_4a0 = (MIR_context_t)0x14778a;
                  _MIR_new_var_op(ctx_00,uVar70);
                  lVar242 = lVar207 + 0x30;
                  *(undefined8 *)((long)&pMStack_208 + lVar207) = local_338._16_8_;
                  *(undefined8 *)((long)apMStack_200 + lVar207) = local_338._24_8_;
                  *(undefined8 *)((long)apMStack_200 + lVar207 + 8) = local_338._32_8_;
                  *(undefined8 *)((long)apMStack_200 + lVar207 + 0x10) = local_338._40_8_;
                  *(ulong *)((long)&local_218.tv_sec + lVar207) =
                       CONCAT44(local_338._4_4_,local_338._0_4_);
                  *(undefined8 *)((long)&local_218.tv_usec + lVar207) = local_338._8_8_;
                  *(undefined8 *)((long)&pMStack_208 + lVar207) = local_338._16_8_;
                  *(undefined8 *)((long)apMStack_200 + lVar207) = local_338._24_8_;
                  lVar207 = lVar242;
                } while (lVar242 != 0x120);
                if (*(int *)&pMVar83->field_0x18 == 0x31) {
                  pMStack_4a0 = (MIR_context_t)0x1477e9;
                  MIR_new_int_op(ctx_00,0x3f);
                  local_3d0 = MIR_ADD;
                  local_3b8 = MIR_AND;
                  MVar239 = MIR_RSH;
                }
                else {
                  pMStack_4a0 = (MIR_context_t)0x147c6d;
                  MIR_new_int_op(ctx_00,0x1f);
                  MVar239 = MIR_RSHS;
                  local_3d0 = MIR_ADDS;
                  local_3b8 = MIR_ANDS;
                }
                pMStack_4a0 = (MIR_context_t)0x147ce1;
                pMVar98 = MIR_new_insn(ctx_00,MIR_MOV);
                pMStack_4a0 = (MIR_context_t)0x147d4b;
                pbVar99 = (bb_t)MIR_new_insn(ctx_00,MVar239);
                pMStack_4a0 = (MIR_context_t)0x147d75;
                MIR_new_int_op(ctx_00,*(long *)((long)local_68.data + 0x10) + -1);
                pMStack_4a0 = (MIR_context_t)0x147db2;
                pMVar100 = MIR_new_insn(ctx_00,MIR_MOV);
                pMStack_4a0 = (MIR_context_t)0x147e15;
                pMVar101 = MIR_new_insn(ctx_00,local_3b8);
                pMStack_4a0 = (MIR_context_t)0x147e76;
                pMVar102 = MIR_new_insn(ctx_00,local_3d0);
                local_338._0_4_ = SUB84(pMVar98,0);
                local_338._4_4_ = (undefined4)((ulong)pMVar98 >> 0x20);
                (pbVar99->bb_insns).head = (bb_insn_t)0x0;
                pMVar102[1].ops[0].u.i = 0;
                pMStack_4a0 = (MIR_context_t)0x147ee1;
                local_338._8_8_ = pbVar99;
                local_338._16_8_ = pMVar100;
                local_338._24_8_ = pMVar101;
                local_338._32_8_ = pMVar102;
                MIR_new_int_op(ctx_00,(ulong)uVar73);
                pMStack_4a0 = (MIR_context_t)0x147f2b;
                pMVar103 = MIR_new_insn(ctx_00,MIR_MOV);
                auVar260 = ZEXT1664(SUB3216(*(undefined1 (*) [32])pMVar124,0));
                pMStack_4a0 = (MIR_context_t)0x147fa7;
                local_338._40_8_ = pMVar103;
                plVar104 = (loop_node_t)MIR_new_insn(ctx_00,MVar218);
                lVar207 = 0;
                local_308 = plVar104;
                do {
                  pMStack_4a0 = (MIR_context_t)0x147fd0;
                  gen_add_insn_before(pgVar120,pMVar83,*(MIR_insn_t *)(local_338 + lVar207 * 8));
                  lVar207 = lVar207 + 1;
                } while (lVar207 != 7);
                pMStack_4a0 = (MIR_context_t)0x148003;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pMVar98->data,0,
                               (bb_insn_t_conflict)pbVar99->index,2,0);
                pMStack_4a0 = (MIR_context_t)0x148025;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pbVar99->index,0,
                               (bb_insn_t_conflict)pMVar101->data,1,0);
                pMStack_4a0 = (MIR_context_t)0x148046;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pMVar100->data,0,
                               (bb_insn_t_conflict)pMVar101->data,2,0);
                pMStack_4a0 = (MIR_context_t)0x14805f;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pMVar101->data,0,
                               (bb_insn_t_conflict)pMVar102->data,1,0);
                pMStack_4a0 = (MIR_context_t)0x148078;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pMVar102->data,0,
                               *(bb_insn_t_conflict *)&plVar104->index,1,0);
                pMStack_4a0 = (MIR_context_t)0x148099;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pMVar103->data,0,
                               *(bb_insn_t_conflict *)&plVar104->index,2,0);
                pvVar217 = pMVar83[1].data;
                pMStack_4a0 = (MIR_context_t)0x1480bb;
                add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pvVar217 + 8),
                               (uint)*(ushort *)((long)pvVar217 + 0x12),
                               (bb_insn_t_conflict)pbVar99->index,1,0);
                pMStack_4a0 = (MIR_context_t)0x1480d8;
                add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pvVar217 + 8),
                               (uint)*(ushort *)((long)pvVar217 + 0x12),
                               (bb_insn_t_conflict)pMVar102->data,2,0);
                pMStack_4a0 = (MIR_context_t)0x1480e8;
                redirect_def(pgVar120,pMVar83,(MIR_insn_t)plVar104,0);
                lVar207 = 7;
              }
              else {
                pMStack_4a0 = (MIR_context_t)0x147ac5;
                MVar69 = _MIR_new_temp_reg(pgVar120->ctx,MIR_T_I64,func);
                uVar70 = MVar69 + 0x21;
                if ((uVar70 != 0xffffffff) && (pgVar120->curr_cfg->max_var < uVar70)) {
                  pgVar120->curr_cfg->max_var = uVar70;
                }
                pMStack_4a0 = (MIR_context_t)0x147aec;
                _MIR_new_var_op(ctx_00,uVar70);
                pMStack_4a0 = (MIR_context_t)0x147aff;
                MIR_new_int_op(ctx_00,(ulong)uVar73);
                pMStack_4a0 = (MIR_context_t)0x147b49;
                pMVar98 = MIR_new_insn(ctx_00,MIR_MOV);
                local_338._0_4_ = SUB84(pMVar98,0);
                local_338._4_4_ = (undefined4)((ulong)pMVar98 >> 0x20);
                pMStack_4a0 = (MIR_context_t)0x147b6a;
                gen_add_insn_before(pgVar120,pMVar83,pMVar98);
                auVar260 = ZEXT1664(SUB3216(*(undefined1 (*) [32])pMVar124,0));
                pMStack_4a0 = (MIR_context_t)0x147bce;
                pbVar99 = (bb_t)MIR_new_insn(ctx_00,MVar218);
                (pbVar99->bb_insns).head = (bb_insn_t)0x0;
                pMStack_4a0 = (MIR_context_t)0x147bef;
                local_338._8_8_ = pbVar99;
                gen_add_insn_before(pgVar120,pMVar83,(MIR_insn_t)pbVar99);
                pMStack_4a0 = (MIR_context_t)0x147bff;
                redirect_def(pgVar120,pMVar83,(MIR_insn_t)pbVar99,0);
                pMStack_4a0 = (MIR_context_t)0x147c1f;
                add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pMVar83[1].data + 8),
                               (uint)*(ushort *)((long)pMVar83[1].data + 0x12),
                               (bb_insn_t_conflict)pbVar99->index,1,0);
                lVar207 = 2;
                pMStack_4a0 = (MIR_context_t)0x147c3d;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pMVar98->data,0,
                               (bb_insn_t_conflict)pbVar99->index,2,0);
              }
              if ((pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                lVar242 = 0;
                do {
                  pcVar79 = "        and ";
                  if (lVar242 == 0) {
                    pcVar79 = "      adding ";
                  }
                  pMStack_4a0 = (MIR_context_t)0x14812a;
                  fprintf((FILE *)pgVar120->debug_file,pcVar79);
                  pMStack_4a0 = (MIR_context_t)0x148142;
                  print_bb_insn(pgVar120,(bb_insn_t_conflict)
                                         **(undefined8 **)(local_338 + lVar242 * 8),1);
                  lVar242 = lVar242 + 1;
                } while (lVar207 != lVar242);
                pMStack_4a0 = (MIR_context_t)0x148165;
                fwrite("        and deleting ",0x15,1,(FILE *)pgVar120->debug_file);
                pMStack_4a0 = (MIR_context_t)0x14817d;
                print_bb_insn(pgVar120,(bb_insn_t_conflict)pMVar83->data,1);
              }
              pMStack_4a0 = (MIR_context_t)0x148185;
              remove_insn_ssa_edges(pMVar83);
              pMStack_4a0 = (MIR_context_t)0x148190;
              gen_delete_insn(pgVar120,pMVar83);
              pMVar83 = *(MIR_insn_t_conflict *)(local_338 + (ulong)((int)lVar207 - 1) * 8);
            }
          }
          uVar241 = *(ulong *)&pMVar83->field_0x18;
          uVar70 = (int)uVar241 - 4;
          pbVar105 = local_358;
          pbVar85 = local_358;
          if ((uVar70 < 6) && (*(char *)&pMVar83[1].insn_link.prev == '\x02')) {
            psVar17 = (ssa_edge_t_conflict)pMVar83[1].data;
            pbVar106 = (bb_insn_t_conflict)pMVar83->data;
            uVar234 = *(ulong *)(&DAT_001b1a18 + (ulong)uVar70 * 8);
            pMVar118 = psVar17->def->insn;
            uVar73 = (uint)*(ulong *)&pMVar118->field_0x18;
            if ((uVar73 - 0x48 < 0x26) &&
               ((0x3af5ebd7bdU >> ((ulong)(uVar73 - 0x48) & 0x3f) & 1) != 0)) {
              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                pMStack_4a0 = (MIR_context_t)0x14823e;
                fprintf((FILE *)pgVar120->debug_file,"    Change code of insn %lu ",
                        (ulong)pbVar106->index);
                pMStack_4a0 = (MIR_context_t)0x14825d;
                MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar83,pMVar15,0);
                pMStack_4a0 = (MIR_context_t)0x148277;
                fwrite("    to move\n",0xc,1,(FILE *)pgVar120->debug_file);
                uVar241 = *(ulong *)&pMVar83->field_0x18;
              }
              *(ulong *)&pMVar83->field_0x18 = uVar241 & 0xffffffff00000000;
              pbVar105 = pbVar106;
              pbVar85 = local_358;
              goto joined_r0x001473ab;
            }
            if (uVar73 < 10) {
              if ((0x90U >> (uVar73 & 0x1f) & 1) == 0) {
                if ((0x120U >> (uVar73 & 0x1f) & 1) == 0) {
                  if ((0x240U >> (uVar73 & 0x1f) & 1) == 0) goto LAB_00148446;
                  uVar76 = 0x20;
                }
                else {
                  uVar76 = 0x10;
                }
              }
              else {
                uVar76 = 8;
              }
              if (uVar76 < *(uint *)(&DAT_001b1a48 + (ulong)uVar70 * 4)) {
                if ((2 < uVar70) && (0xfffffffc < uVar73 - 7)) goto joined_r0x001473ab;
                uVar234 = *(ulong *)&pMVar118->field_0x18 & 0xffffffff;
                if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                  pMStack_4a0 = (MIR_context_t)0x148338;
                  fprintf((FILE *)pgVar120->debug_file,"    Change code of insn %lu: before",
                          (ulong)pbVar106->index);
                  pMStack_4a0 = (MIR_context_t)0x148357;
                  MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar83,pMVar15,0);
                  uVar234 = (ulong)*(uint *)&pMVar118->field_0x18;
                  uVar241 = *(ulong *)&pMVar83->field_0x18;
                }
                *(ulong *)&pMVar83->field_0x18 = uVar241 & 0xffffffff00000000 | uVar234;
              }
              else if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level))
              {
                pMStack_4a0 = (MIR_context_t)0x14839f;
                fprintf((FILE *)pgVar120->debug_file,"    Change code of insn %lu: before",
                        (ulong)pbVar106->index);
                pMStack_4a0 = (MIR_context_t)0x1483be;
                MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar83,pMVar15,0);
              }
              *(undefined4 *)&pMVar83[1].insn_link.next = *(undefined4 *)&pMVar118[1].insn_link.next
              ;
              pMStack_4a0 = (MIR_context_t)0x1483cf;
              remove_ssa_edge(psVar17);
              pMStack_4a0 = (MIR_context_t)0x1483f0;
              add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pMVar118[1].data + 8),
                             (uint)*(ushort *)((long)pMVar118[1].data + 0x12),pbVar106,1,0);
              pbVar105 = pbVar106;
              pbVar85 = local_358;
              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                pMStack_4a0 = (MIR_context_t)0x148415;
                fwrite("    after ",10,1,(FILE *)pgVar120->debug_file);
                pMStack_4a0 = (MIR_context_t)0x148422;
                print_bb_insn(pgVar120,pbVar106,0);
                pbVar85 = local_358;
              }
              goto joined_r0x001473ab;
            }
LAB_00148446:
            if ((2 < uVar70) && ((uVar73 & 0xfffffffe) == 0x3c)) {
              if ((pMVar118[1].data != (void *)0x0) &&
                 ((lVar207 = **(long **)((long)pMVar118[1].data + 8), *(int *)(lVar207 + 0x18) == 0
                  && ((ushort)(*(byte *)(lVar207 + 0x58) - 3) < 2)))) {
                paVar204 = (anon_union_32_12_57d33f68_for_u *)(pMVar118 + 1);
                local_258._8_8_ = pMVar118[1].insn_link.prev;
                ppMVar35 = &pMVar118[1].insn_link.next;
                aStack_248.i = (int64_t)*ppMVar35;
                aStack_248.str.s = (char *)*(undefined8 *)&pMVar118[1].field_0x18;
                aVar59 = *paVar204;
                aStack_248._16_8_ = pMVar118[1].ops[0].data;
                aStack_248.mem.disp = *(undefined8 *)&pMVar118[1].ops[0].field_0x8;
                auVar6 = *(undefined1 (*) [32])ppMVar35;
                local_258._0_4_ = SUB84((void *)(paVar204->str).len,0);
                local_258._4_4_ = (undefined4)((ulong)(paVar204->str).len >> 0x20);
                pvVar217 = (void *)pMVar118[1].ops[0].u.i;
                pMVar88 = (MIR_insn_t)pMVar118[1].ops[0].u.str.s;
                pMVar89 = *(MIR_insn_t *)((long)&pMVar118[1].ops[0].u + 0x10);
                MVar31 = pMVar118[1].ops[0].u.mem.disp;
                MVar32 = pMVar118[1].ops[0].u.mem.disp;
                pvVar228 = pMVar118[2].data;
                pMVar33 = pMVar118[2].insn_link.prev;
                pMVar118[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar118[1].ops[0].u + 0x10);
                *(MIR_disp_t *)&pMVar118[1].field_0x18 = MVar32;
                pMVar118[1].ops[0].data = pvVar228;
                *(MIR_insn_t *)&pMVar118[1].ops[0].field_0x8 = pMVar33;
                (paVar204->str).len = (size_t)pvVar217;
                pMVar118[1].insn_link.prev = pMVar88;
                pMVar118[1].insn_link.next = pMVar89;
                *(MIR_disp_t *)&pMVar118[1].field_0x18 = MVar31;
                auVar260 = ZEXT3264((undefined1  [32])aVar59);
                *(undefined1 (*) [32])((long)&pMVar118[1].ops[0].u + 0x10) = auVar6;
                pMVar118[1].ops[0].u = aVar59;
              }
              pMVar210 = pMVar118[1].ops[0].u.ref;
              if (((pMVar210 != (MIR_item_t)0x0) &&
                  (pvVar217 = pMVar210->module->data, *(int *)((long)pvVar217 + 0x18) == 0)) &&
                 ((ushort)(*(byte *)((long)pvVar217 + 0x58) - 3) < 2)) {
                uVar241 = *(ulong *)((long)pvVar217 + 0x60);
                if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                  pMStack_4a0 = (MIR_context_t)0x14854d;
                  fprintf((FILE *)pgVar120->debug_file,"    Change code of insn %lu ",
                          (ulong)pbVar106->index);
                  pMStack_4a0 = (MIR_context_t)0x14856c;
                  MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar83,pMVar15,0);
                }
                pMStack_4a0 = (MIR_context_t)0x148584;
                MVar69 = _MIR_new_temp_reg(pgVar120->ctx,MIR_T_I64,pMVar15);
                uVar70 = MVar69 + 0x21;
                if ((uVar70 != 0xffffffff) && (pgVar120->curr_cfg->max_var < uVar70)) {
                  pgVar120->curr_cfg->max_var = uVar70;
                }
                pMStack_4a0 = (MIR_context_t)0x1485cc;
                _MIR_new_var_op(pMVar14,uVar70);
                pMStack_4a0 = (MIR_context_t)0x1485e7;
                MIR_new_int_op(pMVar14,uVar241 & uVar234);
                pMStack_4a0 = (MIR_context_t)0x148631;
                pMVar98 = MIR_new_insn(pMVar14,MIR_MOV);
                pMStack_4a0 = (MIR_context_t)0x148654;
                gen_add_insn_before(pgVar120,pMVar83,pMVar98);
                pMStack_4a0 = (MIR_context_t)0x148669;
                _MIR_new_var_op(pMVar14,*(MIR_reg_t *)&pMVar118[1].insn_link.next);
                pMStack_4a0 = (MIR_context_t)0x14867b;
                _MIR_new_var_op(pMVar14,uVar70);
                auVar260 = ZEXT1664(SUB3216(*(undefined1 (*) [32])pMVar83->ops,0));
                pMStack_4a0 = (MIR_context_t)0x1486e5;
                pMVar100 = MIR_new_insn(pMVar14,MIR_AND);
                pMStack_4a0 = (MIR_context_t)0x1486fe;
                gen_add_insn_before(pgVar120,pMVar83,pMVar100);
                pMStack_4a0 = (MIR_context_t)0x14870e;
                remove_ssa_edge(psVar17);
                pMStack_4a0 = (MIR_context_t)0x148728;
                add_ssa_edge_1(pgVar120,(bb_insn_t_conflict)pMVar98->data,0,
                               (bb_insn_t_conflict)pMVar100->data,2,0);
                pMStack_4a0 = (MIR_context_t)0x148749;
                add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pMVar118[1].data + 8),
                               (uint)*(ushort *)((long)pMVar118[1].data + 0x12),
                               (bb_insn_t_conflict)pMVar100->data,1,0);
                pMVar83->ops[0].data = (void *)0x0;
                pvVar217 = pMVar100->ops[0].data;
                if (pvVar217 != (void *)0x0) {
                  pvVar228 = pMVar100->data;
                  do {
                    *(void **)((long)pvVar217 + 8) = pvVar228;
                    *(undefined2 *)((long)pvVar217 + 0x12) = 0;
                    pvVar217 = *(void **)((long)pvVar217 + 0x20);
                  } while (pvVar217 != (void *)0x0);
                }
                pMStack_4a0 = (MIR_context_t)0x148778;
                remove_insn_ssa_edges(pMVar83);
                pMStack_4a0 = (MIR_context_t)0x148783;
                gen_delete_insn(pgVar120,pMVar83);
                pbVar105 = local_358;
                pbVar85 = local_358;
                if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                  pMStack_4a0 = (MIR_context_t)0x1487b0;
                  fwrite(" on ",4,1,(FILE *)pgVar120->debug_file);
                  pMStack_4a0 = (MIR_context_t)0x1487d5;
                  MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar98,pMVar15,0);
                  pMStack_4a0 = (MIR_context_t)0x1487ef;
                  fwrite(" and ",5,1,(FILE *)pgVar120->debug_file);
                  pMStack_4a0 = (MIR_context_t)0x148807;
                  MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar100,pMVar15,1);
                  pbVar105 = local_358;
                  pbVar85 = local_358;
                }
              }
            }
          }
        }
        goto joined_r0x001473ab;
      }
      pgVar211 = (gen_ctx_t)local_300->to_free;
      local_358 = pbVar85;
    } while (pgVar211 != (gen_ctx_t)0x0);
  }
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    auVar260 = ZEXT1664(auVar260._0_16_);
    pMStack_4a0 = (MIR_context_t)0x148849;
    fwrite("+++++++++++++MIR after Copy Propagation:\n",0x29,1,(FILE *)pgVar120->debug_file);
    pMStack_4a0 = (MIR_context_t)0x148866;
    print_CFG(pgVar120,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  auVar255 = auVar260._0_16_;
  if (pgVar120->optimize_level < 2) goto LAB_0014afda;
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    auVar260 = ZEXT1664(auVar255);
    pMStack_4a0 = (MIR_context_t)0x148898;
    fwrite("+++++++++++++DSE:\n",0x12,1,(FILE *)pgVar120->debug_file);
  }
  pbVar99 = (bb_t)pgVar120->temp_bitmap;
  pbVar81 = (pgVar120->curr_cfg->bbs).head;
  if (pbVar81 != (bb_t_conflict)0x0) {
    pcVar79 = (char *)(pbVar81->bb_link).next;
    while( true ) {
      pVVar92 = pbVar81->in;
      if ((((pVVar92 == (bitmap_t)0x0) || (pVVar205 = pbVar81->out, pVVar205 == (bitmap_t)0x0)) ||
          (pVVar110 = pbVar81->gen, pVVar110 == (bitmap_t)0x0)) ||
         (pVVar19 = pbVar81->kill, pVVar19 == (bitmap_t)0x0)) goto LAB_0014f3a3;
      if (pVVar92->varr == (bitmap_el_t *)0x0) break;
      pVVar92->els_num = 0;
      if (pVVar205->varr == (bitmap_el_t *)0x0) goto LAB_0014f5e1;
      pVVar205->els_num = 0;
      if (pVVar110->varr == (bitmap_el_t *)0x0) goto LAB_0014f5e9;
      pVVar110->els_num = 0;
      if (pVVar19->varr == (bitmap_el_t *)0x0) goto LAB_0014f5f1;
      pVVar19->els_num = 0;
      pbVar81 = (pbVar81->bb_link).next;
      if (pbVar81 == (bb_t)0x0) goto LAB_00148955;
    }
    pMStack_4a0 = (MIR_context_t)0x14f5e1;
    generate_func_code_cold_39();
LAB_0014f5e1:
    pMStack_4a0 = (MIR_context_t)0x14f5e9;
    generate_func_code_cold_38();
LAB_0014f5e9:
    pMStack_4a0 = (MIR_context_t)0x14f5f1;
    generate_func_code_cold_37();
LAB_0014f5f1:
    pMStack_4a0 = (MIR_context_t)0x14f5f9;
    generate_func_code_cold_36();
    goto LAB_0014f5f9;
  }
  pcVar79 = (char *)0x0;
LAB_00148955:
  pMVar118 = ((((*local_360)->u).func)->insns).tail;
  if (pMVar118 != (MIR_insn_t_conflict)0x0) {
    uVar70 = pgVar120->optimize_level;
    do {
      if (uVar70 == 0) {
        uVar70 = *(int *)&pMVar118->field_0x18 - 0xa7;
        pMVar83 = pMVar118;
        if ((uVar70 < 0xe) && ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)) {
          pMVar83 = (MIR_insn_t_conflict)pMVar118->data;
        }
      }
      else {
        pMVar83 = (MIR_insn_t_conflict)((long)pMVar118->data + 0x30);
      }
      pvVar217 = pMVar83->data;
      while( true ) {
        uVar70 = pgVar120->optimize_level;
        if (uVar70 == 0) {
          uVar73 = *(int *)&pMVar118->field_0x18 - 0xa7;
          pMVar88 = pMVar118;
          if ((uVar73 < 0xe) && ((0x2007U >> (uVar73 & 0x1f) & 1) != 0)) {
            pMVar88 = (MIR_insn_t)pMVar118->data;
          }
        }
        else {
          pMVar88 = (MIR_insn_t)((long)pMVar118->data + 0x30);
        }
        if (pMVar88->data != pvVar217) break;
        uVar241 = *(ulong *)&pMVar118->field_0x18;
        if (0xfffffffc < (int)uVar241 - 0xaaU) {
          auVar260 = ZEXT1664(auVar260._0_16_);
          pMStack_4a0 = (MIR_context_t)0x148a0d;
          update_call_mem_live(pgVar120,*(bitmap_t *)((long)pvVar217 + 0x78),pMVar118);
          uVar241 = *(ulong *)&pMVar118->field_0x18;
        }
        if ((uVar241 & 0xfffffffc) == 0) {
          auVar255 = auVar260._0_16_;
          if (pMVar118->ops[0].field_0x8 == '\v') {
            uVar70 = pMVar118->ops[0].u.mem.nloc;
            uVar241 = (ulong)uVar70;
            if (uVar241 != 0) {
              plVar198 = *(long **)((long)pvVar217 + 0x78);
              if (plVar198 == (long *)0x0) goto LAB_0014f818;
              if (uVar241 < (ulong)(*plVar198 << 6)) {
                bVar249 = (byte)uVar70 & 0x3f;
                puVar2 = (ulong *)(plVar198[2] + (ulong)(uVar70 >> 6) * 8);
                *puVar2 = *puVar2 & (-2L << bVar249 | 0xfffffffffffffffeU >> 0x40 - bVar249);
              }
              pVVar92 = *(bitmap_t *)((long)pvVar217 + 0x80);
              auVar260 = ZEXT1664(auVar255);
              pMStack_4a0 = (MIR_context_t)0x148a80;
              bitmap_expand(pVVar92,uVar241 + 1);
              if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f820;
              pVVar92->varr[uVar70 >> 6] = pVVar92->varr[uVar70 >> 6] | 1L << (uVar241 & 0x3f);
            }
          }
          else if (*(char *)&pMVar118[1].insn_link.prev == '\v') {
            uVar70 = *(uint *)&pMVar118[1].field_0x1c;
            uVar241 = (ulong)uVar70;
            pVVar92 = *(bitmap_t *)((long)pvVar217 + 0x78);
            if (uVar241 == 0) {
              if (pgVar120->mem_attrs == (VARR_mem_attr_t *)0x0) goto LAB_0014f8a2;
              sVar233 = pgVar120->mem_attrs->els_num;
              auVar260 = ZEXT1664(auVar255);
              pMStack_4a0 = (MIR_context_t)0x148b71;
              bitmap_expand(pVVar92,sVar233 + 1);
              if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f8aa;
              if (sVar233 != 0) {
                pbVar93 = pVVar92->varr;
                uVar241 = 1;
                do {
                  uVar234 = (ulong)((uint)uVar241 & 0x3f);
                  lVar207 = 0x40 - (ulong)((int)sVar233 + (uint)uVar241 & 0x3f);
                  if (0x40 - uVar234 <= sVar233) {
                    lVar207 = 0;
                  }
                  pbVar93[uVar241 >> 6] =
                       pbVar93[uVar241 >> 6] |
                       (0xffffffffffffffffU >> (lVar207 + uVar234 & 0x3f)) << uVar234;
                  lVar207 = 0x40 - (lVar207 + uVar234);
                  uVar241 = uVar241 + lVar207;
                  sVar233 = sVar233 - lVar207;
                } while (sVar233 != 0);
              }
            }
            else {
              auVar260 = ZEXT1664(auVar255);
              pMStack_4a0 = (MIR_context_t)0x148ad3;
              bitmap_expand(pVVar92,uVar241 + 1);
              if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f86c;
              uVar70 = uVar70 >> 6;
              uVar234 = 1L << (uVar241 & 0x3f);
              pVVar92->varr[uVar70] = pVVar92->varr[uVar70] | uVar234;
              pVVar92 = *(bitmap_t *)((long)pvVar217 + 0x80);
              if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f871;
              if (uVar241 < pVVar92->els_num << 6) {
                pVVar92->varr[uVar70] = pVVar92->varr[uVar70] & ~uVar234;
              }
              pvVar228 = pMVar118[1].data;
              if (pvVar228 == (void *)0x0) {
                uVar70 = 0;
              }
              else {
                uVar70 = *(byte *)(*(long *)((long)pvVar228 + 8) + 9) >> 1 & 1;
              }
              pMStack_4a0 = (MIR_context_t)0x148bfa;
              make_live_from_mem(pgVar120,(MIR_op_t *)(pMVar118 + 1),
                                 *(bitmap_t *)((long)pvVar217 + 0x78),pVVar92,uVar70);
            }
          }
        }
        pMVar118 = (pMVar118->insn_link).prev;
        if (pMVar118 == (MIR_insn_t)0x0) goto LAB_00148bff;
      }
    } while( true );
  }
LAB_00148bff:
  pVVar129 = pgVar120->mem_attrs;
  if (pVVar129 == (VARR_mem_attr_t *)0x0) {
    pMStack_4a0 = (MIR_context_t)0x14f89d;
    generate_func_code_cold_168();
LAB_0014f89d:
    pMStack_4a0 = (MIR_context_t)0x14f8a2;
    generate_func_code_cold_164();
LAB_0014f8a2:
    pMStack_4a0 = (MIR_context_t)0x14f8aa;
    generate_func_code_cold_43();
LAB_0014f8aa:
    pMStack_4a0 = (MIR_context_t)0x14f8af;
    generate_func_code_cold_42();
    goto LAB_0014f8af;
  }
  pmVar130 = pVVar129->varr;
  uVar241 = 1;
  while (auVar255 = auVar260._0_16_, uVar241 < pVVar129->els_num) {
    if ((pmVar130[uVar241].alloca_flag & 2) == 0) {
      pVVar92 = ((bb_t)pcVar79)->in;
      auVar260 = ZEXT1664(auVar255);
      pMStack_4a0 = (MIR_context_t)0x148c66;
      bitmap_expand(pVVar92,uVar241 + 1);
      if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f6af;
      uVar234 = 1L << (uVar241 & 0x3f);
      pVVar92->varr[uVar241 >> 6] = pVVar92->varr[uVar241 >> 6] | uVar234;
      pVVar92 = ((bb_t)pcVar79)->out;
      pMStack_4a0 = (MIR_context_t)0x148c98;
      bitmap_expand(pVVar92,uVar241 + 1);
      if (pVVar92 != (bitmap_t)0x0) {
        pVVar92->varr[uVar241 >> 6] = pVVar92->varr[uVar241 >> 6] | uVar234;
        pVVar129 = pgVar120->mem_attrs;
        goto LAB_00148cc0;
      }
      goto LAB_0014f6b4;
    }
LAB_00148cc0:
    uVar241 = uVar241 + 1;
    if (pVVar129 == (VARR_mem_attr_t *)0x0) {
      auVar255 = auVar260._0_16_;
      pMStack_4a0 = (MIR_context_t)0x148cd1;
      generate_func_code_cold_165();
      break;
    }
  }
  pcVar221 = (char *)0x0;
  auVar260 = ZEXT1664(auVar255);
  pMStack_4a0 = (MIR_context_t)0x148cf3;
  solve_dataflow(pgVar120,0,mem_live_con_func_0,mem_live_con_func_n,mem_live_trans_func);
  if (((pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) &&
     (pbVar81 = (pgVar120->curr_cfg->bbs).head, pbVar81 != (bb_t_conflict)0x0)) {
    pcVar79 = "   Mem live out:";
    do {
      pMStack_4a0 = (MIR_context_t)0x148d4a;
      fprintf((FILE *)pgVar120->debug_file,"BB %3lu:\n",pbVar81->index);
      pMStack_4a0 = (MIR_context_t)0x148d62;
      output_bitmap(pgVar120,"   Mem live in:",pbVar81->in,0,(MIR_reg_t *)0x0);
      pMStack_4a0 = (MIR_context_t)0x148d76;
      output_bitmap(pgVar120,"   Mem live out:",pbVar81->out,0,(MIR_reg_t *)0x0);
      pMStack_4a0 = (MIR_context_t)0x148d8a;
      output_bitmap(pgVar120,"   Mem live gen:",pbVar81->gen,0,(MIR_reg_t *)0x0);
      pcVar221 = "   Mem live kill:";
      pMStack_4a0 = (MIR_context_t)0x148da1;
      output_bitmap(pgVar120,"   Mem live kill:",pbVar81->kill,0,(MIR_reg_t *)0x0);
      pbVar81 = (pbVar81->bb_link).next;
    } while (pbVar81 != (bb_t)0x0);
  }
  pbVar81 = (pgVar120->curr_cfg->bbs).head;
  if (pbVar81 == (bb_t_conflict)0x0) {
    local_400 = (MIR_context_t)0x0;
  }
  else {
    local_400 = (MIR_context_t)0x0;
    do {
      pcVar221 = (char *)pbVar81->out;
      pMStack_4a0 = (MIR_context_t)0x148de1;
      bitmap_copy((bitmap_t)pbVar99,(const_bitmap_t)pcVar221);
      pbVar201 = (pbVar81->bb_insns).tail;
LAB_00148de5:
      pbVar85 = pbVar201;
      if (pbVar85 != (bb_insn_t_conflict)0x0) {
        pcVar79 = (char *)pbVar85->insn;
        pbVar201 = (pbVar85->bb_insn_link).prev;
        sVar233 = ((bb_t)pcVar79)->bfs;
        if (0xfffffffc < (int)sVar233 - 0xaaU) {
          pMStack_4a0 = (MIR_context_t)0x148e1b;
          pcVar221 = (char *)pbVar99;
          update_call_mem_live(pgVar120,(bitmap_t)pbVar99,(MIR_insn_t)pcVar79);
          sVar233 = ((bb_t)pcVar79)->bfs;
        }
        if ((sVar233 & 0xfffffffc) == 0) {
          if (*(char *)&(((bb_t)pcVar79)->bb_link).next != '\v') {
            if (*(char *)&(((bb_t)pcVar79)->bb_insns).tail == '\v') {
              uVar70 = *(uint *)((long)&((bb_t)pcVar79)->in + 4);
              uVar241 = (ulong)uVar70;
              if (uVar241 == 0) {
                if (pgVar120->mem_attrs == (VARR_mem_attr_t *)0x0) {
                  pMStack_4a0 = (MIR_context_t)0x14f6e5;
                  generate_func_code_cold_48();
                }
                else {
                  pcVar79 = (char *)pgVar120->mem_attrs->els_num;
                  pcVar221 = (char *)((long)&((bb_t)pcVar79)->index + 1);
                  pMStack_4a0 = (MIR_context_t)0x148f61;
                  bitmap_expand((bitmap_t)pbVar99,(size_t)pcVar221);
                  if (pbVar99 != (bb_t)0x0) {
                    if ((bb_t)pcVar79 != (bb_t)0x0) {
                      sVar233 = pbVar99->rpost;
                      uVar241 = 1;
                      do {
                        uVar234 = (ulong)((uint)uVar241 & 0x3f);
                        lVar207 = 0x40 - (ulong)((int)pcVar79 + (uint)uVar241 & 0x3f);
                        if ((bb_t)(0x40 - uVar234) <= pcVar79) {
                          lVar207 = 0;
                        }
                        pcVar221 = (char *)((0xffffffffffffffffU >> (lVar207 + uVar234 & 0x3f)) <<
                                           uVar234);
                        puVar2 = (ulong *)(sVar233 + (uVar241 >> 6) * 8);
                        *puVar2 = *puVar2 | (ulong)pcVar221;
                        lVar207 = 0x40 - (lVar207 + uVar234);
                        uVar241 = uVar241 + lVar207;
                        pcVar79 = (char *)((long)pcVar79 - lVar207);
                      } while ((bb_t)pcVar79 != (bb_t)0x0);
                      pcVar79 = (char *)0x0;
                    }
                    goto LAB_00148de5;
                  }
                }
                pMStack_4a0 = (MIR_context_t)0x14f6ea;
                generate_func_code_cold_47();
LAB_0014f6ea:
                pMStack_4a0 = (MIR_context_t)0x14f709;
                __assert_fail("addr_info->base != ((void*)0) || addr_info->scale != 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x164d,
                              "int update_addr_p(gen_ctx_t, bb_t, MIR_op_t *, MIR_op_t *, addr_info_t *)"
                             );
              }
              pMStack_4a0 = (MIR_context_t)0x148ef0;
              bitmap_expand((bitmap_t)pbVar99,uVar241 + 1);
              if (pbVar99 == (bb_t)0x0) {
                pMStack_4a0 = (MIR_context_t)0x14f5ba;
                generate_func_code_cold_46();
                goto LAB_0014f5ba;
              }
              pcVar79 = (char *)&((bb_t)pcVar79)->bb_insns;
              puVar2 = (ulong *)(pbVar99->rpost + (ulong)(uVar70 >> 6) * 8);
              *puVar2 = *puVar2 | 1L << (uVar241 & 0x3f);
              if (((DLIST_bb_insn_t *)pcVar79)->head == (bb_insn_t)0x0) {
                uVar70 = 0;
              }
              else {
                uVar70 = *(byte *)(*(long *)&((DLIST_bb_insn_t *)pcVar79)->head->gvn_val_const_p + 9
                                  ) >> 1 & 1;
              }
              pMStack_4a0 = (MIR_context_t)0x148fed;
              pcVar221 = pcVar79;
              make_live_from_mem(pgVar120,(MIR_op_t *)pcVar79,(bitmap_t)pbVar99,(bitmap_t)0x0,uVar70
                                );
            }
            goto LAB_00148de5;
          }
          uVar70 = *(uint *)((long)&(((bb_t)pcVar79)->in_edges).tail + 4);
          uVar241 = (ulong)uVar70;
          if (uVar241 == 0) goto LAB_00148de5;
          if (pbVar99 == (bb_t)0x0) {
            pMStack_4a0 = (MIR_context_t)0x14f502;
            generate_func_code_cold_49();
            goto LAB_0014f502;
          }
          if (uVar241 < pbVar99->index << 6) {
            uVar234 = (ulong)(uVar70 >> 6);
            pcVar221 = *(char **)(pbVar99->rpost + uVar234 * 8);
            *(ulong *)(pbVar99->rpost + uVar234 * 8) = (ulong)pcVar221 & ~(1L << (uVar241 & 0x3f));
            if (((ulong)pcVar221 >> (uVar241 & 0x3f) & 1) != 0) goto LAB_00148de5;
          }
          if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x148e9e;
            fwrite("Removing dead store ",0x14,1,(FILE *)pgVar120->debug_file);
            pMStack_4a0 = (MIR_context_t)0x148eab;
            print_bb_insn(pgVar120,pbVar85,0);
          }
          pMStack_4a0 = (MIR_context_t)0x148eb3;
          remove_insn_ssa_edges((MIR_insn_t)pcVar79);
          pMStack_4a0 = (MIR_context_t)0x148ebe;
          pcVar221 = pcVar79;
          gen_delete_insn(pgVar120,(MIR_insn_t)pcVar79);
          local_400 = (MIR_context_t)((long)local_400 + 1);
        }
        goto LAB_00148de5;
      }
      pbVar81 = (pbVar81->bb_link).next;
    } while (pbVar81 != (bb_t)0x0);
  }
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (0 < pgVar120->debug_level)) {
    pcVar221 = "%5ld removed dead stores\n";
    pMStack_4a0 = (MIR_context_t)0x14903a;
    fprintf((FILE *)pgVar120->debug_file,"%5ld removed dead stores\n",local_400);
    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
      pMStack_4a0 = (MIR_context_t)0x14905f;
      fwrite("+++++++++++++MIR after DSE:\n",0x1c,1,(FILE *)pgVar120->debug_file);
      pcVar221 = &DAT_00000001;
      pMStack_4a0 = (MIR_context_t)0x14907c;
      print_CFG(pgVar120,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
  }
  auVar255 = auVar260._0_16_;
  if (pgVar120->optimize_level < 2) goto LAB_0014afda;
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pcVar221 = (char *)0x24;
    pMStack_4a0 = (MIR_context_t)0x1490ab;
    fwrite("+++++++++++++Dead code elimination:\n",0x24,1,(FILE *)pgVar120->debug_file);
  }
  pVVar126 = pgVar120->temp_bb_insns;
  if ((pVVar126 == (VARR_bb_insn_t *)0x0) || (pVVar126->varr == (bb_insn_t_conflict *)0x0))
  goto LAB_0014f89d;
  pVVar126->els_num = 0;
  pbVar81 = (pgVar120->curr_cfg->bbs).head;
  if (pbVar81 != (bb_t_conflict)0x0) {
    do {
      for (pbVar99 = (bb_t)(pbVar81->bb_insns).head; pbVar99 != (bb_t)0x0;
          pbVar99 = (pbVar99->bb_link).next) {
        pMStack_4a0 = (MIR_context_t)0x1490f5;
        pcVar221 = (char *)pbVar99;
        iVar71 = ssa_dead_insn_p(pgVar120,(bb_insn_t_conflict)pbVar99);
        if (iVar71 != 0) {
          pVVar126 = pgVar120->temp_bb_insns;
          ppbVar94 = pVVar126->varr;
          if (ppbVar94 == (bb_insn_t_conflict *)0x0) goto LAB_0014f2ee;
          sVar233 = pVVar126->els_num;
          uVar241 = sVar233 + 1;
          if (pVVar126->size < uVar241) {
            pcVar79 = (char *)((uVar241 >> 1) + uVar241);
            pcVar221 = (char *)((long)pcVar79 * 8);
            pMStack_4a0 = (MIR_context_t)0x149133;
            ppbVar94 = (bb_insn_t_conflict *)realloc(ppbVar94,(size_t)pcVar221);
            pVVar126->varr = ppbVar94;
            pVVar126->size = (size_t)pcVar79;
            sVar233 = pVVar126->els_num;
            uVar241 = sVar233 + 1;
          }
          pVVar126->els_num = uVar241;
          ppbVar94[sVar233] = (bb_insn_t_conflict)pbVar99;
        }
      }
      pbVar81 = (pbVar81->bb_link).next;
    } while (pbVar81 != (bb_t)0x0);
    pVVar126 = pgVar120->temp_bb_insns;
    if (pVVar126 != (VARR_bb_insn_t *)0x0) goto LAB_00149168;
    goto LAB_0014f6a2;
  }
LAB_00149168:
  while( true ) {
    iVar71 = (int)pcVar221;
    sVar233 = pVVar126->els_num;
    if (sVar233 == 0) break;
    if (pVVar126->varr == (bb_insn_t_conflict *)0x0) goto LAB_0014f6b9;
    pVVar126->els_num = sVar233 - 1;
    pbVar85 = pVVar126->varr[sVar233 - 1];
    pcVar221 = (char *)pbVar85->insn;
    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
      pMStack_4a0 = (MIR_context_t)0x1491c4;
      fprintf((FILE *)pgVar120->debug_file,"  Removing dead insn %-5lu",(ulong)pbVar85->index);
      pMStack_4a0 = (MIR_context_t)0x1491d1;
      print_bb_insn(pgVar120,pbVar85,0);
    }
    uVar241 = ((bb_t)pcVar221)->bfs >> 0x20;
    if (uVar241 != 0) {
      sVar233 = 0;
      pbVar99 = (bb_t)0x0;
      do {
        while( true ) {
          pMStack_4a0 = (MIR_context_t)0x14926e;
          MIR_insn_op_mode(pgVar120->ctx,(MIR_insn_t_conflict)pcVar221,sVar233,(int *)&local_218);
          pcVar79 = (char *)pbVar99;
          if (((uint)local_218.tv_sec != 0) &&
             (*(char *)&(&((bb_t)pcVar221)->bb_link)[sVar233 * 3].next != '\v')) goto LAB_001493a6;
          if ((bb_t)&DAT_00000001 < pbVar99) break;
          cVar66 = *(char *)&(&((bb_t)pcVar221)->bb_link)[sVar233 * 3].next;
          if (cVar66 == '\v') {
            while (*(int *)((long)&(&((bb_t)pcVar221)->out_edges)[sVar233 * 3].head +
                           (ulong)(pbVar99 != (bb_t)0x0) * 4) == -1) {
              bVar250 = pbVar99 != (bb_t)0x0;
              pbVar99 = (bb_t)&DAT_00000001;
              pcVar79 = (char *)pbVar99;
              if (bVar250) goto LAB_001493a4;
            }
            pcVar79 = (char *)((long)&pbVar99->index + 1);
          }
          else {
            if (pbVar99 == (bb_t)&DAT_00000001) break;
            pcVar79 = &DAT_00000001;
            pbVar99 = (bb_t)0x0;
            if (cVar66 != '\x02') goto LAB_001493a6;
          }
          pbVar99 = (&((bb_t)pcVar221)->bb_link)[(long)(int)sVar233 * 3].prev;
          if (pbVar99 != (bb_t)0x0) {
            pbVar85 = (bb_insn_t_conflict)pbVar99->pre;
            pMStack_4a0 = (MIR_context_t)0x1492fe;
            remove_ssa_edge((ssa_edge_t_conflict)pbVar99);
            pMStack_4a0 = (MIR_context_t)0x14931f;
            iVar71 = ssa_dead_insn_p(pgVar120,pbVar85);
            if (iVar71 != 0) {
              pVVar126 = pgVar120->temp_bb_insns;
              ppbVar94 = pVVar126->varr;
              if (ppbVar94 == (bb_insn_t_conflict *)0x0) goto LAB_0014f44a;
              sVar220 = pVVar126->els_num;
              uVar234 = sVar220 + 1;
              if (pVVar126->size < uVar234) {
                sVar220 = (uVar234 >> 1) + uVar234;
                pMStack_4a0 = (MIR_context_t)0x149360;
                ppbVar94 = (bb_insn_t_conflict *)realloc(ppbVar94,sVar220 * 8);
                pVVar126->varr = ppbVar94;
                pVVar126->size = sVar220;
                sVar220 = pVVar126->els_num;
                uVar234 = sVar220 + 1;
              }
              pVVar126->els_num = uVar234;
              ppbVar94[sVar220] = pbVar85;
            }
          }
          pbVar99 = (bb_t)pcVar79;
          if (uVar241 <= sVar233) goto LAB_001491e3;
        }
LAB_001493a4:
        pbVar99 = (bb_t)0x0;
LAB_001493a6:
        sVar233 = sVar233 + 1;
      } while (sVar233 < uVar241);
    }
LAB_001491e3:
    pMStack_4a0 = (MIR_context_t)0x1491ee;
    gen_delete_insn(pgVar120,(MIR_insn_t)pcVar221);
    pVVar126 = pgVar120->temp_bb_insns;
    if (pVVar126 == (VARR_bb_insn_t *)0x0) goto LAB_0014f6a2;
  }
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (0 < pgVar120->debug_level)) {
    iVar71 = 0x1b3ec1;
    pMStack_4a0 = (MIR_context_t)0x1493de;
    fprintf((FILE *)pgVar120->debug_file,"%5ld removed SSA dead insns\n");
    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
      pMStack_4a0 = (MIR_context_t)0x149403;
      fwrite("+++++++++++++MIR after dead code elimination:\n",0x2e,1,(FILE *)pgVar120->debug_file);
      iVar71 = 1;
      pMStack_4a0 = (MIR_context_t)0x149423;
      print_CFG(pgVar120,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
  }
  auVar255 = auVar260._0_16_;
  if (pgVar120->optimize_level < 2) goto LAB_0014afda;
  pMStack_4a0 = (MIR_context_t)0x149435;
  build_loop_tree(pgVar120);
  if ((pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x14944a;
    print_loop_tree(pgVar120,iVar71);
  }
  plVar222 = pgVar120->curr_cfg->root_loop_node;
  for (plVar104 = (plVar222->children).head; plVar104 != (loop_node_t)0x0;
      plVar104 = (plVar104->children_link).next) {
    if (plVar104->bb == (bb_t)0x0) {
      pMStack_4a0 = (MIR_context_t)0x149473;
      licm_add_loop_preheaders(pgVar120,plVar222);
      plVar222 = pgVar120->curr_cfg->root_loop_node;
      pMStack_4a0 = (MIR_context_t)0x149486;
      iVar71 = loop_licm(pgVar120,plVar222);
      if (((iVar71 != 0) && ((FILE *)pgVar120->debug_file != (FILE *)0x0)) &&
         (1 < pgVar120->debug_level)) {
        pMStack_4a0 = (MIR_context_t)0x1494af;
        fwrite("+++++++++++++MIR after loop invariant motion:\n",0x2e,1,(FILE *)pgVar120->debug_file
              );
        plVar222 = (loop_node_t_conflict)&DAT_00000001;
        pMStack_4a0 = (MIR_context_t)0x1494cf;
        print_CFG(pgVar120,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      break;
    }
  }
  pMStack_4a0 = (MIR_context_t)0x1494df;
  destroy_loop_tree((gen_ctx_t)pgVar120->curr_cfg->root_loop_node,plVar222);
  auVar255 = auVar260._0_16_;
  pfVar80 = pgVar120->curr_cfg;
  pfVar80->root_loop_node = (loop_node_t_conflict)0x0;
  if (pgVar120->optimize_level < 2) goto LAB_0014afda;
  pMVar14 = pgVar120->ctx;
  pMVar15 = (pgVar120->curr_func_item->u).func;
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x149531;
    fwrite("+++++++++++++Pressure Relief:\n",0x1e,1,(FILE *)pgVar120->debug_file);
    pfVar80 = pgVar120->curr_cfg;
  }
  pbVar81 = (pfVar80->bbs).head;
  if (pbVar81 != (bb_t_conflict)0x0) {
    bVar250 = false;
    do {
      pbVar201 = (pbVar81->bb_insns).head;
      while (pbVar114 = pbVar201, pbVar114 != (bb_insn_t)0x0) {
        pMVar118 = pbVar114->insn;
        pbVar201 = (pbVar114->bb_insn_link).next;
        if ((((*(uint *)&pMVar118->field_0x18 & 0xfffffffc) == 0) &&
            (pMVar118->ops[0].field_0x8 == '\x02')) &&
           ((cVar66 = *(char *)&pMVar118[1].insn_link.prev, cVar66 != '\x02' &&
            (((cVar66 != '\v' &&
              (puVar113 = (undefined8 *)pMVar118->ops[0].data, puVar113 != (undefined8 *)0x0)) &&
             (puVar113[4] == 0)))))) {
          pcVar79 = (char *)*puVar113;
          pbVar82 = (bb_t_conflict)(((bb_t)pcVar79)->in_edges).head;
          if ((pbVar82 != pbVar81) &&
             (pMVar88 = (MIR_insn_t)((bb_t)pcVar79)->index, *(int *)&pMVar88->field_0x18 != 0xba)) {
            plVar222 = pbVar82->loop_node;
            if (plVar222 == (loop_node_t_conflict)0x0) {
LAB_001495d7:
              if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
                pMStack_4a0 = (MIR_context_t)0x1495f7;
                fprintf((FILE *)pgVar120->debug_file,"  Move insn %-5lu",(ulong)pbVar114->index);
                pMStack_4a0 = (MIR_context_t)0x149621;
                MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar118,pMVar15,0);
                pMStack_4a0 = (MIR_context_t)0x149638;
                fprintf((FILE *)pgVar120->debug_file,"  before insn %-5lu",
                        (ulong)*(uint *)((long)&((bb_t)pcVar79)->pre + 4));
                pMStack_4a0 = (MIR_context_t)0x149659;
                MIR_output_insn(pMVar14,pgVar120->debug_file,
                                (MIR_insn_t_conflict)((bb_t)pcVar79)->index,pMVar15,1);
                pMVar88 = (MIR_insn_t)((bb_t)pcVar79)->index;
              }
              pMStack_4a0 = (MIR_context_t)0x149668;
              gen_move_insn_before(pgVar120,pMVar88,pMVar118);
              bVar250 = true;
            }
            else {
              do {
                plVar222 = plVar222->parent;
                if (plVar222 == (loop_node_t)0x0) goto LAB_001495d7;
              } while (plVar222 != pbVar81->loop_node->parent);
            }
          }
        }
      }
      pbVar81 = (pbVar81->bb_link).next;
    } while (pbVar81 != (bb_t)0x0);
    if (((bVar250) && ((FILE *)pgVar120->debug_file != (FILE *)0x0)) && (1 < pgVar120->debug_level))
    {
      pMStack_4a0 = (MIR_context_t)0x1496b8;
      fwrite("+++++++++++++MIR after pressure relief:\n",0x28,1,(FILE *)pgVar120->debug_file);
      pMStack_4a0 = (MIR_context_t)0x1496dd;
      print_CFG(pgVar120,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
  }
  auVar255 = auVar260._0_16_;
  if (pgVar120->optimize_level < 2) goto LAB_0014afda;
  pgVar211 = (gen_ctx_t)(pgVar120->curr_cfg->bbs).head;
  if (pgVar211 != (gen_ctx_t)0x0) {
    pMVar14 = pgVar120->ctx;
    do {
      if ((bb_insn_t_conflict)pgVar211->temp_bitmap != (bb_insn_t_conflict)0x0) {
        pbVar85 = (bb_insn_t_conflict)pgVar211->temp_bitmap;
        do {
          pcVar79 = (char *)pbVar85->insn;
          pbVar201 = (pbVar85->bb_insn_link).next;
          iVar71 = (int)((bb_t)pcVar79)->bfs;
          if (iVar71 != 0xb4) {
            if (iVar71 != 0xba) break;
            if ((*(char *)&(((bb_t)pcVar79)->bb_link).next != '\x02') ||
               (uVar70 = *(uint *)&(((bb_t)pcVar79)->in_edges).head, uVar70 < 0x22))
            goto LAB_0014f67e;
            pMStack_4a0 = (MIR_context_t)0x149788;
            MVar74 = MIR_reg_type(pgVar120->ctx,uVar70 - 0x21,(pgVar120->curr_func_item->u).func);
            if (MVar74 == MIR_T_F) {
              MVar218 = MIR_FMOV;
            }
            else if (MVar74 == MIR_T_D) {
              MVar218 = MIR_DMOV;
            }
            else {
              MVar218 = (uint)(MVar74 == MIR_T_LD) * 3;
            }
            pMStack_4a0 = (MIR_context_t)0x1497e2;
            MVar69 = get_new_ssa_reg(pgVar120,uVar70,0x25,1);
            if (MVar69 == 0xffffffff) goto LAB_0014f73c;
            pDVar3 = &((bb_t)pcVar79)->bb_link;
            if (((bb_t)pcVar79)->bfs >> 0x21 != 0) {
              piVar115 = &pgVar211->addr_insn_p;
              uVar241 = 1;
              do {
                plVar198 = *(long **)piVar115;
                pbVar99 = pDVar3[uVar241 * 3].prev;
                pDVar3[uVar241 * 3].prev = (bb_t)0x0;
                pMStack_4a0 = (MIR_context_t)0x14985d;
                _MIR_new_var_op(pMVar14,MVar69);
                auVar260 = ZEXT1664(CONCAT412(local_218.tv_usec._4_4_,
                                              CONCAT48((undefined4)local_218.tv_usec,
                                                       CONCAT44(local_218.tv_sec._4_4_,
                                                                (uint)local_218.tv_sec))));
                pMStack_4a0 = (MIR_context_t)0x1498a8;
                pMVar83 = MIR_new_insn(pMVar14,MVar218);
                lVar207 = *plVar198;
                if (*(undefined8 **)(lVar207 + 0x58) == (undefined8 *)0x0) {
                  do {
                    lVar207 = *(long *)(lVar207 + 0x20);
                    if (lVar207 == 0) {
                      pMStack_4a0 = (MIR_context_t)0x149941;
                      MIR_prepend_insn(pMVar14,*local_360,pMVar83);
                      goto LAB_00149941;
                    }
                  } while (*(undefined8 **)(lVar207 + 0x58) == (undefined8 *)0x0);
                  pMStack_4a0 = (MIR_context_t)0x149924;
                  MIR_insert_insn_after
                            (pMVar14,*local_360,
                             (MIR_insn_t_conflict)**(undefined8 **)(lVar207 + 0x58),pMVar83);
LAB_00149941:
                  pMStack_4a0 = (MIR_context_t)0x149958;
                  pbVar105 = create_bb_insn(pgVar120,pMVar83,(bb_t_conflict)*plVar198);
                  pMStack_4a0 = (MIR_context_t)0x149968;
                  DLIST_bb_insn_t_append((DLIST_bb_insn_t *)(*plVar198 + 0x50),pbVar105);
                }
                else {
                  pMVar118 = (MIR_insn_t)**(undefined8 **)(lVar207 + 0x58);
                  iVar71 = (int)*(undefined8 *)&pMVar118->field_0x18;
                  if (((iVar71 - 0xa5U < 0xffffffd1) && (iVar71 != 0xaa)) && (iVar71 != 0xa6)) {
                    pMStack_4a0 = (MIR_context_t)0x14997d;
                    gen_add_insn_after(pgVar120,pMVar118,pMVar83);
                  }
                  else {
                    pMStack_4a0 = (MIR_context_t)0x1498ef;
                    gen_add_insn_before(pgVar120,pMVar118,pMVar83);
                  }
                }
                pMVar83[1].data = pbVar99;
                pbVar105 = (bb_insn_t_conflict)pMVar83->data;
                pbVar99->index = (size_t)pbVar105;
                *(undefined4 *)((long)&pbVar99->rpost + 4) = 1;
                pMStack_4a0 = (MIR_context_t)0x1499b6;
                add_ssa_edge_1(pgVar120,pbVar105,0,pbVar85,(int)uVar241,0);
                *(undefined1 *)&pDVar3[uVar241 * 3].next = 2;
                piVar115 = (int *)(plVar198 + 3);
                uVar234 = uVar241 + 1;
                *(MIR_reg_t *)&pDVar3[uVar241 * 3 + 1].prev = MVar69;
                uVar241 = uVar234;
              } while (uVar234 < *(uint *)((long)&((bb_t)pcVar79)->bfs + 4));
            }
            pbVar99 = pDVar3->prev;
            pbVar107 = pbVar99;
            if (pbVar99 != (bb_t)0x0) {
LAB_00149a07:
              if (*(gen_ctx_t *)(pbVar107->index + 0x30) == pgVar211) goto code_r0x00149a10;
              pMStack_4a0 = (MIR_context_t)0x149a62;
              _MIR_new_var_op(pMVar14,uVar70);
              pMStack_4a0 = (MIR_context_t)0x149a79;
              _MIR_new_var_op(pMVar14,MVar69);
              pMStack_4a0 = (MIR_context_t)0x149ac8;
              pMVar83 = MIR_new_insn(pMVar14,MVar218);
              pMStack_4a0 = (MIR_context_t)0x149ad9;
              gen_add_insn_after(pgVar120,(MIR_insn_t)pcVar79,pMVar83);
              pMVar83->ops[0].data = (((bb_t)pcVar79)->bb_link).prev;
              auVar5._0_8_ = pMVar83[1].data;
              uVar7 = pMVar83[1].insn_link.prev;
              uVar9 = pMVar83[1].insn_link.next;
              auVar5._16_8_ = uVar9;
              auVar5._8_8_ = uVar7;
              uVar11 = *(undefined8 *)&pMVar83[1].field_0x18;
              auVar5._24_8_ = uVar11;
              auVar6 = *(undefined1 (*) [32])&pMVar83[1].insn_link.next;
              auVar255 = auVar6._0_16_;
              auVar253 = auVar6._16_16_;
              (((bb_t)pcVar79)->in_edges).head = (in_edge_t_conflict)auVar255._0_8_;
              (((bb_t)pcVar79)->in_edges).tail = (in_edge_t_conflict)auVar255._8_8_;
              (((bb_t)pcVar79)->out_edges).head = (out_edge_t)auVar253._0_8_;
              (((bb_t)pcVar79)->out_edges).tail = (out_edge_t)auVar253._8_8_;
              (((bb_t)pcVar79)->bb_link).prev = (bb_t)SUB168(auVar5._0_16_,0);
              (((bb_t)pcVar79)->bb_link).next = (bb_t)SUB168(auVar5._0_16_,8);
              (((bb_t)pcVar79)->in_edges).head = (in_edge_t_conflict)SUB168(auVar5._16_16_,0);
              (((bb_t)pcVar79)->in_edges).tail = (in_edge_t_conflict)SUB168(auVar5._16_16_,8);
              pbVar105 = (bb_insn_t_conflict)pMVar83->data;
              for (pvVar217 = pMVar83->ops[0].data; pvVar217 != (void *)0x0;
                  pvVar217 = *(void **)((long)pvVar217 + 0x20)) {
                *(bb_insn_t_conflict *)((long)pvVar217 + 8) = pbVar105;
                *(undefined2 *)((long)pvVar217 + 0x12) = 0;
              }
              auVar260 = ZEXT1664(auVar5._0_16_);
              pMStack_4a0 = (MIR_context_t)0x149b34;
              add_ssa_edge_1(pgVar120,pbVar85,0,pbVar105,1,0);
              goto LAB_00149b34;
            }
LAB_00149a19:
            *(MIR_reg_t *)&(((bb_t)pcVar79)->in_edges).head = MVar69;
            pMStack_4a0 = (MIR_context_t)0x149a35;
            change_ssa_edge_list_def((ssa_edge_t_conflict)pbVar99,pbVar85,0,uVar70,MVar69);
          }
LAB_00149b34:
          pbVar85 = pbVar201;
        } while (pbVar201 != (bb_insn_t)0x0);
      }
      pgVar211 = (gen_ctx_t)pgVar211->to_free;
    } while (pgVar211 != (gen_ctx_t)0x0);
  }
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x149b6f;
    fwrite("+++++++++++++MIR after transformation to conventional SSA:\n",0x3b,1,
           (FILE *)pgVar120->debug_file);
    pMStack_4a0 = (MIR_context_t)0x149b8f;
    print_CFG(pgVar120,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  for (pbVar81 = (pgVar120->curr_cfg->bbs).head; auVar255 = auVar260._0_16_,
      pbVar81 != (bb_t_conflict)0x0; pbVar81 = (pbVar81->bb_link).next) {
    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
      auVar260 = ZEXT1664(auVar255);
      pMStack_4a0 = (MIR_context_t)0x149bd6;
      fprintf((FILE *)pgVar120->debug_file,"Processing bb%lu\n",pbVar81->index);
    }
    pbVar201 = (pbVar81->bb_insns).tail;
    if (pbVar201 != (bb_insn_t)0x0) {
      do {
        pMVar118 = pbVar201->insn;
        pbVar85 = (pbVar201->bb_insn_link).prev;
        auVar260 = ZEXT1664(auVar260._0_16_);
        pMStack_4a0 = (MIR_context_t)0x149c00;
        iVar71 = ssa_delete_insn_if_dead_p(pgVar120,pbVar201);
        if ((iVar71 != 0) ||
           ((uVar70 = *(int *)&pMVar118->field_0x18 - 0xa7, uVar70 < 0xe &&
            ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)))) goto LAB_00149c1e;
        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
          pMStack_4a0 = (MIR_context_t)0x149c50;
          fwrite("  combining insn ",0x11,1,(FILE *)pgVar120->debug_file);
          pMStack_4a0 = (MIR_context_t)0x149c5d;
          print_bb_insn(pgVar120,pbVar201,0);
        }
        pMVar88 = pbVar201->insn;
        if (((*(int *)&pMVar88->field_0x18 - 0x7bU < 0xfffffffc) ||
            (*(char *)&pMVar88[1].insn_link.prev != '\x02')) || (pMVar88[1].data == (void *)0x0))
        goto LAB_0014a041;
        pbVar105 = *(bb_insn_t_conflict *)((long)pMVar88[1].data + 8);
        pMVar89 = pbVar105->insn;
        if (0x25 < *(int *)&pMVar89->field_0x18 - 0x48U) goto LAB_0014a041;
        pbVar82 = pbVar201->bb;
        uVar70 = *(int *)&pMVar88->field_0x18 - 0x79;
        pgVar211 = (gen_ctx_t)pgVar120->ctx;
        switch(*(int *)&pMVar89->field_0x18) {
        case 0x48:
          bVar250 = uVar70 < 0xfffffffe;
          goto LAB_00149d02;
        case 0x49:
          bVar250 = uVar70 < 0xfffffffe;
          goto LAB_00149d13;
        case 0x4a:
          MVar218 = MIR_FBEQ;
          break;
        case 0x4b:
          MVar218 = MIR_DBEQ;
          break;
        case 0x4c:
          MVar218 = MIR_LDBEQ;
          break;
        case 0x4d:
          bVar250 = 0xfffffffd < uVar70;
LAB_00149d02:
          MVar218 = (uint)bVar250 * 5 + MIR_BEQ;
          goto LAB_00149ebb;
        case 0x4e:
          bVar250 = 0xfffffffd < uVar70;
LAB_00149d13:
          MVar218 = (uint)bVar250 * 5 + MIR_BEQS;
          goto LAB_00149ebb;
        case 0x4f:
          MVar218 = MIR_FBNE;
          break;
        case 0x50:
          MVar218 = MIR_DBNE;
          break;
        case 0x51:
          MVar218 = MIR_LDBNE;
          break;
        case 0x52:
          MVar239 = MIR_BGE;
          MVar218 = MIR_BLT;
          goto LAB_00149e91;
        case 0x53:
          MVar239 = MIR_BGES;
          MVar218 = MIR_BLTS;
          goto LAB_00149e91;
        case 0x54:
          MVar239 = MIR_UBGE;
          MVar218 = MIR_UBLT;
          goto LAB_00149e91;
        case 0x55:
          MVar239 = MIR_UBGES;
          MVar218 = MIR_UBLTS;
          goto LAB_00149e91;
        case 0x56:
          MVar218 = MIR_FBLT;
          break;
        case 0x57:
          MVar218 = MIR_DBLT;
          break;
        case 0x58:
          MVar218 = MIR_LDBLT;
          break;
        case 0x59:
          MVar239 = MIR_BGT;
          MVar218 = MIR_BLE;
          goto LAB_00149e91;
        case 0x5a:
          MVar239 = MIR_BGTS;
          MVar218 = MIR_BLES;
          goto LAB_00149e91;
        case 0x5b:
          MVar239 = MIR_UBGT;
          MVar218 = MIR_UBLE;
          goto LAB_00149e91;
        case 0x5c:
          MVar239 = MIR_UBGTS;
          MVar218 = MIR_UBLES;
          goto LAB_00149e91;
        case 0x5d:
          MVar218 = MIR_FBLE;
          break;
        case 0x5e:
          MVar218 = MIR_DBLE;
          break;
        case 0x5f:
          MVar218 = MIR_LDBLE;
          break;
        case 0x60:
          MVar239 = MIR_BLE;
          MVar218 = MIR_BGT;
          goto LAB_00149e91;
        case 0x61:
          MVar239 = MIR_BLES;
          MVar218 = MIR_BGTS;
          goto LAB_00149e91;
        case 0x62:
          MVar239 = MIR_UBLE;
          MVar218 = MIR_UBGT;
          goto LAB_00149e91;
        case 99:
          MVar239 = MIR_UBLES;
          MVar218 = MIR_UBGTS;
          goto LAB_00149e91;
        case 100:
          MVar218 = MIR_FBGT;
          break;
        case 0x65:
          MVar218 = MIR_DBGT;
          break;
        case 0x66:
          MVar218 = MIR_LDBGT;
          break;
        case 0x67:
          MVar239 = MIR_BLT;
          MVar218 = MIR_BGE;
          goto LAB_00149e91;
        case 0x68:
          MVar239 = MIR_BLTS;
          MVar218 = MIR_BGES;
          goto LAB_00149e91;
        case 0x69:
          MVar239 = MIR_UBLT;
          MVar218 = MIR_UBGE;
          goto LAB_00149e91;
        case 0x6a:
          MVar239 = MIR_UBLTS;
          MVar218 = MIR_UBGES;
LAB_00149e91:
          if (uVar70 < 0xfffffffe) {
            MVar218 = MVar239;
          }
          goto LAB_00149ebb;
        case 0x6b:
          MVar218 = MIR_FBGE;
          break;
        case 0x6c:
          MVar218 = MIR_DBGE;
          break;
        case 0x6d:
          MVar218 = MIR_LDBGE;
        }
        if (0xfffffffd < uVar70) {
LAB_00149ebb:
          auVar260 = ZEXT1664(SUB3216(*(undefined1 (*) [32])pMVar88->ops,0));
          pMStack_4a0 = (MIR_context_t)0x149f2b;
          pMVar83 = MIR_new_insn((MIR_context_t)pgVar211,MVar218);
          pMVar83[1].ops[0].u.i = 0;
          pMVar83[1].data = (void *)0x0;
          pMStack_4a0 = (MIR_context_t)0x149f5b;
          MIR_insert_insn_before((MIR_context_t)pgVar211,pgVar120->curr_func_item,pMVar88,pMVar83);
          pMStack_4a0 = (MIR_context_t)0x149f63;
          remove_insn_ssa_edges(pMVar88);
          pMStack_4a0 = (MIR_context_t)0x149f6e;
          gen_delete_insn(pgVar120,pMVar88);
          pMStack_4a0 = (MIR_context_t)0x149f7c;
          pbVar106 = create_bb_insn(pgVar120,pMVar83,pbVar82);
          pMStack_4a0 = (MIR_context_t)0x149f8e;
          DLIST_bb_insn_t_append(&pbVar82->bb_insns,pbVar106);
          pvVar217 = pMVar89[1].data;
          if (pvVar217 != (void *)0x0) {
            pMStack_4a0 = (MIR_context_t)0x149fb3;
            add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pvVar217 + 8),
                           (uint)*(ushort *)((long)pvVar217 + 0x12),pbVar106,1,0);
          }
          pgVar211 = (gen_ctx_t)&pMVar89[1].ops[0].u;
          sVar233 = ((MIR_str_t *)pgVar211)->len;
          if (sVar233 != 0) {
            pMStack_4a0 = (MIR_context_t)0x149fdb;
            add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)(sVar233 + 8),
                           (uint)*(ushort *)(sVar233 + 0x12),pbVar106,2,0);
          }
          if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x14a009;
            fwrite("      changing to ",0x12,1,(FILE *)pgVar120->debug_file);
            pMStack_4a0 = (MIR_context_t)0x14a019;
            print_bb_insn(pgVar120,pbVar106,1);
          }
          pMStack_4a0 = (MIR_context_t)0x14a029;
          ssa_delete_insn_if_dead_p(pgVar120,pbVar105);
          if (pbVar106 != (bb_insn_t_conflict)0x0) {
            pMVar118 = pbVar106->insn;
            pbVar85 = (pbVar106->bb_insn_link).prev;
            pbVar201 = pbVar106;
          }
        }
LAB_0014a041:
        if (*(int *)&pMVar118->field_0x1c != 0) {
          pgVar211 = (gen_ctx_t)pMVar118->ops;
          uVar241 = 0;
          local_358 = pbVar85;
          local_300 = pgVar211;
          do {
            if (*(char *)(pgVar211->call_used_hard_regs + uVar241 * 6 + -0xc) == '\v') {
              ppVVar208 = pgVar211->call_used_hard_regs + uVar241 * 6 + -0xd;
              if (*(int *)((long)ppVVar208 + 0x24) != -1) goto LAB_0014f6be;
              if (*(MIR_reg_t *)(ppVVar208 + 4) != 0xffffffff) {
                pMStack_4a0 = (MIR_context_t)0x14a0ce;
                _MIR_new_var_op(pgVar120->ctx,*(MIR_reg_t *)(ppVVar208 + 4));
                auVar46._4_4_ = local_218.tv_sec._4_4_;
                auVar46._0_4_ = (uint)local_218.tv_sec;
                auVar46._8_4_ = (undefined4)local_218.tv_usec;
                auVar46._12_4_ = local_218.tv_usec._4_4_;
                auVar260 = ZEXT3264(CONCAT824(apMStack_200[0],CONCAT816(pMStack_208,auVar46)));
                uVar234 = 1;
                local_2f0 = ppVVar208;
                bVar250 = false;
                local_338._32_8_ = apMStack_200[1];
                local_338._40_8_ = apMStack_200[2];
                local_338._8_8_ = auVar46._8_8_;
                local_338._16_8_ = pMStack_208;
                local_338._24_8_ = apMStack_200[0];
                local_338._0_4_ = SUB84(*ppVVar208,0);
                local_338._4_4_ = (undefined4)((ulong)*ppVVar208 >> 0x20);
                local_398._0_4_ = (uint)*(byte *)(ppVVar208 + 2);
                local_398._8_8_ = ppVVar208[5];
                local_378 = 1;
                auStack_388._0_8_ = (MIR_item_t)local_338;
                auStack_388._8_8_ = (MIR_item_t)0x0;
                pMVar209 = (MIR_item_t)0x0;
                pVVar92 = ppVVar208[5];
                pMVar210 = (MIR_item_t)local_338;
                MVar74 = (uint)*(byte *)(ppVVar208 + 2);
                bVar196 = true;
                bVar252 = true;
LAB_0014a155:
                do {
                  bVar251 = bVar252;
                  bVar65 = bVar196;
                  MVar213 = MVar74;
                  pMVar243 = pMVar210;
                  pVVar205 = pVVar92;
                  pMVar199 = pMVar209;
                  uVar219 = local_398._4_4_;
                  bVar249 = (byte)uVar234;
                  local_2b8._0_3_ = (undefined3)((uint)_local_378 >> 8);
                  local_2b8._3_1_ = (undefined1)_uStack_374;
                  uStack_2b4._0_3_ = (undefined3)((uint)_uStack_374 >> 8);
                  bVar252 = !bVar250;
                  pMVar209 = pMVar199;
                  pMVar210 = pMVar243;
                  bVar250 = true;
                  bVar196 = bVar65;
                  if (bVar252) {
                    auVar260 = ZEXT1664(auVar260._0_16_);
                    pMStack_4a0 = (MIR_context_t)0x14a200;
                    iVar71 = var_plus_const(pgVar120,(ssa_edge_t_conflict)pMVar243->data,pbVar81,
                                            (MIR_op_t **)auStack_388,(int64_t *)local_2e8);
                    if (iVar71 == 0) {
                      if (local_378 == '\x01') {
                        pMStack_4a0 = (MIR_context_t)0x14a26d;
                        iVar71 = var_mult_const(pgVar120,(ssa_edge_t_conflict)
                                                         *(void **)auStack_388._0_8_,pbVar81,
                                                (MIR_op_t **)auStack_388,(int64_t *)local_2e8);
                        pMVar210 = (MIR_item_t)auStack_388._8_8_;
                        pMVar209 = (MIR_item_t)auStack_388._0_8_;
                        if (iVar71 == 0) goto LAB_0014a2ad;
                        pMVar244 = (MIR_item_t)auStack_388._0_8_;
                        if (local_2e8[0] != (bb_insn_t)0x1) {
                          auStack_388._0_8_ = auStack_388._8_8_;
                          auStack_388._8_8_ = pMVar209;
                          local_378 = (char)local_2e8[0];
                          bVar196 = false;
                          bVar250 = bVar65;
                          goto LAB_0014a3fc;
                        }
                      }
                      else {
LAB_0014a2ad:
                        pMVar244 = (MIR_item_t)auStack_388._0_8_;
                        pMVar210 = (MIR_item_t)auStack_388._8_8_;
                        if ((MIR_item_t)auStack_388._8_8_ == (MIR_item_t)0x0) {
                          pvVar217 = *(void **)auStack_388._0_8_;
                          if (pvVar217 != (void *)0x0) {
                            if (*(char *)(auStack_388._0_8_ + 8) != '\x02') goto LAB_0014f7ea;
                            pMStack_4a0 = (MIR_context_t)0x14a307;
                            pcVar79 = MIR_reg_hard_reg_name
                                                (pgVar120->ctx,
                                                 *(int *)&((DLIST_LINK_MIR_item_t *)
                                                          (auStack_388._0_8_ + 0x10))->prev - 0x21,
                                                 (pgVar120->curr_func_item->u).func);
                            if (pcVar79 != (char *)0x0) {
                              pMVar209 = (MIR_item_t)0x0;
                              goto LAB_0014a224;
                            }
                            lVar207 = **(long **)((long)pvVar217 + 8);
                            if (((*(int *)(lVar207 + 0x18) == 0x22) &&
                                (*(char *)(lVar207 + 0x58) == '\x02')) &&
                               (*(char *)(lVar207 + 0x88) == '\x02')) {
                              pMVar210 = (MIR_item_t)(lVar207 + 0x50);
                              if ((pMVar210->data != (void *)0x0) &&
                                 (pbVar85 = *(bb_insn_t_conflict *)((long)pMVar210->data + 8),
                                 pbVar85->bb != pbVar81)) {
                                pMStack_4a0 = (MIR_context_t)0x14a398;
                                iVar71 = cycle_phi_p(pbVar85);
                                if (iVar71 != 0) goto LAB_0014a3ed;
                              }
                              pMVar209 = (MIR_item_t)(lVar207 + 0x80);
                              if ((pMVar209->data != (void *)0x0) &&
                                 (pbVar85 = *(bb_insn_t_conflict *)((long)pMVar209->data + 8),
                                 pbVar85->bb != pbVar81)) {
                                pMStack_4a0 = (MIR_context_t)0x14a3d2;
                                iVar71 = cycle_phi_p(pbVar85);
                                if (iVar71 != 0) goto LAB_0014a3ed;
                              }
                              bVar250 = false;
                              bVar196 = false;
                              auStack_388._0_8_ = pMVar210;
                              auStack_388._8_8_ = pMVar209;
                              goto LAB_0014a3fc;
                            }
                          }
LAB_0014a3ed:
                          pMVar210 = (MIR_item_t)0x0;
                        }
                      }
                      pMVar209 = pMVar210;
                      pMVar210 = pMVar244;
                      bVar250 = false;
                    }
                    else {
                      local_398._8_8_ = (long)&local_2e8[0]->insn + (long)(size_t *)local_398._8_8_;
                      pMVar209 = (MIR_item_t)auStack_388._8_8_;
                      pMVar244 = (MIR_item_t)auStack_388._0_8_;
LAB_0014a224:
                      pMVar210 = pMVar244;
                      bVar250 = false;
                    }
                  }
LAB_0014a3fc:
                  pVVar92 = (bitmap_t)local_398._8_8_;
                  MVar74 = local_398._0_4_;
                  uVar234 = (ulong)local_378;
                  if ((((local_398._0_4_ != MVar213) || ((bitmap_t)local_398._8_8_ != pVVar205)) ||
                      (pMVar210 != pMVar243)) || ((pMVar209 != pMVar199 || (local_378 != bVar249))))
                  {
                    auVar260 = ZEXT1664(auVar260._0_16_);
                    pMStack_4a0 = (MIR_context_t)0x14a46b;
                    iVar71 = addr_info_ok_p((gen_ctx_t)pgVar120->ctx,(addr_info_t *)local_398);
                    bVar252 = false;
                    if (iVar71 != 0) goto LAB_0014a155;
                  }
                  local_377 = (undefined3)local_2b8;
                  local_378 = bVar249;
                  uStack_373 = (undefined3)uStack_2b4;
                  uStack_374 = (undefined1)(local_2b8 >> 0x18);
                  if (bVar65) goto LAB_0014a702;
                  auVar260 = ZEXT1664(auVar260._0_16_);
                  pMStack_4a0 = (MIR_context_t)0x14a550;
                  local_398._0_4_ = MVar213;
                  local_398._4_4_ = uVar219;
                  local_398._8_8_ = pVVar205;
                  auStack_388._0_8_ = pMVar243;
                  auStack_388._8_8_ = pMVar199;
                  iVar71 = var_plus_const(pgVar120,(ssa_edge_t_conflict)pMVar199->data,pbVar81,
                                          (MIR_op_t **)(auStack_388 + 8),(int64_t *)local_2e8);
                  if (iVar71 == 0) {
                    pMStack_4a0 = (MIR_context_t)0x14a58f;
                    iVar71 = var_mult_const(pgVar120,*(ssa_edge_t_conflict *)auStack_388._8_8_,
                                            pbVar81,(MIR_op_t **)(auStack_388 + 8),
                                            (int64_t *)local_2e8);
                    uVar234 = (ulong)local_378;
                    if (iVar71 == 0) {
                      if (local_378 == 1 && (MIR_item_t)auStack_388._0_8_ == (MIR_item_t)0x0)
                      goto LAB_0014f6ea;
                    }
                    else {
                      uVar234 = (ulong)(ushort)((ushort)local_378 * (ushort)(byte)local_2e8[0]);
                      local_378 = (char)((ushort)local_378 * (ushort)(byte)local_2e8[0]);
                    }
                  }
                  else {
                    uVar234 = (ulong)local_378;
                    local_398._8_8_ = (long)(size_t *)local_398._8_8_ + uVar234 * (long)local_2e8[0]
                    ;
                  }
                  pMVar209 = (MIR_item_t)auStack_388._8_8_;
                  pMVar210 = (MIR_item_t)auStack_388._0_8_;
                  pVVar92 = (bitmap_t)local_398._8_8_;
                  MVar74 = local_398._0_4_;
                  if (((local_398._0_4_ == MVar213) && ((bitmap_t)local_398._8_8_ == pVVar205)) &&
                     (((MIR_item_t)auStack_388._0_8_ == pMVar243 &&
                      (((MIR_item_t)auStack_388._8_8_ == pMVar199 && ((byte)uVar234 == bVar249))))))
                  break;
                  pMStack_4a0 = (MIR_context_t)0x14a621;
                  iVar71 = addr_info_ok_p((gen_ctx_t)pgVar120->ctx,(addr_info_t *)local_398);
                  bVar250 = true;
                  bVar196 = false;
                  bVar252 = false;
                } while (iVar71 != 0);
                local_377 = (undefined3)local_2b8;
                local_378 = bVar249;
                uStack_373 = (undefined3)uStack_2b4;
                uStack_374 = (undefined1)(local_2b8 >> 0x18);
LAB_0014a702:
                ppVVar208 = local_2f0;
                pgVar211 = local_300;
                pbVar85 = local_358;
                local_398._0_4_ = MVar213;
                local_398._4_4_ = uVar219;
                local_398._8_8_ = pVVar205;
                auStack_388._0_8_ = pMVar243;
                auStack_388._8_8_ = pMVar199;
                if (!bVar251) {
                  auVar260 = ZEXT1664(auVar260._0_16_);
                  pMStack_4a0 = (MIR_context_t)0x14a754;
                  remove_ssa_edge((ssa_edge_t_conflict)*local_2f0);
                  ppVVar208[5] = pVVar205;
                  ppVVar208[4] = (bitmap_t)0xffffffffffffffff;
                  if (pMVar243 != (MIR_item_t)0x0) {
                    *(undefined4 *)(ppVVar208 + 4) = *(undefined4 *)&(pMVar243->item_link).prev;
                    pvVar217 = pMVar243->data;
                    if (pvVar217 != (void *)0x0) {
                      pMStack_4a0 = (MIR_context_t)0x14a7aa;
                      add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pvVar217 + 8),
                                     (uint)*(ushort *)((long)pvVar217 + 0x12),pbVar201,(int)uVar241,
                                     0);
                      pMVar199 = (MIR_item_t)auStack_388._8_8_;
                    }
                  }
                  if (pMVar199 != (MIR_item_t)0x0) {
                    *(undefined4 *)((long)ppVVar208 + 0x24) =
                         *(undefined4 *)&(pMVar199->item_link).prev;
                    pvVar217 = pMVar199->data;
                    if (pvVar217 != (void *)0x0) {
                      pMStack_4a0 = (MIR_context_t)0x14a7f1;
                      add_ssa_edge_1(pgVar120,*(bb_insn_t_conflict *)((long)pvVar217 + 8),
                                     (uint)*(ushort *)((long)pvVar217 + 0x12),pbVar201,(int)uVar241,
                                     1);
                    }
                  }
                  *(byte *)((long)ppVVar208 + 0x11) = local_378;
                  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level))
                  {
                    pMStack_4a0 = (MIR_context_t)0x14a824;
                    fprintf((FILE *)pgVar120->debug_file,"    changing mem op %lu to ",uVar241);
                    pMStack_4a0 = (MIR_context_t)0x14a834;
                    print_insn(pgVar120,pMVar118,1);
                  }
                }
              }
            }
            uVar241 = uVar241 + 1;
          } while (uVar241 < *(uint *)&pMVar118->field_0x1c);
        }
LAB_00149c1e:
        pbVar201 = pbVar85;
      } while (pbVar85 != (bb_insn_t_conflict)0x0);
      pcVar79 = (char *)0x0;
    }
  }
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x14a88a;
    fwrite("+++++++++++++MIR after ssa combine:\n",0x24,1,(FILE *)pgVar120->debug_file);
    pMStack_4a0 = (MIR_context_t)0x14a8aa;
    print_CFG(pgVar120,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  auVar260 = ZEXT1664(auVar255);
  pMStack_4a0 = (MIR_context_t)0x14a8b5;
  undo_build_ssa(pgVar120);
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x14a8da;
    fwrite("+++++++++++++MIR after destroying ssa:\n",0x27,1,(FILE *)pgVar120->debug_file);
    pMStack_4a0 = (MIR_context_t)0x14a8f4;
    print_varr_insns(pgVar120,"undef init",pgVar120->ssa_ctx->undef_insns);
    pMStack_4a0 = (MIR_context_t)0x14a90d;
    print_varr_insns(pgVar120,"arg init",pgVar120->ssa_ctx->arg_bb_insns);
    pMStack_4a0 = (MIR_context_t)0x14a91b;
    fputc(10,(FILE *)pgVar120->debug_file);
    pMStack_4a0 = (MIR_context_t)0x14a938;
    print_CFG(pgVar120,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  auVar255 = auVar260._0_16_;
  if (pgVar120->optimize_level < 2) goto LAB_0014afda;
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x14a967;
    fwrite("+++++++++++++Jump optimization:\n",0x20,1,(FILE *)pgVar120->debug_file);
  }
  ctx_01 = (gen_ctx_t)pgVar120->ctx;
  pMStack_4a0 = (MIR_context_t)0x14a97b;
  __stream = pgVar120;
  lVar207 = remove_unreachable_bbs(pgVar120);
  if (((lVar207 != 0) && (__stream = (gen_ctx_t)pgVar120->debug_file, __stream != (gen_ctx_t)0x0))
     && (0 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x14a9a0;
    fprintf((FILE *)__stream,"%ld deleted unrechable bb insns\n",lVar207);
  }
  auVar255 = auVar260._0_16_;
  pVVar92 = pgVar120->temp_bitmap;
  if ((pVVar92 == (bitmap_t)0x0) || (pVVar92->varr == (bitmap_el_t *)0x0)) {
    pMStack_4a0 = (MIR_context_t)0x14f8d3;
    generate_func_code_cold_163();
    goto LAB_0014f8d3;
  }
  pVVar92->els_num = 0;
  pbVar81 = (pgVar120->curr_cfg->bbs).head;
  if (pbVar81 == (bb_t_conflict)0x0) {
LAB_0014af88:
    pMStack_4a0 = (MIR_context_t)0x14af98;
    enumerate_bbs((gen_ctx_t)(pgVar120->curr_cfg->bbs).head);
    if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
      pMStack_4a0 = (MIR_context_t)0x14afbd;
      fwrite("+++++++++++++MIR after Jump optimization:\n",0x2a,1,(FILE *)pgVar120->debug_file);
      pMStack_4a0 = (MIR_context_t)0x14afda;
      print_CFG(pgVar120,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
    }
    goto LAB_0014afda;
  }
  pbVar99 = pbVar81;
  iVar71 = -1;
  do {
    pbVar99 = (pbVar99->bb_link).next;
    if (pbVar99 == (bb_t)0x0) break;
    bVar250 = iVar71 != 0;
    iVar71 = iVar71 + 1;
  } while (bVar250);
  if (pbVar99 != (bb_t)0x0) {
    do {
      pbVar201 = (pbVar99->bb_insns).tail;
      if (pbVar201 != (bb_insn_t)0x0) {
        uVar241 = *(ulong *)&pbVar201->insn->field_0x18;
        if ((int)uVar241 - 0x76U < 0x2f) {
          uVar234 = 1;
          lVar207 = 0;
LAB_0014aa16:
          lVar242 = uVar234 - lVar207;
          pgVar211 = (gen_ctx_t)((ulong)(uint)((int)lVar207 * 0x30) + 0x30);
          do {
            bm = (gen_ctx_t)pgVar120->temp_bitmap;
            pcVar79 = *(char **)(*(long *)((long)pbVar201->insn->ops + (long)pgVar211 + -0x20) +
                                0x30);
            pMStack_4a0 = (MIR_context_t)0x14aa49;
            __stream = bm;
            bitmap_expand((bitmap_t)bm,(size_t)((long)&((bb_t)pcVar79)->index + 1));
            if (bm == (gen_ctx_t)0x0) goto LAB_0014f765;
            pgVar211 = (gen_ctx_t)((long)pgVar211 + 0x30);
            ppvVar248 = &bm->curr_func_item->data + ((ulong)pcVar79 >> 6);
            *ppvVar248 = (void *)((ulong)*ppvVar248 | 1L << ((ulong)pcVar79 & 0x3f));
            lVar242 = lVar242 + -1;
          } while (lVar242 != 0);
        }
        else if ((int)uVar241 == 0xaa) {
          uVar234 = uVar241 >> 0x20;
          lVar207 = 1;
          if (1 < (int)(uVar241 >> 0x20)) goto LAB_0014aa16;
        }
      }
      pbVar99 = (pbVar99->bb_link).next;
    } while (pbVar99 != (bb_t)0x0);
    pbVar81 = (pgVar120->curr_cfg->bbs).head;
    pbVar99 = (bb_t)0x0;
  }
  auVar255 = auVar260._0_16_;
  if (pbVar81 == (bb_t_conflict)0x0) goto LAB_0014af88;
  iVar71 = -1;
  do {
    pbVar81 = (pbVar81->bb_link).next;
    if (pbVar81 == (bb_t)0x0) break;
    bVar250 = iVar71 != 0;
    iVar71 = iVar71 + 1;
  } while (bVar250);
  if (pbVar81 == (bb_t)0x0) goto LAB_0014af88;
  uVar214 = 0;
  while( true ) {
    pbVar201 = (pbVar81->bb_insns).tail;
    pbVar82 = (pbVar81->bb_link).next;
    if (((pbVar81->index != 2) &&
        (pFVar20 = (FILE *)(pbVar81->in_edges).head, pFVar20 != (FILE *)0x0)) &&
       (pFVar20->_IO_read_base == (char *)0x0)) break;
    if (pbVar201 != (bb_insn_t)0x0) {
      pbVar99 = (bb_t)pbVar201->insn;
      iVar71 = (int)pbVar99->bfs;
      goto LAB_0014ab8b;
    }
LAB_0014af6b:
    auVar255 = auVar260._0_16_;
    pbVar81 = pbVar82;
    if (pbVar82 == (bb_t_conflict)0x0) {
      if ((int)uVar214 != 0) {
        pMStack_4a0 = (MIR_context_t)0x14af88;
        remove_unreachable_bbs(pgVar120);
      }
      goto LAB_0014af88;
    }
  }
  if (pbVar201 == (bb_insn_t)0x0) {
LAB_0014ae06:
    peVar23 = (pbVar81->out_edges).head;
    if (peVar23 == (out_edge_t)0x0) {
LAB_0014f8d3:
      pMStack_4a0 = (MIR_context_t)0x14f8f2;
      __assert_fail("out_e != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x19f4,"void jump_opt(gen_ctx_t)");
    }
    pFVar20->_IO_read_ptr = (char *)peVar23->dst;
    peVar21 = (in_edge_t_conflict)pFVar20->_IO_read_end;
    pDVar226 = (DLIST_in_edge_t *)&(peVar21->in_link).next;
    if (peVar21 == (in_edge_t_conflict)0x0) {
      pDVar226 = &pbVar81->in_edges;
    }
    pDVar226->head = (in_edge_t_conflict)0x0;
    if ((FILE *)(pbVar81->in_edges).tail == pFVar20) {
      auVar260 = ZEXT864(0) << 0x40;
      (pbVar81->in_edges).tail = peVar21;
      pFVar20->_IO_read_end = (char *)0x0;
      pFVar20->_IO_read_base = (char *)0x0;
      pbVar107 = peVar23->dst;
      if ((pbVar107->in_edges).tail != (in_edge_t_conflict)0x0) {
        __stream = (gen_ctx_t)(peVar23->in_link).prev;
        peVar25 = (pbVar107->in_edges).head;
        if (__stream == (gen_ctx_t)0x0) {
          if (peVar25 != peVar23) goto LAB_0014f93f;
          (peVar23->in_link).prev = (in_edge_t)pFVar20;
          pFVar20->_IO_read_base = (char *)peVar23;
          pFVar20->_IO_read_end = (char *)0x0;
          (pbVar107->in_edges).head = (in_edge_t_conflict)pFVar20;
        }
        else {
          if (peVar25 == (out_edge_t)0x0) {
            pMStack_4a0 = (MIR_context_t)0x14f93f;
            generate_func_code_cold_57();
LAB_0014f93f:
            pMStack_4a0 = (MIR_context_t)0x14f944;
            generate_func_code_cold_58();
            goto LAB_0014f944;
          }
          __stream->debug_file = pFVar20;
          pFVar20->_IO_read_end = (char *)__stream;
          (peVar23->in_link).prev = (in_edge_t)pFVar20;
          pFVar20->_IO_read_base = (char *)peVar23;
        }
        if ((pbVar81->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0014f8fc;
        pMStack_4a0 = (MIR_context_t)0x14af63;
        __stream = pgVar120;
        remove_bb(pgVar120,pbVar81);
        goto LAB_0014af6b;
      }
    }
    else {
      pMStack_4a0 = (MIR_context_t)0x14f8f7;
      generate_func_code_cold_56();
    }
    pMStack_4a0 = (MIR_context_t)0x14f8fc;
    generate_func_code_cold_59();
LAB_0014f8fc:
    pMStack_4a0 = (MIR_context_t)0x14f91b;
    __assert_fail("(DLIST_in_edge_t_head (&(bb->in_edges))) == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x19f8,"void jump_opt(gen_ctx_t)");
  }
  pbVar99 = (bb_t)pbVar201->insn;
  iVar71 = (int)pbVar99->bfs;
  if (((iVar71 != 0xb4) || ((pbVar201->bb_insn_link).next != (bb_insn_t)0x0)) ||
     ((pbVar201->bb_insn_link).prev != (bb_insn_t)0x0)) {
LAB_0014ab8b:
    if (((iVar71 - 0x76U < 0x2a) || (iVar71 - 0xa1U < 4)) || (iVar71 == 0xa0)) {
      __stream = (gen_ctx_t)pgVar120->debug_file;
      if ((__stream != (gen_ctx_t)0x0) && (1 < pgVar120->debug_level)) {
        pMStack_4a0 = (MIR_context_t)0x14abc4;
        fprintf((FILE *)__stream,"  BB%lu:\n");
      }
      if (*(char *)&(pbVar99->bb_link).next != '\f') {
LAB_0014f8af:
        pMStack_4a0 = (MIR_context_t)0x14f8ce;
        __assert_fail("insn->ops[0].mode == MIR_OP_LABEL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1a01,"void jump_opt(gen_ctx_t)");
      }
      peVar21 = (in_edge_t_conflict)pbVar99->rpost;
      if (((peVar21 == (in_edge_t_conflict)0x0) || (*(int *)&(peVar21->in_link).next != 0xb4)) ||
         (peVar21 != (pbVar99->in_edges).head)) {
LAB_0014abef:
        pbVar107 = (bb_t)(pbVar99->in_edges).head;
        pbVar22 = pbVar107;
        do {
          pcVar79 = (char *)pbVar22;
          pbVar22 = (bb_t)((bb_t)pcVar79)->rpost;
          if (pbVar22 == (bb_t)0x0) goto LAB_0014ac16;
          iVar71 = (int)pbVar22->bfs;
        } while (iVar71 == 0xb4);
        if (iVar71 == 0x76) {
          pcVar79 = (char *)(pbVar22->in_edges).head;
        }
LAB_0014ac16:
        if (pbVar107 != (bb_t)pcVar79) {
          if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x14ac48;
            fwrite("  Changing label in branch insn ",0x20,1,(FILE *)pgVar120->debug_file);
            pMStack_4a0 = (MIR_context_t)0x14ac67;
            __stream = ctx_01;
            MIR_output_insn((MIR_context_t)ctx_01,pgVar120->debug_file,(MIR_insn_t_conflict)pbVar99,
                            (pgVar120->curr_func_item->u).func,0);
            pbVar107 = (bb_t)(pbVar99->in_edges).head;
          }
          sVar233 = pbVar107->index;
          (pbVar99->in_edges).head = (in_edge_t_conflict)pcVar79;
          pbVar107 = *(bb_t *)(sVar233 + 0x30);
          pbVar22 = *(bb_t *)(((bb_t)pcVar79)->index + 0x30);
          pDVar223 = &pbVar81->out_edges;
          if (pbVar107 == pbVar22) goto LAB_0014f7a2;
          do {
            peVar23 = pDVar223->head;
            pDVar223 = (DLIST_out_edge_t *)&(peVar23->out_link).next;
          } while (peVar23->dst != pbVar107);
          peVar23->dst = pbVar22;
          peVar24 = (peVar23->in_link).prev;
          if (peVar24 == (in_edge_t)0x0) {
            if ((pbVar107->in_edges).head == peVar23) {
              peVar224 = (peVar23->in_link).next;
              (pbVar107->in_edges).head = peVar224;
              goto LAB_0014acc0;
            }
            pMStack_4a0 = (MIR_context_t)0x14f853;
            generate_func_code_cold_60();
LAB_0014f853:
            pMStack_4a0 = (MIR_context_t)0x14f858;
            generate_func_code_cold_61();
LAB_0014f858:
            pMStack_4a0 = (MIR_context_t)0x14f85d;
            generate_func_code_cold_63();
            goto LAB_0014f85d;
          }
          peVar224 = (peVar23->in_link).next;
          (peVar24->in_link).next = peVar224;
LAB_0014acc0:
          if (peVar224 == (in_edge_t_conflict)0x0) {
            if ((pbVar107->in_edges).tail != peVar23) goto LAB_0014f853;
            pDVar225 = (DLIST_LINK_in_edge_t *)&(pbVar107->in_edges).tail;
          }
          else {
            pDVar225 = &peVar224->in_link;
          }
          auVar260 = ZEXT864(0) << 0x40;
          pDVar225->prev = peVar24;
          (peVar23->in_link).prev = (in_edge_t)0x0;
          (peVar23->in_link).next = (in_edge_t)0x0;
          pbVar107 = peVar23->dst;
          peVar21 = (pbVar107->in_edges).tail;
          if (peVar21 == (in_edge_t_conflict)0x0) {
            if ((pbVar107->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0014f858;
            pDVar226 = &pbVar107->in_edges;
          }
          else {
            if ((peVar21->in_link).next != (in_edge_t)0x0) {
              pMStack_4a0 = (MIR_context_t)0x14f80e;
              generate_func_code_cold_62();
              goto LAB_0014f80e;
            }
            pDVar226 = (DLIST_in_edge_t *)&(peVar21->in_link).next;
          }
          pDVar226->head = peVar23;
          (peVar23->in_link).next = (in_edge_t)0x0;
          (peVar23->in_link).prev = peVar21;
          (pbVar107->in_edges).tail = peVar23;
          uVar214 = 1;
          pgVar211 = pgVar120;
          if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x14ad5d;
            fwrite("  , result insn ",0x10,1,(FILE *)pgVar120->debug_file);
            uVar214 = 1;
            pMStack_4a0 = (MIR_context_t)0x14ad84;
            __stream = ctx_01;
            MIR_output_insn((MIR_context_t)ctx_01,pgVar120->debug_file,(MIR_insn_t_conflict)pbVar99,
                            (pgVar120->curr_func_item->u).func,1);
          }
          goto LAB_0014abef;
        }
      }
      else {
        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
          pMStack_4a0 = (MIR_context_t)0x14aeba;
          fwrite("  Removing trivial branch insn ",0x1f,1,(FILE *)pgVar120->debug_file);
          pMStack_4a0 = (MIR_context_t)0x14aedc;
          MIR_output_insn((MIR_context_t)ctx_01,pgVar120->debug_file,(MIR_insn_t_conflict)pbVar99,
                          (pgVar120->curr_func_item->u).func,1);
        }
        peVar23 = (pbVar81->out_edges).head;
        peVar23->fall_through_p = '\x01';
        e = (peVar23->out_link).next;
        if (e != (edge_t_conflict)0x0) {
          if ((e->out_link).next != (out_edge_t)0x0) {
            pMStack_4a0 = (MIR_context_t)0x14f93a;
            __assert_fail("e == ((void*)0) || (DLIST_out_edge_t_next (e)) == ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1a0b,"void jump_opt(gen_ctx_t)");
          }
          pMStack_4a0 = (MIR_context_t)0x14aefd;
          delete_edge(e);
        }
        pMStack_4a0 = (MIR_context_t)0x14af0d;
        __stream = pgVar120;
        gen_delete_insn(pgVar120,(MIR_insn_t)pbVar99);
        pgVar211 = pgVar120;
        pbVar82 = pbVar81;
      }
    }
    goto LAB_0014af6b;
  }
  pbVar107 = (bb_t)pgVar120->temp_bitmap;
  if (pbVar107 != (bb_t)0x0) {
    __stream = (gen_ctx_t)(pbVar99->in_edges).head;
    if (((gen_ctx_t)(pbVar107->index << 6) <= __stream) ||
       ((((bitmap_el_t *)pbVar107->rpost)[(ulong)__stream >> 6] >> ((ulong)__stream & 0x3f) & 1) ==
        0)) goto LAB_0014ae06;
    goto LAB_0014ab8b;
  }
LAB_0014f944:
  pMStack_4a0 = (MIR_context_t)MIR_gen_set_debug_file;
  generate_func_code_cold_55();
  pMStack_4a0 = __stream->ctx;
  if (pMStack_4a0 != (MIR_context_t)0x0) {
    *(bb_t *)&pMStack_4a0->func_redef_permission_p = pbVar107;
    return pMStack_4a0;
  }
  pMStack_4a8 = (MIR_context_t)MIR_gen_set_debug_level;
  MIR_gen_set_debug_file_cold_1();
  uVar219 = SUB84(pbVar107,0);
  pMStack_4a8 = __stream->ctx;
  if (pMStack_4a8 != (MIR_context_t)0x0) {
    *(undefined4 *)&pMStack_4a8->insn_nops = uVar219;
    return pMStack_4a8;
  }
  pMStack_4b0 = (MIR_context_t)MIR_gen_set_optimize_level;
  MIR_gen_set_debug_level_cold_1();
  pMStack_4b0 = __stream->ctx;
  if (pMStack_4b0 != (MIR_context_t)0x0) {
    *(undefined4 *)&pMStack_4b0->c2mir_ctx = uVar219;
    return pMStack_4b0;
  }
  pcStack_4b8 = MIR_gen_init;
  MIR_gen_set_optimize_level_cold_1();
  pcStack_4d0 = "  Changing label in branch insn ";
  pgStack_4e0 = pgVar211;
  pbStack_4d8 = (bb_t)pcVar79;
  pbStack_4c8 = pbVar81;
  pbStack_4c0 = pbVar99;
  pcStack_4b8 = (code *)uVar214;
  pgVar120 = (gen_ctx_t)gen_malloc((gen_ctx_t)0x0,0x200);
  __stream->ctx = (MIR_context_t)pgVar120;
  pgVar120->ctx = (MIR_context_t)__stream;
  pgVar120->optimize_level = 2;
  pgVar120->debug_file = (FILE *)0x0;
  pgVar120->target_ctx = (target_ctx *)0x0;
  pgVar120->data_flow_ctx = (data_flow_ctx *)0x0;
  pgVar120->gvn_ctx = (gvn_ctx *)0x0;
  pgVar120->lr_ctx = (lr_ctx *)0x0;
  pgVar120->ra_ctx = (ra_ctx *)0x0;
  pgVar120->combine_ctx = (combine_ctx *)0x0;
  pgVar120->debug_level = 100;
  pgStack_538 = __stream;
  pVVar121 = (VARR_void_ptr_t *)malloc(0x18);
  pVVar121->els_num = 0;
  pgVar120->to_free = pVVar121;
  pVVar121->size = 0x40;
  ppvVar122 = (void_ptr_t *)malloc(0x200);
  pVVar121->varr = ppvVar122;
  pgVar120->addr_insn_p = 0;
  pVVar123 = (VARR_MIR_op_t *)malloc(0x18);
  pVVar123->els_num = 0;
  pgVar120->temp_ops = pVVar123;
  pVVar123->size = 0x10;
  pMVar124 = (MIR_op_t *)malloc(0x300);
  pVVar123->varr = pMVar124;
  pVVar125 = (VARR_MIR_insn_t *)malloc(0x18);
  pVVar125->els_num = 0;
  pgVar120->temp_insns = pVVar125;
  pVVar125->size = 0x10;
  ppMVar86 = (MIR_insn_t_conflict *)malloc(0x80);
  pVVar125->varr = ppMVar86;
  pVVar125 = (VARR_MIR_insn_t *)malloc(0x18);
  pVVar125->els_num = 0;
  pgVar120->temp_insns2 = pVVar125;
  pVVar125->size = 0x10;
  ppMVar86 = (MIR_insn_t_conflict *)malloc(0x80);
  pVVar125->varr = ppMVar86;
  pVVar126 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar126->els_num = 0;
  pgVar120->temp_bb_insns = pVVar126;
  pVVar126->size = 0x10;
  ppbVar94 = (bb_insn_t_conflict *)malloc(0x80);
  pVVar126->varr = ppbVar94;
  pVVar126 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar126->els_num = 0;
  pgVar120->temp_bb_insns2 = pVVar126;
  pVVar126->size = 0x10;
  ppbVar94 = (bb_insn_t_conflict *)malloc(0x80);
  pVVar126->varr = ppbVar94;
  pVVar127 = (VARR_loop_node_t *)malloc(0x18);
  pVVar127->els_num = 0;
  pgVar120->loop_nodes = pVVar127;
  pVVar127->size = 0x20;
  pplVar128 = (loop_node_t_conflict *)malloc(0x100);
  pVVar127->varr = pplVar128;
  pVVar127 = (VARR_loop_node_t *)malloc(0x18);
  pVVar127->els_num = 0;
  pgVar120->queue_nodes = pVVar127;
  pVVar127->size = 0x20;
  pplVar128 = (loop_node_t_conflict *)malloc(0x100);
  pVVar127->varr = pplVar128;
  pVVar127 = (VARR_loop_node_t *)malloc(0x18);
  pVVar127->els_num = 0;
  pgVar120->loop_entries = pVVar127;
  pVVar127->size = 0x10;
  pplVar128 = (loop_node_t_conflict *)malloc(0x80);
  pVVar127->varr = pplVar128;
  pVVar129 = (VARR_mem_attr_t *)malloc(0x18);
  pVVar129->els_num = 0;
  pgVar120->mem_attrs = pVVar129;
  pVVar129->size = 0x20;
  pmVar130 = (mem_attr_t *)malloc(0x400);
  pVVar129->varr = pmVar130;
  pVVar131 = (VARR_target_bb_version_t *)malloc(0x18);
  pVVar131->els_num = 0;
  pgVar120->target_succ_bb_versions = pVVar131;
  pVVar131->size = 0x10;
  pptVar132 = (target_bb_version_t *)malloc(0x80);
  pVVar131->varr = pptVar132;
  pVVar121 = (VARR_void_ptr_t *)malloc(0x18);
  pVVar121->els_num = 0;
  pgVar120->succ_bb_addrs = pVVar121;
  pVVar121->size = 0x10;
  ppvVar122 = (void_ptr_t *)malloc(0x80);
  pVVar121->varr = ppvVar122;
  pVVar133 = (VARR_spot_attr_t *)malloc(0x18);
  pVVar133->els_num = 0;
  pgVar120->spot_attrs = pVVar133;
  pVVar133->size = 0x20;
  psVar134 = (spot_attr_t *)malloc(0x200);
  pVVar133->varr = psVar134;
  pVVar133 = (VARR_spot_attr_t *)malloc(0x18);
  pVVar133->els_num = 0;
  pgVar120->spot2attr = pVVar133;
  pVVar133->size = 0x20;
  psVar134 = (spot_attr_t *)malloc(0x200);
  pVVar133->varr = psVar134;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pVVar92->varr = pbVar93;
  pgVar120->temp_bitmap = pVVar92;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pVVar92->varr = pbVar93;
  pgVar120->temp_bitmap2 = pVVar92;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pgVar120->temp_bitmap3 = pVVar92;
  pVVar92->varr = pbVar93;
  (pgVar120->free_dead_vars).head = (dead_var_t_conflict)0x0;
  (pgVar120->free_dead_vars).tail = (dead_var_t_conflict)0x0;
  pdVar135 = (data_flow_ctx *)gen_malloc(pgVar120,0x18);
  pgVar120->data_flow_ctx = pdVar135;
  pVVar136 = (VARR_bb_t *)malloc(0x18);
  pVVar136->els_num = 0;
  pdVar135->worklist = pVVar136;
  pVVar136->size = 0x40;
  ppbVar97 = (bb_t_conflict *)malloc(0x200);
  pVVar136->varr = ppbVar97;
  pVVar136 = (VARR_bb_t *)malloc(0x18);
  pVVar136->els_num = 0;
  pdVar135->pending = pVVar136;
  pVVar136->size = 0x40;
  ppbVar97 = (bb_t_conflict *)malloc(0x200);
  pVVar136->varr = ppbVar97;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 8;
  pbVar93 = (bitmap_el_t *)malloc(0x40);
  pVVar92->varr = pbVar93;
  pdVar135->bb_to_consider = pVVar92;
  psVar137 = (ssa_ctx *)gen_malloc(pgVar120,0x40);
  pgVar120->ssa_ctx = psVar137;
  pVVar126 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar126->els_num = 0;
  psVar137->arg_bb_insns = pVVar126;
  pVVar126->size = 0x40;
  ppbVar94 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar126->varr = ppbVar94;
  pVVar126 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar126->els_num = 0;
  psVar137->undef_insns = pVVar126;
  pVVar126->size = 0x40;
  ppbVar94 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar126->varr = ppbVar94;
  pVVar126 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar126->els_num = 0;
  psVar137->phis = pVVar126;
  pVVar126->size = 0x40;
  ppbVar94 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar126->varr = ppbVar94;
  pVVar126 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar126->els_num = 0;
  psVar137->deleted_phis = pVVar126;
  pVVar126->size = 0x40;
  ppbVar94 = (bb_insn_t_conflict *)malloc(0x200);
  puVar230 = (uint *)0x40;
  pVVar126->varr = ppbVar94;
  pHVar138 = (HTAB_def_tab_el_t *)malloc(0x40);
  if (pHVar138 == (HTAB_def_tab_el_t *)0x0) goto LAB_001516ca;
  pVVar139 = (VARR_HTAB_EL_def_tab_el_t *)malloc(0x18);
  pVVar139->els_num = 0;
  pHVar138->els = pVVar139;
  pVVar139->size = 0x400;
  pHVar140 = (HTAB_EL_def_tab_el_t *)malloc(0x8000);
  pVVar139->varr = pHVar140;
  if (pHVar140 == (HTAB_EL_def_tab_el_t *)0x0) {
    MIR_gen_init_cold_14();
LAB_001516d4:
    MIR_gen_init_cold_12();
LAB_001516d9:
    MIR_gen_init_cold_10();
LAB_001516de:
    MIR_gen_init_cold_8();
    goto LAB_001516e3;
  }
  pptStack_548 = &pgVar120->target_ctx;
  pVVar139->size = 0x400;
  pVVar139->els_num = 0x400;
  pVVar141 = (VARR_htab_ind_t *)malloc(0x18);
  puVar230 = (uint *)0x2000;
  pVVar141->els_num = 0;
  pHVar138->entries = pVVar141;
  pVVar141->size = 0x800;
  piVar142 = (insn_pattern_info_t *)malloc(0x2000);
  pHVar138->arg = pgVar120;
  sVar233 = 0x800;
  iVar71 = 0x800;
  pVVar141->varr = (htab_ind_t *)piVar142;
  pHVar138->hash_func = def_tab_el_hash;
  pHVar138->eq_func = def_tab_el_eq;
  pHVar138->free_func = (_func_void_def_tab_el_t_void_ptr *)0x0;
  pHVar138->els_num = 0;
  pHVar138->els_start = 0;
  pHVar138->els_bound = 0;
  pHVar138->collisions = 0;
  uVar241 = 0;
  do {
    if (piVar142 == (insn_pattern_info_t *)0x0) goto LAB_001516a9;
    uVar234 = uVar241 + 1;
    if (sVar233 < uVar234) {
      sVar233 = (uVar234 >> 1) + uVar234;
      puVar230 = (uint *)piVar142;
      piVar142 = (insn_pattern_info_t *)realloc(piVar142,sVar233 * 4);
      pVVar141->varr = (htab_ind_t *)piVar142;
      pVVar141->size = sVar233;
      uVar241 = pVVar141->els_num;
      uVar234 = uVar241 + 1;
    }
    iVar71 = iVar71 + -1;
    (&piVar142->start)[uVar241] = 0xffffffff;
    pVVar141->els_num = uVar234;
    uVar241 = uVar234;
  } while (iVar71 != 0);
  psVar28 = pgVar120->ssa_ctx;
  psVar137->def_tab = pHVar138;
  pVVar143 = (VARR_ssa_edge_t *)malloc(0x18);
  psVar28->ssa_edges_to_process = pVVar143;
  pVVar143->els_num = 0;
  pVVar143->size = 0x200;
  ppsVar144 = (ssa_edge_t_conflict *)malloc(0x1000);
  psVar137 = pgVar120->ssa_ctx;
  pVVar143->varr = ppsVar144;
  pVVar145 = (VARR_size_t *)malloc(0x18);
  psVar137->curr_reg_indexes = pVVar145;
  pVVar145->els_num = 0;
  pVVar145->size = 0x1000;
  psVar146 = (size_t *)malloc(0x8000);
  psVar137 = pgVar120->ssa_ctx;
  pVVar145->varr = psVar146;
  pVVar147 = (VARR_char *)malloc(0x18);
  psVar137->reg_name = pVVar147;
  pVVar147->els_num = 0;
  pVVar147->size = 0x14;
  pcVar79 = (char *)malloc(0x14);
  pVVar147->varr = pcVar79;
  pMVar14 = pgVar120->ctx;
  pgVar148 = (gvn_ctx *)gen_malloc(pgVar120,0x30);
  pgVar120->gvn_ctx = pgVar148;
  pVVar149 = (VARR_expr_t *)malloc(0x18);
  pgVar148->exprs = pVVar149;
  pVVar149->els_num = 0;
  pVVar149->size = 0x200;
  ppeVar150 = (expr_t *)malloc(0x1000);
  puVar230 = (uint *)0x40;
  pVVar149->varr = ppeVar150;
  pHVar151 = (HTAB_expr_t *)malloc(0x40);
  if (pHVar151 == (HTAB_expr_t *)0x0) goto LAB_001516ca;
  pVVar152 = (VARR_HTAB_EL_expr_t *)malloc(0x18);
  pVVar152->els_num = 0;
  pHVar151->els = pVVar152;
  pVVar152->size = 0x400;
  pHVar153 = (HTAB_EL_expr_t *)malloc(0x4000);
  pVVar152->varr = pHVar153;
  if (pHVar153 == (HTAB_EL_expr_t *)0x0) goto LAB_001516d4;
  pVVar152->size = 0x400;
  pVVar152->els_num = 0x400;
  pVVar141 = (VARR_htab_ind_t *)malloc(0x18);
  puVar230 = (uint *)0x2000;
  pVVar141->els_num = 0;
  pHVar151->entries = pVVar141;
  pVVar141->size = 0x800;
  piVar142 = (insn_pattern_info_t *)malloc(0x2000);
  sVar233 = 0x800;
  iVar71 = 0x800;
  pVVar141->varr = (htab_ind_t *)piVar142;
  pHVar151->arg = pgVar120;
  pHVar151->hash_func = expr_hash;
  pHVar151->eq_func = expr_eq;
  pHVar151->free_func = (_func_void_expr_t_void_ptr *)0x0;
  pHVar151->els_num = 0;
  pHVar151->els_start = 0;
  pHVar151->els_bound = 0;
  pHVar151->collisions = 0;
  uVar241 = 0;
  do {
    if (piVar142 == (insn_pattern_info_t *)0x0) goto LAB_001516ae;
    uVar234 = uVar241 + 1;
    if (sVar233 < uVar234) {
      sVar233 = (uVar234 >> 1) + uVar234;
      puVar230 = (uint *)piVar142;
      piVar142 = (insn_pattern_info_t *)realloc(piVar142,sVar233 * 4);
      pVVar141->varr = (htab_ind_t *)piVar142;
      pVVar141->size = sVar233;
      uVar241 = pVVar141->els_num;
      uVar234 = uVar241 + 1;
    }
    iVar71 = iVar71 + -1;
    (&piVar142->start)[uVar241] = 0xffffffff;
    pVVar141->els_num = uVar234;
    uVar241 = uVar234;
  } while (iVar71 != 0);
  pgVar148->expr_tab = pHVar151;
  _MIR_new_var_mem_op(&MStack_578,pMVar14,MIR_T_I64,0,0xffffffff,0xffffffff,'\0');
  _MIR_new_var_op(pMVar14,0);
  pMVar83 = MIR_new_insn(pMVar14,MIR_MOV);
  pgVar148 = pgVar120->gvn_ctx;
  pgVar148->temp_mem_insn = pMVar83;
  pVVar154 = (VARR_mem_expr_t *)malloc(0x18);
  pgVar148->mem_exprs = pVVar154;
  pVVar154->els_num = 0;
  pVVar154->size = 0x100;
  ppmVar96 = (mem_expr_t *)malloc(0x800);
  pgVar148 = pgVar120->gvn_ctx;
  puVar230 = (uint *)0x40;
  pVVar154->varr = ppmVar96;
  pHVar155 = (HTAB_mem_expr_t *)malloc(0x40);
  if (pHVar155 == (HTAB_mem_expr_t *)0x0) goto LAB_001516ca;
  pVVar156 = (VARR_HTAB_EL_mem_expr_t *)malloc(0x18);
  pVVar156->els_num = 0;
  pHVar155->els = pVVar156;
  pVVar156->size = 0x200;
  pHVar157 = (HTAB_EL_mem_expr_t *)malloc(0x2000);
  pVVar156->varr = pHVar157;
  if (pHVar157 == (HTAB_EL_mem_expr_t *)0x0) goto LAB_001516d9;
  pVVar156->size = 0x200;
  pVVar156->els_num = 0x200;
  pVVar141 = (VARR_htab_ind_t *)malloc(0x18);
  puVar230 = (uint *)0x1000;
  pVVar141->els_num = 0;
  pHVar155->entries = pVVar141;
  pVVar141->size = 0x400;
  piVar142 = (insn_pattern_info_t *)malloc(0x1000);
  pHVar155->arg = pgVar120;
  sVar233 = 0x400;
  iVar71 = 0x400;
  pVVar141->varr = (htab_ind_t *)piVar142;
  pHVar155->hash_func = mem_expr_hash;
  pHVar155->eq_func = mem_expr_eq;
  pHVar155->free_func = (_func_void_mem_expr_t_void_ptr *)0x0;
  pHVar155->els_num = 0;
  pHVar155->els_start = 0;
  pHVar155->els_bound = 0;
  pHVar155->collisions = 0;
  uVar241 = 0;
  do {
    if (piVar142 == (insn_pattern_info_t *)0x0) goto LAB_001516b3;
    uVar234 = uVar241 + 1;
    if (sVar233 < uVar234) {
      sVar233 = (uVar234 >> 1) + uVar234;
      puVar230 = (uint *)piVar142;
      piVar142 = (insn_pattern_info_t *)realloc(piVar142,sVar233 * 4);
      pVVar141->varr = (htab_ind_t *)piVar142;
      pVVar141->size = sVar233;
      uVar241 = pVVar141->els_num;
      uVar234 = uVar241 + 1;
    }
    iVar71 = iVar71 + -1;
    (&piVar142->start)[uVar241] = 0xffffffff;
    pVVar141->els_num = uVar234;
    uVar241 = uVar234;
  } while (iVar71 != 0);
  pgVar148->mem_expr_tab = pHVar155;
  pgVar148 = pgVar120->gvn_ctx;
  pVVar158 = (VARR_insn_nop_pair_t *)malloc(0x18);
  pgVar148->insn_nop_pairs = pVVar158;
  pVVar158->els_num = 0;
  pVVar158->size = 0x10;
  piVar159 = (insn_nop_pair_t *)malloc(0x100);
  pVVar158->varr = piVar159;
  plVar160 = (lr_ctx *)gen_malloc(pgVar120,0x68);
  pgVar120->lr_ctx = plVar160;
  pVVar161 = (VARR_int *)malloc(0x18);
  plVar160->var_to_scan_var_map = pVVar161;
  pVVar161->els_num = 0;
  pVVar161->size = 0x40;
  piVar115 = (int *)malloc(0x100);
  pVVar161->varr = piVar115;
  pVVar162 = (VARR_MIR_reg_t *)malloc(0x18);
  pVVar162->els_num = 0;
  plVar160->scan_var_to_var_map = pVVar162;
  pVVar162->size = 0x40;
  pMVar109 = (MIR_reg_t *)malloc(0x100);
  pVVar162->varr = pMVar109;
  pVVar163 = (VARR_live_range_t *)malloc(0x18);
  pVVar163->els_num = 0;
  pVVar163->size = 0x40;
  plVar160->free_lr_list = (live_range_t_conflict)0x0;
  plVar160->free_lr_bb_list = (lr_bb_t_conflict)0x0;
  plVar160->var_live_ranges = pVVar163;
  pplVar164 = (live_range_t_conflict *)malloc(0x200);
  pVVar163->varr = pplVar164;
  pVVar161 = (VARR_int *)malloc(0x18);
  pVVar161->els_num = 0;
  plVar160->point_map = pVVar161;
  pVVar161->size = 0x400;
  piVar115 = (int *)malloc(0x1000);
  pVVar161->varr = piVar115;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pVVar92->varr = pbVar93;
  plVar160->live_vars = pVVar92;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pVVar92->varr = pbVar93;
  plVar160->referenced_vars = pVVar92;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pVVar92->varr = pbVar93;
  plVar160->points_with_born_vars = pVVar92;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pVVar92->varr = pbVar93;
  plVar160->points_with_dead_vars = pVVar92;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 4;
  pbVar93 = (bitmap_el_t *)malloc(0x20);
  pVVar92->varr = pbVar93;
  plVar160->points_with_born_or_dead_vars = pVVar92;
  pcVar165 = (coalesce_ctx *)gen_malloc(pgVar120,0x20);
  pgVar120->coalesce_ctx = pcVar165;
  pVVar166 = (VARR_mv_t *)malloc(0x18);
  pVVar166->els_num = 0;
  pcVar165->moves = pVVar166;
  pVVar166->size = 0x40;
  pmVar108 = (mv_t *)malloc(0x400);
  pVVar166->varr = pmVar108;
  pVVar162 = (VARR_MIR_reg_t *)malloc(0x18);
  pVVar162->els_num = 0;
  pVVar162->size = 0x40;
  pcVar165->first_coalesced_reg = pVVar162;
  pMVar109 = (MIR_reg_t *)malloc(0x100);
  pVVar162->varr = pMVar109;
  pVVar162 = (VARR_MIR_reg_t *)malloc(0x18);
  pVVar162->els_num = 0;
  pcVar165->next_coalesced_reg = pVVar162;
  pVVar162->size = 0x40;
  pMVar109 = (MIR_reg_t *)malloc(0x100);
  pVVar162->varr = pMVar109;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 0x40;
  pbVar93 = (bitmap_el_t *)malloc(0x200);
  pVVar92->varr = pbVar93;
  pcVar165->conflict_matrix = pVVar92;
  prVar167 = (ra_ctx *)gen_malloc(pgVar120,0x248);
  pgVar120->ra_ctx = prVar167;
  pVVar162 = (VARR_MIR_reg_t *)malloc(0x18);
  pVVar162->els_num = 0;
  prVar167->reg_renumber = pVVar162;
  pVVar162->size = 0x40;
  pMVar109 = (MIR_reg_t *)malloc(0x100);
  pVVar162->varr = pMVar109;
  pVVar168 = (VARR_allocno_info_t *)malloc(0x18);
  pVVar168->els_num = 0;
  prVar167->sorted_regs = pVVar168;
  pVVar168->size = 0x40;
  paVar169 = (allocno_info_t *)malloc(0x400);
  pVVar168->varr = paVar169;
  pVVar170 = (VARR_bitmap_t *)malloc(0x18);
  pVVar170->els_num = 0;
  prVar167->used_locs = pVVar170;
  pVVar170->size = 0x40;
  ppVVar208 = (bitmap_t *)malloc(0x200);
  pVVar170->varr = ppVVar208;
  pVVar170 = (VARR_bitmap_t *)malloc(0x18);
  pVVar170->els_num = 0;
  prVar167->busy_used_locs = pVVar170;
  pVVar170->size = 0x40;
  ppVVar208 = (bitmap_t *)malloc(0x200);
  pVVar170->varr = ppVVar208;
  pVVar170 = (VARR_bitmap_t *)malloc(0x18);
  pVVar170->els_num = 0;
  prVar167->var_bbs = pVVar170;
  pVVar170->size = 0x40;
  ppVVar208 = (bitmap_t *)malloc(0x200);
  pVVar170->varr = ppVVar208;
  pVVar171 = (VARR_lr_gap_t *)malloc(0x18);
  pVVar171->els_num = 0;
  prVar167->spill_gaps = pVVar171;
  pVVar171->size = 0x40;
  plVar172 = (lr_gap_t *)malloc(0x400);
  pVVar171->varr = plVar172;
  pVVar171 = (VARR_lr_gap_t *)malloc(0x18);
  pVVar171->els_num = 0;
  prVar167->curr_gaps = pVVar171;
  pVVar171->size = 0x40;
  plVar172 = (lr_gap_t *)malloc(0x400);
  pVVar171->varr = plVar172;
  pVVar173 = (VARR_spill_el_t *)malloc(0x18);
  pVVar173->els_num = 0;
  prVar167->spill_els = pVVar173;
  pVVar173->size = 0x40;
  psVar174 = (spill_el_t *)malloc(0x400);
  pVVar173->varr = psVar174;
  lVar207 = 8;
  do {
    pgVar120->ra_ctx->lr_gap_bitmaps[lVar207 + -8] = (bitmap_t)0x0;
    lVar207 = lVar207 + 1;
  } while (lVar207 != 0x2a);
  prVar167 = pgVar120->ra_ctx;
  puVar230 = (uint *)0x40;
  pHVar175 = (HTAB_lr_gap_t *)malloc(0x40);
  if (pHVar175 == (HTAB_lr_gap_t *)0x0) goto LAB_001516ca;
  pVVar176 = (VARR_HTAB_EL_lr_gap_t *)malloc(0x18);
  pVVar176->els_num = 0;
  pHVar175->els = pVVar176;
  pVVar176->size = 0x400;
  pHVar177 = (HTAB_EL_lr_gap_t *)malloc(0x6000);
  pVVar176->varr = pHVar177;
  if (pHVar177 == (HTAB_EL_lr_gap_t *)0x0) goto LAB_001516de;
  pVVar176->size = 0x400;
  pVVar176->els_num = 0x400;
  pVVar141 = (VARR_htab_ind_t *)malloc(0x18);
  puVar230 = (uint *)0x2000;
  pVVar141->els_num = 0;
  pHVar175->entries = pVVar141;
  pVVar141->size = 0x800;
  piVar142 = (insn_pattern_info_t *)malloc(0x2000);
  sVar233 = 0x800;
  iVar71 = 0x800;
  pHVar175->arg = (void *)0x0;
  pVVar141->varr = (htab_ind_t *)piVar142;
  pHVar175->hash_func = lr_gap_hash;
  pHVar175->eq_func = lr_gap_eq;
  pHVar175->free_func = (_func_void_lr_gap_t_void_ptr *)0x0;
  pHVar175->els_num = 0;
  pHVar175->els_start = 0;
  pHVar175->els_bound = 0;
  pHVar175->collisions = 0;
  uVar241 = 0;
  do {
    if (piVar142 == (insn_pattern_info_t *)0x0) goto LAB_001516b8;
    uVar234 = uVar241 + 1;
    if (sVar233 < uVar234) {
      sVar233 = (uVar234 >> 1) + uVar234;
      puVar230 = (uint *)piVar142;
      piVar142 = (insn_pattern_info_t *)realloc(piVar142,sVar233 * 4);
      pVVar141->varr = (htab_ind_t *)piVar142;
      pVVar141->size = sVar233;
      uVar241 = pVVar141->els_num;
      uVar234 = uVar241 + 1;
    }
    iVar71 = iVar71 + -1;
    (&piVar142->start)[uVar241] = 0xffffffff;
    pVVar141->els_num = uVar234;
    uVar241 = uVar234;
  } while (iVar71 != 0);
  prVar167->lr_gap_tab = pHVar175;
  prVar167 = pgVar120->ra_ctx;
  pVVar178 = (VARR_spill_cache_el_t *)malloc(0x18);
  prVar167->spill_cache = pVVar178;
  pVVar178->els_num = 0;
  pVVar178->size = 0x40;
  psVar179 = (spill_cache_el_t *)malloc(0x200);
  prVar167 = pgVar120->ra_ctx;
  pVVar178->varr = psVar179;
  prVar167->spill_cache_age = 0;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 1;
  pbVar93 = (bitmap_el_t *)malloc(8);
  pVVar92->varr = pbVar93;
  prVar167->conflict_locs1 = pVVar92;
  pcVar180 = (combine_ctx *)gen_malloc(pgVar120,0x50);
  pgVar120->combine_ctx = pcVar180;
  pcVar180->curr_bb_var_ref_age = 0;
  pVVar145 = (VARR_size_t *)malloc(0x18);
  pVVar145->els_num = 0;
  pcVar180->var_ref_ages = pVVar145;
  pVVar145->size = 0x40;
  psVar146 = (size_t *)malloc(0x200);
  pVVar145->varr = psVar146;
  pVVar181 = (VARR_var_ref_t *)malloc(0x18);
  pVVar181->els_num = 0;
  pcVar180->var_refs = pVVar181;
  pVVar181->size = 0x40;
  pvVar182 = (var_ref_t *)malloc(0x800);
  pVVar181->varr = pvVar182;
  pVVar162 = (VARR_MIR_reg_t *)malloc(0x18);
  pVVar162->els_num = 0;
  pcVar180->insn_vars = pVVar162;
  pVVar162->size = 0x40;
  pMVar109 = (MIR_reg_t *)malloc(0x100);
  pVVar162->varr = pMVar109;
  pVVar145 = (VARR_size_t *)malloc(0x18);
  pVVar145->els_num = 0;
  pcVar180->changed_op_numbers = pVVar145;
  pVVar145->size = 0x10;
  psVar146 = (size_t *)malloc(0x80);
  pVVar145->varr = psVar146;
  pVVar123 = (VARR_MIR_op_t *)malloc(0x18);
  pVVar123->els_num = 0;
  pcVar180->last_right_ops = pVVar123;
  pVVar123->size = 0x10;
  pMVar124 = (MIR_op_t *)malloc(0x300);
  pVVar123->varr = pMVar124;
  pVVar92 = (bitmap_t)malloc(0x18);
  pVVar92->els_num = 0;
  pVVar92->size = 0x40;
  pbVar93 = (bitmap_el_t *)malloc(0x200);
  pMStack_530 = pgVar120->ctx;
  pVVar92->varr = pbVar93;
  pcVar180->vars_bitmap = pVVar92;
  ptVar183 = (target_ctx *)gen_malloc(pgVar120,0x68);
  pgVar120->target_ctx = ptVar183;
  pVVar184 = (VARR_uint8_t *)malloc(0x18);
  pVVar184->els_num = 0;
  ptVar183->result_code = pVVar184;
  pVVar184->size = 0x40;
  puVar116 = (uint8_t *)malloc(0x40);
  pVVar184->varr = puVar116;
  pVVar161 = (VARR_int *)malloc(0x18);
  pVVar161->els_num = 0;
  ptVar183->insn_pattern_indexes = pVVar161;
  pVVar161->size = 0x40;
  piVar115 = (int *)malloc(0x100);
  pVVar161->varr = piVar115;
  pVVar185 = (VARR_uint64_t *)malloc(0x18);
  pVVar185->els_num = 0;
  ptVar183->const_pool = pVVar185;
  pVVar185->size = 0x40;
  puVar117 = (uint64_t *)malloc(0x200);
  pVVar185->varr = puVar117;
  pVVar186 = (VARR_const_ref_t *)malloc(0x18);
  pVVar186->els_num = 0;
  ptVar183->const_refs = pVVar186;
  pVVar186->size = 0x40;
  pcVar187 = (const_ref_t *)malloc(0xa00);
  pVVar186->varr = pcVar187;
  pVVar188 = (VARR_label_ref_t *)malloc(0x18);
  pVVar188->els_num = 0;
  ptVar183->label_refs = pVVar188;
  pVVar188->size = 0x40;
  plVar189 = (label_ref_t *)malloc(0x800);
  pVVar188->varr = plVar189;
  pVVar185 = (VARR_uint64_t *)malloc(0x18);
  pVVar185->els_num = 0;
  ptVar183->abs_address_locs = pVVar185;
  pVVar185->size = 0x40;
  puVar117 = (uint64_t *)malloc(0x200);
  pVVar185->varr = puVar117;
  pVVar190 = (VARR_MIR_code_reloc_t *)malloc(0x18);
  pVVar190->els_num = 0;
  ptVar183->relocs = pVVar190;
  pVVar190->size = 0x40;
  pMVar119 = (MIR_code_reloc_t *)malloc(0x400);
  pVVar190->varr = pMVar119;
  pVVar191 = (VARR_call_ref_t *)malloc(0x18);
  pVVar191->els_num = 0;
  ptVar183->call_refs = pVVar191;
  pVVar191->size = 0x40;
  pcVar192 = (call_ref_t *)malloc(0x400);
  pVVar191->varr = pcVar192;
  MStack_51c = MIR_T_D;
  aMStack_518[0].size = 0;
  aMStack_518[0].type = MIR_T_D;
  aMStack_518[0]._4_4_ = 0;
  aMStack_518[0].name = "src";
  _MIR_register_unspec_insn(pgVar120->ctx,0,"movdqa",1,&MStack_51c,1,0,aMStack_518);
  ptVar183 = pgVar120->target_ctx;
  pVVar161 = (VARR_int *)malloc(0x18);
  ptVar183->pattern_indexes = pVVar161;
  lVar207 = 0;
  pVVar161->els_num = 0;
  pVVar161->size = 0x40;
  piVar115 = (int *)malloc(0x100);
  pVVar161->varr = piVar115;
LAB_00150b9c:
  iVar71 = 0;
  ppStack_528 = patterns + lVar207;
  pbVar194 = (byte *)patterns[lVar207].replacement;
  lStack_540 = lVar207;
LAB_00150bc6:
  iVar232 = 0;
  iVar77 = 0;
  iVar78 = 0;
  uVar219 = 0;
  uStack_5a4 = 0;
  uStack_5ac = 0;
  uStack_580 = 0;
  uStack_5a8 = 0;
  bVar252 = false;
  uVar70 = 0;
  bVar65 = false;
  bVar250 = false;
  bVar196 = false;
LAB_00150c28:
  puVar230 = &switchD_00150cbb::switchdataD_001b1020;
  bVar249 = *pbVar194;
  MStack_578.data = pbVar194;
  if ((bVar249 == 0) || (bVar249 == 0x3b)) goto LAB_00151042;
  if (((int)(char)bVar249 - 0x30U < 10) ||
     (pbVar193 = pbVar194, '6' < (char)bVar249 && (int)(char)bVar249 - 0x41U < 6)) {
    if (iVar232 != 0) {
      if (iVar77 == 0) {
        iVar77 = 1;
      }
      else {
        iVar77 = 1;
        bVar251 = iVar78 != 0;
        iVar78 = 1;
        if (bVar251) {
          __assert_fail("!opcode2_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x90d,"int get_max_insn_size(gen_ctx_t, const char *)");
        }
      }
    }
    pbVar193 = pbVar194 + 2;
    iVar232 = 1;
    bVar249 = pbVar194[2];
  }
  uVar73 = uStack_5a8;
  MStack_578.data = pbVar193;
  bVar251 = bVar252;
  if (bVar249 < 0x2f) {
    if (bVar249 < 0x20) {
      if (bVar249 != 9) {
        if (bVar249 != 0) goto switchD_00150cbb_caseD_4b;
        goto LAB_00151042;
      }
    }
    else {
      if (bVar249 == 0x20) goto LAB_00151020;
      if (bVar249 != 0x2b) goto switchD_00150cbb_caseD_4b;
      MStack_578.data = pbVar193 + 1;
      if (pbVar193[1] == 0x68) {
        iVar232 = 1;
        MStack_578.data = pbVar193 + 2;
      }
      else {
        iVar232 = 1;
        if (2 < (byte)(pbVar193[1] - 0x30)) goto LAB_0015163e;
      }
    }
    goto LAB_00151020;
  }
  switch(bVar249) {
  case 0x48:
  case 0x68:
    MStack_578.data = pbVar193 + 1;
    read_hex((char **)&MStack_578);
  case 0x71:
    uVar219 = 1;
    break;
  case 0x49:
  case 0x4a:
  case 0x69:
    MStack_578.data = pbVar193 + 1;
    if ((pbVar193[1] & 0xf8) != 0x30) {
      __assert_fail("\'0\' <= ch && ch <= \'7\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x948,"int get_max_insn_size(gen_ctx_t, const char *)");
    }
    if (bVar249 == 0x69) {
      bVar251 = true;
    }
    else if (bVar249 == 0x49) {
      bVar65 = true;
    }
    else {
      bVar250 = true;
    }
    break;
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x55:
  case 0x57:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x73:
  case 0x74:
  case 0x75:
switchD_00150cbb_caseD_4b:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x988,"int get_max_insn_size(gen_ctx_t, const char *)");
  case 0x4c:
    uVar70 = 1;
    goto LAB_00150f68;
  case 0x50:
    MStack_578.data = pbVar193 + 1;
    uVar219 = 1;
    uVar70 = 1;
    if ((pbVar193[1] & 0xf8) != 0x30) {
      __assert_fail("\'0\' <= ch && ch <= \'7\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x95c,"int get_max_insn_size(gen_ctx_t, const char *)");
    }
    break;
  case 0x52:
  case 0x53:
  case 0x72:
    MStack_578.data = pbVar193 + 1;
    uVar219 = 1;
    if (2 < (byte)(pbVar193[1] - 0x30)) {
      __assert_fail("\'0\' <= ch && ch <= \'2\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x924,"int get_max_insn_size(gen_ctx_t, const char *)");
    }
    break;
  case 0x54:
    uVar219 = 1;
    bVar196 = true;
    break;
  case 0x56:
  case 0x76:
    MStack_578.data = pbVar193 + 1;
    read_hex((char **)&MStack_578);
    bVar251 = true;
    if (bVar249 != 0x76) {
      bVar65 = true;
      bVar251 = bVar252;
    }
    break;
  case 0x58:
  case 0x59:
  case 0x5a:
    if (iVar232 == 0) {
      uStack_5a4 = 1;
      iVar232 = 0;
    }
    else {
      iVar232 = 0;
      uStack_5a4 = 1;
      uStack_580 = 1;
      if (iVar77 != 0) {
        __assert_fail("!opcode1_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x91a,"int get_max_insn_size(gen_ctx_t, const char *)");
      }
    }
    break;
  case 0x61:
    MStack_578.data = pbVar193 + 1;
    bVar249 = pbVar193[1];
    if (bVar249 == 0x70) {
      uStack_5ac = 1;
      uVar70 = 1;
    }
    else if (bVar249 == 0x6d) {
      uStack_5ac = 1;
    }
    else {
      if (bVar249 != 100) {
        __assert_fail("ch == \'m\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x941,"int get_max_insn_size(gen_ctx_t, const char *)");
      }
      MStack_578.data = pbVar193 + 2;
      uVar247 = read_hex((char **)&MStack_578);
      uStack_5ac = 1;
      uVar73 = 1;
      if ((long)(char)uVar247 != uVar247) {
        uVar73 = uStack_5a8;
        uVar70 = 1;
      }
    }
    break;
  case 99:
    MStack_578.data = pbVar193 + 1;
    read_hex((char **)&MStack_578);
    bVar252 = uVar70 != 0;
    uVar70 = 1;
    if (bVar252) {
      __assert_fail("!disp32_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x971,"int get_max_insn_size(gen_ctx_t, const char *)");
    }
    break;
  case 0x6c:
    uStack_5a8 = 1;
LAB_00150f68:
    MStack_578.data = pbVar193 + 1;
    uVar73 = uStack_5a8;
    if (2 < (byte)(pbVar193[1] - 0x30)) {
      __assert_fail("\'0\' <= ch && ch <= \'2\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x958,"int get_max_insn_size(gen_ctx_t, const char *)");
    }
    break;
  case 0x6d:
    MStack_578.data = pbVar193 + 1;
    uVar219 = 1;
    if ((pbVar193[1] | 0x20) == 0x74) {
      uStack_5ac = 1;
      uStack_5a8 = 1;
      uVar73 = uStack_5a8;
    }
    else {
      uStack_5ac = 1;
      uVar70 = 1;
      if (2 < (byte)(pbVar193[1] - 0x30)) {
        __assert_fail("\'0\' <= ch && ch <= \'2\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x930,"int get_max_insn_size(gen_ctx_t, const char *)");
      }
    }
    break;
  default:
    if (bVar249 == 0x2f) {
      MStack_578.data = pbVar193 + 1;
      uVar219 = 1;
      if ((pbVar193[1] & 0xf8) != 0x30) {
        __assert_fail("\'0\' <= ch && ch <= \'7\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x962,"int get_max_insn_size(gen_ctx_t, const char *)");
      }
      break;
    }
    if (bVar249 != 0x3b) goto switchD_00150cbb_caseD_4b;
LAB_00151042:
    auVar255 = vpinsrd_avx(ZEXT416(uStack_5a4),uVar219,1);
    auVar255 = vpinsrd_avx(auVar255,uStack_5ac,2);
    auVar253 = vpinsrd_avx(ZEXT416(uStack_5a8),iVar232,1);
    auVar253 = vpinsrd_avx(auVar253,iVar77,2);
    auVar253 = vpinsrd_avx(auVar253,iVar78,3);
    auVar255 = vpinsrd_avx(auVar255,uStack_580,3);
    auVar259._0_16_ = ZEXT116(0) * auVar253 + ZEXT116(1) * auVar255;
    auVar259._16_16_ = ZEXT116(1) * auVar253;
    uVar214 = vptestmd_avx512vl(auVar259,auVar259);
    iVar77 = iVar71 + 4;
    if (uVar70 == 0) {
      iVar77 = iVar71;
    }
    iVar77 = (iVar77 + POPCOUNT((int)uVar214) + 1) - (uint)!bVar252;
    iVar71 = iVar77 + 4;
    if (!bVar65) {
      iVar71 = iVar77;
    }
    iVar77 = iVar71 + 8;
    if (!bVar250) {
      iVar77 = iVar71;
    }
    iVar71 = iVar77 + 4;
    if (!bVar196) {
      iVar71 = iVar77;
    }
    pbVar194 = (byte *)((long)MStack_578.data + 1);
    if (bVar249 == 0) goto code_r0x001510e2;
    goto LAB_00150bc6;
  }
LAB_00151020:
  bVar252 = bVar251;
  uStack_5a8 = uVar73;
  pbVar194 = (byte *)((long)MStack_578.data + 1);
  goto LAB_00150c28;
code_r0x00147312:
  pVVar154->els_num = sVar233 - 1;
  pMStack_4a0 = (MIR_context_t)0x147323;
  free(pVVar154->varr[sVar233 - 1]);
  goto LAB_001472e9;
code_r0x00149a10:
  pbVar107 = (pbVar107->bb_link).prev;
  if (pbVar107 == (bb_t)0x0) goto LAB_00149a19;
  goto LAB_00149a07;
code_r0x001510e2:
  ppStack_528->max_insn_size = iVar71;
  pVVar161 = (*pptStack_548)->pattern_indexes;
  piVar115 = pVVar161->varr;
  if (piVar115 == (int *)0x0) goto LAB_001516bd;
  sVar233 = pVVar161->els_num;
  uVar241 = sVar233 + 1;
  if (pVVar161->size < uVar241) {
    sVar233 = (uVar241 >> 1) + uVar241;
    piVar115 = (int *)realloc(piVar115,sVar233 * 4);
    pVVar161->varr = piVar115;
    pVVar161->size = sVar233;
    sVar233 = pVVar161->els_num;
    uVar241 = sVar233 + 1;
  }
  pptVar63 = pptStack_548;
  pVVar161->els_num = uVar241;
  piVar115[sVar233] = (int)lStack_540;
  lVar207 = lStack_540 + 1;
  if (lVar207 == 0x2d9) goto code_r0x0015116d;
  goto LAB_00150b9c;
LAB_0014bdfb:
  pVVar92 = pbVar99->in;
  if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f4a1;
  pVVar205 = pgVar120->lr_ctx->live_vars;
  if (pVVar205 == (bitmap_t)0x0) goto LAB_0014f4a6;
  uVar241 = pVVar92->els_num;
  uVar234 = pVVar205->els_num;
  pVVar110 = pVVar92;
  uVar215 = uVar234;
  if (uVar234 < uVar241) {
    pVVar110 = pVVar205;
    pVVar205 = pVVar92;
    uVar215 = uVar241;
    uVar241 = uVar234;
  }
  pbVar93 = pVVar205->varr;
  pMStack_4a0 = (MIR_context_t)0x14be63;
  iVar71 = bcmp(pVVar110->varr,pbVar93,uVar241 * 8);
  if (iVar71 != 0) goto LAB_0014f09b;
  if (uVar241 < uVar215) {
    do {
      if (pbVar93[uVar241] != 0) goto LAB_0014f09b;
      uVar241 = uVar241 + 1;
    } while (uVar215 != uVar241);
  }
LAB_0014be8b:
  pbVar99 = (pbVar99->bb_link).next;
  if (pbVar99 == (bb_t)0x0) goto LAB_0014be98;
  goto LAB_0014b980;
  while( true ) {
    uVar73 = pMVar109[uVar234];
    if ((uint)uVar234 != uVar73) {
      prVar91[uVar73].freq = prVar91[uVar73].freq + prVar91[uVar234].freq;
      prVar91[uVar234].freq = 0;
    }
    uVar73 = (uint)uVar234 + 1;
    uVar234 = (ulong)uVar73;
    if (uVar70 < uVar73) break;
LAB_0014c3b3:
    if (uVar241 <= uVar234) goto LAB_0014f3c5;
  }
LAB_0014c3eb:
  uVar241 = 0xffffffffffffffff;
  lVar207 = 0;
  do {
    uVar241 = uVar241 + 1;
    if (pVVar166->els_num <= uVar241) {
      pMVar118 = ((((*local_360)->u).func)->insns).head;
      while (pMVar83 = pMVar118, pMVar83 != (MIR_insn_t_conflict)0x0) {
        pMVar118 = (pMVar83->insn_link).next;
        pMStack_4a0 = (MIR_context_t)0x14c5c4;
        sVar233 = MIR_insn_nops(pMVar14,pMVar83);
        if (sVar233 != 0) {
          pMVar109 = &pMVar83->ops[0].u.mem.index;
          bVar250 = false;
          do {
            if (*(char *)(pMVar109 + -7) == '\v') {
              pMStack_4a0 = (MIR_context_t)0x14c600;
              uVar70 = substitute_reg(pgVar120,pMVar109 + -1);
              pMStack_4a0 = (MIR_context_t)0x14c612;
              uVar73 = substitute_reg(pgVar120,pMVar109);
              uVar73 = uVar73 | uVar70;
LAB_0014c61c:
              bVar250 = uVar73 != 0 || bVar250;
            }
            else if (*(char *)(pMVar109 + -7) == '\x02') {
              pMStack_4a0 = (MIR_context_t)0x14c5f2;
              uVar73 = substitute_reg(pgVar120,(MIR_reg_t *)(pMVar109 + -5));
              goto LAB_0014c61c;
            }
            pMVar109 = pMVar109 + 0xc;
            sVar233 = sVar233 - 1;
          } while (sVar233 != 0);
          if (bVar250) {
            for (puVar230 = *(uint **)((long)pMVar83->data + 0x38); puVar230 != (uint *)0x0;
                puVar230 = *(uint **)(puVar230 + 4)) {
              uVar241 = (ulong)*puVar230;
              if (0x21 < uVar241) {
                pVVar162 = pgVar120->coalesce_ctx->first_coalesced_reg;
                if (((pVVar162 == (VARR_MIR_reg_t *)0x0) || (pVVar162->varr == (MIR_reg_t *)0x0)) ||
                   (pVVar162->els_num <= uVar241)) goto LAB_0014f096;
                uVar70 = pVVar162->varr[uVar241];
                if (uVar70 != *puVar230) {
                  *puVar230 = uVar70;
                }
              }
            }
          }
        }
      }
      for (pbVar81 = (pgVar120->curr_cfg->bbs).head; pbVar81 != (bb_t_conflict)0x0;
          pbVar81 = (pbVar81->bb_link).next) {
        pMStack_4a0 = (MIR_context_t)0x14c6a6;
        update_bitmap_after_coalescing(pgVar120,pbVar81->in);
        pMStack_4a0 = (MIR_context_t)0x14c6b2;
        update_bitmap_after_coalescing(pgVar120,pbVar81->out);
      }
      pFVar112 = (FILE *)pgVar120->debug_file;
      if ((pFVar112 != (FILE *)0x0) && (0 < pgVar120->debug_level)) {
        pVVar166 = pgVar120->coalesce_ctx->moves;
        if (pVVar166 == (VARR_mv_t *)0x0) goto LAB_0014f82a;
        if (iVar71 != 0) {
          pMStack_4a0 = (MIR_context_t)0x14c714;
          fprintf(pFVar112,"Coalesced Moves = %d out of %d moves (%.1f%%)\n",
                  ((double)iVar71 * 100.0) / (double)(int)pVVar166->els_num);
          pFVar112 = (FILE *)pgVar120->debug_file;
          if (pFVar112 == (FILE *)0x0) goto LAB_0014c760;
        }
        if (1 < pgVar120->debug_level) {
          pMStack_4a0 = (MIR_context_t)0x14c73c;
          fwrite("+++++++++++++MIR after coalescing:\n",0x23,1,pFVar112);
          pMStack_4a0 = (MIR_context_t)0x14c760;
          print_CFG(pgVar120,1,1,1,1,output_bb_border_live_info);
        }
      }
      goto LAB_0014c760;
    }
    if (pVVar166->varr == (mv_t *)0x0) {
LAB_0014f28d:
      pMStack_4a0 = (MIR_context_t)0x14f292;
      generate_func_code_cold_85();
LAB_0014f292:
      pMStack_4a0 = (MIR_context_t)0x14f2b1;
      __assert_fail("sreg > ST1_HARD_REG && dreg > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1b27,"void coalesce(gen_ctx_t)");
    }
    pbVar201 = *(bb_insn_t *)((long)&pVVar166->varr->bb_insn + lVar207);
    pMVar118 = pbVar201->insn;
    uVar234 = (ulong)*(uint *)&pMVar118[1].insn_link.next;
    if ((uVar234 < 0x22) || (uVar70 = pMVar118->ops[0].u.reg, uVar70 < 0x22)) goto LAB_0014f292;
    pVVar162 = pcVar165->first_coalesced_reg;
    if ((pVVar162 == (VARR_MIR_reg_t *)0x0) ||
       ((pMVar109 = pVVar162->varr, pMVar109 == (MIR_reg_t *)0x0 || (pVVar162->els_num <= uVar234)))
       ) goto LAB_0014f16a;
    if (pVVar162->els_num <= (ulong)uVar70) {
      pMStack_4a0 = (MIR_context_t)0x14f2b6;
      generate_func_code_cold_82();
      goto LAB_0014f2b6;
    }
    if (pMVar109[uVar234] == pMVar109[uVar70]) {
      pbVar81 = pbVar201->bb;
      if (((pbVar81->bb_insns).tail == pbVar201) && ((pbVar81->bb_insns).head == pbVar201)) {
        pMStack_4a0 = (MIR_context_t)0x14c4fc;
        pMVar83 = MIR_new_label(pMVar14);
        pMStack_4a0 = (MIR_context_t)0x14c51e;
        MIR_insert_insn_before(pMVar14,pgVar120->curr_func_item,pMVar118,pMVar83);
        pMStack_4a0 = (MIR_context_t)0x14c536;
        add_new_bb_insn(pgVar120,pMVar83,pbVar81,0);
        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
          pMStack_4a0 = (MIR_context_t)0x14c55c;
          fwrite("Adding label for becoming empty BB ",0x23,1,(FILE *)pgVar120->debug_file);
          pMStack_4a0 = (MIR_context_t)0x14c583;
          MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar83,(pgVar120->curr_func_item->u).func,1)
          ;
          goto LAB_0014c478;
        }
      }
      else {
LAB_0014c478:
        if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
          pMStack_4a0 = (MIR_context_t)0x14c4a6;
          fwrite("Deleting coalesced move ",0x18,1,(FILE *)pgVar120->debug_file);
          pMStack_4a0 = (MIR_context_t)0x14c4c8;
          MIR_output_insn(pMVar14,pgVar120->debug_file,pMVar118,(pgVar120->curr_func_item->u).func,1
                         );
        }
      }
      pMStack_4a0 = (MIR_context_t)0x14c4d3;
      gen_delete_insn(pgVar120,pMVar118);
      pcVar165 = pgVar120->coalesce_ctx;
      pVVar166 = pcVar165->moves;
    }
    lVar207 = lVar207 + 0x10;
    if (pVVar166 == (VARR_mv_t *)0x0) {
LAB_0014f2b6:
      pMStack_4a0 = (MIR_context_t)0x14f2bb;
      generate_func_code_cold_83();
LAB_0014f2bb:
      pMStack_4a0 = (MIR_context_t)0x14f2da;
      __assert_fail("MIR_addr_code_p (insn->code) && insn->ops[0].mode == MIR_OP_VAR && insn->ops[1].mode == MIR_OP_VAR"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0xb53,"void transform_addrs(gen_ctx_t)");
    }
  } while( true );
LAB_0014dc50:
  uVar241 = uVar241 + 1;
  if (uVar241 == 0x10) goto code_r0x0014dc59;
  goto LAB_0014dc15;
code_r0x0014dc59:
  ptVar183 = pgVar120->target_ctx;
  if ((((ptVar183->leaf_p == '\0') || (ptVar183->alloca_p != '\0')) ||
      (lVar207 != 0 || ptVar183->block_arg_func_p != '\0')) ||
     ((sVar233 != 0 || (pMVar15->vararg_p != '\0')))) {
    plVar222 = (loop_node_t_conflict)(pMVar15->insns).head;
    pMStack_4a0 = (MIR_context_t)0x14dcbf;
    _MIR_new_var_op(pMVar14,4);
    if (pgVar120->target_ctx->keep_fp_p == '\0') {
      bVar250 = true;
    }
    else {
      pMStack_4a0 = (MIR_context_t)0x14dd03;
      _MIR_new_var_op(pMVar14,5);
      pMStack_4a0 = (MIR_context_t)0x14dd35;
      _MIR_new_var_mem_op((MIR_op_t *)local_398,pMVar14,MIR_T_I64,-8,4,0xffffffff,'\x01');
      pMStack_4a0 = (MIR_context_t)0x14dd79;
      pMVar83 = MIR_new_insn(pMVar14,MIR_MOV);
      pMStack_4a0 = (MIR_context_t)0x14dd87;
      gen_add_insn_before(pgVar120,(MIR_insn_t)plVar222,pMVar83);
      pMStack_4a0 = (MIR_context_t)0x14dda1;
      MIR_new_int_op(pMVar14,-8);
      pMStack_4a0 = (MIR_context_t)0x14de0e;
      pMVar83 = MIR_new_insn(pMVar14,MIR_ADD);
      pMStack_4a0 = (MIR_context_t)0x14de1c;
      gen_add_insn_before(pgVar120,(MIR_insn_t)plVar222,pMVar83);
      bVar250 = pgVar120->target_ctx->keep_fp_p == '\0';
    }
    lVar242 = 0xb0;
    if (pMVar15->vararg_p == '\0') {
      lVar242 = 0;
    }
    lVar206 = lVar242 + 8;
    if (pMVar15->jret_p != '\0') {
      lVar206 = lVar242;
    }
    uVar241 = sVar233 * 8 + 0xf & 0xfffffffffffffff0;
    if (!bVar250) {
      uVar241 = sVar233 << 3;
    }
    uVar234 = lVar207 + 0xf + uVar241;
    uVar215 = uVar234 & 0xfffffffffffffff0;
    lVar206 = lVar206 + uVar215;
    pMStack_4a0 = (MIR_context_t)0x14dea0;
    MIR_new_int_op(pMVar14,lVar206);
    pMStack_4a0 = (MIR_context_t)0x14def2;
    pMVar83 = MIR_new_insn(pMVar14,MIR_SUB);
    pMStack_4a0 = (MIR_context_t)0x14df08;
    pcVar79 = (char *)plVar222;
    gen_add_insn_before(pgVar120,(MIR_insn_t)plVar222,pMVar83);
    if (pMVar15->vararg_p != '\0') {
      uVar70 = (uint)uVar234;
      pMStack_4a0 = (MIR_context_t)0x14df26;
      isave(pgVar120,(MIR_insn_t)plVar222,uVar70 & 0xfffffff0,7);
      pMStack_4a0 = (MIR_context_t)0x14df3c;
      isave(pgVar120,(MIR_insn_t)plVar222,uVar70 & 0xfffffff0 | 8,6);
      iVar71 = (int)uVar215;
      pMStack_4a0 = (MIR_context_t)0x14df51;
      isave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x10,2);
      pMStack_4a0 = (MIR_context_t)0x14df66;
      isave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x18,1);
      pMStack_4a0 = (MIR_context_t)0x14df7b;
      isave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x20,8);
      pMStack_4a0 = (MIR_context_t)0x14df90;
      isave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x28,9);
      pMStack_4a0 = (MIR_context_t)0x14dfa5;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x30,0x10);
      pMStack_4a0 = (MIR_context_t)0x14dfba;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x40,0x11);
      pMStack_4a0 = (MIR_context_t)0x14dfcf;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x50,0x12);
      pMStack_4a0 = (MIR_context_t)0x14dfe4;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x60,0x13);
      pMStack_4a0 = (MIR_context_t)0x14dff9;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x70,0x14);
      pMStack_4a0 = (MIR_context_t)0x14e011;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x80,0x15);
      pMStack_4a0 = (MIR_context_t)0x14e029;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0x90,0x16);
      pMStack_4a0 = (MIR_context_t)0x14e041;
      pcVar79 = (char *)plVar222;
      dsave(pgVar120,(MIR_insn_t)plVar222,iVar71 + 0xa0,0x17);
      uVar215 = uVar215 + 0xb0;
    }
    bVar250 = pgVar120->target_ctx->keep_fp_p == '\0';
    uVar234 = -uVar215;
    if (bVar250) {
      uVar234 = uVar241;
    }
    uVar111 = 0;
    local_3f8 = bVar250 ^ 5;
    do {
      if (uVar111 == 3 || (~(uint)uVar111 & 0xc) == 0) {
        if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f16f;
        if ((uVar111 < pVVar92->els_num << 6) && ((*pVVar92->varr >> (uVar111 & 0x3f) & 1) != 0)) {
          pMStack_4a0 = (MIR_context_t)0x14e0f0;
          _MIR_new_var_mem_op((MIR_op_t *)local_258,pMVar14,MIR_T_I64,uVar234,local_3f8,0xffffffff,
                              '\x01');
          pMStack_4a0 = (MIR_context_t)0x14e103;
          _MIR_new_var_op(pMVar14,(uint)uVar111);
          pMStack_4a0 = (MIR_context_t)0x14e14d;
          pMVar83 = MIR_new_insn(pMVar14,MIR_MOV);
          pMStack_4a0 = (MIR_context_t)0x14e160;
          pcVar79 = (char *)plVar222;
          gen_add_insn_before(pgVar120,(MIR_insn_t)plVar222,pMVar83);
          uVar234 = uVar234 + 8;
        }
      }
      uVar111 = uVar111 + 1;
    } while (uVar111 != 0x10);
    for (plVar222 = (loop_node_t_conflict)(pMVar15->insns).tail;
        plVar222 != (loop_node_t_conflict)0x0;
        plVar222 = (loop_node_t_conflict)((DLIST_LINK_MIR_insn_t *)&plVar222->bb)->prev) {
      if (*(int *)&plVar222->parent - 0xabU < 2) {
        uVar234 = -uVar215;
        if (pgVar120->target_ctx->keep_fp_p == '\0') {
          uVar234 = uVar241;
        }
        uVar241 = 0;
        goto LAB_0014e1d3;
      }
    }
  }
  goto LAB_0014e450;
LAB_0014e1d3:
  do {
    if (uVar241 == 3 || (~(uint)uVar241 & 0xc) == 0) {
      if (pVVar92 == (bitmap_t)0x0) goto LAB_0014f2df;
      if ((uVar241 < pVVar92->els_num << 6) && ((*pVVar92->varr >> (uVar241 & 0x3f) & 1) != 0)) {
        pMStack_4a0 = (MIR_context_t)0x14e225;
        _MIR_new_var_op(pMVar14,(uint)uVar241);
        pMStack_4a0 = (MIR_context_t)0x14e252;
        _MIR_new_var_mem_op(local_f8,pMVar14,MIR_T_I64,uVar234,local_3f8,0xffffffff,'\x01');
        pMStack_4a0 = (MIR_context_t)0x14e29c;
        pMVar83 = MIR_new_insn(pMVar14,MIR_MOV);
        pMStack_4a0 = (MIR_context_t)0x14e2af;
        gen_add_insn_before(pgVar120,(MIR_insn_t)plVar222,pMVar83);
        uVar234 = uVar234 + 8;
      }
    }
    uVar241 = uVar241 + 1;
  } while (uVar241 != 0x10);
  if (pgVar120->target_ctx->keep_fp_p == '\0') {
    pMStack_4a0 = (MIR_context_t)0x14e3f0;
    MIR_new_int_op(pMVar14,lVar206);
    MVar218 = MIR_ADD;
  }
  else {
    pMStack_4a0 = (MIR_context_t)0x14e2f9;
    MIR_new_int_op(pMVar14,8);
    pMStack_4a0 = (MIR_context_t)0x14e35d;
    pMVar83 = MIR_new_insn(pMVar14,MIR_ADD);
    pMStack_4a0 = (MIR_context_t)0x14e36b;
    gen_add_insn_before(pgVar120,(MIR_insn_t)plVar222,pMVar83);
    pMStack_4a0 = (MIR_context_t)0x14e39d;
    _MIR_new_var_mem_op(&local_68,pMVar14,MIR_T_I64,-8,4,0xffffffff,'\x01');
    MVar218 = MIR_MOV;
  }
  pMStack_4a0 = (MIR_context_t)0x14e442;
  pMVar83 = MIR_new_insn(pMVar14,MVar218);
  pMStack_4a0 = (MIR_context_t)0x14e450;
  gen_add_insn_before(pgVar120,(MIR_insn_t)plVar222,pMVar83);
  pcVar79 = (char *)plVar222;
LAB_0014e450:
  if (((FILE *)pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
    pMStack_4a0 = (MIR_context_t)0x14e47d;
    fwrite("+++++++++++++MIR after forming prolog/epilog and insn splitting:\n",0x41,1,
           (FILE *)pgVar120->debug_file);
    pcVar79 = (char *)0x0;
    pMStack_4a0 = (MIR_context_t)0x14e497;
    print_CFG(pgVar120,0,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
  }
  if (local_33c == 0) {
    local_400 = (MIR_context_t)0x0;
    puVar116 = (uint8_t *)0x0;
LAB_0014eda7:
    if (pgVar120->optimize_level != 0) {
      pMStack_4a0 = (MIR_context_t)0x14edbd;
      destroy_loop_tree((gen_ctx_t)pgVar120->curr_cfg->root_loop_node,(loop_node_t_conflict)pcVar79)
      ;
    }
    pMVar210 = *local_360;
    if ((pMVar210->item_type != MIR_func_item) || (pMVar210->data == (void *)0x0)) {
LAB_0014f4ab:
      pMStack_4a0 = (MIR_context_t)0x14f4ca;
      __assert_fail("gen_ctx->curr_func_item->item_type == MIR_func_item && gen_ctx->curr_func_item->data != ((void*)0)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x751,"void destroy_func_cfg(gen_ctx_t)");
    }
    for (pMVar83 = (((pMVar210->u).func)->insns).head; pMVar83 != (MIR_insn_t)0x0;
        pMVar83 = (pMVar83->insn_link).next) {
      pbVar85 = (bb_insn_t_conflict)pMVar83->data;
      if (pgVar120->optimize_level == 0) {
        if (pbVar85 == (bb_insn_t_conflict)0x0) {
LAB_0014f1d4:
          pMStack_4a0 = (MIR_context_t)0x14f1f3;
          __assert_fail("insn->data != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x755,"void destroy_func_cfg(gen_ctx_t)");
        }
        pMStack_4a0 = (MIR_context_t)0x14ee16;
        delete_insn_data(pMVar83);
      }
      else {
        if (pbVar85 == (bb_insn_t_conflict)0x0) goto LAB_0014f188;
        pMStack_4a0 = (MIR_context_t)0x14ee03;
        delete_bb_insn(pgVar120,pbVar85);
      }
    }
    pfVar80 = pgVar120->curr_cfg;
    pbVar81 = (pfVar80->bbs).head;
    if (pbVar81 != (bb_t_conflict)0x0) {
      do {
        pbVar99 = (pbVar81->bb_link).next;
        pMStack_4a0 = (MIR_context_t)0x14ee38;
        delete_bb(pgVar120,pbVar81);
        pbVar81 = pbVar99;
      } while (pbVar99 != (bb_t)0x0);
      pfVar80 = pgVar120->curr_cfg;
    }
    pVVar90 = pfVar80->reg_info;
    if ((pVVar90 == (VARR_reg_info_t *)0x0) || (pVVar90->varr == (reg_info_t *)0x0)) {
      pMStack_4a0 = (MIR_context_t)0x14f4cf;
      generate_func_code_cold_136();
    }
    else {
      pMStack_4a0 = (MIR_context_t)0x14ee66;
      free(pVVar90->varr);
      pMStack_4a0 = (MIR_context_t)0x14ee6e;
      free(pVVar90);
      pfVar80->reg_info = (VARR_reg_info_t *)0x0;
      pVVar92 = pgVar120->curr_cfg->call_crossed_regs;
      if ((pVVar92 != (bitmap_t)0x0) && (pVVar92->varr != (bitmap_el_t *)0x0)) {
        pMStack_4a0 = (MIR_context_t)0x14ee9c;
        free(pVVar92->varr);
        pMStack_4a0 = (MIR_context_t)0x14eea4;
        free(pVVar92);
        ppMVar64 = local_360;
        pMStack_4a0 = (MIR_context_t)0x14eeb7;
        free((*local_360)->data);
        pMVar16 = local_350;
        (*ppMVar64)->data = (void *)0x0;
        if (local_33c == 0) {
          pvVar217 = (void *)0x0;
        }
        else {
          pFVar112 = (FILE *)pgVar120->debug_file;
          if ((pFVar112 != (FILE *)0x0) && (-1 < pgVar120->debug_level)) {
            pMStack_4a0 = (MIR_context_t)0x14eefd;
            pcVar79 = MIR_item_name(local_348,local_350);
            lVar207 = 0;
            for (pMVar83 = (((pMVar16->u).func)->insns).head; pMVar83 != (MIR_insn_t_conflict)0x0;
                pMVar83 = (pMVar83->insn_link).next) {
              lVar207 = lVar207 + 1;
            }
            pMStack_4a0 = (MIR_context_t)0x14ef32;
            gettimeofday(&local_218,(__timezone_ptr_t)0x0);
            auVar258._0_8_ = (double)CONCAT44(local_218.tv_usec._4_4_,(undefined4)local_218.tv_usec)
            ;
            auVar258._8_8_ = in_XMM2_Qb;
            auVar261._0_8_ = (double)CONCAT44(local_218.tv_sec._4_4_,(uint)local_218.tv_sec);
            auVar261._8_8_ = in_XMM2_Qb;
            auVar255 = vfmadd132sd_fma(auVar261,auVar258,ZEXT816(0x412e848000000000));
            pMStack_4a0 = (MIR_context_t)0x14ef7d;
            fprintf(pFVar112,
                    "  Code generation for %s: %lu MIR insns (addr=%llx, len=%lu) -- time %.2f ms\n"
                    ,(auVar255._0_8_ - (double)local_2f8) / 1000.0,pcVar79,lVar207,puVar116,
                    local_400);
          }
          pMVar16 = local_350;
          pMStack_4a0 = (MIR_context_t)0x14ef95;
          _MIR_restore_func_insns(local_348,local_350);
          ppvVar248 = &pMVar16->addr;
          ((pMVar16->u).func)->machine_code = puVar116;
LAB_0014efa1:
          pvVar217 = *ppvVar248;
        }
        return pvVar217;
      }
    }
    pMStack_4a0 = (MIR_context_t)0x14f4d4;
    generate_func_code_cold_135();
LAB_0014f4d4:
    pMStack_4a0 = (MIR_context_t)0x14f4d9;
    generate_func_code_cold_29();
LAB_0014f4d9:
    pMStack_4a0 = (MIR_context_t)0x14f4de;
    generate_func_code_cold_28();
LAB_0014f4de:
    pMStack_4a0 = (MIR_context_t)0x14f4fd;
    __assert_fail("func_item->u.func->call_addr != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2410,"void *generate_func_code(MIR_context_t, MIR_item_t, int)");
  }
  pMVar210 = pgVar120->curr_func_item;
  if (pMVar210->item_type != MIR_func_item) {
    pMStack_4a0 = (MIR_context_t)0x14f66f;
    __assert_fail("gen_ctx->curr_func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0xb44,"uint8_t *target_translate(gen_ctx_t, size_t *)");
  }
  ptVar183 = pgVar120->target_ctx;
  pVVar184 = ptVar183->result_code;
  if ((pVVar184 == (VARR_uint8_t *)0x0) || (pVVar184->varr == (uint8_t *)0x0)) {
LAB_0014f545:
    pMStack_4a0 = (MIR_context_t)0x14f54a;
    generate_func_code_cold_159();
LAB_0014f54a:
    pMStack_4a0 = (MIR_context_t)0x14f54f;
    generate_func_code_cold_158();
LAB_0014f54f:
    pMStack_4a0 = (MIR_context_t)0x14f554;
    generate_func_code_cold_157();
LAB_0014f554:
    pMStack_4a0 = (MIR_context_t)0x14f559;
    generate_func_code_cold_156();
LAB_0014f559:
    pMStack_4a0 = (MIR_context_t)0x14f55e;
    generate_func_code_cold_155();
LAB_0014f55e:
    pMStack_4a0 = (MIR_context_t)0x14f563;
    generate_func_code_cold_154();
  }
  else {
    pVVar184->els_num = 0;
    pVVar185 = ptVar183->const_pool;
    if ((pVVar185 == (VARR_uint64_t *)0x0) || (pVVar185->varr == (uint64_t *)0x0))
    goto LAB_0014f54a;
    pVVar185->els_num = 0;
    pVVar186 = ptVar183->const_refs;
    if ((pVVar186 == (VARR_const_ref_t *)0x0) || (pVVar186->varr == (const_ref_t *)0x0))
    goto LAB_0014f54f;
    pVVar186->els_num = 0;
    pVVar188 = ptVar183->label_refs;
    if ((pVVar188 == (VARR_label_ref_t *)0x0) || (pVVar188->varr == (label_ref_t *)0x0))
    goto LAB_0014f554;
    pVVar188->els_num = 0;
    pVVar185 = ptVar183->abs_address_locs;
    if ((pVVar185 == (VARR_uint64_t *)0x0) || (pVVar185->varr == (uint64_t *)0x0))
    goto LAB_0014f559;
    pVVar185->els_num = 0;
    pVVar161 = ptVar183->insn_pattern_indexes;
    if ((pVVar161 == (VARR_int *)0x0) || (pVVar161->varr == (int *)0x0)) goto LAB_0014f55e;
    pVVar161->els_num = 0;
    puVar246 = (undefined1 *)(((pMVar210->u).func)->insns).head;
    if ((MIR_insn_t_conflict)puVar246 != (MIR_insn_t_conflict)0x0) {
      sVar233 = 0;
      do {
        if (*(int *)&((MIR_insn_t)puVar246)->field_0x18 != 0xb9) {
          if (*(int *)&((MIR_insn_t)puVar246)->field_0x18 == 0xb4) {
            pMStack_4a0 = (MIR_context_t)0x14e5b8;
            iVar71 = gen_nested_loop_label_p(pgVar120,(MIR_insn_t)puVar246);
            if (iVar71 != 0) {
              sVar233 = sVar233 + 8;
            }
            pMStack_4a0 = (MIR_context_t)0x14e5d1;
            set_label_disp(pgVar120,(MIR_insn_t)puVar246,sVar233);
          }
          else {
            pMStack_4a0 = (MIR_context_t)0x14e5e3;
            iVar71 = find_insn_pattern(pgVar120,(MIR_insn_t)puVar246,(int *)&local_218);
            if (iVar71 < 0) goto LAB_0014f31c;
            pVVar161 = pgVar120->target_ctx->insn_pattern_indexes;
            uVar241 = (ulong)((int)(*(ulong *)&((MIR_insn_t)puVar246)->field_0x18 >> 0x1d) - 8U &
                             0xfffffff8);
            if ((int)*(ulong *)&((MIR_insn_t)puVar246)->field_0x18 != 0xaa) {
              uVar241 = 0;
            }
            piVar115 = pVVar161->varr;
            if (piVar115 == (int *)0x0) goto LAB_0014f317;
            sVar220 = pVVar161->els_num;
            lVar207 = (long)(int)(uint)local_218.tv_sec;
            uVar234 = sVar220 + 1;
            if (pVVar161->size < uVar234) {
              sVar220 = (uVar234 >> 1) + uVar234;
              pMStack_4a0 = (MIR_context_t)0x14e659;
              piVar115 = (int *)realloc(piVar115,sVar220 * 4);
              pVVar161->varr = piVar115;
              pVVar161->size = sVar220;
              sVar220 = pVVar161->els_num;
              uVar234 = sVar220 + 1;
            }
            pVVar161->els_num = uVar234;
            piVar115[sVar220] = iVar71;
            sVar233 = sVar233 + lVar207 + uVar241;
          }
        }
        puVar246 = (undefined1 *)(((MIR_insn_t)puVar246)->insn_link).next;
      } while ((MIR_insn_t)puVar246 != (MIR_insn_t)0x0);
      pMVar83 = ((((*local_360)->u).func)->insns).head;
      puVar246 = (undefined1 *)0x0;
      if (pMVar83 != (MIR_insn_t_conflict)0x0) {
        uVar241 = 0;
        do {
          iVar71 = *(int *)&pMVar83->field_0x18;
          if (iVar71 != 0xb9) {
            if (iVar71 != 0xb4) {
              pVVar161 = pgVar120->target_ctx->insn_pattern_indexes;
              if (((pVVar161 != (VARR_int *)0x0) && (pVVar161->varr != (int *)0x0)) &&
                 (uVar241 < pVVar161->els_num)) {
                if (((iVar71 - 0x76U < 0x2a) || (iVar71 - 0xa1U < 4)) || (iVar71 == 0xa0)) {
                  pMStack_4a0 = (MIR_context_t)0x14e7e7;
                  uVar70 = find_insn_pattern(pgVar120,pMVar83,(int *)0x0);
                }
                else {
                  uVar70 = pVVar161->varr[uVar241];
                }
                if (-1 < (int)uVar70) {
                  pVVar184 = pgVar120->target_ctx->result_code;
                  if (pVVar184 != (VARR_uint8_t *)0x0) {
                    sVar233 = pVVar184->els_num;
                    pMStack_4a0 = (MIR_context_t)0x14e81f;
                    out_insn(pgVar120,pMVar83,patterns[uVar70].replacement,(void **)0x0);
                    pVVar184 = pgVar120->target_ctx->result_code;
                    if (pVVar184 == (VARR_uint8_t *)0x0) {
                      pMStack_4a0 = (MIR_context_t)0x14f3fd;
                      generate_func_code_cold_129();
LAB_0014f3fd:
                      pMStack_4a0 = (MIR_context_t)0x14f402;
                      generate_func_code_cold_88();
LAB_0014f402:
                      pMStack_4a0 = (MIR_context_t)0x14f421;
                      __assert_fail("var1 == (VARR_MIR_reg_tget (gen_ctx->coalesce_ctx->first_coalesced_reg, var1))"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1a93,"int var_conflict_p(gen_ctx_t, MIR_reg_t, MIR_reg_t)");
                    }
                    uVar241 = uVar241 + 1;
                    if ((pVVar184->els_num - sVar233 <= (ulong)(long)patterns[uVar70].max_insn_size)
                       || (*(int *)&pMVar83->field_0x18 == 0xaa)) goto LAB_0014e886;
                    goto LAB_0014f535;
                  }
                  goto LAB_0014f3cf;
                }
                goto LAB_0014f3d9;
              }
              goto LAB_0014f1ca;
            }
            pMStack_4a0 = (MIR_context_t)0x14e6e7;
            iVar71 = gen_nested_loop_label_p(pgVar120,pMVar83);
            ptVar183 = pgVar120->target_ctx;
            if (iVar71 != 0) {
              pVVar184 = ptVar183->result_code;
              if (pVVar184 == (VARR_uint8_t *)0x0) {
                pMStack_4a0 = (MIR_context_t)0x14f52b;
                generate_func_code_cold_126();
LAB_0014f52b:
                pMStack_4a0 = (MIR_context_t)0x14f530;
                generate_func_code_cold_96();
LAB_0014f530:
                pMStack_4a0 = (MIR_context_t)0x14f535;
                generate_func_code_cold_93();
LAB_0014f535:
                pMStack_4a0 = (MIR_context_t)0x14f53d;
                generate_func_code_cold_128();
LAB_0014f53d:
                pMStack_4a0 = (MIR_context_t)0x14f545;
                generate_func_code_cold_2();
                goto LAB_0014f545;
              }
              uVar234 = pVVar184->els_num;
              uVar73 = (uint)uVar234 & 7;
              uVar70 = 8 - uVar73;
              if ((uVar234 & 7) == 0) {
                uVar70 = uVar73;
              }
              uVar215 = (ulong)uVar70;
              if (7 < uVar70) goto LAB_0014f507;
              if ((uVar234 & 7) == 0) goto LAB_0014e859;
              if (pVVar184->varr == (uint8_t *)0x0) {
                pMStack_4a0 = (MIR_context_t)0x14f596;
                generate_func_code_cold_125();
                goto LAB_0014f596;
              }
              iVar71 = *(int *)(nop_pats_rel + uVar215 * 4);
              uVar234 = uVar234 + uVar215;
              if (pVVar184->size < uVar234) {
                sVar245 = (uVar234 >> 1) + uVar234;
                pMStack_4a0 = (MIR_context_t)0x14e75b;
                puVar116 = (uint8_t *)realloc(pVVar184->varr,sVar245);
                pVVar184->varr = puVar116;
                pVVar184->size = sVar245;
              }
              uVar234 = 0;
              do {
                sVar233 = pVVar184->els_num;
                pVVar184->els_num = sVar233 + 1;
                lVar207 = (long)iVar71 + uVar234;
                uVar234 = uVar234 + 1;
                pVVar184->varr[sVar233] = nop_pats_rel[lVar207];
              } while (uVar215 != uVar234);
              ptVar183 = pgVar120->target_ctx;
            }
LAB_0014e859:
            if (ptVar183->result_code != (VARR_uint8_t *)0x0) {
              pMStack_4a0 = (MIR_context_t)0x14e87c;
              set_label_disp(pgVar120,pMVar83,ptVar183->result_code->els_num);
              goto LAB_0014e886;
            }
            goto LAB_0014f3d4;
          }
LAB_0014e886:
          pMVar83 = (pMVar83->insn_link).next;
          puVar246 = nop_pats_rel;
        } while (pMVar83 != (MIR_insn_t)0x0);
      }
    }
    ptVar183 = pgVar120->target_ctx;
    pVVar188 = ptVar183->label_refs;
    if (pVVar188 != (VARR_label_ref_t *)0x0) {
      uVar241 = 0;
      do {
        if (pVVar188->els_num <= uVar241) goto LAB_0014ea69;
        plVar189 = pVVar188->varr;
        if (plVar189 == (label_ref_t *)0x0) goto LAB_0014f120;
        puVar246 = (undefined1 *)plVar189[uVar241].label_val_disp;
        pMVar118 = plVar189[uVar241].u.label;
        if (plVar189[uVar241].abs_addr_p != '\0') {
          if (ptVar183->result_code == (VARR_uint8_t *)0x0) {
            pMStack_4a0 = (MIR_context_t)0x14f1ac;
            generate_func_code_cold_149();
          }
          else {
            puVar116 = ptVar183->result_code->varr + (long)puVar246;
            pMStack_4a0 = (MIR_context_t)0x14e922;
            sVar233 = get_label_disp(pgVar120,pMVar118);
            uVar70 = 9;
            do {
              *puVar116 = (uint8_t)sVar233;
              puVar116 = puVar116 + 1;
              sVar233 = (long)sVar233 >> 8;
              uVar70 = uVar70 - 1;
            } while (1 < uVar70);
            pVVar185 = pgVar120->target_ctx->abs_address_locs;
            puVar117 = pVVar185->varr;
            if (puVar117 != (uint64_t *)0x0) {
              sVar233 = pVVar185->els_num;
              uVar234 = sVar233 + 1;
              if (pVVar185->size < uVar234) {
                sVar233 = (uVar234 >> 1) + uVar234;
                pMStack_4a0 = (MIR_context_t)0x14e976;
                puVar117 = (uint64_t *)realloc(puVar117,sVar233 * 8);
                pVVar185->varr = puVar117;
                pVVar185->size = sVar233;
                sVar233 = pVVar185->els_num;
                uVar234 = sVar233 + 1;
              }
              pVVar185->els_num = uVar234;
              puVar117[sVar233] = (uint64_t)puVar246;
              goto LAB_0014ea05;
            }
          }
          pMStack_4a0 = (MIR_context_t)0x14f1b1;
          generate_func_code_cold_148();
LAB_0014f1b1:
          pMStack_4a0 = (MIR_context_t)0x14f1b6;
          generate_func_code_cold_122();
LAB_0014f1b6:
          pMStack_4a0 = (MIR_context_t)0x14f1bb;
          generate_func_code_cold_27();
LAB_0014f1bb:
          pMStack_4a0 = (MIR_context_t)0x14f1c0;
          generate_func_code_cold_26();
LAB_0014f1c0:
          pMStack_4a0 = (MIR_context_t)0x14f1c5;
          generate_func_code_cold_1();
LAB_0014f1c5:
          pMStack_4a0 = (MIR_context_t)0x14f1ca;
          generate_func_code_cold_110();
LAB_0014f1ca:
          pMStack_4a0 = (MIR_context_t)0x14f1cf;
          generate_func_code_cold_131();
LAB_0014f1cf:
          pMStack_4a0 = (MIR_context_t)0x14f1d4;
          generate_func_code_cold_101();
          goto LAB_0014f1d4;
        }
        sVar233 = plVar189[uVar241].next_insn_disp;
        if (plVar189[uVar241].short_p == '\0') {
          if (ptVar183->result_code == (VARR_uint8_t *)0x0) goto LAB_0014f3ca;
          puVar246 = ptVar183->result_code->varr +
                     (long)(((MIR_insn_t_conflict)puVar246)->ops + -1) + 0x10;
          pMStack_4a0 = (MIR_context_t)0x14e9ec;
          sVar220 = get_label_disp(pgVar120,pMVar118);
          lVar207 = sVar220 - sVar233;
          uVar70 = 5;
          do {
            *(char *)&((MIR_insn_t_conflict)puVar246)->data = (char)lVar207;
            puVar246 = (undefined1 *)((long)&((MIR_insn_t_conflict)puVar246)->data + 1);
            lVar207 = lVar207 >> 8;
            uVar70 = uVar70 - 1;
          } while (1 < uVar70);
        }
        else {
          pMStack_4a0 = (MIR_context_t)0x14e9a5;
          sVar220 = get_label_disp(pgVar120,pMVar118);
          lVar207 = sVar220 - sVar233;
          uVar67 = (uint8_t)lVar207;
          if ((char)uVar67 != lVar207) goto LAB_0014f2f3;
          pVVar184 = pgVar120->target_ctx->result_code;
          if (pVVar184 == (VARR_uint8_t *)0x0) {
            pMStack_4a0 = (MIR_context_t)0x14f317;
            generate_func_code_cold_150();
LAB_0014f317:
            pMStack_4a0 = (MIR_context_t)0x14f31c;
            generate_func_code_cold_132();
LAB_0014f31c:
            pMStack_4a0 = (MIR_context_t)0x14f334;
            generate_func_code_cold_133();
LAB_0014f334:
            pMStack_4a0 = (MIR_context_t)0x14f33c;
            generate_func_code_cold_65();
LAB_0014f33c:
            pMStack_4a0 = (MIR_context_t)0x14f341;
            generate_func_code_cold_77();
LAB_0014f341:
            pMStack_4a0 = (MIR_context_t)0x14f360;
            __assert_fail("insn->ops[op_num].mode == MIR_OP_VAR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0xb9e,"void transform_addrs(gen_ctx_t)");
          }
          pVVar184->varr[(long)puVar246] = uVar67;
        }
LAB_0014ea05:
        ptVar183 = pgVar120->target_ctx;
        uVar241 = uVar241 + 1;
        pVVar188 = ptVar183->label_refs;
      } while (pVVar188 != (VARR_label_ref_t *)0x0);
    }
    pMStack_4a0 = (MIR_context_t)0x14ea21;
    generate_func_code_cold_153();
    do {
      pMVar118 = (((MIR_insn_t_conflict)puVar246)->insn_link).next;
      if (pMVar118 == (MIR_insn_t)0x0) goto LAB_0014f183;
      pMVar88 = (MIR_insn_t)((long)&pVVar188->els_num + 1);
      if ((((MIR_insn_t_conflict)puVar246)->insn_link).prev < pMVar88) {
        pMVar88 = (MIR_insn_t)((long)pMVar88->ops + (((ulong)pMVar88 >> 1) - 0x20));
        pMStack_4a0 = (MIR_context_t)0x14ea4c;
        pMVar118 = (MIR_insn_t)realloc(pMVar118,(size_t)pMVar88);
        (((MIR_insn_t_conflict)puVar246)->insn_link).next = pMVar118;
        (((MIR_insn_t_conflict)puVar246)->insn_link).prev = pMVar88;
        pVVar188 = (VARR_label_ref_t *)((MIR_insn_t_conflict)puVar246)->data;
        pMVar88 = (MIR_insn_t)((long)&pVVar188->els_num + 1);
      }
      ((MIR_insn_t_conflict)puVar246)->data = pMVar88;
      *(undefined1 *)((long)&pVVar188->varr + (long)(pMVar118->ops + -1)) = 0;
      ptVar183 = pgVar120->target_ctx;
LAB_0014ea69:
      puVar246 = (undefined1 *)ptVar183->result_code;
      if ((MIR_insn_t_conflict)puVar246 == (MIR_insn_t_conflict)0x0) goto LAB_0014f17e;
      pVVar188 = (VARR_label_ref_t *)((MIR_insn_t_conflict)puVar246)->data;
    } while (((ulong)pVVar188 & 0xf) != 0);
    pVVar186 = ptVar183->const_refs;
    if (pVVar186 != (VARR_const_ref_t *)0x0) {
      uVar241 = 0;
      do {
        if (pVVar186->els_num <= uVar241) goto LAB_0014eb77;
        pcVar187 = pVVar186->varr;
        if (pcVar187 == (const_ref_t *)0x0) goto LAB_0014f125;
        pVVar184 = ptVar183->result_code;
        if (pVVar184 == (VARR_uint8_t *)0x0) goto LAB_0014f12a;
        uVar234 = pcVar187[uVar241].const_num;
        puVar116 = pVVar184->varr + pcVar187[uVar241].pc;
        lVar207 = pVVar184->els_num - pcVar187[uVar241].next_insn_disp;
        uVar70 = 5;
        do {
          *puVar116 = (uint8_t)lVar207;
          puVar116 = puVar116 + 1;
          lVar207 = lVar207 >> 8;
          uVar70 = uVar70 - 1;
        } while (1 < uVar70);
        pVVar185 = pgVar120->target_ctx->const_pool;
        if (((pVVar185 == (VARR_uint64_t *)0x0) || (pVVar185->varr == (uint64_t *)0x0)) ||
           (pVVar185->els_num <= uVar234)) {
LAB_0014f04b:
          pMStack_4a0 = (MIR_context_t)0x14f050;
          generate_func_code_cold_143();
LAB_0014f050:
          pMStack_4a0 = (MIR_context_t)0x14f055;
          generate_func_code_cold_16();
LAB_0014f055:
          pMStack_4a0 = (MIR_context_t)0x14f05a;
          generate_func_code_cold_118();
LAB_0014f05a:
          pMStack_4a0 = (MIR_context_t)0x14f079;
          __assert_fail("move_code_p (use_insn->code)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0xbc6,"void transform_addrs(gen_ctx_t)");
        }
        uVar247 = pVVar185->varr[uVar234];
        uVar70 = 9;
        do {
          pMStack_4a0 = (MIR_context_t)0x14eb2f;
          put_byte((gen_ctx *)pgVar120->target_ctx->result_code,(uint)uVar247 & 0xff);
          uVar247 = uVar247 >> 8;
          uVar70 = uVar70 - 1;
        } while (1 < uVar70);
        uVar70 = 9;
        do {
          pMStack_4a0 = (MIR_context_t)0x14eb51;
          put_byte((gen_ctx *)pgVar120->target_ctx->result_code,0);
          uVar70 = uVar70 - 1;
        } while (1 < uVar70);
        ptVar183 = pgVar120->target_ctx;
        uVar241 = uVar241 + 1;
        pVVar186 = ptVar183->const_refs;
      } while (pVVar186 != (VARR_const_ref_t *)0x0);
    }
    pMStack_4a0 = (MIR_context_t)0x14eb77;
    generate_func_code_cold_146();
    ptVar183 = extraout_RAX;
LAB_0014eb77:
    pVVar184 = ptVar183->result_code;
    if (pVVar184 == (VARR_uint8_t *)0x0) {
      pMStack_4a0 = (MIR_context_t)0x14f674;
      generate_func_code_cold_142();
LAB_0014f674:
      pMStack_4a0 = (MIR_context_t)0x14f679;
      generate_func_code_cold_137();
LAB_0014f679:
      pMStack_4a0 = (MIR_context_t)0x14f67e;
      generate_func_code_cold_20();
LAB_0014f67e:
      pMStack_4a0 = (MIR_context_t)0x14f69d;
      __assert_fail("insn->ops[0].mode == MIR_OP_VAR && insn->ops[0].u.var > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0xa90,"void make_conventional_ssa(gen_ctx_t)");
    }
    local_400 = (MIR_context_t)pVVar184->els_num;
    pMStack_4a0 = (MIR_context_t)0x14eba0;
    puVar116 = _MIR_publish_code(local_348,pVVar184->varr,(size_t)local_400);
    ((local_350->u).func)->call_addr = puVar116;
    ptVar183 = pgVar120->target_ctx;
    pVVar190 = ptVar183->relocs;
    if ((pVVar190 != (VARR_MIR_code_reloc_t *)0x0) && (pVVar190->varr != (MIR_code_reloc_t *)0x0)) {
      base = (uint8_t *)((local_350->u).func)->call_addr;
      pVVar190->els_num = 0;
      pVVar185 = ptVar183->abs_address_locs;
      if (pVVar185 != (VARR_uint64_t *)0x0) {
        uVar241 = 0;
        do {
          if (pVVar185->els_num <= uVar241) goto LAB_0014ecb6;
          if (pVVar185->varr == (uint64_t *)0x0) goto LAB_0014f12f;
          sVar233 = pVVar185->varr[uVar241];
          lVar207 = 8;
          uVar234 = 0;
          do {
            uVar234 = (ulong)base[lVar207 + (sVar233 - 1)] | uVar234 << 8;
            lVar207 = lVar207 + -1;
          } while (lVar207 != 0);
          pVVar190 = ptVar183->relocs;
          pMVar119 = pVVar190->varr;
          if (pMVar119 == (MIR_code_reloc_t *)0x0) goto LAB_0014f134;
          sVar220 = pVVar190->els_num;
          uVar215 = sVar220 + 1;
          if (pVVar190->size < uVar215) {
            sVar220 = (uVar215 >> 1) + uVar215;
            pMStack_4a0 = (MIR_context_t)0x14ec70;
            pMVar119 = (MIR_code_reloc_t *)realloc(pMVar119,sVar220 * 0x10);
            pVVar190->varr = pMVar119;
            pVVar190->size = sVar220;
            sVar220 = pVVar190->els_num;
            uVar215 = sVar220 + 1;
          }
          pVVar190->els_num = uVar215;
          uVar241 = uVar241 + 1;
          pMVar119[sVar220].offset = sVar233;
          pMVar119[sVar220].value = base + uVar234;
          ptVar183 = pgVar120->target_ctx;
          pVVar185 = ptVar183->abs_address_locs;
        } while (pVVar185 != (VARR_uint64_t *)0x0);
      }
      pMStack_4a0 = (MIR_context_t)0x14ecb6;
      generate_func_code_cold_140();
      ptVar183 = extraout_RAX_00;
LAB_0014ecb6:
      pVVar190 = ptVar183->relocs;
      if (pVVar190 == (VARR_MIR_code_reloc_t *)0x0) goto LAB_0014f674;
      pMStack_4a0 = (MIR_context_t)0x14ecd6;
      _MIR_update_code_arr(pgVar120->ctx,base,pVVar190->els_num,pVVar190->varr);
      pMStack_4a0 = (MIR_context_t)0x14ece1;
      change_calls(pgVar120,base);
      for (pMVar238 = ((pgVar120->curr_func_item->u).func)->first_lref;
          pMVar238 != (MIR_lref_data *)0x0; pMVar238 = pMVar238->next) {
        pMStack_4a0 = (MIR_context_t)0x14ed01;
        sVar233 = get_label_disp(pgVar120,pMVar238->label);
        lVar207 = pMVar238->disp;
        puVar30 = base;
        if (pMVar238->label2 != (MIR_insn_t)0x0) {
          pMStack_4a0 = (MIR_context_t)0x14ed19;
          sVar220 = get_label_disp(pgVar120,pMVar238->label2);
          puVar30 = (uint8_t *)-sVar220;
        }
        *(uint8_t **)pMVar238->load_addr = puVar30 + sVar233 + lVar207;
      }
      if ((pgVar120->debug_file != (FILE *)0x0) && (1 < pgVar120->debug_level)) {
        pMStack_4a0 = (MIR_context_t)0x14ed60;
        _MIR_dump_code((char *)0x0,puVar116,(size_t)local_400);
        pMStack_4a0 = (MIR_context_t)0x14ed75;
        fprintf((FILE *)pgVar120->debug_file,"code size = %lu:\n",local_400);
      }
      pcVar79 = (char *)local_350->addr;
      pMStack_4a0 = (MIR_context_t)0x14ed96;
      _MIR_redirect_thunk(local_348,pcVar79,((local_350->u).func)->call_addr);
      goto LAB_0014eda7;
    }
  }
  pMStack_4a0 = (MIR_context_t)0x14f568;
  generate_func_code_cold_141();
LAB_0014f568:
  pMStack_4a0 = (MIR_context_t)0x14f56d;
  generate_func_code_cold_179();
LAB_0014f56d:
  pMStack_4a0 = (MIR_context_t)0x14f572;
  generate_func_code_cold_174();
LAB_0014f572:
  pMStack_4a0 = (MIR_context_t)0x14f591;
  __assert_fail("gen_ctx->curr_func_item->item_type == MIR_func_item",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1bac,"void make_io_dup_op_insns(gen_ctx_t)");
code_r0x0015116d:
  if ((*pptStack_548)->pattern_indexes == (VARR_int *)0x0) {
LAB_001516e3:
    MIR_gen_init_cold_5();
  }
  else {
    qsort((*pptStack_548)->pattern_indexes->varr,0x2d9,4,pattern_index_cmp);
    ptVar183 = *pptVar63;
    pVVar195 = (VARR_insn_pattern_info_t *)malloc(0x18);
    puVar230 = (uint *)0x200;
    ptVar183->insn_pattern_info = pVVar195;
    pVVar195->els_num = 0;
    pVVar195->size = 0x40;
    piVar142 = (insn_pattern_info_t *)malloc(0x200);
    iVar71 = 0xbc;
    pVVar195->varr = piVar142;
    do {
      pVVar195 = (*pptVar63)->insn_pattern_info;
      piVar142 = pVVar195->varr;
      if (piVar142 == (insn_pattern_info_t *)0x0) goto LAB_001516c5;
      sVar233 = pVVar195->els_num;
      uVar241 = sVar233 + 1;
      if (pVVar195->size < uVar241) {
        sVar233 = (uVar241 >> 1) + uVar241;
        puVar230 = (uint *)piVar142;
        piVar142 = (insn_pattern_info_t *)realloc(piVar142,sVar233 * 8);
        pVVar195->varr = piVar142;
        pVVar195->size = sVar233;
        sVar233 = pVVar195->els_num;
        uVar241 = sVar233 + 1;
      }
      pMVar14 = pMStack_530;
      iVar71 = iVar71 + -1;
      pVVar195->els_num = uVar241;
      piVar142[sVar233].start = 0;
      piVar142[sVar233].num = 0;
    } while (iVar71 != 0);
    pVVar195 = (*pptVar63)->insn_pattern_info;
    if (pVVar195 != (VARR_insn_pattern_info_t *)0x0) {
      pVVar161 = (*pptVar63)->pattern_indexes;
      if ((pVVar161 == (VARR_int *)0x0) || (piVar115 = pVVar161->varr, piVar115 == (int *)0x0)) {
LAB_001516a4:
        MIR_gen_init_cold_2();
LAB_001516a9:
        MIR_gen_init_cold_13();
LAB_001516ae:
        MIR_gen_init_cold_11();
LAB_001516b3:
        MIR_gen_init_cold_9();
LAB_001516b8:
        MIR_gen_init_cold_7();
LAB_001516bd:
        MIR_gen_init_cold_6();
LAB_001516c5:
        MIR_gen_init_cold_4();
LAB_001516ca:
        mir_htab_error((char *)puVar230);
      }
      piVar142 = pVVar195->varr;
      sVar233 = pVVar161->els_num;
      puVar230 = (uint *)0xbc;
      sVar220 = 0;
      do {
        if (sVar233 == sVar220) goto LAB_001516a4;
        MVar218 = patterns[piVar115[sVar220]].code;
        if (MVar218 != (MIR_insn_code_t)puVar230) {
          if (sVar220 == 0) {
            iVar71 = 0;
          }
          else {
            iVar71 = (int)sVar220;
            piVar142[(long)puVar230].num = iVar71 - piVar142[(long)puVar230].start;
          }
          piVar142[MVar218].start = iVar71;
          puVar230 = (uint *)(ulong)MVar218;
        }
        sVar220 = sVar220 + 1;
      } while (sVar220 != 0x2d9);
      if ((int)puVar230 != 0xbc) {
        iVar77 = 0;
        piVar142[(long)puVar230].num = 0x2d9 - piVar142[(long)puVar230].start;
        MIR_new_label_op(pMStack_530,(MIR_label_t)0x0);
        pMVar83 = MIR_new_insn(pMVar14,MIR_JMP);
        pgVar120->target_ctx->temp_jump = pMVar83;
        iVar71 = find_insn_pattern(pgVar120,pMVar83,(int *)0x0);
        uVar70 = 0;
        pgVar120->target_ctx->temp_jump_pat_ind = iVar71;
        iVar71 = 0;
        pgVar120->max_int_hard_regs = 0;
        pgVar120->max_fp_hard_regs = 0;
        do {
          if ((0x20 < (uVar70 & 0x3e)) || ((0x101000410U >> (uVar70 & 0x3e) & 1) == 0)) {
            if (uVar70 < 0x10) {
              iVar71 = iVar71 + 1;
              pgVar120->max_int_hard_regs = iVar71;
            }
            else {
              iVar77 = iVar77 + 1;
              pgVar120->max_fp_hard_regs = iVar77;
            }
          }
          uVar70 = uVar70 + 1;
        } while (uVar70 != 0x22);
        lVar207 = 0;
        do {
          pVVar92 = (bitmap_t)malloc(0x18);
          pVVar92->els_num = 0;
          pVVar92->size = 1;
          pbVar93 = (bitmap_el_t *)malloc(8);
          uVar241 = 0;
          pVVar92->varr = pbVar93;
          pgVar120->call_used_hard_regs[lVar207] = pVVar92;
          do {
            if (uVar241 != 3 && ((uint)uVar241 & 0x3c) != 0xc) {
              pVVar92 = pgVar120->call_used_hard_regs[lVar207];
              bitmap_expand(pVVar92,uVar241 + 1);
              if (pVVar92 == (bitmap_t)0x0) {
                MIR_gen_init_cold_1();
LAB_0015163e:
                __assert_fail("\'0\' <= ch && ch <= \'2\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0x96a,"int get_max_insn_size(gen_ctx_t, const char *)");
              }
              *pVVar92->varr = *pVVar92->varr | 1L << (uVar241 & 0x3f);
            }
            uVar241 = uVar241 + 1;
          } while (uVar241 != 0x22);
          lVar207 = lVar207 + 1;
          if (lVar207 == 0x13) {
            pVVar92 = (bitmap_t)malloc(0x18);
            pVVar92->els_num = 0;
            pVVar92->size = 4;
            pbVar93 = (bitmap_el_t *)malloc(0x20);
            pVVar92->varr = pbVar93;
            pgVar120->tied_regs = pVVar92;
            pVVar92 = (bitmap_t)malloc(0x18);
            pVVar92->els_num = 0;
            pVVar92->size = 4;
            pbVar93 = (bitmap_el_t *)malloc(0x20);
            pVVar92->varr = pbVar93;
            pgVar120->addr_regs = pVVar92;
            pVVar92 = (bitmap_t)malloc(0x18);
            pVVar92->els_num = 0;
            pVVar92->size = 0x10;
            pbVar93 = (bitmap_el_t *)malloc(0x80);
            pVVar92->varr = pbVar93;
            pgVar120->insn_to_consider = pVVar92;
            pVVar92 = (bitmap_t)malloc(0x18);
            pVVar92->els_num = 0;
            pVVar92->size = 1;
            pbVar93 = (bitmap_el_t *)malloc(8);
            pVVar92->varr = pbVar93;
            pgVar120->func_used_hard_regs = pVVar92;
            pvVar217 = _MIR_get_bb_wrapper((MIR_context_t)pgStack_538,pgVar120,bb_version_generator)
            ;
            pgVar120->bb_wrapper = pvVar217;
            pgVar120->overall_bbs_num = 0;
            pgVar120->overall_gen_bbs_num = 0;
            return pvVar217;
          }
        } while( true );
      }
      goto LAB_001516f0;
    }
  }
  MIR_gen_init_cold_3();
LAB_001516f0:
  __assert_fail("prev_code != MIR_INSN_BOUND",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x770,"void patterns_init(gen_ctx_t)");
LAB_0014f22c:
  pMStack_4a0 = (MIR_context_t)0x14f231;
  generate_func_code_cold_30();
LAB_0014f231:
  pMStack_4a0 = (MIR_context_t)0x14f236;
  generate_func_code_cold_117();
LAB_0014f236:
  pMStack_4a0 = (MIR_context_t)0x14f255;
  __assert_fail("func_item->item_type == MIR_func_item && func_item->data == ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x240e,"void *generate_func_code(MIR_context_t, MIR_item_t, int)");
LAB_0014f16f:
  pMStack_4a0 = (MIR_context_t)0x14f174;
  generate_func_code_cold_160();
LAB_0014f174:
  pMStack_4a0 = (MIR_context_t)0x14f179;
  generate_func_code_cold_91();
LAB_0014f179:
  pMStack_4a0 = (MIR_context_t)0x14f17e;
  generate_func_code_cold_9();
LAB_0014f17e:
  pMStack_4a0 = (MIR_context_t)0x14f183;
  generate_func_code_cold_147();
LAB_0014f183:
  pMStack_4a0 = (MIR_context_t)0x14f188;
  generate_func_code_cold_134();
LAB_0014f188:
  pMStack_4a0 = (MIR_context_t)0x14f1a7;
  __assert_fail("bb_insn != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x759,"void destroy_func_cfg(gen_ctx_t)");
LAB_0014f120:
  pMStack_4a0 = (MIR_context_t)0x14f125;
  generate_func_code_cold_152();
LAB_0014f125:
  pMStack_4a0 = (MIR_context_t)0x14f12a;
  generate_func_code_cold_145();
LAB_0014f12a:
  pMStack_4a0 = (MIR_context_t)0x14f12f;
  generate_func_code_cold_144();
LAB_0014f12f:
  pMStack_4a0 = (MIR_context_t)0x14f134;
  generate_func_code_cold_139();
LAB_0014f134:
  pMStack_4a0 = (MIR_context_t)0x14f139;
  generate_func_code_cold_138();
LAB_0014f139:
  pMStack_4a0 = (MIR_context_t)0x14f141;
  generate_func_code_cold_18();
LAB_0014f141:
  pMStack_4a0 = (MIR_context_t)0x14f160;
  __assert_fail("bb_insn->insn->ops[1].data != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xb4b,"void transform_addrs(gen_ctx_t)");
LAB_0014f3c5:
  pMStack_4a0 = (MIR_context_t)0x14f3ca;
  generate_func_code_cold_79();
LAB_0014f3ca:
  pMStack_4a0 = (MIR_context_t)0x14f3cf;
  generate_func_code_cold_151();
LAB_0014f3cf:
  pMStack_4a0 = (MIR_context_t)0x14f3d4;
  generate_func_code_cold_130();
LAB_0014f3d4:
  pMStack_4a0 = (MIR_context_t)0x14f3d9;
  generate_func_code_cold_127();
LAB_0014f3d9:
  pMStack_4a0 = (MIR_context_t)0x14f3f8;
  __assert_fail("ind >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0xb67,"uint8_t *target_translate(gen_ctx_t, size_t *)");
LAB_0014f2df:
  pMStack_4a0 = (MIR_context_t)0x14f2e4;
  generate_func_code_cold_124();
LAB_0014f2e4:
  pMStack_4a0 = (MIR_context_t)0x14f2e9;
  generate_func_code_cold_169();
LAB_0014f2e9:
  pMStack_4a0 = (MIR_context_t)0x14f2ee;
  generate_func_code_cold_35();
LAB_0014f2ee:
  pMStack_4a0 = (MIR_context_t)0x14f2f3;
  generate_func_code_cold_50();
LAB_0014f2f3:
  pMStack_4a0 = (MIR_context_t)0x14f312;
  __assert_fail("-128 <= disp && disp < 128",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0xb1a,"uint8_t *translate_finish(gen_ctx_t, size_t *)");
LAB_0014f502:
  pMStack_4a0 = (MIR_context_t)0x14f507;
  generate_func_code_cold_21();
LAB_0014f507:
  pMStack_4a0 = (MIR_context_t)0x14f526;
  __assert_fail("(size_t) padn < sizeof (nop_pats) / sizeof (char *)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0xb5f,"uint8_t *target_translate(gen_ctx_t, size_t *)");
LAB_0014f07e:
  pMStack_4a0 = (MIR_context_t)0x14f086;
  generate_func_code_cold_4();
LAB_0014f086:
  pMStack_4a0 = (MIR_context_t)0x14f08e;
  generate_func_code_cold_3();
LAB_0014f08e:
  pMStack_4a0 = (MIR_context_t)0x14f096;
  generate_func_code_cold_5();
LAB_0014f096:
  pMStack_4a0 = (MIR_context_t)0x14f09b;
  generate_func_code_cold_80();
LAB_0014f09b:
  pMStack_4a0 = (MIR_context_t)0x14f0ba;
  __assert_fail("bitmap_equal_p (bb->in, gen_ctx->lr_ctx->live_vars)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1a73,"void process_bb_conflicts(gen_ctx_t, bb_t, MIR_insn_t, MIR_insn_t)");
LAB_0014f0f7:
  pMStack_4a0 = (MIR_context_t)0x14f0fc;
  generate_func_code_cold_10();
LAB_0014f0fc:
  pMStack_4a0 = (MIR_context_t)0x14f11b;
  __assert_fail("insn->code == MIR_LABEL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x73b,"void build_func_cfg(gen_ctx_t)");
LAB_0014efe4:
  pMStack_4a0 = (MIR_context_t)0x14efe9;
  generate_func_code_cold_90();
LAB_0014efe9:
  pMStack_4a0 = (MIR_context_t)0x14efee;
  generate_func_code_cold_99();
LAB_0014efee:
  pMStack_4a0 = (MIR_context_t)0x14eff6;
  generate_func_code_cold_13();
LAB_0014eff6:
  pMStack_4a0 = (MIR_context_t)0x14f018;
  __assert_fail("insn->ops[i].mode == MIR_OP_VAR",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xb69,"void transform_addrs(gen_ctx_t)");
}

Assistant:

static void *generate_func_code (MIR_context_t ctx, MIR_item_t func_item, int machine_code_p) {
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  uint8_t *code;
  void *machine_code = NULL;
  size_t code_len = 0;
  double start_time = real_usec_time ();
  uint32_t bbs_num;

  gen_assert (func_item->item_type == MIR_func_item && func_item->data == NULL);
  if (func_item->u.func->machine_code != NULL) {
    gen_assert (func_item->u.func->call_addr != NULL);
    _MIR_redirect_thunk (ctx, func_item->addr, func_item->u.func->call_addr);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++The code for %s has been already generated\n",
               MIR_item_name (ctx, func_item));
    });
    return func_item->addr;
  }
  DEBUG (0, {
    fprintf (debug_file, "Code generation of function %s:\n", MIR_item_name (ctx, func_item));
  });
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR before generator:\n");
    MIR_output_item (ctx, debug_file, func_item);
  });
  curr_func_item = func_item;
  _MIR_duplicate_func_insns (ctx, func_item);
  curr_cfg = func_item->data = gen_malloc (gen_ctx, sizeof (struct func_cfg));
  build_func_cfg (gen_ctx);
  bbs_num = curr_bb_index;
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after building CFG:\n");
    print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
  });
  if (optimize_level >= 2 && !addr_insn_p && clone_bbs (gen_ctx)) {
    /* do not clone bbs before addr transformation: it can prevent addr transformations */
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after cloning BBs:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
    });
  }
  if (optimize_level >= 2) {
    build_ssa (gen_ctx, !addr_insn_p);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after building SSA%s:\n",
               addr_insn_p ? " for address transformation" : "");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2 && addr_insn_p) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Transform Addr Insns and cloning BBs:\n"); });
    transform_addrs (gen_ctx);
    undo_build_ssa (gen_ctx);
    clone_bbs (gen_ctx);
    build_ssa (gen_ctx, TRUE);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Addr Insns Transformation and cloning BBs:\n");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++GVN:\n"); });
    gvn (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after GVN:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
    gvn_clear (gen_ctx);
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Copy Propagation:\n"); });
    copy_prop (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Copy Propagation:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++DSE:\n"); });
    dse (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after DSE:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    ssa_dead_code_elimination (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after dead code elimination:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    build_loop_tree (gen_ctx);
    DEBUG (2, { print_loop_tree (gen_ctx, TRUE); });
    if (licm (gen_ctx)) {
      DEBUG (2, {
        fprintf (debug_file, "+++++++++++++MIR after loop invariant motion:\n");
        print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
      });
    }
    destroy_loop_tree (gen_ctx, curr_cfg->root_loop_node);
    curr_cfg->root_loop_node = NULL;
  }
  if (optimize_level >= 2 && pressure_relief (gen_ctx)) {
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after pressure relief:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    make_conventional_ssa (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after transformation to conventional SSA:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
    ssa_combine (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after ssa combine:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
    undo_build_ssa (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after destroying ssa:\n");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Jump optimization:\n"); });
    jump_opt (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Jump optimization:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  target_machinize (gen_ctx);
  make_io_dup_op_insns (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after machinize:\n");
    print_CFG (gen_ctx, FALSE, FALSE, TRUE, TRUE, NULL);
  });
  if (optimize_level >= 1) {
    build_loop_tree (gen_ctx);
    DEBUG (2, { print_loop_tree (gen_ctx, TRUE); });
  }
  if (optimize_level >= 2) {
    collect_moves (gen_ctx);
    if (consider_move_vars_only (gen_ctx)) {
      calculate_func_cfg_live_info (gen_ctx, FALSE);
      print_live_info (gen_ctx, "Live info before coalesce", TRUE, FALSE);
      coalesce (gen_ctx);
      DEBUG (2, {
        fprintf (debug_file, "+++++++++++++MIR after coalescing:\n");
        print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, output_bb_border_live_info);
      });
    }
  }
  consider_all_live_vars (gen_ctx);
  calculate_func_cfg_live_info (gen_ctx, TRUE);
  print_live_info (gen_ctx, "Live info before RA", optimize_level > 0, TRUE);
  reg_alloc (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after RA:\n");
    print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
  });
  if (optimize_level < 2 && machine_code_p) remove_property_insns (gen_ctx);
  if (optimize_level >= 1) {
    consider_all_live_vars (gen_ctx);
    calculate_func_cfg_live_info (gen_ctx, FALSE);
    add_bb_insn_dead_vars (gen_ctx);
    print_live_info (gen_ctx, "Live info before combine", FALSE, FALSE);
    combine (gen_ctx, machine_code_p); /* After combine the BB live info is still valid */
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after combine:\n");
      print_CFG (gen_ctx, FALSE, FALSE, TRUE, FALSE, NULL);
    });
    dead_code_elimination (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after dead code elimination after 2nd combine:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, FALSE, output_bb_live_info);
    });
  }
  target_make_prolog_epilog (gen_ctx, func_used_hard_regs, func_stack_slots_num);
  target_split_insns (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after forming prolog/epilog and insn splitting:\n");
    print_CFG (gen_ctx, FALSE, FALSE, TRUE, TRUE, NULL);
  });
  if (machine_code_p) {
    code = target_translate (gen_ctx, &code_len);
    machine_code = func_item->u.func->call_addr = _MIR_publish_code (ctx, code, code_len);
    target_rebase (gen_ctx, func_item->u.func->call_addr);
#if MIR_GEN_CALL_TRACE
    func_item->u.func->call_addr = _MIR_get_wrapper (ctx, func_item, print_and_execute_wrapper);
#endif
    DEBUG (2, {
      _MIR_dump_code (NULL, machine_code, code_len);
      fprintf (debug_file, "code size = %lu:\n", (unsigned long) code_len);
    });
    _MIR_redirect_thunk (ctx, func_item->addr, func_item->u.func->call_addr);
  }
  if (optimize_level != 0) destroy_loop_tree (gen_ctx, curr_cfg->root_loop_node);
  destroy_func_cfg (gen_ctx);
  if (collect_bb_stat_p) overall_bbs_num += bbs_num;
  if (!machine_code_p) return NULL;
  DEBUG (0, {
    fprintf (debug_file,
             "  Code generation for %s: %lu MIR insns (addr=%llx, len=%lu) -- time %.2f ms\n",
             MIR_item_name (ctx, func_item),
             (long unsigned) DLIST_LENGTH (MIR_insn_t, func_item->u.func->insns),
             (unsigned long long) machine_code, (unsigned long) code_len,
             (real_usec_time () - start_time) / 1000.0);
  });
  _MIR_restore_func_insns (ctx, func_item);
  /* ??? We should use atomic here but c2mir does not implement them yet.  */
  func_item->u.func->machine_code = machine_code;
  return func_item->addr;
}